

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O3

void av1_dr_prediction_z3_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  unkbyte10 Var17;
  undefined1 auVar18 [12];
  unkbyte10 Var19;
  undefined1 auVar20 [12];
  unkbyte10 Var21;
  undefined1 auVar22 [12];
  unkbyte10 Var23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [14];
  undefined1 auVar49 [12];
  undefined1 auVar50 [14];
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [14];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [14];
  undefined1 auVar59 [12];
  undefined1 auVar60 [14];
  undefined1 auVar61 [12];
  undefined1 auVar62 [14];
  undefined1 auVar63 [12];
  undefined1 auVar64 [14];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [14];
  undefined1 auVar69 [12];
  undefined1 auVar70 [14];
  undefined1 auVar71 [12];
  undefined1 auVar72 [14];
  undefined1 auVar73 [12];
  undefined1 auVar74 [14];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [12];
  undefined1 auVar80 [14];
  undefined1 auVar81 [12];
  undefined1 auVar82 [14];
  undefined1 auVar83 [12];
  undefined1 auVar84 [14];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [14];
  undefined1 auVar97 [12];
  undefined1 auVar98 [14];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  undefined1 auVar105 [14];
  undefined1 auVar106 [12];
  undefined1 auVar107 [14];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [14];
  undefined1 auVar116 [12];
  undefined1 auVar117 [14];
  undefined1 auVar118 [12];
  undefined1 auVar119 [14];
  undefined1 auVar120 [12];
  undefined1 auVar121 [14];
  undefined1 auVar122 [12];
  undefined1 auVar123 [12];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  undefined1 auVar130 [12];
  undefined1 auVar131 [12];
  undefined1 auVar132 [12];
  undefined1 auVar133 [14];
  undefined1 auVar134 [12];
  undefined1 auVar135 [14];
  undefined1 auVar136 [12];
  undefined1 auVar137 [14];
  undefined1 auVar138 [12];
  undefined1 auVar139 [14];
  undefined1 auVar140 [12];
  undefined1 auVar141 [12];
  undefined1 auVar142 [12];
  undefined1 auVar143 [14];
  undefined1 auVar144 [12];
  undefined1 auVar145 [14];
  undefined1 auVar146 [12];
  undefined1 auVar147 [14];
  undefined1 auVar148 [12];
  undefined1 auVar149 [14];
  undefined1 auVar150 [12];
  undefined1 auVar151 [12];
  undefined1 auVar152 [12];
  undefined1 auVar153 [12];
  undefined1 auVar154 [12];
  undefined1 auVar155 [12];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  unkbyte10 Var158;
  undefined1 auVar159 [12];
  unkbyte10 Var160;
  undefined1 auVar161 [12];
  unkbyte10 Var162;
  undefined1 auVar163 [12];
  unkbyte10 Var164;
  undefined1 auVar165 [14];
  undefined1 auVar166 [12];
  undefined1 auVar167 [14];
  undefined1 auVar168 [12];
  undefined1 auVar169 [14];
  undefined1 auVar170 [12];
  undefined1 auVar171 [14];
  undefined1 auVar172 [12];
  undefined1 auVar173 [14];
  undefined1 auVar174 [12];
  undefined1 auVar175 [14];
  undefined1 auVar176 [12];
  undefined1 auVar177 [14];
  undefined1 auVar178 [12];
  undefined1 auVar179 [14];
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar182 [12];
  undefined1 auVar183 [12];
  undefined1 auVar184 [12];
  undefined1 auVar185 [12];
  undefined1 auVar186 [12];
  undefined1 auVar187 [12];
  undefined1 auVar188 [12];
  undefined1 auVar189 [12];
  undefined1 auVar190 [12];
  undefined1 auVar191 [12];
  undefined1 auVar192 [12];
  undefined1 auVar193 [14];
  undefined1 auVar194 [12];
  undefined1 auVar195 [14];
  undefined1 auVar196 [12];
  undefined1 auVar197 [12];
  undefined1 auVar198 [12];
  undefined1 auVar199 [12];
  undefined1 auVar200 [12];
  undefined1 auVar201 [12];
  undefined1 auVar202 [12];
  undefined1 auVar203 [12];
  undefined1 auVar204 [12];
  undefined1 auVar205 [12];
  undefined1 auVar206 [12];
  undefined1 auVar207 [12];
  undefined1 auVar208 [12];
  undefined1 auVar209 [12];
  undefined1 auVar210 [12];
  undefined1 auVar211 [12];
  undefined1 auVar212 [12];
  undefined1 auVar213 [12];
  undefined1 auVar214 [14];
  undefined1 auVar215 [12];
  undefined1 auVar216 [14];
  undefined1 auVar217 [12];
  undefined1 auVar218 [12];
  undefined1 auVar219 [14];
  undefined1 auVar220 [12];
  undefined1 auVar221 [14];
  undefined1 auVar222 [12];
  undefined1 auVar223 [12];
  undefined1 auVar224 [14];
  undefined1 auVar225 [12];
  undefined1 auVar226 [14];
  undefined1 auVar227 [12];
  undefined1 auVar228 [12];
  undefined1 auVar229 [12];
  undefined1 auVar230 [12];
  undefined1 auVar231 [12];
  undefined1 auVar232 [12];
  undefined1 auVar233 [12];
  undefined1 auVar234 [12];
  undefined1 auVar235 [12];
  undefined1 auVar236 [12];
  undefined1 auVar237 [12];
  undefined1 auVar238 [12];
  undefined1 auVar239 [12];
  undefined1 auVar240 [12];
  uint6 uVar241;
  uint6 uVar242;
  unkbyte10 Var243;
  unkbyte10 Var244;
  unkbyte10 Var245;
  unkbyte10 Var246;
  undefined1 auVar247 [11];
  undefined1 auVar248 [11];
  undefined1 auVar249 [11];
  undefined1 auVar250 [11];
  undefined1 auVar251 [11];
  undefined1 auVar252 [11];
  undefined1 auVar253 [11];
  undefined1 auVar254 [11];
  undefined1 auVar255 [11];
  undefined1 auVar256 [11];
  undefined1 auVar257 [11];
  unkbyte10 Var258;
  undefined1 auVar259 [11];
  unkbyte10 Var260;
  undefined1 auVar261 [11];
  undefined1 auVar262 [11];
  undefined1 auVar263 [11];
  undefined1 auVar264 [11];
  undefined1 auVar265 [11];
  undefined1 auVar266 [11];
  undefined1 auVar267 [11];
  undefined1 auVar268 [11];
  undefined1 auVar269 [13];
  undefined1 auVar270 [13];
  undefined1 auVar271 [13];
  undefined1 auVar272 [13];
  undefined1 auVar273 [13];
  undefined1 auVar274 [13];
  undefined1 auVar275 [13];
  undefined1 auVar276 [13];
  undefined1 auVar277 [13];
  undefined1 auVar278 [13];
  undefined1 auVar279 [13];
  undefined1 auVar280 [13];
  undefined1 auVar281 [13];
  undefined1 auVar282 [13];
  undefined1 auVar283 [13];
  undefined1 auVar284 [13];
  undefined1 auVar285 [13];
  undefined1 auVar286 [13];
  undefined1 auVar287 [12];
  undefined1 auVar288 [12];
  undefined1 auVar289 [13];
  undefined1 auVar290 [13];
  undefined1 auVar291 [12];
  undefined1 auVar292 [12];
  undefined1 auVar293 [12];
  undefined1 auVar294 [12];
  undefined1 auVar295 [12];
  undefined1 auVar296 [12];
  undefined1 auVar297 [12];
  undefined1 auVar298 [12];
  bool bVar299;
  long lVar300;
  uint8_t *puVar301;
  byte bVar302;
  undefined1 (*pauVar303) [16];
  long lVar304;
  ptrdiff_t pitchSrc;
  uint uVar305;
  long lVar306;
  int iVar307;
  uint uVar308;
  int iVar309;
  long lVar310;
  ulong uVar311;
  bool bVar312;
  short sVar313;
  undefined2 uVar2257;
  undefined2 uVar314;
  undefined2 uVar2258;
  undefined1 auVar317 [12];
  undefined1 auVar324 [12];
  short sVar502;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar375 [16];
  undefined1 auVar379 [16];
  undefined1 auVar382 [16];
  undefined1 auVar319 [12];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar320 [12];
  undefined1 auVar433 [16];
  undefined1 auVar321 [12];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar322 [12];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar488 [16];
  undefined1 auVar323 [12];
  undefined1 auVar493 [16];
  undefined2 uVar503;
  undefined1 auVar507 [12];
  undefined1 auVar533 [12];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar550 [16];
  undefined1 auVar553 [16];
  undefined1 auVar506 [12];
  undefined1 auVar555 [16];
  undefined1 auVar560 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar566 [16];
  undefined1 auVar570 [16];
  undefined1 auVar508 [12];
  undefined1 auVar572 [16];
  undefined1 auVar577 [16];
  undefined1 auVar509 [12];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar583 [16];
  undefined1 auVar587 [16];
  undefined1 auVar510 [12];
  undefined1 auVar589 [16];
  undefined1 auVar594 [16];
  undefined1 auVar511 [12];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar600 [16];
  undefined1 auVar604 [16];
  undefined1 auVar512 [12];
  undefined1 auVar606 [16];
  undefined1 auVar611 [16];
  undefined1 auVar513 [12];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar617 [16];
  undefined1 auVar620 [16];
  undefined1 auVar514 [12];
  undefined1 auVar622 [16];
  undefined1 auVar627 [16];
  undefined1 auVar515 [12];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar637 [16];
  undefined1 auVar516 [12];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar518 [12];
  undefined1 auVar648 [16];
  undefined1 auVar519 [12];
  undefined1 auVar654 [16];
  undefined1 auVar657 [16];
  undefined1 auVar660 [16];
  undefined1 auVar520 [12];
  undefined1 auVar662 [16];
  undefined1 auVar667 [16];
  undefined1 auVar521 [12];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar673 [16];
  undefined1 auVar677 [16];
  undefined1 auVar522 [12];
  undefined1 auVar679 [16];
  undefined1 auVar684 [16];
  undefined1 auVar523 [12];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar524 [12];
  undefined1 auVar695 [16];
  undefined1 auVar525 [12];
  undefined1 auVar704 [16];
  undefined1 auVar707 [16];
  undefined1 auVar710 [16];
  undefined1 auVar526 [12];
  undefined1 auVar712 [16];
  undefined1 auVar717 [16];
  undefined1 auVar527 [12];
  undefined1 auVar719 [16];
  undefined1 auVar528 [12];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar529 [12];
  undefined1 auVar731 [16];
  undefined1 auVar734 [16];
  undefined1 auVar737 [16];
  undefined1 auVar530 [12];
  undefined1 auVar739 [16];
  undefined1 auVar744 [16];
  undefined1 auVar531 [12];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar754 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar532 [12];
  undefined1 auVar771 [16];
  undefined2 uVar780;
  undefined2 uVar2259;
  undefined4 uVar781;
  undefined1 auVar790 [12];
  undefined1 auVar802 [12];
  undefined1 auVar784 [12];
  undefined1 auVar816 [16];
  undefined1 auVar822 [16];
  undefined1 auVar785 [12];
  undefined1 auVar824 [16];
  undefined1 auVar830 [16];
  undefined1 auVar786 [12];
  undefined1 auVar832 [16];
  undefined1 auVar838 [16];
  undefined1 auVar787 [12];
  undefined1 auVar840 [16];
  undefined1 auVar788 [12];
  undefined1 auVar847 [16];
  undefined1 auVar853 [16];
  undefined1 auVar860 [16];
  undefined1 auVar863 [16];
  undefined1 auVar791 [12];
  undefined1 auVar792 [12];
  undefined1 auVar866 [16];
  undefined1 auVar872 [16];
  undefined1 auVar793 [12];
  undefined1 auVar874 [16];
  undefined1 auVar880 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar795 [12];
  undefined1 auVar895 [16];
  undefined1 auVar796 [12];
  undefined1 auVar897 [16];
  undefined1 auVar797 [12];
  undefined1 auVar798 [12];
  undefined1 auVar905 [16];
  undefined1 auVar799 [12];
  undefined1 auVar910 [16];
  undefined1 auVar800 [12];
  undefined1 auVar912 [16];
  undefined1 auVar918 [16];
  undefined1 auVar925 [16];
  undefined1 auVar801 [12];
  undefined1 auVar929 [16];
  undefined1 auVar934 [16];
  undefined2 uVar935;
  undefined4 uVar936;
  undefined1 auVar939 [12];
  undefined1 auVar963 [12];
  undefined1 in_XMM3 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar940 [12];
  undefined1 auVar986 [16];
  undefined1 auVar991 [16];
  undefined1 auVar941 [12];
  undefined1 auVar942 [12];
  undefined1 auVar1001 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar943 [12];
  undefined1 auVar944 [12];
  undefined1 auVar1016 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar945 [12];
  undefined1 auVar946 [12];
  undefined1 auVar1031 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar947 [12];
  undefined1 auVar948 [12];
  undefined1 auVar1046 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar950 [12];
  undefined1 auVar951 [12];
  undefined1 auVar1065 [16];
  undefined1 auVar952 [12];
  undefined1 auVar953 [12];
  undefined1 auVar1075 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar954 [12];
  undefined1 auVar955 [12];
  undefined1 auVar1090 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar957 [12];
  undefined1 auVar1112 [16];
  undefined1 auVar958 [12];
  undefined1 auVar959 [12];
  undefined1 auVar1122 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar960 [12];
  undefined1 auVar1141 [16];
  undefined1 auVar961 [12];
  undefined1 auVar962 [12];
  undefined1 auVar1151 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  ushort uVar1169;
  undefined1 auVar1170 [12];
  undefined1 auVar1187 [12];
  ushort uVar1346;
  ushort uVar1347;
  ushort uVar1348;
  ushort uVar1349;
  ushort uVar1351;
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  ushort uVar1350;
  ushort uVar1352;
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1171 [12];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1172 [12];
  undefined1 auVar1173 [12];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1174 [12];
  undefined1 auVar1175 [12];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1176 [12];
  undefined1 auVar1177 [12];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1178 [12];
  undefined1 auVar1179 [12];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1180 [12];
  undefined1 auVar1181 [12];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1182 [12];
  undefined1 auVar1183 [12];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1184 [12];
  undefined1 auVar1185 [12];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1186 [12];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1188 [12];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1345 [16];
  ushort uVar1353;
  undefined1 auVar1354 [12];
  ushort uVar1423;
  ushort uVar1424;
  ushort uVar1425;
  ushort uVar1426;
  ushort uVar1428;
  undefined1 auVar1355 [16];
  ushort uVar1427;
  ushort uVar1429;
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1420 [16];
  undefined2 uVar1430;
  undefined4 uVar1431;
  undefined1 auVar1435 [12];
  undefined1 auVar1436 [12];
  undefined1 auVar1437 [12];
  undefined1 auVar1438 [12];
  undefined1 auVar1439 [12];
  undefined1 auVar1440 [12];
  undefined1 auVar1441 [12];
  undefined1 auVar1442 [12];
  undefined1 auVar1443 [12];
  undefined1 auVar1444 [12];
  undefined1 auVar1445 [12];
  undefined1 auVar1446 [12];
  undefined1 auVar1447 [12];
  undefined1 auVar1448 [12];
  undefined1 auVar1449 [12];
  undefined1 auVar1450 [12];
  undefined1 auVar1451 [12];
  undefined1 auVar1453 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar1474 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1482 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1514 [16];
  undefined1 auVar1521 [12];
  undefined1 in_XMM7 [16];
  undefined1 auVar1522 [16];
  undefined1 auVar1523 [16];
  undefined1 auVar1524 [16];
  undefined1 auVar1531 [16];
  undefined1 auVar1538 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1568 [16];
  undefined1 auVar1569 [16];
  undefined1 auVar1576 [16];
  undefined1 auVar1583 [16];
  undefined1 auVar1590 [16];
  undefined1 auVar1597 [16];
  undefined1 auVar1604 [16];
  undefined1 auVar1611 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1621 [16];
  undefined1 auVar1628 [12];
  undefined1 auVar1636 [12];
  undefined1 auVar1637 [16];
  undefined1 auVar1638 [16];
  undefined1 auVar1639 [16];
  undefined1 auVar1640 [16];
  undefined1 auVar1641 [16];
  undefined1 auVar1642 [16];
  undefined1 auVar1643 [16];
  undefined1 auVar1644 [16];
  undefined1 auVar1645 [16];
  undefined1 auVar1646 [16];
  undefined1 auVar1647 [16];
  undefined1 auVar1648 [16];
  undefined1 auVar1649 [16];
  undefined1 auVar1650 [16];
  undefined1 auVar1651 [16];
  undefined1 auVar1652 [16];
  undefined1 auVar1653 [16];
  undefined1 auVar1654 [16];
  undefined1 auVar1655 [16];
  undefined1 auVar1663 [16];
  undefined1 auVar1629 [12];
  undefined1 auVar1671 [16];
  undefined1 auVar1630 [12];
  undefined1 auVar1679 [16];
  undefined1 auVar1631 [12];
  undefined1 auVar1687 [16];
  undefined1 auVar1632 [12];
  undefined1 auVar1695 [16];
  undefined1 auVar1696 [16];
  undefined1 auVar1697 [16];
  undefined1 auVar1698 [16];
  undefined1 auVar1699 [16];
  undefined1 auVar1700 [16];
  undefined1 auVar1701 [16];
  undefined1 auVar1633 [12];
  undefined1 auVar1709 [16];
  undefined1 auVar1634 [12];
  undefined1 auVar1717 [16];
  undefined1 auVar1718 [16];
  undefined1 auVar1719 [16];
  undefined1 auVar1720 [16];
  undefined1 auVar1721 [16];
  undefined1 auVar1722 [16];
  undefined1 auVar1723 [16];
  undefined1 auVar1724 [16];
  undefined1 auVar1725 [16];
  undefined1 auVar1726 [16];
  undefined1 auVar1729 [16];
  undefined1 auVar1733 [16];
  undefined1 auVar1635 [12];
  undefined1 auVar1741 [16];
  undefined1 auVar1744 [16];
  undefined1 auVar1752 [16];
  undefined1 auVar1755 [16];
  undefined2 uVar1758;
  undefined4 uVar1759;
  undefined1 auVar1763 [12];
  undefined1 auVar1764 [12];
  undefined1 auVar1765 [12];
  undefined1 auVar1766 [12];
  undefined1 auVar1767 [12];
  undefined1 auVar1768 [12];
  undefined1 auVar1769 [12];
  undefined1 auVar1770 [12];
  undefined1 auVar1771 [12];
  undefined1 auVar1772 [12];
  undefined1 auVar1773 [12];
  undefined1 auVar1774 [12];
  undefined1 auVar1775 [12];
  undefined1 auVar1776 [12];
  undefined1 auVar1777 [12];
  undefined1 auVar1779 [12];
  undefined1 in_XMM9 [16];
  undefined1 auVar1795 [16];
  undefined1 auVar1802 [16];
  undefined1 auVar1807 [16];
  undefined1 auVar1810 [16];
  undefined1 auVar1813 [16];
  undefined1 auVar1816 [16];
  undefined1 auVar1821 [16];
  undefined1 auVar1824 [16];
  undefined1 auVar1827 [12];
  undefined1 in_XMM10 [16];
  undefined1 auVar1828 [16];
  undefined1 auVar1835 [16];
  undefined1 auVar1842 [16];
  undefined1 auVar1849 [16];
  undefined1 auVar1856 [16];
  undefined1 auVar1857 [16];
  undefined1 auVar1864 [16];
  undefined1 auVar1869 [16];
  undefined1 auVar1876 [16];
  undefined1 auVar1883 [16];
  undefined1 auVar1886 [16];
  undefined1 auVar1890 [16];
  undefined1 auVar1897 [16];
  undefined1 auVar1900 [16];
  undefined1 auVar1907 [16];
  undefined2 uVar1910;
  undefined4 uVar1911;
  undefined1 auVar1915 [12];
  undefined1 auVar1932 [16];
  undefined1 auVar1935 [16];
  undefined1 auVar1939 [16];
  undefined1 auVar1916 [12];
  undefined1 auVar1944 [16];
  undefined1 auVar1917 [12];
  undefined1 auVar1949 [16];
  undefined1 auVar1918 [12];
  undefined1 auVar1953 [16];
  undefined1 auVar1956 [16];
  undefined1 auVar1960 [16];
  undefined1 auVar1919 [12];
  undefined1 auVar1964 [16];
  undefined1 auVar1920 [12];
  undefined1 auVar1969 [16];
  undefined1 auVar1972 [16];
  undefined1 auVar1975 [16];
  undefined1 auVar1921 [12];
  undefined1 auVar1979 [16];
  undefined1 auVar1982 [16];
  undefined1 auVar1986 [16];
  undefined2 uVar1989;
  undefined4 uVar1990;
  undefined1 auVar1994 [12];
  undefined1 auVar1995 [12];
  undefined1 auVar1996 [12];
  undefined1 auVar1997 [12];
  undefined1 auVar1998 [12];
  undefined1 auVar1999 [12];
  undefined1 auVar2000 [12];
  undefined1 auVar2001 [12];
  undefined1 auVar2002 [12];
  undefined1 auVar2003 [12];
  undefined1 auVar2004 [12];
  undefined1 auVar2005 [12];
  undefined1 auVar2006 [12];
  undefined1 auVar2007 [12];
  undefined1 auVar2008 [12];
  undefined1 auVar2010 [12];
  undefined1 auVar2026 [16];
  undefined1 auVar2033 [16];
  undefined1 auVar2038 [12];
  undefined1 auVar2047 [12];
  undefined1 auVar2048 [16];
  undefined1 auVar2053 [16];
  undefined1 auVar2039 [12];
  undefined1 auVar2062 [16];
  undefined1 auVar2040 [12];
  undefined1 auVar2071 [16];
  undefined1 auVar2041 [12];
  undefined1 auVar2080 [16];
  undefined1 auVar2042 [12];
  undefined1 auVar2085 [16];
  undefined1 auVar2088 [16];
  undefined1 auVar2043 [12];
  undefined1 auVar2097 [16];
  undefined1 auVar2044 [12];
  undefined1 auVar2102 [16];
  undefined1 auVar2045 [12];
  undefined1 auVar2111 [16];
  undefined1 auVar2046 [12];
  undefined1 auVar2120 [16];
  undefined1 auVar2129 [16];
  undefined1 auVar2132 [16];
  undefined1 auVar2139 [16];
  undefined1 auVar2146 [16];
  undefined1 auVar2153 [16];
  undefined1 auVar2156 [16];
  undefined1 auVar2163 [16];
  undefined1 auVar2166 [16];
  undefined1 auVar2173 [16];
  undefined1 auVar2180 [16];
  undefined1 auVar2187 [16];
  undefined1 auVar2194 [16];
  undefined1 auVar2201 [16];
  undefined1 auVar2208 [16];
  undefined1 auVar2215 [16];
  undefined1 auVar2222 [16];
  undefined1 auVar2229 [16];
  undefined1 auVar2236 [16];
  undefined1 auVar2243 [16];
  undefined1 auVar2250 [16];
  __m128i d [32];
  __m128i dstvec_h [32];
  uint8_t dstT [4096];
  undefined8 auStack_1738 [5];
  undefined8 uStack_1710;
  undefined1 uStack_16f0;
  undefined1 uStack_16ef;
  undefined1 uStack_16ee;
  undefined1 uStack_16ed;
  undefined1 uStack_16ec;
  undefined1 uStack_16eb;
  undefined1 uStack_16ea;
  undefined1 uStack_16e9;
  undefined1 uStack_16c0;
  undefined1 uStack_16bf;
  undefined1 uStack_16be;
  undefined1 uStack_16bd;
  undefined1 uStack_16bc;
  undefined1 uStack_16bb;
  undefined1 uStack_16ba;
  undefined1 uStack_16b9;
  undefined8 local_16b8 [5];
  undefined1 uStack_1690;
  undefined1 uStack_168f;
  undefined1 uStack_168e;
  undefined1 uStack_168d;
  undefined1 uStack_168c;
  undefined1 uStack_168b;
  undefined1 uStack_168a;
  undefined1 uStack_1689;
  undefined1 uStack_1670;
  undefined1 uStack_166f;
  undefined1 uStack_166e;
  undefined1 uStack_166d;
  undefined1 uStack_166c;
  undefined1 uStack_166b;
  undefined1 uStack_166a;
  undefined1 uStack_1669;
  undefined1 uStack_1640;
  undefined1 uStack_163f;
  undefined1 uStack_163e;
  undefined1 uStack_163d;
  undefined1 uStack_163c;
  undefined1 uStack_163b;
  undefined1 uStack_163a;
  undefined1 uStack_1639;
  undefined8 local_1638 [2];
  undefined1 local_1628;
  undefined1 uStack_1627;
  undefined1 uStack_1626;
  undefined1 uStack_1625;
  undefined1 uStack_1624;
  undefined1 uStack_1623;
  undefined1 uStack_1622;
  undefined1 uStack_1621;
  undefined1 uStack_1620;
  undefined1 uStack_161f;
  undefined1 uStack_161e;
  undefined1 uStack_161d;
  undefined1 uStack_161c;
  undefined1 uStack_161b;
  undefined1 uStack_161a;
  undefined1 uStack_1619;
  undefined4 local_1618;
  undefined4 uStack_1614;
  undefined4 uStack_1610;
  undefined4 uStack_160c;
  undefined1 local_1608 [16];
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined1 local_15c8 [16];
  undefined8 local_15b8;
  undefined8 auStack_15b0 [3];
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined1 local_1588 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined1 local_1548 [16];
  undefined8 local_1538;
  undefined8 auStack_1530 [3];
  undefined4 local_1518;
  undefined4 uStack_1514;
  undefined4 uStack_1510;
  undefined4 uStack_150c;
  undefined4 uStack_1500;
  undefined4 uStack_14fc;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined4 local_14d8;
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  undefined4 uStack_14c0;
  undefined4 uStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined4 local_1498;
  undefined4 uStack_1494;
  undefined4 uStack_1490;
  undefined4 uStack_148c;
  undefined4 uStack_1480;
  undefined4 uStack_147c;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined4 local_1458;
  undefined4 uStack_1454;
  undefined4 uStack_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1440;
  undefined4 uStack_143c;
  undefined4 local_1438;
  undefined4 uStack_1434;
  undefined8 uStack_1430;
  undefined1 local_1428;
  undefined1 uStack_1427;
  undefined1 uStack_1426;
  undefined1 uStack_1425;
  undefined1 uStack_1424;
  undefined1 uStack_1423;
  undefined1 uStack_1422;
  undefined1 uStack_1421;
  undefined1 uStack_1420;
  undefined1 uStack_141f;
  undefined1 uStack_141e;
  undefined1 uStack_141d;
  undefined1 uStack_141c;
  undefined1 uStack_141b;
  undefined1 uStack_141a;
  undefined1 uStack_1419;
  undefined1 local_1418 [16];
  undefined1 local_1408;
  undefined1 uStack_1407;
  undefined1 uStack_1406;
  undefined1 uStack_1405;
  undefined1 uStack_1404;
  undefined1 uStack_1403;
  undefined1 uStack_1402;
  undefined1 uStack_1401;
  undefined1 uStack_1400;
  undefined1 uStack_13ff;
  undefined1 uStack_13fe;
  undefined1 uStack_13fd;
  undefined1 uStack_13fc;
  undefined1 uStack_13fb;
  undefined1 uStack_13fa;
  undefined1 uStack_13f9;
  undefined1 local_13f8 [16];
  undefined1 local_13e8;
  undefined1 uStack_13e7;
  undefined1 uStack_13e6;
  undefined1 uStack_13e5;
  undefined1 uStack_13e4;
  undefined1 uStack_13e3;
  undefined1 uStack_13e2;
  undefined1 uStack_13e1;
  undefined1 uStack_13e0;
  undefined1 uStack_13df;
  undefined1 uStack_13de;
  undefined1 uStack_13dd;
  undefined1 uStack_13dc;
  undefined1 uStack_13db;
  undefined1 uStack_13da;
  undefined1 uStack_13d9;
  undefined1 local_13d8 [16];
  undefined1 local_13c8;
  undefined1 uStack_13c7;
  undefined1 uStack_13c6;
  undefined1 uStack_13c5;
  undefined1 uStack_13c4;
  undefined1 uStack_13c3;
  undefined1 uStack_13c2;
  undefined1 uStack_13c1;
  undefined1 uStack_13c0;
  undefined1 uStack_13bf;
  undefined1 uStack_13be;
  undefined1 uStack_13bd;
  undefined1 uStack_13bc;
  undefined1 uStack_13bb;
  undefined1 uStack_13ba;
  undefined1 uStack_13b9;
  undefined1 local_13b8 [16];
  undefined1 local_13a8;
  undefined1 uStack_13a7;
  undefined1 uStack_13a6;
  undefined1 uStack_13a5;
  undefined1 uStack_13a4;
  undefined1 uStack_13a3;
  undefined1 uStack_13a2;
  undefined1 uStack_13a1;
  undefined1 uStack_13a0;
  undefined1 uStack_139f;
  undefined1 uStack_139e;
  undefined1 uStack_139d;
  undefined1 uStack_139c;
  undefined1 uStack_139b;
  undefined1 uStack_139a;
  undefined1 uStack_1399;
  undefined1 local_1398 [16];
  undefined1 local_1388;
  undefined1 uStack_1387;
  undefined1 uStack_1386;
  undefined1 uStack_1385;
  undefined1 uStack_1384;
  undefined1 uStack_1383;
  undefined1 uStack_1382;
  undefined1 uStack_1381;
  undefined1 uStack_1380;
  undefined1 uStack_137f;
  undefined1 uStack_137e;
  undefined1 uStack_137d;
  undefined1 uStack_137c;
  undefined1 uStack_137b;
  undefined1 uStack_137a;
  undefined1 uStack_1379;
  undefined1 local_1378 [16];
  undefined1 local_1368;
  undefined1 uStack_1367;
  undefined1 uStack_1366;
  undefined1 uStack_1365;
  undefined1 uStack_1364;
  undefined1 uStack_1363;
  undefined1 uStack_1362;
  undefined1 uStack_1361;
  undefined1 uStack_1360;
  undefined1 uStack_135f;
  undefined1 uStack_135e;
  undefined1 uStack_135d;
  undefined1 uStack_135c;
  undefined1 uStack_135b;
  undefined1 uStack_135a;
  undefined1 uStack_1359;
  undefined1 local_1358 [16];
  undefined1 local_1348;
  undefined1 uStack_1347;
  undefined1 uStack_1346;
  undefined1 uStack_1345;
  undefined1 uStack_1344;
  undefined1 uStack_1343;
  undefined1 uStack_1342;
  undefined1 uStack_1341;
  undefined1 uStack_1340;
  undefined1 uStack_133f;
  undefined1 uStack_133e;
  undefined1 uStack_133d;
  undefined1 uStack_133c;
  undefined1 uStack_133b;
  undefined1 uStack_133a;
  undefined1 uStack_1339;
  undefined8 local_1338 [2];
  undefined1 local_1328;
  undefined1 uStack_1327;
  undefined1 uStack_1326;
  undefined1 uStack_1325;
  undefined1 uStack_1324;
  undefined1 uStack_1323;
  undefined1 uStack_1322;
  undefined1 uStack_1321;
  undefined1 uStack_1320;
  undefined1 uStack_131f;
  undefined1 uStack_131e;
  undefined1 uStack_131d;
  undefined1 uStack_131c;
  undefined1 uStack_131b;
  undefined1 uStack_131a;
  undefined1 uStack_1319;
  undefined1 local_1318 [16];
  undefined1 local_1308;
  undefined1 uStack_1307;
  undefined1 uStack_1306;
  undefined1 uStack_1305;
  undefined1 uStack_1304;
  undefined1 uStack_1303;
  undefined1 uStack_1302;
  undefined1 uStack_1301;
  undefined1 uStack_1300;
  undefined1 uStack_12ff;
  undefined1 uStack_12fe;
  undefined1 uStack_12fd;
  undefined1 uStack_12fc;
  undefined1 uStack_12fb;
  undefined1 uStack_12fa;
  undefined1 uStack_12f9;
  undefined1 local_12f8 [16];
  undefined1 local_12e8;
  undefined1 uStack_12e7;
  undefined1 uStack_12e6;
  undefined1 uStack_12e5;
  undefined1 uStack_12e4;
  undefined1 uStack_12e3;
  undefined1 uStack_12e2;
  undefined1 uStack_12e1;
  undefined1 uStack_12e0;
  undefined1 uStack_12df;
  undefined1 uStack_12de;
  undefined1 uStack_12dd;
  undefined1 uStack_12dc;
  undefined1 uStack_12db;
  undefined1 uStack_12da;
  undefined1 uStack_12d9;
  undefined1 local_12d8 [16];
  undefined1 local_12c8;
  undefined1 uStack_12c7;
  undefined1 uStack_12c6;
  undefined1 uStack_12c5;
  undefined1 uStack_12c4;
  undefined1 uStack_12c3;
  undefined1 uStack_12c2;
  undefined1 uStack_12c1;
  undefined1 uStack_12c0;
  undefined1 uStack_12bf;
  undefined1 uStack_12be;
  undefined1 uStack_12bd;
  undefined1 uStack_12bc;
  undefined1 uStack_12bb;
  undefined1 uStack_12ba;
  undefined1 uStack_12b9;
  undefined1 local_12b8 [16];
  undefined1 local_12a8;
  undefined1 uStack_12a7;
  undefined1 uStack_12a6;
  undefined1 uStack_12a5;
  undefined1 uStack_12a4;
  undefined1 uStack_12a3;
  undefined1 uStack_12a2;
  undefined1 uStack_12a1;
  undefined1 uStack_12a0;
  undefined1 uStack_129f;
  undefined1 uStack_129e;
  undefined1 uStack_129d;
  undefined1 uStack_129c;
  undefined1 uStack_129b;
  undefined1 uStack_129a;
  undefined1 uStack_1299;
  undefined1 local_1298 [16];
  undefined1 local_1288;
  undefined1 uStack_1287;
  undefined1 uStack_1286;
  undefined1 uStack_1285;
  undefined1 uStack_1284;
  undefined1 uStack_1283;
  undefined1 uStack_1282;
  undefined1 uStack_1281;
  undefined1 uStack_1280;
  undefined1 uStack_127f;
  undefined1 uStack_127e;
  undefined1 uStack_127d;
  undefined1 uStack_127c;
  undefined1 uStack_127b;
  undefined1 uStack_127a;
  undefined1 uStack_1279;
  undefined1 local_1278 [16];
  undefined1 local_1268;
  undefined1 uStack_1267;
  undefined1 uStack_1266;
  undefined1 uStack_1265;
  undefined1 uStack_1264;
  undefined1 uStack_1263;
  undefined1 uStack_1262;
  undefined1 uStack_1261;
  undefined1 uStack_1260;
  undefined1 uStack_125f;
  undefined1 uStack_125e;
  undefined1 uStack_125d;
  undefined1 uStack_125c;
  undefined1 uStack_125b;
  undefined1 uStack_125a;
  undefined1 uStack_1259;
  undefined1 local_1258 [16];
  undefined1 local_1248;
  undefined1 uStack_1247;
  undefined1 uStack_1246;
  undefined1 uStack_1245;
  undefined1 uStack_1244;
  undefined1 uStack_1243;
  undefined1 uStack_1242;
  undefined1 uStack_1241;
  undefined1 uStack_1240;
  undefined1 uStack_123f;
  undefined1 uStack_123e;
  undefined1 uStack_123d;
  undefined1 uStack_123c;
  undefined1 uStack_123b;
  undefined1 uStack_123a;
  undefined1 uStack_1239;
  undefined8 local_1238 [4];
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined4 local_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c0;
  undefined4 uStack_11bc;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined4 local_1198;
  undefined4 uStack_1194;
  undefined4 uStack_1190;
  undefined4 uStack_118c;
  undefined4 uStack_1180;
  undefined4 uStack_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined4 local_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined8 local_1138;
  undefined8 auStack_1130 [3];
  undefined4 local_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined2 local_ff8;
  undefined2 uStack_ff6;
  undefined2 uStack_ff4;
  undefined2 uStack_ff2;
  undefined2 uStack_ff0;
  undefined2 uStack_fee;
  undefined2 uStack_fec;
  undefined2 uStack_fea;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined2 local_fd8;
  undefined2 uStack_fd6;
  undefined2 uStack_fd4;
  undefined2 uStack_fd2;
  undefined2 uStack_fd0;
  undefined2 uStack_fce;
  undefined2 uStack_fcc;
  undefined2 uStack_fca;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined1 local_f58 [16];
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined1 local_f38 [14];
  undefined1 local_f28;
  undefined1 uStack_f27;
  undefined1 uStack_f26;
  undefined1 uStack_f25;
  undefined1 uStack_f24;
  undefined1 uStack_f23;
  undefined1 uStack_f22;
  undefined1 uStack_f21;
  undefined1 uStack_f20;
  undefined1 uStack_f1f;
  undefined1 uStack_f1e;
  undefined1 uStack_f1d;
  undefined1 uStack_f1c;
  undefined1 uStack_f1b;
  undefined1 uStack_f1a;
  undefined1 uStack_f19;
  undefined1 local_f18 [14];
  undefined1 local_f08;
  undefined1 uStack_f07;
  undefined1 uStack_f06;
  undefined1 uStack_f05;
  undefined1 uStack_f04;
  undefined1 uStack_f03;
  undefined1 uStack_f02;
  undefined1 uStack_f01;
  undefined1 uStack_f00;
  undefined1 uStack_eff;
  undefined1 uStack_efe;
  undefined1 uStack_efd;
  undefined1 uStack_efc;
  undefined1 uStack_efb;
  undefined1 uStack_efa;
  undefined1 uStack_ef9;
  undefined1 local_ef8 [14];
  undefined1 local_ee8;
  undefined1 uStack_ee7;
  undefined1 uStack_ee6;
  undefined1 uStack_ee5;
  undefined1 uStack_ee4;
  undefined1 uStack_ee3;
  undefined1 uStack_ee2;
  undefined1 uStack_ee1;
  undefined1 uStack_ee0;
  undefined1 uStack_edf;
  undefined1 uStack_ede;
  undefined1 uStack_edd;
  undefined1 uStack_edc;
  undefined1 uStack_edb;
  undefined1 uStack_eda;
  undefined1 uStack_ed9;
  undefined1 local_ed8 [14];
  undefined1 local_ec8;
  undefined1 uStack_ec7;
  undefined1 uStack_ec6;
  undefined1 uStack_ec5;
  undefined1 uStack_ec4;
  undefined1 uStack_ec3;
  undefined1 uStack_ec2;
  undefined1 uStack_ec1;
  undefined1 uStack_ec0;
  undefined1 uStack_ebf;
  undefined1 uStack_ebe;
  undefined1 uStack_ebd;
  undefined1 uStack_ebc;
  undefined1 uStack_ebb;
  undefined1 uStack_eba;
  undefined1 uStack_eb9;
  undefined1 local_eb8 [14];
  undefined1 local_ea8;
  undefined1 uStack_ea7;
  undefined1 uStack_ea6;
  undefined1 uStack_ea5;
  undefined1 uStack_ea4;
  undefined1 uStack_ea3;
  undefined1 uStack_ea2;
  undefined1 uStack_ea1;
  undefined1 uStack_ea0;
  undefined1 uStack_e9f;
  undefined1 uStack_e9e;
  undefined1 uStack_e9d;
  undefined1 uStack_e9c;
  undefined1 uStack_e9b;
  undefined1 uStack_e9a;
  undefined1 uStack_e99;
  undefined1 local_e98 [14];
  undefined1 local_e88;
  undefined1 uStack_e87;
  undefined1 uStack_e86;
  undefined1 uStack_e85;
  undefined1 uStack_e84;
  undefined1 uStack_e83;
  undefined1 uStack_e82;
  undefined1 uStack_e81;
  undefined1 uStack_e80;
  undefined1 uStack_e7f;
  undefined1 uStack_e7e;
  undefined1 uStack_e7d;
  undefined1 uStack_e7c;
  undefined1 uStack_e7b;
  undefined1 uStack_e7a;
  undefined1 uStack_e79;
  undefined1 local_e78 [14];
  undefined1 local_e68;
  undefined1 uStack_e67;
  undefined1 uStack_e66;
  undefined1 uStack_e65;
  undefined1 uStack_e64;
  undefined1 uStack_e63;
  undefined1 uStack_e62;
  undefined1 uStack_e61;
  undefined1 uStack_e60;
  undefined1 uStack_e5f;
  undefined1 uStack_e5e;
  undefined1 uStack_e5d;
  undefined1 uStack_e5c;
  undefined1 uStack_e5b;
  undefined1 uStack_e5a;
  undefined1 uStack_e59;
  undefined1 local_e58 [14];
  undefined1 local_e48;
  undefined1 uStack_e47;
  undefined1 uStack_e46;
  undefined1 uStack_e45;
  undefined1 uStack_e44;
  undefined1 uStack_e43;
  undefined1 uStack_e42;
  undefined1 uStack_e41;
  undefined1 uStack_e40;
  undefined1 uStack_e3f;
  undefined1 uStack_e3e;
  undefined1 uStack_e3d;
  undefined1 uStack_e3c;
  undefined1 uStack_e3b;
  undefined1 uStack_e3a;
  undefined1 uStack_e39;
  undefined1 auVar335 [16];
  undefined1 auVar344 [16];
  undefined1 auVar353 [16];
  undefined1 auVar362 [16];
  undefined1 auVar370 [16];
  undefined1 auVar396 [16];
  undefined1 auVar406 [16];
  undefined1 auVar415 [16];
  undefined1 auVar444 [16];
  undefined1 auVar466 [16];
  undefined1 auVar336 [16];
  undefined1 auVar345 [16];
  undefined1 auVar354 [16];
  undefined1 auVar363 [16];
  undefined1 auVar371 [16];
  undefined6 uVar315;
  undefined1 auVar397 [16];
  undefined1 auVar407 [16];
  undefined1 auVar416 [16];
  undefined1 auVar445 [16];
  undefined1 auVar467 [16];
  undefined1 auVar337 [16];
  undefined1 auVar346 [16];
  undefined1 auVar355 [16];
  undefined1 auVar364 [16];
  undefined1 auVar372 [16];
  undefined1 auVar377 [16];
  undefined1 auVar383 [16];
  undefined8 uVar316;
  undefined1 auVar398 [16];
  undefined1 auVar408 [16];
  undefined1 auVar417 [16];
  undefined1 auVar425 [16];
  undefined1 auVar434 [16];
  undefined1 auVar446 [16];
  undefined1 auVar451 [16];
  undefined1 auVar456 [16];
  undefined1 auVar468 [16];
  undefined1 auVar473 [16];
  undefined1 auVar481 [16];
  undefined1 auVar489 [16];
  undefined1 auVar494 [16];
  undefined1 auVar384 [16];
  undefined1 auVar426 [16];
  undefined1 auVar435 [16];
  undefined1 auVar457 [16];
  undefined1 auVar474 [16];
  undefined1 auVar482 [16];
  undefined1 auVar495 [16];
  undefined1 auVar338 [16];
  undefined1 auVar347 [16];
  undefined1 auVar356 [16];
  undefined1 auVar365 [16];
  undefined1 auVar373 [16];
  undefined1 auVar380 [16];
  undefined1 auVar385 [16];
  undefined1 auVar318 [12];
  undefined1 auVar399 [16];
  undefined1 auVar409 [16];
  undefined1 auVar418 [16];
  undefined1 auVar427 [16];
  undefined1 auVar436 [16];
  undefined1 auVar447 [16];
  undefined1 auVar452 [16];
  undefined1 auVar458 [16];
  undefined1 auVar469 [16];
  undefined1 auVar475 [16];
  undefined1 auVar483 [16];
  undefined1 auVar490 [16];
  undefined1 auVar496 [16];
  undefined1 auVar386 [16];
  undefined1 auVar428 [16];
  undefined1 auVar437 [16];
  undefined1 auVar459 [16];
  undefined1 auVar476 [16];
  undefined1 auVar484 [16];
  undefined1 auVar497 [16];
  undefined1 auVar339 [16];
  undefined1 auVar348 [16];
  undefined1 auVar357 [16];
  undefined1 auVar366 [16];
  undefined1 auVar374 [16];
  undefined1 auVar381 [16];
  undefined1 auVar387 [16];
  undefined1 auVar390 [16];
  undefined1 auVar325 [14];
  undefined1 auVar392 [16];
  undefined1 auVar400 [16];
  undefined1 auVar410 [16];
  undefined1 auVar419 [16];
  undefined1 auVar429 [16];
  undefined1 auVar432 [16];
  undefined1 auVar438 [16];
  undefined1 auVar441 [16];
  undefined1 auVar448 [16];
  undefined1 auVar453 [16];
  undefined1 auVar460 [16];
  undefined1 auVar463 [16];
  undefined1 auVar470 [16];
  undefined1 auVar477 [16];
  undefined1 auVar485 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar498 [16];
  undefined1 auVar501 [16];
  undefined1 auVar388 [16];
  undefined1 auVar430 [16];
  undefined1 auVar439 [16];
  undefined1 auVar461 [16];
  undefined1 auVar478 [16];
  undefined1 auVar486 [16];
  undefined1 auVar499 [16];
  undefined1 auVar378 [16];
  undefined1 auVar389 [16];
  undefined1 auVar391 [16];
  undefined1 auVar431 [16];
  undefined1 auVar440 [16];
  undefined1 auVar462 [16];
  undefined1 auVar479 [16];
  undefined1 auVar487 [16];
  undefined1 auVar500 [16];
  undefined1 auVar376 [16];
  undefined1 auVar480 [16];
  undefined1 auVar556 [16];
  undefined1 auVar573 [16];
  undefined1 auVar590 [16];
  undefined1 auVar607 [16];
  undefined1 auVar623 [16];
  undefined6 uVar504;
  undefined1 auVar649 [16];
  undefined1 auVar663 [16];
  undefined1 auVar680 [16];
  undefined1 auVar713 [16];
  undefined1 auVar740 [16];
  undefined1 auVar557 [16];
  undefined1 auVar567 [16];
  undefined1 auVar574 [16];
  undefined1 auVar584 [16];
  undefined1 auVar591 [16];
  undefined1 auVar601 [16];
  undefined1 auVar608 [16];
  undefined1 auVar624 [16];
  undefined8 uVar505;
  undefined1 auVar650 [16];
  undefined1 auVar664 [16];
  undefined1 auVar674 [16];
  undefined1 auVar681 [16];
  undefined1 auVar688 [16];
  undefined1 auVar696 [16];
  undefined1 auVar714 [16];
  undefined1 auVar723 [16];
  undefined1 auVar741 [16];
  undefined1 auVar763 [16];
  undefined1 auVar772 [16];
  undefined1 auVar631 [16];
  undefined1 auVar638 [16];
  undefined1 auVar689 [16];
  undefined1 auVar697 [16];
  undefined1 auVar724 [16];
  undefined1 auVar748 [16];
  undefined1 auVar755 [16];
  undefined1 auVar764 [16];
  undefined1 auVar773 [16];
  undefined1 auVar548 [16];
  undefined1 auVar551 [16];
  undefined1 auVar558 [16];
  undefined1 auVar564 [16];
  undefined1 auVar568 [16];
  undefined1 auVar575 [16];
  undefined1 auVar581 [16];
  undefined1 auVar585 [16];
  undefined1 auVar592 [16];
  undefined1 auVar598 [16];
  undefined1 auVar602 [16];
  undefined1 auVar609 [16];
  undefined1 auVar615 [16];
  undefined1 auVar618 [16];
  undefined1 auVar625 [16];
  undefined1 auVar632 [16];
  undefined1 auVar517 [12];
  undefined1 auVar645 [16];
  undefined1 auVar651 [16];
  undefined1 auVar655 [16];
  undefined1 auVar658 [16];
  undefined1 auVar665 [16];
  undefined1 auVar671 [16];
  undefined1 auVar675 [16];
  undefined1 auVar682 [16];
  undefined1 auVar690 [16];
  undefined1 auVar698 [16];
  undefined1 auVar705 [16];
  undefined1 auVar708 [16];
  undefined1 auVar715 [16];
  undefined1 auVar725 [16];
  undefined1 auVar732 [16];
  undefined1 auVar735 [16];
  undefined1 auVar742 [16];
  undefined1 auVar749 [16];
  undefined1 auVar756 [16];
  undefined1 auVar765 [16];
  undefined1 auVar774 [16];
  undefined1 auVar633 [16];
  undefined1 auVar639 [16];
  undefined1 auVar691 [16];
  undefined1 auVar699 [16];
  undefined1 auVar726 [16];
  undefined1 auVar750 [16];
  undefined1 auVar757 [16];
  undefined1 auVar766 [16];
  undefined1 auVar775 [16];
  undefined1 auVar549 [16];
  undefined1 auVar552 [16];
  undefined1 auVar534 [14];
  undefined1 auVar559 [16];
  undefined1 auVar561 [16];
  undefined1 auVar565 [16];
  undefined1 auVar569 [16];
  undefined1 auVar535 [14];
  undefined1 auVar576 [16];
  undefined1 auVar578 [16];
  undefined1 auVar582 [16];
  undefined1 auVar586 [16];
  undefined1 auVar536 [14];
  undefined1 auVar593 [16];
  undefined1 auVar595 [16];
  undefined1 auVar599 [16];
  undefined1 auVar603 [16];
  undefined1 auVar537 [14];
  undefined1 auVar610 [16];
  undefined1 auVar612 [16];
  undefined1 auVar616 [16];
  undefined1 auVar619 [16];
  undefined1 auVar538 [14];
  undefined1 auVar626 [16];
  undefined1 auVar628 [16];
  undefined1 auVar634 [16];
  undefined1 auVar641 [16];
  undefined1 auVar539 [14];
  undefined1 auVar646 [16];
  undefined1 auVar540 [14];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar656 [16];
  undefined1 auVar659 [16];
  undefined1 auVar541 [14];
  undefined1 auVar666 [16];
  undefined1 auVar668 [16];
  undefined1 auVar672 [16];
  undefined1 auVar676 [16];
  undefined1 auVar542 [14];
  undefined1 auVar683 [16];
  undefined1 auVar685 [16];
  undefined1 auVar692 [16];
  undefined1 auVar700 [16];
  undefined1 auVar703 [16];
  undefined1 auVar706 [16];
  undefined1 auVar709 [16];
  undefined1 auVar543 [14];
  undefined1 auVar716 [16];
  undefined1 auVar718 [16];
  undefined1 auVar544 [14];
  undefined1 auVar727 [16];
  undefined1 auVar730 [16];
  undefined1 auVar733 [16];
  undefined1 auVar736 [16];
  undefined1 auVar545 [14];
  undefined1 auVar743 [16];
  undefined1 auVar745 [16];
  undefined1 auVar751 [16];
  undefined1 auVar758 [16];
  undefined1 auVar767 [16];
  undefined1 auVar770 [16];
  undefined1 auVar776 [16];
  undefined1 auVar779 [16];
  undefined1 auVar635 [16];
  undefined1 auVar640 [16];
  undefined1 auVar693 [16];
  undefined1 auVar701 [16];
  undefined1 auVar728 [16];
  undefined1 auVar752 [16];
  undefined1 auVar759 [16];
  undefined1 auVar768 [16];
  undefined1 auVar777 [16];
  undefined1 auVar554 [16];
  undefined1 auVar571 [16];
  undefined1 auVar588 [16];
  undefined1 auVar605 [16];
  undefined1 auVar621 [16];
  undefined1 auVar636 [16];
  undefined1 auVar642 [16];
  undefined1 auVar647 [16];
  undefined1 auVar661 [16];
  undefined1 auVar678 [16];
  undefined1 auVar694 [16];
  undefined1 auVar702 [16];
  undefined1 auVar711 [16];
  undefined1 auVar720 [16];
  undefined1 auVar729 [16];
  undefined1 auVar738 [16];
  undefined1 auVar753 [16];
  undefined1 auVar760 [16];
  undefined1 auVar769 [16];
  undefined1 auVar778 [16];
  undefined1 auVar817 [16];
  undefined1 auVar825 [16];
  undefined1 auVar833 [16];
  undefined1 auVar841 [16];
  undefined1 auVar848 [16];
  undefined1 auVar867 [16];
  undefined1 auVar875 [16];
  undefined1 auVar898 [16];
  undefined1 auVar913 [16];
  undefined1 auVar818 [16];
  undefined1 auVar826 [16];
  undefined1 auVar834 [16];
  undefined1 auVar842 [16];
  undefined1 auVar849 [16];
  undefined6 uVar782;
  undefined1 auVar868 [16];
  undefined1 auVar876 [16];
  undefined1 auVar899 [16];
  undefined1 auVar914 [16];
  undefined1 auVar819 [16];
  undefined1 auVar827 [16];
  undefined1 auVar835 [16];
  undefined1 auVar843 [16];
  undefined1 auVar850 [16];
  undefined8 uVar783;
  undefined1 auVar869 [16];
  undefined1 auVar877 [16];
  undefined1 auVar794 [12];
  undefined1 auVar887 [16];
  undefined1 auVar900 [16];
  undefined1 auVar915 [16];
  undefined1 auVar854 [16];
  undefined1 auVar881 [16];
  undefined1 auVar888 [16];
  undefined1 auVar906 [16];
  undefined1 auVar922 [16];
  undefined1 auVar930 [16];
  undefined1 auVar820 [16];
  undefined1 auVar828 [16];
  undefined1 auVar836 [16];
  undefined1 auVar844 [16];
  undefined1 auVar851 [16];
  undefined1 auVar855 [16];
  undefined1 auVar789 [12];
  undefined1 auVar870 [16];
  undefined1 auVar878 [16];
  undefined1 auVar889 [16];
  undefined1 auVar901 [16];
  undefined1 auVar916 [16];
  undefined1 auVar919 [16];
  undefined1 auVar926 [16];
  undefined1 auVar856 [16];
  undefined1 auVar882 [16];
  undefined1 auVar890 [16];
  undefined1 auVar907 [16];
  undefined1 auVar923 [16];
  undefined1 auVar931 [16];
  undefined1 auVar803 [14];
  undefined1 auVar821 [16];
  undefined1 auVar804 [14];
  undefined1 auVar829 [16];
  undefined1 auVar805 [14];
  undefined1 auVar837 [16];
  undefined1 auVar806 [14];
  undefined1 auVar845 [16];
  undefined1 auVar807 [14];
  undefined1 auVar852 [16];
  undefined1 auVar857 [16];
  undefined1 auVar808 [14];
  undefined1 auVar862 [16];
  undefined1 auVar809 [14];
  undefined1 auVar810 [14];
  undefined1 auVar871 [16];
  undefined1 auVar811 [14];
  undefined1 auVar879 [16];
  undefined1 auVar884 [16];
  undefined1 auVar891 [16];
  undefined1 auVar894 [16];
  undefined1 auVar812 [14];
  undefined1 auVar902 [16];
  undefined1 auVar813 [14];
  undefined1 auVar904 [16];
  undefined1 auVar909 [16];
  undefined1 auVar814 [14];
  undefined1 auVar917 [16];
  undefined1 auVar920 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar933 [16];
  undefined1 auVar858 [16];
  undefined1 auVar883 [16];
  undefined1 auVar892 [16];
  undefined1 auVar908 [16];
  undefined1 auVar924 [16];
  undefined1 auVar932 [16];
  undefined1 auVar815 [16];
  undefined1 auVar823 [16];
  undefined1 auVar831 [16];
  undefined1 auVar839 [16];
  undefined1 auVar846 [16];
  undefined1 auVar859 [16];
  undefined1 auVar861 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar873 [16];
  undefined1 auVar893 [16];
  undefined1 auVar896 [16];
  undefined1 auVar903 [16];
  undefined1 auVar911 [16];
  undefined1 auVar921 [16];
  undefined1 auVar987 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1047 [16];
  undefined6 uVar937;
  undefined1 auVar1076 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar977 [16];
  undefined1 auVar988 [16];
  undefined1 auVar992 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1048 [16];
  undefined8 uVar938;
  undefined1 auVar1056 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar956 [12];
  undefined1 auVar1104 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar978 [16];
  undefined1 auVar993 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar979 [16];
  undefined1 auVar989 [16];
  undefined1 auVar994 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar949 [12];
  undefined1 auVar1058 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar980 [16];
  undefined1 auVar995 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar981 [16];
  undefined1 auVar984 [16];
  undefined1 auVar964 [14];
  undefined1 auVar990 [16];
  undefined1 auVar996 [16];
  undefined1 auVar999 [16];
  undefined1 auVar965 [14];
  undefined1 auVar1005 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar966 [14];
  undefined1 auVar1020 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar967 [14];
  undefined1 auVar1035 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar968 [14];
  undefined1 auVar1050 [16];
  undefined1 auVar969 [14];
  undefined1 auVar1060 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar970 [14];
  undefined1 auVar1070 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar971 [14];
  undefined1 auVar1079 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar972 [14];
  undefined1 auVar1094 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar973 [14];
  undefined1 auVar1126 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar974 [14];
  undefined1 auVar1155 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar982 [16];
  undefined1 auVar997 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar983 [16];
  undefined1 auVar985 [16];
  undefined1 auVar998 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1303 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1206 [16];
  undefined1 auVar1189 [14];
  undefined1 auVar1215 [16];
  undefined1 auVar1190 [14];
  undefined1 auVar1224 [16];
  undefined1 auVar1191 [14];
  undefined1 auVar1234 [16];
  undefined1 auVar1192 [14];
  undefined1 auVar1244 [16];
  undefined1 auVar1193 [14];
  undefined1 auVar1252 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1194 [14];
  undefined1 auVar1278 [16];
  undefined1 auVar1195 [14];
  undefined1 auVar1287 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1196 [14];
  undefined1 auVar1314 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1197 [14];
  undefined1 auVar1342 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1407 [16];
  undefined6 uVar1432;
  undefined8 uVar1433;
  undefined1 auVar1483 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1515 [16];
  undefined1 auVar1434 [12];
  undefined1 auVar1484 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1452 [12];
  undefined1 auVar1509 [16];
  undefined1 auVar1516 [16];
  undefined1 auVar1485 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1517 [16];
  undefined1 auVar1454 [14];
  undefined1 auVar1465 [16];
  undefined1 auVar1455 [14];
  undefined1 auVar1467 [16];
  undefined1 auVar1456 [14];
  undefined1 auVar1469 [16];
  undefined1 auVar1457 [14];
  undefined1 auVar1471 [16];
  undefined1 auVar1458 [14];
  undefined1 auVar1473 [16];
  undefined1 auVar1459 [14];
  undefined1 auVar1477 [16];
  undefined1 auVar1460 [14];
  undefined1 auVar1479 [16];
  undefined1 auVar1461 [14];
  undefined1 auVar1481 [16];
  undefined1 auVar1486 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1462 [14];
  undefined1 auVar1497 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1463 [14];
  undefined1 auVar1506 [16];
  undefined1 auVar1511 [16];
  undefined1 auVar1518 [16];
  undefined1 auVar1487 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1512 [16];
  undefined1 auVar1519 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1472 [16];
  undefined1 auVar1476 [16];
  undefined1 auVar1478 [16];
  undefined1 auVar1480 [16];
  undefined1 auVar1488 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1513 [16];
  undefined1 auVar1520 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1525 [16];
  undefined1 auVar1532 [16];
  undefined1 auVar1539 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1570 [16];
  undefined1 auVar1577 [16];
  undefined1 auVar1584 [16];
  undefined1 auVar1591 [16];
  undefined1 auVar1598 [16];
  undefined1 auVar1605 [16];
  undefined1 auVar1612 [16];
  undefined1 auVar1622 [16];
  undefined1 auVar1526 [16];
  undefined1 auVar1533 [16];
  undefined1 auVar1540 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1571 [16];
  undefined1 auVar1578 [16];
  undefined1 auVar1585 [16];
  undefined1 auVar1592 [16];
  undefined1 auVar1599 [16];
  undefined1 auVar1606 [16];
  undefined1 auVar1613 [16];
  undefined1 auVar1623 [16];
  undefined1 auVar1527 [16];
  undefined1 auVar1534 [16];
  undefined1 auVar1541 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1572 [16];
  undefined1 auVar1579 [16];
  undefined1 auVar1586 [16];
  undefined1 auVar1593 [16];
  undefined1 auVar1600 [16];
  undefined1 auVar1607 [16];
  undefined1 auVar1614 [16];
  undefined1 auVar1619 [16];
  undefined1 auVar1624 [16];
  undefined1 auVar1528 [16];
  undefined1 auVar1535 [16];
  undefined1 auVar1542 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1567 [16];
  undefined1 auVar1573 [16];
  undefined1 auVar1580 [16];
  undefined1 auVar1587 [16];
  undefined1 auVar1594 [16];
  undefined1 auVar1601 [16];
  undefined1 auVar1608 [16];
  undefined1 auVar1615 [16];
  undefined1 auVar1625 [16];
  undefined1 auVar1529 [16];
  undefined1 auVar1536 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1565 [16];
  undefined1 auVar1574 [16];
  undefined1 auVar1581 [16];
  undefined1 auVar1588 [16];
  undefined1 auVar1595 [16];
  undefined1 auVar1602 [16];
  undefined1 auVar1609 [16];
  undefined1 auVar1616 [16];
  undefined1 auVar1620 [16];
  undefined1 auVar1626 [16];
  undefined1 auVar1530 [16];
  undefined1 auVar1537 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1566 [16];
  undefined1 auVar1575 [16];
  undefined1 auVar1582 [16];
  undefined1 auVar1589 [16];
  undefined1 auVar1596 [16];
  undefined1 auVar1603 [16];
  undefined1 auVar1610 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1627 [16];
  undefined1 auVar1656 [16];
  undefined1 auVar1664 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1680 [16];
  undefined1 auVar1688 [16];
  undefined1 auVar1702 [16];
  undefined1 auVar1710 [16];
  undefined1 auVar1730 [16];
  undefined1 auVar1734 [16];
  undefined1 auVar1745 [16];
  undefined1 auVar1657 [16];
  undefined1 auVar1665 [16];
  undefined1 auVar1673 [16];
  undefined1 auVar1681 [16];
  undefined1 auVar1689 [16];
  undefined1 auVar1703 [16];
  undefined1 auVar1711 [16];
  undefined1 auVar1735 [16];
  undefined1 auVar1746 [16];
  undefined1 auVar1658 [16];
  undefined1 auVar1666 [16];
  undefined1 auVar1674 [16];
  undefined1 auVar1682 [16];
  undefined1 auVar1690 [16];
  undefined1 auVar1704 [16];
  undefined1 auVar1712 [16];
  undefined1 auVar1727 [16];
  undefined1 auVar1731 [16];
  undefined1 auVar1736 [16];
  undefined1 auVar1742 [16];
  undefined1 auVar1747 [16];
  undefined1 auVar1753 [16];
  undefined1 auVar1756 [16];
  undefined1 auVar1659 [16];
  undefined1 auVar1667 [16];
  undefined1 auVar1675 [16];
  undefined1 auVar1683 [16];
  undefined1 auVar1691 [16];
  undefined1 auVar1705 [16];
  undefined1 auVar1713 [16];
  undefined1 auVar1737 [16];
  undefined1 auVar1748 [16];
  undefined1 auVar1660 [16];
  undefined1 auVar1668 [16];
  undefined1 auVar1676 [16];
  undefined1 auVar1684 [16];
  undefined1 auVar1692 [16];
  undefined1 auVar1706 [16];
  undefined1 auVar1714 [16];
  undefined1 auVar1728 [16];
  undefined1 auVar1732 [16];
  undefined1 auVar1738 [16];
  undefined1 auVar1743 [16];
  undefined1 auVar1749 [16];
  undefined1 auVar1754 [16];
  undefined1 auVar1757 [16];
  undefined1 auVar1661 [16];
  undefined1 auVar1669 [16];
  undefined1 auVar1677 [16];
  undefined1 auVar1685 [16];
  undefined1 auVar1693 [16];
  undefined1 auVar1707 [16];
  undefined1 auVar1715 [16];
  undefined1 auVar1739 [16];
  undefined1 auVar1750 [16];
  undefined1 auVar1662 [16];
  undefined1 auVar1670 [16];
  undefined1 auVar1678 [16];
  undefined1 auVar1686 [16];
  undefined1 auVar1694 [16];
  undefined1 auVar1708 [16];
  undefined1 auVar1716 [16];
  undefined1 auVar1740 [16];
  undefined1 auVar1751 [16];
  undefined6 uVar1760;
  undefined8 uVar1761;
  undefined1 auVar1796 [16];
  undefined1 auVar1762 [12];
  undefined1 auVar1797 [16];
  undefined1 auVar1808 [16];
  undefined1 auVar1811 [16];
  undefined1 auVar1817 [16];
  undefined1 auVar1778 [12];
  undefined1 auVar1822 [16];
  undefined1 auVar1825 [16];
  undefined1 auVar1798 [16];
  undefined1 auVar1780 [14];
  undefined1 auVar1781 [14];
  undefined1 auVar1782 [14];
  undefined1 auVar1790 [16];
  undefined1 auVar1783 [14];
  undefined1 auVar1792 [16];
  undefined1 auVar1784 [14];
  undefined1 auVar1794 [16];
  undefined1 auVar1799 [16];
  undefined1 auVar1785 [14];
  undefined1 auVar1804 [16];
  undefined1 auVar1786 [14];
  undefined1 auVar1806 [16];
  undefined1 auVar1809 [16];
  undefined1 auVar1812 [16];
  undefined1 auVar1787 [14];
  undefined1 auVar1815 [16];
  undefined1 auVar1818 [16];
  undefined1 auVar1788 [14];
  undefined1 auVar1820 [16];
  undefined1 auVar1823 [16];
  undefined1 auVar1826 [16];
  undefined1 auVar1800 [16];
  undefined1 auVar1789 [16];
  undefined1 auVar1791 [16];
  undefined1 auVar1793 [16];
  undefined1 auVar1801 [16];
  undefined1 auVar1803 [16];
  undefined1 auVar1805 [16];
  undefined1 auVar1814 [16];
  undefined1 auVar1819 [16];
  undefined1 auVar1887 [16];
  undefined1 auVar1829 [16];
  undefined1 auVar1836 [16];
  undefined1 auVar1843 [16];
  undefined1 auVar1850 [16];
  undefined1 auVar1858 [16];
  undefined1 auVar1865 [16];
  undefined1 auVar1870 [16];
  undefined1 auVar1877 [16];
  undefined1 auVar1891 [16];
  undefined1 auVar1901 [16];
  undefined1 auVar1830 [16];
  undefined1 auVar1837 [16];
  undefined1 auVar1844 [16];
  undefined1 auVar1851 [16];
  undefined1 auVar1859 [16];
  undefined1 auVar1871 [16];
  undefined1 auVar1878 [16];
  undefined1 auVar1884 [16];
  undefined1 auVar1888 [16];
  undefined1 auVar1892 [16];
  undefined1 auVar1898 [16];
  undefined1 auVar1902 [16];
  undefined1 auVar1908 [16];
  undefined1 auVar1831 [16];
  undefined1 auVar1838 [16];
  undefined1 auVar1845 [16];
  undefined1 auVar1852 [16];
  undefined1 auVar1860 [16];
  undefined1 auVar1866 [16];
  undefined1 auVar1872 [16];
  undefined1 auVar1879 [16];
  undefined1 auVar1893 [16];
  undefined1 auVar1903 [16];
  undefined1 auVar1832 [16];
  undefined1 auVar1839 [16];
  undefined1 auVar1846 [16];
  undefined1 auVar1853 [16];
  undefined1 auVar1861 [16];
  undefined1 auVar1868 [16];
  undefined1 auVar1873 [16];
  undefined1 auVar1880 [16];
  undefined1 auVar1885 [16];
  undefined1 auVar1889 [16];
  undefined1 auVar1894 [16];
  undefined1 auVar1899 [16];
  undefined1 auVar1904 [16];
  undefined1 auVar1909 [16];
  undefined1 auVar1833 [16];
  undefined1 auVar1840 [16];
  undefined1 auVar1847 [16];
  undefined1 auVar1854 [16];
  undefined1 auVar1862 [16];
  undefined1 auVar1867 [16];
  undefined1 auVar1874 [16];
  undefined1 auVar1881 [16];
  undefined1 auVar1895 [16];
  undefined1 auVar1905 [16];
  undefined1 auVar1834 [16];
  undefined1 auVar1841 [16];
  undefined1 auVar1848 [16];
  undefined1 auVar1855 [16];
  undefined1 auVar1863 [16];
  undefined1 auVar1875 [16];
  undefined1 auVar1882 [16];
  undefined1 auVar1896 [16];
  undefined1 auVar1906 [16];
  undefined6 uVar1912;
  undefined8 uVar1913;
  undefined1 auVar1936 [16];
  undefined1 auVar1940 [16];
  undefined1 auVar1945 [16];
  undefined1 auVar1957 [16];
  undefined1 auVar1965 [16];
  undefined1 auVar1933 [16];
  undefined1 auVar1914 [12];
  undefined1 auVar1937 [16];
  undefined1 auVar1941 [16];
  undefined1 auVar1946 [16];
  undefined1 auVar1950 [16];
  undefined1 auVar1958 [16];
  undefined1 auVar1961 [16];
  undefined1 auVar1966 [16];
  undefined1 auVar1970 [16];
  undefined1 auVar1973 [16];
  undefined1 auVar1976 [16];
  undefined1 auVar1980 [16];
  undefined1 auVar1983 [16];
  undefined1 auVar1922 [12];
  undefined1 auVar1987 [16];
  undefined1 auVar1954 [16];
  undefined1 auVar1934 [16];
  undefined1 auVar1923 [14];
  undefined1 auVar1938 [16];
  undefined1 auVar1924 [14];
  undefined1 auVar1942 [16];
  undefined1 auVar1925 [14];
  undefined1 auVar1947 [16];
  undefined1 auVar1926 [14];
  undefined1 auVar1951 [16];
  undefined1 auVar1927 [14];
  undefined1 auVar1959 [16];
  undefined1 auVar1962 [16];
  undefined1 auVar1928 [14];
  undefined1 auVar1967 [16];
  undefined1 auVar1929 [14];
  undefined1 auVar1971 [16];
  undefined1 auVar1974 [16];
  undefined1 auVar1977 [16];
  undefined1 auVar1930 [14];
  undefined1 auVar1981 [16];
  undefined1 auVar1984 [16];
  undefined1 auVar1931 [14];
  undefined1 auVar1988 [16];
  undefined1 auVar1955 [16];
  undefined1 auVar1943 [16];
  undefined1 auVar1948 [16];
  undefined1 auVar1952 [16];
  undefined1 auVar1963 [16];
  undefined1 auVar1968 [16];
  undefined1 auVar1978 [16];
  undefined1 auVar1985 [16];
  undefined6 uVar1991;
  undefined8 uVar1992;
  undefined1 auVar1993 [12];
  undefined1 auVar2027 [16];
  undefined1 auVar2009 [12];
  undefined1 auVar2011 [14];
  undefined1 auVar2012 [14];
  undefined1 auVar2013 [14];
  undefined1 auVar2021 [16];
  undefined1 auVar2014 [14];
  undefined1 auVar2023 [16];
  undefined1 auVar2015 [14];
  undefined1 auVar2025 [16];
  undefined1 auVar2028 [16];
  undefined1 auVar2016 [14];
  undefined1 auVar2030 [16];
  undefined1 auVar2017 [14];
  undefined1 auVar2032 [16];
  undefined1 auVar2018 [14];
  undefined1 auVar2035 [16];
  undefined1 auVar2019 [14];
  undefined1 auVar2037 [16];
  undefined1 auVar2020 [16];
  undefined1 auVar2022 [16];
  undefined1 auVar2024 [16];
  undefined1 auVar2029 [16];
  undefined1 auVar2031 [16];
  undefined1 auVar2034 [16];
  undefined1 auVar2036 [16];
  undefined1 auVar2054 [16];
  undefined1 auVar2063 [16];
  undefined1 auVar2072 [16];
  undefined1 auVar2089 [16];
  undefined1 auVar2103 [16];
  undefined1 auVar2112 [16];
  undefined1 auVar2121 [16];
  undefined1 auVar2049 [16];
  undefined1 auVar2055 [16];
  undefined1 auVar2064 [16];
  undefined1 auVar2073 [16];
  undefined1 auVar2081 [16];
  undefined1 auVar2090 [16];
  undefined1 auVar2098 [16];
  undefined1 auVar2104 [16];
  undefined1 auVar2113 [16];
  undefined1 auVar2122 [16];
  undefined1 auVar2056 [16];
  undefined1 auVar2065 [16];
  undefined1 auVar2074 [16];
  undefined1 auVar2086 [16];
  undefined1 auVar2091 [16];
  undefined1 auVar2105 [16];
  undefined1 auVar2114 [16];
  undefined1 auVar2123 [16];
  undefined1 auVar2050 [16];
  undefined1 auVar2057 [16];
  undefined1 auVar2066 [16];
  undefined1 auVar2075 [16];
  undefined1 auVar2082 [16];
  undefined1 auVar2092 [16];
  undefined1 auVar2099 [16];
  undefined1 auVar2106 [16];
  undefined1 auVar2115 [16];
  undefined1 auVar2124 [16];
  undefined1 auVar2052 [16];
  undefined1 auVar2058 [16];
  undefined1 auVar2061 [16];
  undefined1 auVar2067 [16];
  undefined1 auVar2070 [16];
  undefined1 auVar2076 [16];
  undefined1 auVar2079 [16];
  undefined1 auVar2084 [16];
  undefined1 auVar2087 [16];
  undefined1 auVar2093 [16];
  undefined1 auVar2096 [16];
  undefined1 auVar2101 [16];
  undefined1 auVar2107 [16];
  undefined1 auVar2110 [16];
  undefined1 auVar2116 [16];
  undefined1 auVar2119 [16];
  undefined1 auVar2125 [16];
  undefined1 auVar2128 [16];
  undefined1 auVar2051 [16];
  undefined1 auVar2059 [16];
  undefined1 auVar2068 [16];
  undefined1 auVar2077 [16];
  undefined1 auVar2083 [16];
  undefined1 auVar2094 [16];
  undefined1 auVar2100 [16];
  undefined1 auVar2108 [16];
  undefined1 auVar2117 [16];
  undefined1 auVar2126 [16];
  undefined1 auVar2060 [16];
  undefined1 auVar2069 [16];
  undefined1 auVar2078 [16];
  undefined1 auVar2095 [16];
  undefined1 auVar2109 [16];
  undefined1 auVar2118 [16];
  undefined1 auVar2127 [16];
  undefined1 auVar2133 [16];
  undefined1 auVar2140 [16];
  undefined1 auVar2147 [16];
  undefined1 auVar2157 [16];
  undefined1 auVar2167 [16];
  undefined1 auVar2174 [16];
  undefined1 auVar2181 [16];
  undefined1 auVar2134 [16];
  undefined1 auVar2141 [16];
  undefined1 auVar2148 [16];
  undefined1 auVar2158 [16];
  undefined1 auVar2168 [16];
  undefined1 auVar2175 [16];
  undefined1 auVar2182 [16];
  undefined1 auVar2130 [16];
  undefined1 auVar2135 [16];
  undefined1 auVar2142 [16];
  undefined1 auVar2149 [16];
  undefined1 auVar2154 [16];
  undefined1 auVar2159 [16];
  undefined1 auVar2164 [16];
  undefined1 auVar2169 [16];
  undefined1 auVar2176 [16];
  undefined1 auVar2183 [16];
  undefined1 auVar2136 [16];
  undefined1 auVar2143 [16];
  undefined1 auVar2150 [16];
  undefined1 auVar2160 [16];
  undefined1 auVar2170 [16];
  undefined1 auVar2177 [16];
  undefined1 auVar2184 [16];
  undefined1 auVar2131 [16];
  undefined1 auVar2137 [16];
  undefined1 auVar2144 [16];
  undefined1 auVar2151 [16];
  undefined1 auVar2155 [16];
  undefined1 auVar2161 [16];
  undefined1 auVar2165 [16];
  undefined1 auVar2171 [16];
  undefined1 auVar2178 [16];
  undefined1 auVar2185 [16];
  undefined1 auVar2138 [16];
  undefined1 auVar2145 [16];
  undefined1 auVar2152 [16];
  undefined1 auVar2162 [16];
  undefined1 auVar2172 [16];
  undefined1 auVar2179 [16];
  undefined1 auVar2186 [16];
  undefined1 auVar2188 [16];
  undefined1 auVar2195 [16];
  undefined1 auVar2202 [16];
  undefined1 auVar2209 [16];
  undefined1 auVar2216 [16];
  undefined1 auVar2223 [16];
  undefined1 auVar2230 [16];
  undefined1 auVar2237 [16];
  undefined1 auVar2244 [16];
  undefined1 auVar2251 [16];
  undefined1 auVar2189 [16];
  undefined1 auVar2196 [16];
  undefined1 auVar2203 [16];
  undefined1 auVar2210 [16];
  undefined1 auVar2217 [16];
  undefined1 auVar2224 [16];
  undefined1 auVar2231 [16];
  undefined1 auVar2238 [16];
  undefined1 auVar2245 [16];
  undefined1 auVar2252 [16];
  undefined1 auVar2190 [16];
  undefined1 auVar2197 [16];
  undefined1 auVar2204 [16];
  undefined1 auVar2211 [16];
  undefined1 auVar2218 [16];
  undefined1 auVar2225 [16];
  undefined1 auVar2232 [16];
  undefined1 auVar2239 [16];
  undefined1 auVar2246 [16];
  undefined1 auVar2253 [16];
  undefined1 auVar2191 [16];
  undefined1 auVar2198 [16];
  undefined1 auVar2205 [16];
  undefined1 auVar2212 [16];
  undefined1 auVar2219 [16];
  undefined1 auVar2226 [16];
  undefined1 auVar2233 [16];
  undefined1 auVar2240 [16];
  undefined1 auVar2247 [16];
  undefined1 auVar2254 [16];
  undefined1 auVar2192 [16];
  undefined1 auVar2199 [16];
  undefined1 auVar2206 [16];
  undefined1 auVar2213 [16];
  undefined1 auVar2220 [16];
  undefined1 auVar2227 [16];
  undefined1 auVar2234 [16];
  undefined1 auVar2241 [16];
  undefined1 auVar2248 [16];
  undefined1 auVar2255 [16];
  undefined1 auVar2193 [16];
  undefined1 auVar2200 [16];
  undefined1 auVar2207 [16];
  undefined1 auVar2214 [16];
  undefined1 auVar2221 [16];
  undefined1 auVar2228 [16];
  undefined1 auVar2235 [16];
  undefined1 auVar2242 [16];
  undefined1 auVar2249 [16];
  undefined1 auVar2256 [16];
  
  iVar307 = (int)left;
  bVar302 = (byte)upsample_left;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar307 = 7 << (bVar302 & 0x1f);
        auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
        lVar300 = 0;
        auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar311 = 0;
        uVar305 = dy;
        do {
          iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
          uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
          if ((int)uVar308 < 1) {
            if (uVar311 < 4) {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
                lVar300 = lVar300 + 0x10;
              } while (lVar300 != 0x40);
            }
            break;
          }
          if (3 < uVar308) {
            uVar308 = 4;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar309);
          if (upsample_left == 0) {
            auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
            auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1198._4_4_ = auVar1198._0_4_;
            auVar1198._8_4_ = auVar1198._0_4_;
            auVar1198._12_4_ = auVar1198._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_0050db80);
            auVar1522 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
            auVar1199._0_4_ = auVar1198._0_4_;
            auVar1199._4_4_ = auVar1199._0_4_;
            auVar1199._8_4_ = auVar1199._0_4_;
            auVar1199._12_4_ = auVar1199._0_4_;
            auVar1198 = psllw(auVar1199,ZEXT416((uint)upsample_left));
            auVar1523._0_2_ = auVar1198._0_2_ >> 1;
            auVar1523._2_2_ = auVar1198._2_2_ >> 1;
            auVar1523._4_2_ = auVar1198._4_2_ >> 1;
            auVar1523._6_2_ = auVar1198._6_2_ >> 1;
            auVar1523._8_2_ = auVar1198._8_2_ >> 1;
            auVar1523._10_2_ = auVar1198._10_2_ >> 1;
            auVar1523._12_2_ = auVar1198._12_2_ >> 1;
            auVar1523._14_2_ = auVar1198._14_2_ >> 1;
            auVar1198 = auVar1523 & auVar332;
          }
          auVar1199 = pmovzxbw(in_XMM9,auVar1356);
          auVar1856 = pmovzxbw(in_XMM10,auVar1522);
          auVar1523 = psllw(auVar1199,5);
          in_XMM10._0_2_ = (auVar1856._0_2_ - auVar1199._0_2_) * auVar1198._0_2_;
          in_XMM10._2_2_ = (auVar1856._2_2_ - auVar1199._2_2_) * auVar1198._2_2_;
          in_XMM10._4_2_ = (auVar1856._4_2_ - auVar1199._4_2_) * auVar1198._4_2_;
          in_XMM10._6_2_ = (auVar1856._6_2_ - auVar1199._6_2_) * auVar1198._6_2_;
          in_XMM10._8_2_ = (auVar1856._8_2_ - auVar1199._8_2_) * auVar1198._8_2_;
          in_XMM10._10_2_ = (auVar1856._10_2_ - auVar1199._10_2_) * auVar1198._10_2_;
          in_XMM10._12_2_ = (auVar1856._12_2_ - auVar1199._12_2_) * auVar1198._12_2_;
          in_XMM10._14_2_ = (auVar1856._14_2_ - auVar1199._14_2_) * auVar1198._14_2_;
          uVar1353 = (ushort)(auVar1523._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1423 = (ushort)(auVar1523._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1424 = (ushort)(auVar1523._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1425 = (ushort)(auVar1523._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1426 = (ushort)(auVar1523._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1427 = (ushort)(auVar1523._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1428 = (ushort)(auVar1523._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1429 = (ushort)(auVar1523._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
          auVar1856._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar1856[2] = auVar1356[9];
          auVar1856[3] = 0;
          auVar1856[4] = auVar1356[10];
          auVar1856[5] = 0;
          auVar1856[6] = auVar1356[0xb];
          auVar1856[7] = 0;
          auVar1856[8] = auVar1356[0xc];
          auVar1856[9] = 0;
          auVar1856[10] = auVar1356[0xd];
          auVar1856[0xb] = 0;
          auVar1856[0xc] = auVar1356[0xe];
          auVar1856[0xd] = 0;
          auVar1856[0xe] = auVar1356[0xf];
          auVar1856[0xf] = 0;
          auVar1199 = psllw(auVar1856,5);
          uVar1169 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ +
                             (auVar1522[8] - auVar1856._0_2_) * auVar1198._0_2_) >> 5;
          uVar1346 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ +
                             ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1198._2_2_) >> 5;
          uVar1347 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ +
                             ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1198._4_2_) >> 5
          ;
          uVar1348 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ +
                             ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1198._6_2_) >>
                     5;
          uVar1349 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ +
                             ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1198._8_2_) >>
                     5;
          uVar1350 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ +
                             ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1198._10_2_)
                     >> 5;
          uVar1351 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ +
                             ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1198._12_2_)
                     >> 5;
          uVar1352 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ +
                             ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1198._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
          in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
          in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
          in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
          in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
          in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
          in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
          in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
          in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
          in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
          in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
          in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
          in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
          auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
          *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
          uVar305 = uVar305 + dy;
          uVar311 = uVar311 + 1;
          lVar300 = lVar300 + 0x10;
        } while (uVar311 != 4);
        auVar378[0xe] = local_1038[7];
        auVar378._0_14_ = local_1038._0_14_;
        auVar378[0xf] = local_1028[7];
        auVar1522._14_2_ = auVar378._14_2_;
        auVar1522._0_13_ = local_1038._0_13_;
        auVar1522[0xd] = local_1028[6];
        auVar546._13_3_ = auVar1522._13_3_;
        auVar546._0_12_ = local_1038._0_12_;
        auVar546[0xc] = local_1038[6];
        auVar975._12_4_ = auVar546._12_4_;
        auVar975._0_11_ = local_1038._0_11_;
        auVar975[0xb] = local_1028[5];
        auVar332._11_5_ = auVar975._11_5_;
        auVar332._0_10_ = local_1038._0_10_;
        auVar332[10] = local_1038[5];
        auVar1356._10_6_ = auVar332._10_6_;
        auVar1356._0_9_ = local_1038._0_9_;
        auVar1356[9] = local_1028[4];
        auVar377._9_7_ = auVar1356._9_7_;
        auVar377._0_8_ = local_1038._0_8_;
        auVar377[8] = local_1038[4];
        Var17 = CONCAT91(CONCAT81(auVar377._8_8_,local_1028[3]),local_1038[3]);
        auVar97._2_10_ = Var17;
        auVar97[1] = local_1028[2];
        auVar97[0] = local_1038[2];
        auVar96._2_12_ = auVar97;
        auVar96[1] = local_1028[1];
        auVar96[0] = local_1038[1];
        uVar2257 = CONCAT11(local_1028[0],local_1038[0]);
        auVar376._2_14_ = auVar96;
        auVar636[0xe] = local_1018[7];
        auVar636._0_14_ = local_1018._0_14_;
        auVar636[0xf] = local_1008[7];
        auVar635._14_2_ = auVar636._14_2_;
        auVar635._0_13_ = local_1018._0_13_;
        auVar635[0xd] = local_1008[6];
        auVar634._13_3_ = auVar635._13_3_;
        auVar634._0_12_ = local_1018._0_12_;
        auVar634[0xc] = local_1018[6];
        auVar633._12_4_ = auVar634._12_4_;
        auVar633._0_11_ = local_1018._0_11_;
        auVar633[0xb] = local_1008[5];
        auVar632._11_5_ = auVar633._11_5_;
        auVar632._0_10_ = local_1018._0_10_;
        auVar632[10] = local_1018[5];
        auVar631._10_6_ = auVar632._10_6_;
        auVar631._0_9_ = local_1018._0_9_;
        auVar631[9] = local_1008[4];
        auVar630._9_7_ = auVar631._9_7_;
        auVar630._0_8_ = local_1018._0_8_;
        auVar630[8] = local_1018[4];
        Var19 = CONCAT91(CONCAT81(auVar630._8_8_,local_1008[3]),local_1018[3]);
        auVar99._2_10_ = Var19;
        auVar99[1] = local_1008[2];
        auVar99[0] = local_1018[2];
        auVar98._2_12_ = auVar99;
        auVar98[1] = local_1008[1];
        auVar98[0] = local_1018[1];
        auVar381._0_12_ = auVar376._0_12_;
        auVar381._12_2_ = (short)Var17;
        auVar381._14_2_ = (short)Var19;
        auVar380._12_4_ = auVar381._12_4_;
        auVar380._0_10_ = auVar376._0_10_;
        auVar380._10_2_ = auVar99._0_2_;
        auVar379._10_6_ = auVar380._10_6_;
        auVar379._0_8_ = auVar376._0_8_;
        auVar379._8_2_ = auVar97._0_2_;
        auVar100._4_8_ = auVar379._8_8_;
        auVar100._2_2_ = auVar98._0_2_;
        auVar100._0_2_ = auVar96._0_2_;
        *(uint *)dst = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),uVar2257);
        *(int *)(dst + stride) = auVar100._0_4_;
        *(int *)(dst + stride * 2) = auVar379._8_4_;
        *(undefined4 *)(dst + stride * 3) = auVar380._12_4_;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar307 = 0xf << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 8) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x80);
          }
          break;
        }
        if (7 < uVar308) {
          uVar308 = 8;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1645._0_4_ = auVar1198._0_4_;
          auVar1645._4_4_ = auVar1645._0_4_;
          auVar1645._8_4_ = auVar1645._0_4_;
          auVar1645._12_4_ = auVar1645._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1643._0_4_ = auVar1198._0_4_;
          auVar1643._4_4_ = auVar1643._0_4_;
          auVar1643._8_4_ = auVar1643._0_4_;
          auVar1643._12_4_ = auVar1643._0_4_;
          auVar1198 = psllw(auVar1643,ZEXT416((uint)upsample_left));
          auVar1644._0_2_ = auVar1198._0_2_ >> 1;
          auVar1644._2_2_ = auVar1198._2_2_ >> 1;
          auVar1644._4_2_ = auVar1198._4_2_ >> 1;
          auVar1644._6_2_ = auVar1198._6_2_ >> 1;
          auVar1644._8_2_ = auVar1198._8_2_ >> 1;
          auVar1644._10_2_ = auVar1198._10_2_ >> 1;
          auVar1644._12_2_ = auVar1198._12_2_ >> 1;
          auVar1644._14_2_ = auVar1198._14_2_ >> 1;
          auVar1645 = auVar1644 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1645._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1645._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1645._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1645._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1645._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1645._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1645._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1645._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar328._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar328[2] = auVar1356[9];
        auVar328[3] = 0;
        auVar328[4] = auVar1356[10];
        auVar328[5] = 0;
        auVar328[6] = auVar1356[0xb];
        auVar328[7] = 0;
        auVar328[8] = auVar1356[0xc];
        auVar328[9] = 0;
        auVar328[10] = auVar1356[0xd];
        auVar328[0xb] = 0;
        auVar328[0xc] = auVar1356[0xe];
        auVar328[0xd] = 0;
        auVar328[0xe] = auVar1356[0xf];
        auVar328[0xf] = 0;
        auVar1198 = psllw(auVar328,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar328._0_2_) * auVar1645._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1645._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1645._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1645._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1645._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1645._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1645._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1645._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 8);
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar638._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar251._6_5_ = 0;
      auVar251._0_6_ = uVar241;
      auVar639._0_11_ = auVar251 << 0x30;
      auVar273._8_5_ = 0;
      auVar273._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar640._0_13_ = auVar273 << 0x30;
      uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar1051._0_9_ = (unkuint9)uVar308 << 0x30;
      uVar242 = CONCAT24(uStack_fce,uVar308);
      auVar252._6_5_ = 0;
      auVar252._0_6_ = uVar242;
      auVar1052._0_11_ = auVar252 << 0x30;
      auVar274._8_5_ = 0;
      auVar274._0_8_ = CONCAT26(uStack_fcc,uVar242);
      auVar1053._0_13_ = auVar274 << 0x30;
      auVar389[0xe] = local_1038[7];
      auVar389._0_14_ = local_1038._0_14_;
      auVar389[0xf] = local_1028[7];
      auVar388._14_2_ = auVar389._14_2_;
      auVar388._0_13_ = local_1038._0_13_;
      auVar388[0xd] = local_1028[6];
      auVar387._13_3_ = auVar388._13_3_;
      auVar387._0_12_ = local_1038._0_12_;
      auVar387[0xc] = local_1038[6];
      auVar386._12_4_ = auVar387._12_4_;
      auVar386._0_11_ = local_1038._0_11_;
      auVar386[0xb] = local_1028[5];
      auVar385._11_5_ = auVar386._11_5_;
      auVar385._0_10_ = local_1038._0_10_;
      auVar385[10] = local_1038[5];
      auVar384._10_6_ = auVar385._10_6_;
      auVar384._0_9_ = local_1038._0_9_;
      auVar384[9] = local_1028[4];
      auVar383._9_7_ = auVar384._9_7_;
      auVar383._0_8_ = local_1038._0_8_;
      auVar383[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar383._8_8_,local_1028[3]),local_1038[3]);
      auVar102._2_10_ = Var17;
      auVar102[1] = local_1028[2];
      auVar102[0] = local_1038[2];
      auVar101._2_12_ = auVar102;
      auVar101[1] = local_1028[1];
      auVar101[0] = local_1038[1];
      auVar382._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar382._2_14_ = auVar101;
      auVar859[0xe] = local_1018[7];
      auVar859._0_14_ = local_1018._0_14_;
      auVar859[0xf] = local_1008[7];
      auVar858._14_2_ = auVar859._14_2_;
      auVar858._0_13_ = local_1018._0_13_;
      auVar858[0xd] = local_1008[6];
      auVar857._13_3_ = auVar858._13_3_;
      auVar857._0_12_ = local_1018._0_12_;
      auVar857[0xc] = local_1018[6];
      auVar856._12_4_ = auVar857._12_4_;
      auVar856._0_11_ = local_1018._0_11_;
      auVar856[0xb] = local_1008[5];
      auVar855._11_5_ = auVar856._11_5_;
      auVar855._0_10_ = local_1018._0_10_;
      auVar855[10] = local_1018[5];
      auVar854._10_6_ = auVar855._10_6_;
      auVar854._0_9_ = local_1018._0_9_;
      auVar854[9] = local_1008[4];
      auVar853._9_7_ = auVar854._9_7_;
      auVar853._0_8_ = local_1018._0_8_;
      auVar853[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar853._8_8_,local_1008[3]),local_1018[3]);
      auVar104._2_10_ = Var19;
      auVar104[1] = local_1008[2];
      auVar104[0] = local_1018[2];
      auVar103._2_12_ = auVar104;
      auVar103[1] = local_1008[1];
      auVar103[0] = local_1018[1];
      auVar640._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar640[0xd] = local_fe8._6_1_;
      Var243 = CONCAT37(auVar640._13_3_,CONCAT16((char)uStack_ff2,uVar241));
      auVar639._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
      auVar639[0xb] = local_fe8._5_1_;
      Var162 = CONCAT55(auVar639._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
      auVar638._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
      auVar638[9] = local_fe8._4_1_;
      Var158 = CONCAT73(auVar638._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
      Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar106._2_10_ = Var21;
      auVar106[1] = local_fe8._2_1_;
      auVar106[0] = (char)uStack_ff6;
      auVar105._2_12_ = auVar106;
      auVar105[1] = local_fe8._1_1_;
      auVar105[0] = (char)((ushort)local_ff8 >> 8);
      auVar637._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      auVar637._2_14_ = auVar105;
      auVar1053._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >> 0x40
           );
      auVar1053[0xd] = local_fc8._6_1_;
      Var244 = CONCAT37(auVar1053._13_3_,CONCAT16((char)uStack_fd2,uVar242));
      auVar1052._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
      auVar1052[0xb] = local_fc8._5_1_;
      Var164 = CONCAT55(auVar1052._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar308));
      auVar1051._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
      auVar1051[9] = local_fc8._4_1_;
      Var160 = CONCAT73(auVar1051._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
      Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                       (char)((ushort)uStack_fd6 >> 8));
      auVar108._2_10_ = Var23;
      auVar108[1] = local_fc8._2_1_;
      auVar108[0] = (char)uStack_fd6;
      auVar107._2_12_ = auVar108;
      auVar107[1] = local_fc8._1_1_;
      auVar107[0] = (char)((ushort)local_fd8 >> 8);
      auVar1252._0_12_ = auVar382._0_12_;
      auVar1252._12_2_ = (short)Var17;
      auVar1252._14_2_ = (short)Var19;
      auVar1251._12_4_ = auVar1252._12_4_;
      auVar1251._0_10_ = auVar382._0_10_;
      auVar1251._10_2_ = auVar104._0_2_;
      auVar1250._10_6_ = auVar1251._10_6_;
      auVar1250._0_8_ = auVar382._0_8_;
      auVar1250._8_2_ = auVar102._0_2_;
      auVar109._4_8_ = auVar1250._8_8_;
      auVar109._2_2_ = auVar103._0_2_;
      auVar109._0_2_ = auVar101._0_2_;
      auVar1249._0_4_ = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar382._0_2_);
      auVar1249._4_12_ = auVar109;
      auVar1374._0_12_ = auVar637._0_12_;
      auVar1374._12_2_ = (short)Var21;
      auVar1374._14_2_ = (short)Var23;
      auVar1373._12_4_ = auVar1374._12_4_;
      auVar1373._0_10_ = auVar637._0_10_;
      auVar1373._10_2_ = auVar108._0_2_;
      auVar1372._10_6_ = auVar1373._10_6_;
      auVar1372._0_8_ = auVar637._0_8_;
      auVar1372._8_2_ = auVar106._0_2_;
      auVar110._4_8_ = auVar1372._8_8_;
      auVar110._2_2_ = auVar107._0_2_;
      auVar110._0_2_ = auVar105._0_2_;
      auVar1474._0_8_ = auVar1249._0_8_;
      auVar1474._8_4_ = auVar109._0_4_;
      auVar1474._12_4_ = auVar110._0_4_;
      *(ulong *)dst =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar637._0_2_),
                    auVar1249._0_4_);
      *(long *)(dst + stride) = auVar1474._8_8_;
      auVar490._12_4_ = CONCAT22(auVar853._8_2_,auVar383._8_2_);
      auVar317._0_8_ = CONCAT26(auVar855._10_2_,CONCAT24(auVar385._10_2_,auVar490._12_4_));
      auVar317._8_2_ = auVar387._12_2_;
      auVar317._10_2_ = auVar857._12_2_;
      auVar390._12_2_ = auVar388._14_2_;
      auVar390._0_12_ = auVar317;
      auVar390._14_2_ = auVar858._14_2_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
      auVar516._0_8_ =
           CONCAT26((short)((unkuint10)Var164 >> 0x20),
                    CONCAT24((short)((unkuint10)Var162 >> 0x20),auVar926._12_4_));
      auVar516._8_2_ = (short)((unkuint10)Var243 >> 0x30);
      auVar516._10_2_ = (short)((unkuint10)Var244 >> 0x30);
      auVar641._12_2_ = auVar640._14_2_;
      auVar641._0_12_ = auVar516;
      auVar641._14_2_ = auVar1053._14_2_;
      *(int *)(dst + stride * 2) = auVar1250._8_4_;
      *(int *)(dst + stride * 2 + 4) = auVar1372._8_4_;
      *(undefined4 *)(dst + stride * 3 + 8) = auVar1251._12_4_;
      *(undefined4 *)(dst + stride * 3 + 0xc) = auVar1373._12_4_;
      auVar860._8_4_ = (int)((ulong)auVar317._0_8_ >> 0x20);
      auVar860._0_8_ = auVar317._0_8_;
      auVar860._12_4_ = (int)((ulong)auVar516._0_8_ >> 0x20);
      *(ulong *)(dst + stride * 4) = CONCAT44(auVar926._12_4_,auVar490._12_4_);
      *(long *)(dst + stride * 5) = auVar860._8_8_;
      auVar490._12_4_ = auVar390._12_4_;
      auVar926._12_4_ = auVar641._12_4_;
      *(int *)(dst + stride * 6) = auVar317._8_4_;
      *(int *)(dst + stride * 6 + 4) = auVar516._8_4_;
      lVar300 = stride * 7;
LAB_00340cfe:
      *(undefined4 *)(dst + lVar300 + 8) = auVar490._12_4_;
      *(undefined4 *)(dst + lVar300 + 0xc) = auVar926._12_4_;
      return;
    }
    if (bw == 0x10) {
      iVar307 = 0x1f << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x100);
          }
          break;
        }
        if (0xf < uVar308) {
          uVar308 = 0x10;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1654._0_4_ = auVar1198._0_4_;
          auVar1654._4_4_ = auVar1654._0_4_;
          auVar1654._8_4_ = auVar1654._0_4_;
          auVar1654._12_4_ = auVar1654._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1652._0_4_ = auVar1198._0_4_;
          auVar1652._4_4_ = auVar1652._0_4_;
          auVar1652._8_4_ = auVar1652._0_4_;
          auVar1652._12_4_ = auVar1652._0_4_;
          auVar1198 = psllw(auVar1652,ZEXT416((uint)upsample_left));
          auVar1653._0_2_ = auVar1198._0_2_ >> 1;
          auVar1653._2_2_ = auVar1198._2_2_ >> 1;
          auVar1653._4_2_ = auVar1198._4_2_ >> 1;
          auVar1653._6_2_ = auVar1198._6_2_ >> 1;
          auVar1653._8_2_ = auVar1198._8_2_ >> 1;
          auVar1653._10_2_ = auVar1198._10_2_ >> 1;
          auVar1653._12_2_ = auVar1198._12_2_ >> 1;
          auVar1653._14_2_ = auVar1198._14_2_ >> 1;
          auVar1654 = auVar1653 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1654._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1654._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1654._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1654._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1654._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1654._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1654._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1654._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar331._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar331[2] = auVar1356[9];
        auVar331[3] = 0;
        auVar331[4] = auVar1356[10];
        auVar331[5] = 0;
        auVar331[6] = auVar1356[0xb];
        auVar331[7] = 0;
        auVar331[8] = auVar1356[0xc];
        auVar331[9] = 0;
        auVar331[10] = auVar1356[0xd];
        auVar331[0xb] = 0;
        auVar331[0xc] = auVar1356[0xe];
        auVar331[0xd] = 0;
        auVar331[0xe] = auVar1356[0xf];
        auVar331[0xf] = 0;
        auVar1198 = psllw(auVar331,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar331._0_2_) * auVar1654._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1654._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1654._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1654._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1654._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1654._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1654._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1654._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 0x10);
      auVar1043._0_14_ = local_1038._0_14_;
      auVar1043[0xe] = local_1038[7];
      auVar1043[0xf] = local_1028[7];
      auVar1042._14_2_ = auVar1043._14_2_;
      auVar1042._0_13_ = local_1038._0_13_;
      auVar1042[0xd] = local_1028[6];
      auVar1041._13_3_ = auVar1042._13_3_;
      auVar1041._0_12_ = local_1038._0_12_;
      auVar1041[0xc] = local_1038[6];
      auVar1040._12_4_ = auVar1041._12_4_;
      auVar1040._0_11_ = local_1038._0_11_;
      auVar1040[0xb] = local_1028[5];
      auVar1039._11_5_ = auVar1040._11_5_;
      auVar1039._0_10_ = local_1038._0_10_;
      auVar1039[10] = local_1038[5];
      auVar1038._10_6_ = auVar1039._10_6_;
      auVar1038._0_9_ = local_1038._0_9_;
      auVar1038[9] = local_1028[4];
      auVar1037._9_7_ = auVar1038._9_7_;
      auVar1037._0_8_ = local_1038._0_8_;
      auVar1037[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar1037._8_8_,local_1028[3]),local_1038[3]);
      auVar88._2_10_ = Var17;
      auVar88[1] = local_1028[2];
      auVar88[0] = local_1038[2];
      auVar1036._4_12_ = auVar88;
      auVar1036[3] = local_1028[1];
      auVar1036[2] = local_1038[1];
      auVar1036._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar2221._0_14_ = local_1018._0_14_;
      auVar2221[0xe] = local_1018[7];
      auVar2221[0xf] = local_1008[7];
      auVar2220._14_2_ = auVar2221._14_2_;
      auVar2220._0_13_ = local_1018._0_13_;
      auVar2220[0xd] = local_1008[6];
      auVar2219._13_3_ = auVar2220._13_3_;
      auVar2219._0_12_ = local_1018._0_12_;
      auVar2219[0xc] = local_1018[6];
      auVar2218._12_4_ = auVar2219._12_4_;
      auVar2218._0_11_ = local_1018._0_11_;
      auVar2218[0xb] = local_1008[5];
      auVar2217._11_5_ = auVar2218._11_5_;
      auVar2217._0_10_ = local_1018._0_10_;
      auVar2217[10] = local_1018[5];
      auVar2216._10_6_ = auVar2217._10_6_;
      auVar2216._0_9_ = local_1018._0_9_;
      auVar2216[9] = local_1008[4];
      auVar2215._9_7_ = auVar2216._9_7_;
      auVar2215._0_8_ = local_1018._0_8_;
      auVar2215[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar2215._8_8_,local_1008[3]),local_1018[3]);
      auVar89._2_10_ = Var19;
      auVar89[1] = local_1008[2];
      auVar89[0] = local_1018[2];
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar2081._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar249._6_5_ = 0;
      auVar249._0_6_ = uVar241;
      auVar2082._0_11_ = auVar249 << 0x30;
      auVar271._8_5_ = 0;
      auVar271._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar2083._0_13_ = auVar271 << 0x30;
      auVar2083._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar2083[0xd] = local_fe8._6_1_;
      Var243 = CONCAT37(auVar2083._13_3_,CONCAT16((char)uStack_ff2,uVar241));
      auVar2082._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
      auVar2082[0xb] = local_fe8._5_1_;
      Var162 = CONCAT55(auVar2082._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
      auVar2081._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
      auVar2081[9] = local_fe8._4_1_;
      Var158 = CONCAT73(auVar2081._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
      Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar90._2_10_ = Var21;
      auVar90[1] = local_fe8._2_1_;
      auVar90[0] = (char)uStack_ff6;
      auVar2080._4_12_ = auVar90;
      auVar2080[3] = local_fe8._1_1_;
      uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
      auVar2080[2] = uStack_1624;
      auVar2080._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      uVar305 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar2153._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fce,uVar305);
      auVar250._6_5_ = 0;
      auVar250._0_6_ = uVar241;
      auVar2154._0_11_ = auVar250 << 0x30;
      auVar272._8_5_ = 0;
      auVar272._0_8_ = CONCAT26(uStack_fcc,uVar241);
      auVar2155._0_13_ = auVar272 << 0x30;
      auVar2155._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar241))) >> 0x40
           );
      auVar2155[0xd] = local_fc8._6_1_;
      Var244 = CONCAT37(auVar2155._13_3_,CONCAT16((char)uStack_fd2,uVar241));
      auVar2154._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
      auVar2154[0xb] = local_fc8._5_1_;
      Var164 = CONCAT55(auVar2154._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar305));
      auVar2153._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
      auVar2153[9] = local_fc8._4_1_;
      Var160 = CONCAT73(auVar2153._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
      Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                       (char)((ushort)uStack_fd6 >> 8));
      auVar91._2_10_ = Var23;
      auVar91[1] = local_fc8._2_1_;
      auVar91[0] = (char)uStack_fd6;
      auVar1951._0_12_ = auVar1036._0_12_;
      auVar1951._12_2_ = (short)Var17;
      auVar1951._14_2_ = (short)Var19;
      auVar1950._12_4_ = auVar1951._12_4_;
      auVar1950._0_10_ = auVar1036._0_10_;
      auVar1950._10_2_ = auVar89._0_2_;
      auVar1949._10_6_ = auVar1950._10_6_;
      auVar1949._0_8_ = auVar1036._0_8_;
      auVar1949._8_2_ = auVar88._0_2_;
      auVar616._0_12_ = auVar2080._0_12_;
      auVar616._12_2_ = (short)Var21;
      auVar616._14_2_ = (short)Var23;
      auVar615._12_4_ = auVar616._12_4_;
      auVar615._0_10_ = auVar2080._0_10_;
      auVar615._10_2_ = auVar91._0_2_;
      auVar614._10_6_ = auVar615._10_6_;
      auVar614._0_8_ = auVar2080._0_8_;
      auVar614._8_2_ = auVar90._0_2_;
      auVar1246._0_14_ = local_fb8._0_14_;
      auVar1246[0xe] = local_fb8[7];
      auVar1246[0xf] = local_fa8[7];
      auVar1245._14_2_ = auVar1246._14_2_;
      auVar1245._0_13_ = local_fb8._0_13_;
      auVar1245[0xd] = local_fa8[6];
      auVar1244._13_3_ = auVar1245._13_3_;
      auVar1244._0_12_ = local_fb8._0_12_;
      auVar1244[0xc] = local_fb8[6];
      auVar1243._12_4_ = auVar1244._12_4_;
      auVar1243._0_11_ = local_fb8._0_11_;
      auVar1243[0xb] = local_fa8[5];
      auVar1242._11_5_ = auVar1243._11_5_;
      auVar1242._0_10_ = local_fb8._0_10_;
      auVar1242[10] = local_fb8[5];
      auVar1241._10_6_ = auVar1242._10_6_;
      auVar1241._0_9_ = local_fb8._0_9_;
      auVar1241[9] = local_fa8[4];
      auVar1240._9_7_ = auVar1241._9_7_;
      auVar1240._0_8_ = local_fb8._0_8_;
      auVar1240[8] = local_fb8[4];
      Var17 = CONCAT91(CONCAT81(auVar1240._8_8_,local_fa8[3]),local_fb8[3]);
      auVar92._2_10_ = Var17;
      auVar92[1] = local_fa8[2];
      auVar92[0] = local_fb8[2];
      auVar1239._4_12_ = auVar92;
      auVar1239[3] = local_fa8[1];
      auVar1239[2] = local_fb8[1];
      auVar1239._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1558._0_14_ = local_f98._0_14_;
      auVar1558[0xe] = local_f98[7];
      auVar1558[0xf] = local_f88[7];
      auVar1557._14_2_ = auVar1558._14_2_;
      auVar1557._0_13_ = local_f98._0_13_;
      auVar1557[0xd] = local_f88[6];
      auVar1556._13_3_ = auVar1557._13_3_;
      auVar1556._0_12_ = local_f98._0_12_;
      auVar1556[0xc] = local_f98[6];
      auVar1555._12_4_ = auVar1556._12_4_;
      auVar1555._0_11_ = local_f98._0_11_;
      auVar1555[0xb] = local_f88[5];
      auVar1554._11_5_ = auVar1555._11_5_;
      auVar1554._0_10_ = local_f98._0_10_;
      auVar1554[10] = local_f98[5];
      auVar1553._10_6_ = auVar1554._10_6_;
      auVar1553._0_9_ = local_f98._0_9_;
      auVar1553[9] = local_f88[4];
      auVar1552._9_7_ = auVar1553._9_7_;
      auVar1552._0_8_ = local_f98._0_8_;
      auVar1552[8] = local_f98[4];
      Var19 = CONCAT91(CONCAT81(auVar1552._8_8_,local_f88[3]),local_f98[3]);
      auVar93._2_10_ = Var19;
      auVar93[1] = local_f88[2];
      auVar93[0] = local_f98[2];
      auVar1694._0_14_ = local_f78._0_14_;
      auVar1694[0xe] = local_f78[7];
      auVar1694[0xf] = local_f68._7_1_;
      auVar1693._14_2_ = auVar1694._14_2_;
      auVar1693._0_13_ = local_f78._0_13_;
      auVar1693[0xd] = local_f68._6_1_;
      auVar1692._13_3_ = auVar1693._13_3_;
      auVar1692._0_12_ = local_f78._0_12_;
      auVar1692[0xc] = local_f78[6];
      auVar1691._12_4_ = auVar1692._12_4_;
      auVar1691._0_11_ = local_f78._0_11_;
      auVar1691[0xb] = local_f68._5_1_;
      auVar1690._11_5_ = auVar1691._11_5_;
      auVar1690._0_10_ = local_f78._0_10_;
      auVar1690[10] = local_f78[5];
      auVar1689._10_6_ = auVar1690._10_6_;
      auVar1689._0_9_ = local_f78._0_9_;
      auVar1689[9] = local_f68._4_1_;
      auVar1688._9_7_ = auVar1689._9_7_;
      auVar1688._0_8_ = local_f78._0_8_;
      auVar1688[8] = local_f78[4];
      Var21 = CONCAT91(CONCAT81(auVar1688._8_8_,local_f68._3_1_),local_f78[3]);
      auVar94._2_10_ = Var21;
      auVar94[1] = local_f68._2_1_;
      auVar94[0] = local_f78[2];
      auVar1687._4_12_ = auVar94;
      auVar1687[3] = local_f68._1_1_;
      auVar1687[2] = local_f78[1];
      auVar1687._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
      auVar1863._0_14_ = local_f58._0_14_;
      auVar1863[0xe] = local_f58[7];
      auVar1863[0xf] = local_f48._7_1_;
      auVar1862._14_2_ = auVar1863._14_2_;
      auVar1862._0_13_ = local_f58._0_13_;
      auVar1862[0xd] = local_f48._6_1_;
      auVar1861._13_3_ = auVar1862._13_3_;
      auVar1861._0_12_ = local_f58._0_12_;
      auVar1861[0xc] = local_f58[6];
      auVar1860._12_4_ = auVar1861._12_4_;
      auVar1860._0_11_ = local_f58._0_11_;
      auVar1860[0xb] = local_f48._5_1_;
      auVar1859._11_5_ = auVar1860._11_5_;
      auVar1859._0_10_ = local_f58._0_10_;
      auVar1859[10] = local_f58[5];
      auVar1858._10_6_ = auVar1859._10_6_;
      auVar1858._0_9_ = local_f58._0_9_;
      auVar1858[9] = local_f48._4_1_;
      auVar1857._9_7_ = auVar1858._9_7_;
      auVar1857._0_8_ = local_f58._0_8_;
      auVar1857[8] = local_f58[4];
      Var23 = CONCAT91(CONCAT81(auVar1857._8_8_,local_f48._3_1_),local_f58[3]);
      auVar95._2_10_ = Var23;
      auVar95[1] = local_f48._2_1_;
      auVar95[0] = local_f58[2];
      auVar619._0_12_ = auVar1239._0_12_;
      auVar619._12_2_ = (short)Var17;
      auVar619._14_2_ = (short)Var19;
      auVar618._12_4_ = auVar619._12_4_;
      auVar618._0_10_ = auVar1239._0_10_;
      auVar618._10_2_ = auVar93._0_2_;
      auVar617._10_6_ = auVar618._10_6_;
      auVar617._0_8_ = auVar1239._0_8_;
      auVar617._8_2_ = auVar92._0_2_;
      auVar1371._0_12_ = auVar1687._0_12_;
      auVar1371._12_2_ = (short)Var21;
      auVar1371._14_2_ = (short)Var23;
      auVar1370._12_4_ = auVar1371._12_4_;
      auVar1370._0_10_ = auVar1687._0_10_;
      auVar1370._10_2_ = auVar95._0_2_;
      auVar1369._10_6_ = auVar1370._10_6_;
      auVar1369._0_8_ = auVar1687._0_8_;
      auVar1369._8_2_ = auVar94._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar2080._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar1036._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1687._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1239._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1623 = local_fe8._1_1_;
      uStack_1622 = (char)((ushort)local_fd8 >> 8);
      uStack_1621 = local_fc8._1_1_;
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68._1_1_;
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48._1_1_;
      local_1618 = auVar1949._8_4_;
      uStack_1614 = auVar614._8_4_;
      uStack_1610 = auVar617._8_4_;
      uStack_160c = auVar1369._8_4_;
      local_1608._8_4_ = auVar1950._12_4_;
      local_1608._12_4_ = auVar615._12_4_;
      auVar490._12_4_ = CONCAT22(auVar2215._8_2_,auVar1037._8_2_);
      auVar947._0_8_ = CONCAT26(auVar2217._10_2_,CONCAT24(auVar1039._10_2_,auVar490._12_4_));
      auVar947._8_2_ = auVar1041._12_2_;
      auVar947._10_2_ = auVar2219._12_2_;
      auVar1044._12_2_ = auVar1042._14_2_;
      auVar1044._0_12_ = auVar947;
      auVar1044._14_2_ = auVar2220._14_2_;
      uVar936 = CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
      auVar2042._0_8_ =
           CONCAT26((short)((unkuint10)Var164 >> 0x20),
                    CONCAT24((short)((unkuint10)Var162 >> 0x20),uVar936));
      auVar2042._8_2_ = (short)((unkuint10)Var243 >> 0x30);
      auVar2042._10_2_ = (short)((unkuint10)Var244 >> 0x30);
      auVar2084._12_2_ = auVar2083._14_2_;
      auVar2084._0_12_ = auVar2042;
      auVar2084._14_2_ = auVar2155._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1552._8_2_,auVar1240._8_2_);
      auVar1178._0_8_ = CONCAT26(auVar1554._10_2_,CONCAT24(auVar1242._10_2_,auVar926._12_4_));
      auVar1178._8_2_ = auVar1244._12_2_;
      auVar1178._10_2_ = auVar1556._12_2_;
      uVar781 = CONCAT22(auVar1857._8_2_,auVar1688._8_2_);
      auVar1632._0_8_ = CONCAT26(auVar1859._10_2_,CONCAT24(auVar1690._10_2_,uVar781));
      auVar1632._8_2_ = auVar1692._12_2_;
      auVar1632._10_2_ = auVar1861._12_2_;
      auVar368._8_4_ = (int)((ulong)auVar947._0_8_ >> 0x20);
      auVar368._0_8_ = auVar947._0_8_;
      auVar368._12_4_ = (int)((ulong)auVar2042._0_8_ >> 0x20);
      auVar620._8_4_ = (int)((ulong)auVar1178._0_8_ >> 0x20);
      auVar620._0_8_ = auVar1178._0_8_;
      auVar620._12_4_ = (int)((ulong)auVar1632._0_8_ >> 0x20);
      local_15f8 = CONCAT44(uVar936,auVar490._12_4_);
      uStack_15f0 = CONCAT44(uVar781,auVar926._12_4_);
      local_15e8 = auVar368._8_8_;
      uStack_15e0 = auVar620._8_8_;
      local_15d8 = CONCAT44(auVar2042._8_4_,auVar947._8_4_);
      uStack_15d0 = CONCAT44(auVar1632._8_4_,auVar1178._8_4_);
      local_15c8._8_4_ = auVar1044._12_4_;
      local_15c8._12_4_ = auVar2084._12_4_;
      uVar314 = CONCAT11(local_1028[8],local_1038[8]);
      uVar1431 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar314));
      uVar1432 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1431));
      uVar1433 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1432));
      auVar1442._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1433));
      auVar1442[10] = local_1038[0xd];
      auVar1442[0xb] = local_1028[0xd];
      auVar1458[0xc] = local_1038[0xe];
      auVar1458._0_12_ = auVar1442;
      auVar1458[0xd] = local_1028[0xe];
      auVar1472[0xe] = local_1038[0xf];
      auVar1472._0_14_ = auVar1458;
      auVar1472[0xf] = local_1028[0xf];
      uStack_1640 = local_1018[8];
      uStack_163f = local_1018[9];
      uStack_163e = local_1018[10];
      uStack_163d = local_1018[0xb];
      uStack_163c = local_1018[0xc];
      uStack_163b = local_1018[0xd];
      uStack_163a = local_1018[0xe];
      uStack_1639 = local_1018[0xf];
      auVar490._12_4_ =
           CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
      uVar315 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar490._12_4_));
      uVar316 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar315));
      auVar514._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar316));
      auVar514[10] = uStack_163b;
      auVar514[0xb] = local_1008[0xd];
      auVar538[0xc] = uStack_163a;
      auVar538._0_12_ = auVar514;
      auVar538[0xd] = local_1008[0xe];
      auVar621[0xe] = uStack_1639;
      auVar621._0_14_ = auVar538;
      auVar621[0xf] = local_1008[0xf];
      uStack_1670 = (undefined1)uStack_ff0;
      uStack_166f = (undefined1)((ushort)uStack_ff0 >> 8);
      uStack_166e = (undefined1)uStack_fee;
      uStack_166d = (undefined1)((ushort)uStack_fee >> 8);
      uStack_166c = (undefined1)uStack_fec;
      uStack_166b = (undefined1)((ushort)uStack_fec >> 8);
      uStack_166a = (undefined1)uStack_fea;
      uStack_1669 = (undefined1)((ushort)uStack_fea >> 8);
      auVar926._12_4_ =
           CONCAT13(uStack_fe0._1_1_,
                    CONCAT12(uStack_166f,CONCAT11((undefined1)uStack_fe0,uStack_1670)));
      uVar504 = CONCAT15(uStack_fe0._2_1_,CONCAT14(uStack_166e,auVar926._12_4_));
      uVar505 = CONCAT17(uStack_fe0._3_1_,CONCAT16(uStack_166d,uVar504));
      auVar788._0_10_ = CONCAT19(uStack_fe0._4_1_,CONCAT18(uStack_166c,uVar505));
      auVar788[10] = uStack_166b;
      auVar788[0xb] = uStack_fe0._5_1_;
      auVar807[0xc] = uStack_166a;
      auVar807._0_12_ = auVar788;
      auVar807[0xd] = uStack_fe0._6_1_;
      auVar846[0xe] = uStack_1669;
      auVar846._0_14_ = auVar807;
      auVar846[0xf] = uStack_fe0._7_1_;
      uStack_1690 = (undefined1)uStack_fd0;
      uStack_168f = (undefined1)((ushort)uStack_fd0 >> 8);
      uStack_168e = (undefined1)uStack_fce;
      uStack_168d = (undefined1)((ushort)uStack_fce >> 8);
      uStack_168c = (undefined1)uStack_fcc;
      uStack_168b = (undefined1)((ushort)uStack_fcc >> 8);
      uStack_168a = (undefined1)uStack_fca;
      uStack_1689 = (undefined1)((ushort)uStack_fca >> 8);
      uVar781 = CONCAT13(uStack_fc0._1_1_,
                         CONCAT12(uStack_168f,CONCAT11((undefined1)uStack_fc0,uStack_1690)));
      uVar782 = CONCAT15(uStack_fc0._2_1_,CONCAT14(uStack_168e,uVar781));
      uVar783 = CONCAT17(uStack_fc0._3_1_,CONCAT16(uStack_168d,uVar782));
      auVar948._0_10_ = CONCAT19(uStack_fc0._4_1_,CONCAT18(uStack_168c,uVar783));
      auVar948[10] = uStack_168b;
      auVar948[0xb] = uStack_fc0._5_1_;
      auVar968[0xc] = uStack_168a;
      auVar968._0_12_ = auVar948;
      auVar968[0xd] = uStack_fc0._6_1_;
      auVar1045[0xe] = uStack_1689;
      auVar1045._0_14_ = auVar968;
      auVar1045[0xf] = uStack_fc0._7_1_;
      uVar503 = CONCAT11(local_fa8[8],local_fb8[8]);
      uVar1759 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar503));
      uVar1760 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1759));
      uVar1761 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1760));
      auVar1770._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1761));
      auVar1770[10] = local_fb8[0xd];
      auVar1770[0xb] = local_fa8[0xd];
      auVar1784[0xc] = local_fb8[0xe];
      auVar1784._0_12_ = auVar1770;
      auVar1784[0xd] = local_fa8[0xe];
      auVar1793[0xe] = local_fb8[0xf];
      auVar1793._0_14_ = auVar1784;
      auVar1793[0xf] = local_fa8[0xf];
      uStack_16c0 = local_f98[8];
      uStack_16bf = local_f98[9];
      uStack_16be = local_f98[10];
      uStack_16bd = local_f98[0xb];
      uStack_16bc = local_f98[0xc];
      uStack_16bb = local_f98[0xd];
      uStack_16ba = local_f98[0xe];
      uStack_16b9 = local_f98[0xf];
      uVar936 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
      uVar937 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar936));
      uVar938 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar937));
      auVar1179._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar938));
      auVar1179[10] = uStack_16bb;
      auVar1179[0xb] = local_f88[0xd];
      auVar1193[0xc] = uStack_16ba;
      auVar1193._0_12_ = auVar1179;
      auVar1193[0xd] = local_f88[0xe];
      auVar1247[0xe] = uStack_16b9;
      auVar1247._0_14_ = auVar1193;
      auVar1247[0xf] = local_f88[0xf];
      uVar780 = CONCAT11((undefined1)uStack_f60,local_f78[8]);
      uVar1990 = CONCAT13(uStack_f60._1_1_,CONCAT12(local_f78[9],uVar780));
      uVar1991 = CONCAT15(uStack_f60._2_1_,CONCAT14(local_f78[10],uVar1990));
      uVar1992 = CONCAT17(uStack_f60._3_1_,CONCAT16(local_f78[0xb],uVar1991));
      auVar2001._0_10_ = CONCAT19(uStack_f60._4_1_,CONCAT18(local_f78[0xc],uVar1992));
      auVar2001[10] = local_f78[0xd];
      auVar2001[0xb] = uStack_f60._5_1_;
      auVar2015[0xc] = local_f78[0xe];
      auVar2015._0_12_ = auVar2001;
      auVar2015[0xd] = uStack_f60._6_1_;
      auVar2024[0xe] = local_f78[0xf];
      auVar2024._0_14_ = auVar2015;
      auVar2024[0xf] = uStack_f60._7_1_;
      uStack_16f0 = local_f58[8];
      uStack_16ef = local_f58[9];
      uStack_16ee = local_f58[10];
      uStack_16ed = local_f58[0xb];
      uStack_16ec = local_f58[0xc];
      uStack_16eb = local_f58[0xd];
      uStack_16ea = local_f58[0xe];
      uStack_16e9 = local_f58[0xf];
      uVar1911 = CONCAT13(uStack_f40._1_1_,
                          CONCAT12(uStack_16ef,CONCAT11((undefined1)uStack_f40,uStack_16f0)));
      uVar1912 = CONCAT15(uStack_f40._2_1_,CONCAT14(uStack_16ee,uVar1911));
      uVar1913 = CONCAT17(uStack_f40._3_1_,CONCAT16(uStack_16ed,uVar1912));
      auVar1918._0_10_ = CONCAT19(uStack_f40._4_1_,CONCAT18(uStack_16ec,uVar1913));
      auVar1918[10] = uStack_16eb;
      auVar1918[0xb] = uStack_f40._5_1_;
      auVar1927[0xc] = uStack_16ea;
      auVar1927._0_12_ = auVar1918;
      auVar1927[0xd] = uStack_f40._6_1_;
      auVar1952[0xe] = uStack_16e9;
      auVar1952._0_14_ = auVar1927;
      auVar1952[0xf] = uStack_f40._7_1_;
      auVar374._12_2_ = (short)((ulong)uVar1433 >> 0x30);
      auVar374._0_12_ = auVar1442;
      auVar374._14_2_ = (short)((ulong)uVar316 >> 0x30);
      auVar373._12_4_ = auVar374._12_4_;
      auVar373._10_2_ = (short)((uint6)uVar315 >> 0x20);
      auVar373._0_10_ = auVar1442._0_10_;
      auVar372._10_6_ = auVar373._10_6_;
      auVar372._8_2_ = (short)((uint6)uVar1432 >> 0x20);
      auVar372._0_8_ = uVar1433;
      auVar371._8_8_ = auVar372._8_8_;
      auVar371._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
      auVar371._0_6_ = uVar1432;
      auVar370._6_10_ = auVar371._6_10_;
      auVar370._4_2_ = (short)((uint)uVar1431 >> 0x10);
      auVar370._0_4_ = uVar1431;
      auVar369._4_12_ = auVar370._4_12_;
      auVar369._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar314);
      auVar626._12_2_ = (short)((ulong)uVar505 >> 0x30);
      auVar626._0_12_ = auVar788;
      auVar626._14_2_ = (short)((ulong)uVar783 >> 0x30);
      auVar625._12_4_ = auVar626._12_4_;
      auVar625._10_2_ = (short)((uint6)uVar782 >> 0x20);
      auVar625._0_10_ = auVar788._0_10_;
      auVar624._10_6_ = auVar625._10_6_;
      auVar624._8_2_ = (short)((uint6)uVar504 >> 0x20);
      auVar624._0_8_ = uVar505;
      auVar623._8_8_ = auVar624._8_8_;
      auVar623._6_2_ = (short)((uint)uVar781 >> 0x10);
      auVar623._0_6_ = uVar504;
      auVar622._6_10_ = auVar623._6_10_;
      auVar622._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
      auVar622._0_4_ = auVar926._12_4_;
      auVar852._12_2_ = (short)((ulong)uVar1761 >> 0x30);
      auVar852._0_12_ = auVar1770;
      auVar852._14_2_ = (short)((ulong)uVar938 >> 0x30);
      auVar851._12_4_ = auVar852._12_4_;
      auVar851._10_2_ = (short)((uint6)uVar937 >> 0x20);
      auVar851._0_10_ = auVar1770._0_10_;
      auVar850._10_6_ = auVar851._10_6_;
      auVar850._8_2_ = (short)((uint6)uVar1760 >> 0x20);
      auVar850._0_8_ = uVar1761;
      auVar849._8_8_ = auVar850._8_8_;
      auVar849._6_2_ = (short)((uint)uVar936 >> 0x10);
      auVar849._0_6_ = uVar1760;
      auVar848._6_10_ = auVar849._6_10_;
      auVar848._4_2_ = (short)((uint)uVar1759 >> 0x10);
      auVar848._0_4_ = uVar1759;
      auVar847._4_12_ = auVar848._4_12_;
      auVar847._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar503);
      auVar1050._12_2_ = (short)((ulong)uVar1992 >> 0x30);
      auVar1050._0_12_ = auVar2001;
      auVar1050._14_2_ = (short)((ulong)uVar1913 >> 0x30);
      auVar1049._12_4_ = auVar1050._12_4_;
      auVar1049._10_2_ = (short)((uint6)uVar1912 >> 0x20);
      auVar1049._0_10_ = auVar2001._0_10_;
      auVar1048._10_6_ = auVar1049._10_6_;
      auVar1048._8_2_ = (short)((uint6)uVar1991 >> 0x20);
      auVar1048._0_8_ = uVar1992;
      auVar1047._8_8_ = auVar1048._8_8_;
      auVar1047._6_2_ = (short)((uint)uVar1911 >> 0x10);
      auVar1047._0_6_ = uVar1991;
      auVar1046._6_10_ = auVar1047._6_10_;
      auVar1046._4_2_ = (short)((uint)uVar1990 >> 0x10);
      auVar1046._0_4_ = uVar1990;
      auVar1248._0_8_ = auVar369._0_8_;
      auVar1248._8_4_ = auVar370._4_4_;
      auVar1248._12_4_ = auVar622._4_4_;
      auVar627._0_8_ = auVar847._0_8_;
      auVar627._8_4_ = auVar848._4_4_;
      auVar627._12_4_ = auVar1046._4_4_;
      local_15b8 = CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_fc0,uStack_1690),
                                     CONCAT11((undefined1)uStack_fe0,uStack_1670)),auVar369._0_4_);
      auStack_15b0[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_f40,uStack_16f0),uVar780),auVar847._0_4_);
      auStack_15b0[1] = auVar1248._8_8_;
      auStack_15b0[2] = auVar627._8_8_;
      local_1598 = CONCAT44(auVar624._8_4_,auVar372._8_4_);
      uStack_1590 = CONCAT44(auVar1048._8_4_,auVar850._8_4_);
      local_1588._8_4_ = auVar373._12_4_;
      local_1588._12_4_ = auVar625._12_4_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)auVar514._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1442._0_10_ >> 0x40));
      auVar1443._0_8_ = CONCAT26(auVar514._10_2_,CONCAT24(auVar1442._10_2_,auVar926._12_4_));
      auVar1443._8_2_ = auVar1458._12_2_;
      auVar1443._10_2_ = auVar538._12_2_;
      auVar1473._12_2_ = auVar1472._14_2_;
      auVar1473._0_12_ = auVar1443;
      auVar1473._14_2_ = auVar621._14_2_;
      auVar490._12_4_ =
           CONCAT22((short)((unkuint10)auVar948._0_10_ >> 0x40),
                    (short)((unkuint10)auVar788._0_10_ >> 0x40));
      auVar515._0_8_ = CONCAT26(auVar948._10_2_,CONCAT24(auVar788._10_2_,auVar490._12_4_));
      auVar515._8_2_ = auVar807._12_2_;
      auVar515._10_2_ = auVar968._12_2_;
      auVar628._12_2_ = auVar846._14_2_;
      auVar628._0_12_ = auVar515;
      auVar628._14_2_ = auVar1045._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)auVar1179._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1770._0_10_ >> 0x40));
      auVar1771._0_8_ = CONCAT26(auVar1179._10_2_,CONCAT24(auVar1770._10_2_,uVar781));
      auVar1771._8_2_ = auVar1784._12_2_;
      auVar1771._10_2_ = auVar1193._12_2_;
      auVar1794._12_2_ = auVar1793._14_2_;
      auVar1794._0_12_ = auVar1771;
      auVar1794._14_2_ = auVar1247._14_2_;
      uVar936 = CONCAT22((short)((unkuint10)auVar1918._0_10_ >> 0x40),
                         (short)((unkuint10)auVar2001._0_10_ >> 0x40));
      auVar2002._0_8_ = CONCAT26(auVar1918._10_2_,CONCAT24(auVar2001._10_2_,uVar936));
      auVar2002._8_2_ = auVar2015._12_2_;
      auVar2002._10_2_ = auVar1927._12_2_;
      auVar2025._12_2_ = auVar2024._14_2_;
      auVar2025._0_12_ = auVar2002;
      auVar2025._14_2_ = auVar1952._14_2_;
      auVar375._8_4_ = (int)((ulong)auVar1443._0_8_ >> 0x20);
      auVar375._0_8_ = auVar1443._0_8_;
      auVar375._12_4_ = (int)((ulong)auVar515._0_8_ >> 0x20);
      auVar629._8_4_ = (int)((ulong)auVar1771._0_8_ >> 0x20);
      auVar629._0_8_ = auVar1771._0_8_;
      auVar629._12_4_ = (int)((ulong)auVar2002._0_8_ >> 0x20);
      local_1578 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
      uStack_1570 = CONCAT44(uVar936,uVar781);
      local_1568 = auVar375._8_8_;
      uStack_1560 = auVar629._8_8_;
      local_1558 = CONCAT44(auVar515._8_4_,auVar1443._8_4_);
      uStack_1550 = CONCAT44(auVar2002._8_4_,auVar1771._8_4_);
      local_1548._8_4_ = auVar1473._12_4_;
      local_1548._12_4_ = auVar628._12_4_;
      local_1538 = CONCAT44(auVar2025._12_4_,auVar1794._12_4_);
      lVar300 = 0;
      do {
        uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar300);
        *(undefined8 *)(dst + 8) = uVar316;
        lVar300 = lVar300 + 0x10;
        dst = dst + stride;
      } while (lVar300 != 0x100);
      return;
    }
    if (bw == 0x20) {
      auVar546 = pshufb(ZEXT116(left[0x3f]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      lVar304 = 0;
      uVar305 = dy;
      do {
        iVar307 = (int)uVar305 >> 6;
        lVar306 = lVar300;
        if (iVar307 < 0x3f) {
          uVar308 = -(iVar307 + -0x3f);
          auVar332 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar332 = pshuflw(auVar332,auVar332,0);
          lVar310 = 0;
          lVar306 = 0;
          do {
            auVar1200 = auVar546;
            if (lVar306 < (int)uVar308) {
              auVar1356 = *(undefined1 (*) [16])(left + lVar306 + iVar307);
              auVar1522 = *(undefined1 (*) [16])(left + lVar306 + (long)iVar307 + 1);
              auVar1198 = pmovzxbw(auVar546,auVar1356);
              auVar1523 = pmovzxbw(in_XMM7,auVar1522);
              auVar1199 = psllw(auVar1198,5);
              sVar313 = auVar332._0_2_;
              in_XMM7._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * sVar313;
              sVar502 = auVar332._2_2_;
              in_XMM7._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * sVar502;
              in_XMM7._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * sVar313;
              in_XMM7._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * sVar502;
              in_XMM7._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * sVar313;
              in_XMM7._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * sVar502;
              in_XMM7._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * sVar313;
              in_XMM7._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * sVar502;
              uVar1169 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM7._0_2_) >> 5;
              uVar1346 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM7._2_2_) >> 5;
              uVar1347 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM7._4_2_) >> 5;
              uVar1348 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM7._6_2_) >> 5;
              uVar1349 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM7._8_2_) >> 5;
              uVar1350 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM7._10_2_) >> 5;
              uVar1351 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM7._12_2_) >> 5;
              uVar1352 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM7._14_2_) >> 5;
              auVar1355._0_2_ = CONCAT11(0,auVar1356[8]);
              auVar1355[2] = auVar1356[9];
              auVar1355[3] = 0;
              auVar1355[4] = auVar1356[10];
              auVar1355[5] = 0;
              auVar1355[6] = auVar1356[0xb];
              auVar1355[7] = 0;
              auVar1355[8] = auVar1356[0xc];
              auVar1355[9] = 0;
              auVar1355[10] = auVar1356[0xd];
              auVar1355[0xb] = 0;
              auVar1355[0xc] = auVar1356[0xe];
              auVar1355[0xd] = 0;
              auVar1355[0xe] = auVar1356[0xf];
              auVar1355[0xf] = 0;
              auVar1198 = psllw(auVar1355,5);
              uVar1353 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                                 (auVar1522[8] - auVar1355._0_2_) * sVar313) >> 5;
              uVar1423 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                                 ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * sVar502) >> 5;
              uVar1424 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                                 ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * sVar313) >> 5;
              uVar1425 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                                 ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * sVar502) >> 5;
              uVar1426 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                                 ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * sVar313) >> 5;
              uVar1427 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                                 ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * sVar502) >> 5;
              uVar1428 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                                 ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * sVar313) >> 5;
              uVar1429 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                                 ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * sVar502) >> 5;
              auVar1200[1] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 -
                             (0xff < uVar1346);
              auVar1200[0] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 -
                             (0xff < uVar1169);
              auVar1200[2] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 -
                             (0xff < uVar1347);
              auVar1200[3] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 -
                             (0xff < uVar1348);
              auVar1200[4] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 -
                             (0xff < uVar1349);
              auVar1200[5] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 -
                             (0xff < uVar1350);
              auVar1200[6] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 -
                             (0xff < uVar1351);
              auVar1200[7] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 -
                             (0xff < uVar1352);
              auVar1200[8] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 -
                             (0xff < uVar1353);
              auVar1200[9] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 -
                             (0xff < uVar1423);
              auVar1200[10] =
                   (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
              auVar1200[0xb] =
                   (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
              auVar1200[0xc] =
                   (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
              auVar1200[0xd] =
                   (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
              auVar1200[0xe] =
                   (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
              auVar1200[0xf] =
                   (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
            }
            *(undefined1 (*) [16])((long)local_1638 + lVar310) = auVar1200;
            lVar310 = lVar310 + 0x10;
            lVar306 = 0x10;
          } while (lVar310 != 0x20);
          if (0x1f < uVar308) {
            uVar308 = 0x20;
          }
          auVar1._8_8_ = local_1638[1];
          auVar1._0_8_ = local_1638[0];
          auVar332 = pblendvb(auVar546,auVar1,*(undefined1 (*) [16])(Mask[0][0] + (uVar308 << 4)));
          auVar6[1] = uStack_1627;
          auVar6[0] = local_1628;
          auVar6[2] = uStack_1626;
          auVar6[3] = uStack_1625;
          auVar6[4] = uStack_1624;
          auVar6[5] = uStack_1623;
          auVar6[6] = uStack_1622;
          auVar6[7] = uStack_1621;
          auVar6[8] = uStack_1620;
          auVar6[9] = uStack_161f;
          auVar6[10] = uStack_161e;
          auVar6[0xb] = uStack_161d;
          auVar6[0xc] = uStack_161c;
          auVar6[0xd] = uStack_161b;
          auVar6[0xe] = uStack_161a;
          auVar6[0xf] = uStack_1619;
          auVar1356 = pblendvb(auVar546,auVar6,*(undefined1 (*) [16])(Mask[1][0] + (uVar308 << 4)));
          *(undefined1 (*) [16])(local_1038 + lVar304 * 0x10) = auVar332;
          *(undefined1 (*) [16])(&local_1438 + lVar304 * 4) = auVar1356;
          uVar305 = uVar305 + dy;
        }
        else {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar306) = auVar546;
            *(undefined1 (*) [16])((long)&local_1438 + lVar306) = auVar546;
            lVar306 = lVar306 + 0x10;
          } while (lVar306 != 0x200);
        }
        if (0x3e < iVar307) break;
        lVar304 = lVar304 + 1;
        lVar300 = lVar300 + 0x10;
      } while (lVar304 != 0x20);
      auVar983._0_14_ = local_1038._0_14_;
      auVar983[0xe] = local_1038[7];
      auVar983[0xf] = local_1028[7];
      auVar982._14_2_ = auVar983._14_2_;
      auVar982._0_13_ = local_1038._0_13_;
      auVar982[0xd] = local_1028[6];
      auVar981._13_3_ = auVar982._13_3_;
      auVar981._0_12_ = local_1038._0_12_;
      auVar981[0xc] = local_1038[6];
      auVar980._12_4_ = auVar981._12_4_;
      auVar980._0_11_ = local_1038._0_11_;
      auVar980[0xb] = local_1028[5];
      auVar979._11_5_ = auVar980._11_5_;
      auVar979._0_10_ = local_1038._0_10_;
      auVar979[10] = local_1038[5];
      auVar978._10_6_ = auVar979._10_6_;
      auVar978._0_9_ = local_1038._0_9_;
      auVar978[9] = local_1028[4];
      auVar977._9_7_ = auVar978._9_7_;
      auVar977._0_8_ = local_1038._0_8_;
      auVar977[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar977._8_8_,local_1028[3]),local_1038[3]);
      auVar16._2_10_ = Var17;
      auVar16[1] = local_1028[2];
      auVar16[0] = local_1038[2];
      auVar976._4_12_ = auVar16;
      auVar976[3] = local_1028[1];
      auVar976[2] = local_1038[1];
      auVar976._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar2193._0_14_ = local_1018._0_14_;
      auVar2193[0xe] = local_1018[7];
      auVar2193[0xf] = local_1008[7];
      auVar2192._14_2_ = auVar2193._14_2_;
      auVar2192._0_13_ = local_1018._0_13_;
      auVar2192[0xd] = local_1008[6];
      auVar2191._13_3_ = auVar2192._13_3_;
      auVar2191._0_12_ = local_1018._0_12_;
      auVar2191[0xc] = local_1018[6];
      auVar2190._12_4_ = auVar2191._12_4_;
      auVar2190._0_11_ = local_1018._0_11_;
      auVar2190[0xb] = local_1008[5];
      auVar2189._11_5_ = auVar2190._11_5_;
      auVar2189._0_10_ = local_1018._0_10_;
      auVar2189[10] = local_1018[5];
      auVar2188._10_6_ = auVar2189._10_6_;
      auVar2188._0_9_ = local_1018._0_9_;
      auVar2188[9] = local_1008[4];
      auVar2187._9_7_ = auVar2188._9_7_;
      auVar2187._0_8_ = local_1018._0_8_;
      auVar2187[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar2187._8_8_,local_1008[3]),local_1018[3]);
      auVar18._2_10_ = Var19;
      auVar18[1] = local_1008[2];
      auVar18[0] = local_1018[2];
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar2049._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar247._6_5_ = 0;
      auVar247._0_6_ = uVar241;
      auVar2050._0_11_ = auVar247 << 0x30;
      auVar269._8_5_ = 0;
      auVar269._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar2051._0_13_ = auVar269 << 0x30;
      auVar2051._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar2051[0xd] = local_fe8._6_1_;
      Var243 = CONCAT37(auVar2051._13_3_,CONCAT16((char)uStack_ff2,uVar241));
      auVar2050._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
      auVar2050[0xb] = local_fe8._5_1_;
      Var162 = CONCAT55(auVar2050._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
      auVar2049._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
      auVar2049[9] = local_fe8._4_1_;
      Var158 = CONCAT73(auVar2049._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
      Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar20._2_10_ = Var21;
      auVar20[1] = local_fe8._2_1_;
      auVar20[0] = (char)uStack_ff6;
      auVar2048._4_12_ = auVar20;
      auVar2048[3] = local_fe8._1_1_;
      uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
      auVar2048[2] = uStack_1624;
      auVar2048._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      uVar305 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar2129._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fce,uVar305);
      auVar248._6_5_ = 0;
      auVar248._0_6_ = uVar241;
      auVar2130._0_11_ = auVar248 << 0x30;
      auVar270._8_5_ = 0;
      auVar270._0_8_ = CONCAT26(uStack_fcc,uVar241);
      auVar2131._0_13_ = auVar270 << 0x30;
      auVar2131._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar241))) >> 0x40
           );
      auVar2131[0xd] = local_fc8._6_1_;
      Var244 = CONCAT37(auVar2131._13_3_,CONCAT16((char)uStack_fd2,uVar241));
      auVar2130._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
      auVar2130[0xb] = local_fc8._5_1_;
      Var164 = CONCAT55(auVar2130._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar305));
      auVar2129._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
      auVar2129[9] = local_fc8._4_1_;
      Var160 = CONCAT73(auVar2129._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
      Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                       (char)((ushort)uStack_fd6 >> 8));
      auVar22._2_10_ = Var23;
      auVar22[1] = local_fc8._2_1_;
      auVar22[0] = (char)uStack_fd6;
      auVar1934._0_12_ = auVar976._0_12_;
      auVar1934._12_2_ = (short)Var17;
      auVar1934._14_2_ = (short)Var19;
      auVar1933._12_4_ = auVar1934._12_4_;
      auVar1933._0_10_ = auVar976._0_10_;
      auVar1933._10_2_ = auVar18._0_2_;
      auVar1932._10_6_ = auVar1933._10_6_;
      auVar1932._0_8_ = auVar976._0_8_;
      auVar1932._8_2_ = auVar16._0_2_;
      auVar549._0_12_ = auVar2048._0_12_;
      auVar549._12_2_ = (short)Var21;
      auVar549._14_2_ = (short)Var23;
      auVar548._12_4_ = auVar549._12_4_;
      auVar548._0_10_ = auVar2048._0_10_;
      auVar548._10_2_ = auVar22._0_2_;
      auVar547._10_6_ = auVar548._10_6_;
      auVar547._0_8_ = auVar2048._0_8_;
      auVar547._8_2_ = auVar20._0_2_;
      auVar1208._0_14_ = local_fb8._0_14_;
      auVar1208[0xe] = local_fb8[7];
      auVar1208[0xf] = local_fa8[7];
      auVar1207._14_2_ = auVar1208._14_2_;
      auVar1207._0_13_ = local_fb8._0_13_;
      auVar1207[0xd] = local_fa8[6];
      auVar1206._13_3_ = auVar1207._13_3_;
      auVar1206._0_12_ = local_fb8._0_12_;
      auVar1206[0xc] = local_fb8[6];
      auVar1205._12_4_ = auVar1206._12_4_;
      auVar1205._0_11_ = local_fb8._0_11_;
      auVar1205[0xb] = local_fa8[5];
      auVar1204._11_5_ = auVar1205._11_5_;
      auVar1204._0_10_ = local_fb8._0_10_;
      auVar1204[10] = local_fb8[5];
      auVar1203._10_6_ = auVar1204._10_6_;
      auVar1203._0_9_ = local_fb8._0_9_;
      auVar1203[9] = local_fa8[4];
      auVar1202._9_7_ = auVar1203._9_7_;
      auVar1202._0_8_ = local_fb8._0_8_;
      auVar1202[8] = local_fb8[4];
      Var17 = CONCAT91(CONCAT81(auVar1202._8_8_,local_fa8[3]),local_fb8[3]);
      auVar24._2_10_ = Var17;
      auVar24[1] = local_fa8[2];
      auVar24[0] = local_fb8[2];
      auVar1201._4_12_ = auVar24;
      auVar1201[3] = local_fa8[1];
      auVar1201[2] = local_fb8[1];
      auVar1201._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1530._0_14_ = local_f98._0_14_;
      auVar1530[0xe] = local_f98[7];
      auVar1530[0xf] = local_f88[7];
      auVar1529._14_2_ = auVar1530._14_2_;
      auVar1529._0_13_ = local_f98._0_13_;
      auVar1529[0xd] = local_f88[6];
      auVar1528._13_3_ = auVar1529._13_3_;
      auVar1528._0_12_ = local_f98._0_12_;
      auVar1528[0xc] = local_f98[6];
      auVar1527._12_4_ = auVar1528._12_4_;
      auVar1527._0_11_ = local_f98._0_11_;
      auVar1527[0xb] = local_f88[5];
      auVar1526._11_5_ = auVar1527._11_5_;
      auVar1526._0_10_ = local_f98._0_10_;
      auVar1526[10] = local_f98[5];
      auVar1525._10_6_ = auVar1526._10_6_;
      auVar1525._0_9_ = local_f98._0_9_;
      auVar1525[9] = local_f88[4];
      auVar1524._9_7_ = auVar1525._9_7_;
      auVar1524._0_8_ = local_f98._0_8_;
      auVar1524[8] = local_f98[4];
      Var19 = CONCAT91(CONCAT81(auVar1524._8_8_,local_f88[3]),local_f98[3]);
      auVar25._2_10_ = Var19;
      auVar25[1] = local_f88[2];
      auVar25[0] = local_f98[2];
      auVar1662._0_14_ = local_f78._0_14_;
      auVar1662[0xe] = local_f78[7];
      auVar1662[0xf] = local_f68._7_1_;
      auVar1661._14_2_ = auVar1662._14_2_;
      auVar1661._0_13_ = local_f78._0_13_;
      auVar1661[0xd] = local_f68._6_1_;
      auVar1660._13_3_ = auVar1661._13_3_;
      auVar1660._0_12_ = local_f78._0_12_;
      auVar1660[0xc] = local_f78[6];
      auVar1659._12_4_ = auVar1660._12_4_;
      auVar1659._0_11_ = local_f78._0_11_;
      auVar1659[0xb] = local_f68._5_1_;
      auVar1658._11_5_ = auVar1659._11_5_;
      auVar1658._0_10_ = local_f78._0_10_;
      auVar1658[10] = local_f78[5];
      auVar1657._10_6_ = auVar1658._10_6_;
      auVar1657._0_9_ = local_f78._0_9_;
      auVar1657[9] = local_f68._4_1_;
      auVar1656._9_7_ = auVar1657._9_7_;
      auVar1656._0_8_ = local_f78._0_8_;
      auVar1656[8] = local_f78[4];
      Var21 = CONCAT91(CONCAT81(auVar1656._8_8_,local_f68._3_1_),local_f78[3]);
      auVar26._2_10_ = Var21;
      auVar26[1] = local_f68._2_1_;
      auVar26[0] = local_f78[2];
      auVar1655._4_12_ = auVar26;
      auVar1655[3] = local_f68._1_1_;
      auVar1655[2] = local_f78[1];
      auVar1655._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
      auVar1834._0_14_ = local_f58._0_14_;
      auVar1834[0xe] = local_f58[7];
      auVar1834[0xf] = local_f48._7_1_;
      auVar1833._14_2_ = auVar1834._14_2_;
      auVar1833._0_13_ = local_f58._0_13_;
      auVar1833[0xd] = local_f48._6_1_;
      auVar1832._13_3_ = auVar1833._13_3_;
      auVar1832._0_12_ = local_f58._0_12_;
      auVar1832[0xc] = local_f58[6];
      auVar1831._12_4_ = auVar1832._12_4_;
      auVar1831._0_11_ = local_f58._0_11_;
      auVar1831[0xb] = local_f48._5_1_;
      auVar1830._11_5_ = auVar1831._11_5_;
      auVar1830._0_10_ = local_f58._0_10_;
      auVar1830[10] = local_f58[5];
      auVar1829._10_6_ = auVar1830._10_6_;
      auVar1829._0_9_ = local_f58._0_9_;
      auVar1829[9] = local_f48._4_1_;
      auVar1828._9_7_ = auVar1829._9_7_;
      auVar1828._0_8_ = local_f58._0_8_;
      auVar1828[8] = local_f58[4];
      Var23 = CONCAT91(CONCAT81(auVar1828._8_8_,local_f48._3_1_),local_f58[3]);
      auVar27._2_10_ = Var23;
      auVar27[1] = local_f48._2_1_;
      auVar27[0] = local_f58[2];
      auVar552._0_12_ = auVar1201._0_12_;
      auVar552._12_2_ = (short)Var17;
      auVar552._14_2_ = (short)Var19;
      auVar551._12_4_ = auVar552._12_4_;
      auVar551._0_10_ = auVar1201._0_10_;
      auVar551._10_2_ = auVar25._0_2_;
      auVar550._10_6_ = auVar551._10_6_;
      auVar550._0_8_ = auVar1201._0_8_;
      auVar550._8_2_ = auVar24._0_2_;
      auVar1359._0_12_ = auVar1655._0_12_;
      auVar1359._12_2_ = (short)Var21;
      auVar1359._14_2_ = (short)Var23;
      auVar1358._12_4_ = auVar1359._12_4_;
      auVar1358._0_10_ = auVar1655._0_10_;
      auVar1358._10_2_ = auVar27._0_2_;
      auVar1357._10_6_ = auVar1358._10_6_;
      auVar1357._0_8_ = auVar1655._0_8_;
      auVar1357._8_2_ = auVar26._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar2048._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar976._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1655._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1201._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1623 = local_fe8._1_1_;
      uStack_1622 = (char)((ushort)local_fd8 >> 8);
      uStack_1621 = local_fc8._1_1_;
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68._1_1_;
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48._1_1_;
      local_1618 = auVar1932._8_4_;
      uStack_1614 = auVar547._8_4_;
      uStack_1610 = auVar550._8_4_;
      uStack_160c = auVar1357._8_4_;
      local_1608._8_4_ = auVar1933._12_4_;
      local_1608._12_4_ = auVar548._12_4_;
      auVar490._12_4_ = CONCAT22(auVar2187._8_2_,auVar977._8_2_);
      auVar939._0_8_ = CONCAT26(auVar2189._10_2_,CONCAT24(auVar979._10_2_,auVar490._12_4_));
      auVar939._8_2_ = auVar981._12_2_;
      auVar939._10_2_ = auVar2191._12_2_;
      auVar984._12_2_ = auVar982._14_2_;
      auVar984._0_12_ = auVar939;
      auVar984._14_2_ = auVar2192._14_2_;
      uVar936 = CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
      auVar2038._0_8_ =
           CONCAT26((short)((unkuint10)Var164 >> 0x20),
                    CONCAT24((short)((unkuint10)Var162 >> 0x20),uVar936));
      auVar2038._8_2_ = (short)((unkuint10)Var243 >> 0x30);
      auVar2038._10_2_ = (short)((unkuint10)Var244 >> 0x30);
      auVar2052._12_2_ = auVar2051._14_2_;
      auVar2052._0_12_ = auVar2038;
      auVar2052._14_2_ = auVar2131._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1524._8_2_,auVar1202._8_2_);
      auVar1170._0_8_ = CONCAT26(auVar1526._10_2_,CONCAT24(auVar1204._10_2_,auVar926._12_4_));
      auVar1170._8_2_ = auVar1206._12_2_;
      auVar1170._10_2_ = auVar1528._12_2_;
      uVar781 = CONCAT22(auVar1828._8_2_,auVar1656._8_2_);
      auVar1628._0_8_ = CONCAT26(auVar1830._10_2_,CONCAT24(auVar1658._10_2_,uVar781));
      auVar1628._8_2_ = auVar1660._12_2_;
      auVar1628._10_2_ = auVar1832._12_2_;
      auVar333._8_4_ = (int)((ulong)auVar939._0_8_ >> 0x20);
      auVar333._0_8_ = auVar939._0_8_;
      auVar333._12_4_ = (int)((ulong)auVar2038._0_8_ >> 0x20);
      auVar553._8_4_ = (int)((ulong)auVar1170._0_8_ >> 0x20);
      auVar553._0_8_ = auVar1170._0_8_;
      auVar553._12_4_ = (int)((ulong)auVar1628._0_8_ >> 0x20);
      local_15f8 = CONCAT44(uVar936,auVar490._12_4_);
      uStack_15f0 = CONCAT44(uVar781,auVar926._12_4_);
      local_15e8 = auVar333._8_8_;
      uStack_15e0 = auVar553._8_8_;
      local_15d8 = CONCAT44(auVar2038._8_4_,auVar939._8_4_);
      uStack_15d0 = CONCAT44(auVar1628._8_4_,auVar1170._8_4_);
      local_15c8._8_4_ = auVar984._12_4_;
      local_15c8._12_4_ = auVar2052._12_4_;
      uVar314 = CONCAT11(local_1028[8],local_1038[8]);
      uVar1431 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar314));
      uVar1432 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1431));
      uVar1433 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1432));
      auVar1434._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1433));
      auVar1434[10] = local_1038[0xd];
      auVar1434[0xb] = local_1028[0xd];
      auVar1454[0xc] = local_1038[0xe];
      auVar1454._0_12_ = auVar1434;
      auVar1454[0xd] = local_1028[0xe];
      auVar1464[0xe] = local_1038[0xf];
      auVar1464._0_14_ = auVar1454;
      auVar1464[0xf] = local_1028[0xf];
      uStack_1640 = local_1018[8];
      uStack_163f = local_1018[9];
      uStack_163e = local_1018[10];
      uStack_163d = local_1018[0xb];
      uStack_163c = local_1018[0xc];
      uStack_163b = local_1018[0xd];
      uStack_163a = local_1018[0xe];
      uStack_1639 = local_1018[0xf];
      auVar490._12_4_ =
           CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
      uVar315 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar490._12_4_));
      uVar316 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar315));
      auVar506._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar316));
      auVar506[10] = uStack_163b;
      auVar506[0xb] = local_1008[0xd];
      auVar534[0xc] = uStack_163a;
      auVar534._0_12_ = auVar506;
      auVar534[0xd] = local_1008[0xe];
      auVar554[0xe] = uStack_1639;
      auVar554._0_14_ = auVar534;
      auVar554[0xf] = local_1008[0xf];
      uStack_1670 = (undefined1)uStack_ff0;
      uStack_166f = (undefined1)((ushort)uStack_ff0 >> 8);
      uStack_166e = (undefined1)uStack_fee;
      uStack_166d = (undefined1)((ushort)uStack_fee >> 8);
      uStack_166c = (undefined1)uStack_fec;
      uStack_166b = (undefined1)((ushort)uStack_fec >> 8);
      uStack_166a = (undefined1)uStack_fea;
      uStack_1669 = (undefined1)((ushort)uStack_fea >> 8);
      auVar926._12_4_ =
           CONCAT13(uStack_fe0._1_1_,
                    CONCAT12(uStack_166f,CONCAT11((undefined1)uStack_fe0,uStack_1670)));
      uVar504 = CONCAT15(uStack_fe0._2_1_,CONCAT14(uStack_166e,auVar926._12_4_));
      uVar505 = CONCAT17(uStack_fe0._3_1_,CONCAT16(uStack_166d,uVar504));
      auVar784._0_10_ = CONCAT19(uStack_fe0._4_1_,CONCAT18(uStack_166c,uVar505));
      auVar784[10] = uStack_166b;
      auVar784[0xb] = uStack_fe0._5_1_;
      auVar803[0xc] = uStack_166a;
      auVar803._0_12_ = auVar784;
      auVar803[0xd] = uStack_fe0._6_1_;
      auVar815[0xe] = uStack_1669;
      auVar815._0_14_ = auVar803;
      auVar815[0xf] = uStack_fe0._7_1_;
      uStack_1690 = (undefined1)uStack_fd0;
      uStack_168f = (undefined1)((ushort)uStack_fd0 >> 8);
      uStack_168e = (undefined1)uStack_fce;
      uStack_168d = (undefined1)((ushort)uStack_fce >> 8);
      uStack_168c = (undefined1)uStack_fcc;
      uStack_168b = (undefined1)((ushort)uStack_fcc >> 8);
      uStack_168a = (undefined1)uStack_fca;
      uStack_1689 = (undefined1)((ushort)uStack_fca >> 8);
      uVar781 = CONCAT13(uStack_fc0._1_1_,
                         CONCAT12(uStack_168f,CONCAT11((undefined1)uStack_fc0,uStack_1690)));
      uVar782 = CONCAT15(uStack_fc0._2_1_,CONCAT14(uStack_168e,uVar781));
      uVar783 = CONCAT17(uStack_fc0._3_1_,CONCAT16(uStack_168d,uVar782));
      auVar940._0_10_ = CONCAT19(uStack_fc0._4_1_,CONCAT18(uStack_168c,uVar783));
      auVar940[10] = uStack_168b;
      auVar940[0xb] = uStack_fc0._5_1_;
      auVar964[0xc] = uStack_168a;
      auVar964._0_12_ = auVar940;
      auVar964[0xd] = uStack_fc0._6_1_;
      auVar985[0xe] = uStack_1689;
      auVar985._0_14_ = auVar964;
      auVar985[0xf] = uStack_fc0._7_1_;
      uVar503 = CONCAT11(local_fa8[8],local_fb8[8]);
      uVar1759 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar503));
      uVar1760 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1759));
      uVar1761 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1760));
      auVar1762._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1761));
      auVar1762[10] = local_fb8[0xd];
      auVar1762[0xb] = local_fa8[0xd];
      auVar1780[0xc] = local_fb8[0xe];
      auVar1780._0_12_ = auVar1762;
      auVar1780[0xd] = local_fa8[0xe];
      uStack_16c0 = local_f98[8];
      uStack_16bf = local_f98[9];
      uStack_16be = local_f98[10];
      uStack_16bd = local_f98[0xb];
      uStack_16bc = local_f98[0xc];
      uStack_16bb = local_f98[0xd];
      uStack_16ba = local_f98[0xe];
      uVar936 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
      uVar937 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar936));
      uVar938 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar937));
      auVar1171._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar938));
      auVar1171[10] = uStack_16bb;
      auVar1171[0xb] = local_f88[0xd];
      auVar1189[0xc] = uStack_16ba;
      auVar1189._0_12_ = auVar1171;
      auVar1189[0xd] = local_f88[0xe];
      uVar780 = CONCAT11((undefined1)uStack_f60,local_f78[8]);
      uVar1990 = CONCAT13(uStack_f60._1_1_,CONCAT12(local_f78[9],uVar780));
      uVar1991 = CONCAT15(uStack_f60._2_1_,CONCAT14(local_f78[10],uVar1990));
      uVar1992 = CONCAT17(uStack_f60._3_1_,CONCAT16(local_f78[0xb],uVar1991));
      auVar1993._0_10_ = CONCAT19(uStack_f60._4_1_,CONCAT18(local_f78[0xc],uVar1992));
      auVar1993[10] = local_f78[0xd];
      auVar1993[0xb] = uStack_f60._5_1_;
      auVar2011[0xc] = local_f78[0xe];
      auVar2011._0_12_ = auVar1993;
      auVar2011[0xd] = uStack_f60._6_1_;
      uStack_16f0 = local_f58[8];
      uStack_16ef = local_f58[9];
      uStack_16ee = local_f58[10];
      uStack_16ed = local_f58[0xb];
      uStack_16ec = local_f58[0xc];
      uStack_16eb = local_f58[0xd];
      uStack_16ea = local_f58[0xe];
      uVar1911 = CONCAT13(uStack_f40._1_1_,
                          CONCAT12(uStack_16ef,CONCAT11((undefined1)uStack_f40,uStack_16f0)));
      uVar1912 = CONCAT15(uStack_f40._2_1_,CONCAT14(uStack_16ee,uVar1911));
      uVar1913 = CONCAT17(uStack_f40._3_1_,CONCAT16(uStack_16ed,uVar1912));
      auVar1914._0_10_ = CONCAT19(uStack_f40._4_1_,CONCAT18(uStack_16ec,uVar1913));
      auVar1914[10] = uStack_16eb;
      auVar1914[0xb] = uStack_f40._5_1_;
      auVar1923[0xc] = uStack_16ea;
      auVar1923._0_12_ = auVar1914;
      auVar1923[0xd] = uStack_f40._6_1_;
      auVar339._12_2_ = (short)((ulong)uVar1433 >> 0x30);
      auVar339._0_12_ = auVar1434;
      auVar339._14_2_ = (short)((ulong)uVar316 >> 0x30);
      auVar338._12_4_ = auVar339._12_4_;
      auVar338._10_2_ = (short)((uint6)uVar315 >> 0x20);
      auVar338._0_10_ = auVar1434._0_10_;
      auVar337._10_6_ = auVar338._10_6_;
      auVar337._8_2_ = (short)((uint6)uVar1432 >> 0x20);
      auVar337._0_8_ = uVar1433;
      auVar336._8_8_ = auVar337._8_8_;
      auVar336._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
      auVar336._0_6_ = uVar1432;
      auVar335._6_10_ = auVar336._6_10_;
      auVar335._4_2_ = (short)((uint)uVar1431 >> 0x10);
      auVar335._0_4_ = uVar1431;
      auVar334._4_12_ = auVar335._4_12_;
      auVar334._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar314);
      auVar559._12_2_ = (short)((ulong)uVar505 >> 0x30);
      auVar559._0_12_ = auVar784;
      auVar559._14_2_ = (short)((ulong)uVar783 >> 0x30);
      auVar558._12_4_ = auVar559._12_4_;
      auVar558._10_2_ = (short)((uint6)uVar782 >> 0x20);
      auVar558._0_10_ = auVar784._0_10_;
      auVar557._10_6_ = auVar558._10_6_;
      auVar557._8_2_ = (short)((uint6)uVar504 >> 0x20);
      auVar557._0_8_ = uVar505;
      auVar556._8_8_ = auVar557._8_8_;
      auVar556._6_2_ = (short)((uint)uVar781 >> 0x10);
      auVar556._0_6_ = uVar504;
      auVar555._6_10_ = auVar556._6_10_;
      auVar555._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
      auVar555._0_4_ = auVar926._12_4_;
      auVar821._12_2_ = (short)((ulong)uVar1761 >> 0x30);
      auVar821._0_12_ = auVar1762;
      auVar821._14_2_ = (short)((ulong)uVar938 >> 0x30);
      auVar820._12_4_ = auVar821._12_4_;
      auVar820._10_2_ = (short)((uint6)uVar937 >> 0x20);
      auVar820._0_10_ = auVar1762._0_10_;
      auVar819._10_6_ = auVar820._10_6_;
      auVar819._8_2_ = (short)((uint6)uVar1760 >> 0x20);
      auVar819._0_8_ = uVar1761;
      auVar818._8_8_ = auVar819._8_8_;
      auVar818._6_2_ = (short)((uint)uVar936 >> 0x10);
      auVar818._0_6_ = uVar1760;
      auVar817._6_10_ = auVar818._6_10_;
      auVar817._4_2_ = (short)((uint)uVar1759 >> 0x10);
      auVar817._0_4_ = uVar1759;
      auVar816._4_12_ = auVar817._4_12_;
      auVar816._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar503);
      auVar990._12_2_ = (short)((ulong)uVar1992 >> 0x30);
      auVar990._0_12_ = auVar1993;
      auVar990._14_2_ = (short)((ulong)uVar1913 >> 0x30);
      auVar989._12_4_ = auVar990._12_4_;
      auVar989._10_2_ = (short)((uint6)uVar1912 >> 0x20);
      auVar989._0_10_ = auVar1993._0_10_;
      auVar988._10_6_ = auVar989._10_6_;
      auVar988._8_2_ = (short)((uint6)uVar1991 >> 0x20);
      auVar988._0_8_ = uVar1992;
      auVar987._8_8_ = auVar988._8_8_;
      auVar987._6_2_ = (short)((uint)uVar1911 >> 0x10);
      auVar987._0_6_ = uVar1991;
      auVar986._6_10_ = auVar987._6_10_;
      auVar986._4_2_ = (short)((uint)uVar1990 >> 0x10);
      auVar986._0_4_ = uVar1990;
      auVar1209._0_8_ = auVar334._0_8_;
      auVar1209._8_4_ = auVar335._4_4_;
      auVar1209._12_4_ = auVar555._4_4_;
      auVar560._0_8_ = auVar816._0_8_;
      auVar560._8_4_ = auVar817._4_4_;
      auVar560._12_4_ = auVar986._4_4_;
      local_15b8 = CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_fc0,uStack_1690),
                                     CONCAT11((undefined1)uStack_fe0,uStack_1670)),auVar334._0_4_);
      auStack_15b0[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_f40,uStack_16f0),uVar780),auVar816._0_4_);
      auStack_15b0[1] = auVar1209._8_8_;
      auStack_15b0[2] = auVar560._8_8_;
      local_1598 = CONCAT44(auVar557._8_4_,auVar337._8_4_);
      uStack_1590 = CONCAT44(auVar988._8_4_,auVar819._8_4_);
      local_1588._8_4_ = auVar338._12_4_;
      local_1588._12_4_ = auVar558._12_4_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)auVar506._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1434._0_10_ >> 0x40));
      auVar1435._0_8_ = CONCAT26(auVar506._10_2_,CONCAT24(auVar1434._10_2_,auVar926._12_4_));
      auVar1435._8_2_ = auVar1454._12_2_;
      auVar1435._10_2_ = auVar534._12_2_;
      auVar1465._12_2_ = auVar1464._14_2_;
      auVar1465._0_12_ = auVar1435;
      auVar1465._14_2_ = auVar554._14_2_;
      auVar490._12_4_ =
           CONCAT22((short)((unkuint10)auVar940._0_10_ >> 0x40),
                    (short)((unkuint10)auVar784._0_10_ >> 0x40));
      auVar507._0_8_ = CONCAT26(auVar940._10_2_,CONCAT24(auVar784._10_2_,auVar490._12_4_));
      auVar507._8_2_ = auVar803._12_2_;
      auVar507._10_2_ = auVar964._12_2_;
      auVar561._12_2_ = auVar815._14_2_;
      auVar561._0_12_ = auVar507;
      auVar561._14_2_ = auVar985._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)auVar1171._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1762._0_10_ >> 0x40));
      auVar1763._0_8_ = CONCAT26(auVar1171._10_2_,CONCAT24(auVar1762._10_2_,uVar781));
      auVar1763._8_2_ = auVar1780._12_2_;
      auVar1763._10_2_ = auVar1189._12_2_;
      uVar936 = CONCAT22((short)((unkuint10)auVar1914._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1993._0_10_ >> 0x40));
      auVar1994._0_8_ = CONCAT26(auVar1914._10_2_,CONCAT24(auVar1993._10_2_,uVar936));
      auVar1994._8_2_ = auVar2011._12_2_;
      auVar1994._10_2_ = auVar1923._12_2_;
      auVar340._8_4_ = (int)((ulong)auVar1435._0_8_ >> 0x20);
      auVar340._0_8_ = auVar1435._0_8_;
      auVar340._12_4_ = (int)((ulong)auVar507._0_8_ >> 0x20);
      auVar562._8_4_ = (int)((ulong)auVar1763._0_8_ >> 0x20);
      auVar562._0_8_ = auVar1763._0_8_;
      auVar562._12_4_ = (int)((ulong)auVar1994._0_8_ >> 0x20);
      local_1578 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
      uStack_1570 = CONCAT44(uVar936,uVar781);
      local_1568 = auVar340._8_8_;
      uStack_1560 = auVar562._8_8_;
      local_1558 = CONCAT44(auVar507._8_4_,auVar1435._8_4_);
      uStack_1550 = CONCAT44(auVar1994._8_4_,auVar1763._8_4_);
      local_1548._8_4_ = auVar1465._12_4_;
      local_1548._12_4_ = auVar561._12_4_;
      auVar13._8_8_ = uStack_1430;
      auVar13._0_8_ = CONCAT44(uStack_1434,local_1438);
      auVar998._0_14_ = auVar13._0_14_;
      auVar998[0xe] = (char)((uint)uStack_1434 >> 0x18);
      auVar998[0xf] = uStack_1421;
      auVar997._14_2_ = auVar998._14_2_;
      auVar997._0_13_ = auVar13._0_13_;
      auVar997[0xd] = uStack_1422;
      auVar996._13_3_ = auVar997._13_3_;
      auVar996._0_12_ = auVar13._0_12_;
      auVar996[0xc] = (char)((uint)uStack_1434 >> 0x10);
      auVar995._12_4_ = auVar996._12_4_;
      auVar995._0_11_ = auVar13._0_11_;
      auVar995[0xb] = uStack_1423;
      auVar994._11_5_ = auVar995._11_5_;
      auVar994._0_10_ = auVar13._0_10_;
      auVar994[10] = (char)((uint)uStack_1434 >> 8);
      auVar993._10_6_ = auVar994._10_6_;
      auVar993._0_9_ = auVar13._0_9_;
      auVar993[9] = uStack_1424;
      auVar992._9_7_ = auVar993._9_7_;
      auVar992[8] = (char)uStack_1434;
      auVar992._0_8_ = CONCAT44(uStack_1434,local_1438);
      Var17 = CONCAT91(CONCAT81(auVar992._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18));
      auVar29._2_10_ = Var17;
      auVar29[1] = uStack_1426;
      auVar29[0] = (char)((uint)local_1438 >> 0x10);
      auVar28._2_12_ = auVar29;
      auVar28[1] = uStack_1427;
      auVar28[0] = (char)((uint)local_1438 >> 8);
      auVar991._0_2_ = CONCAT11(local_1428,(char)local_1438);
      auVar991._2_14_ = auVar28;
      auVar2200._0_14_ = local_1418._0_14_;
      auVar2200[0xe] = local_1418[7];
      auVar2200[0xf] = uStack_1401;
      auVar2199._14_2_ = auVar2200._14_2_;
      auVar2199._0_13_ = local_1418._0_13_;
      auVar2199[0xd] = uStack_1402;
      auVar2198._13_3_ = auVar2199._13_3_;
      auVar2198._0_12_ = local_1418._0_12_;
      auVar2198[0xc] = local_1418[6];
      auVar2197._12_4_ = auVar2198._12_4_;
      auVar2197._0_11_ = local_1418._0_11_;
      auVar2197[0xb] = uStack_1403;
      auVar2196._11_5_ = auVar2197._11_5_;
      auVar2196._0_10_ = local_1418._0_10_;
      auVar2196[10] = local_1418[5];
      auVar2195._10_6_ = auVar2196._10_6_;
      auVar2195._0_9_ = local_1418._0_9_;
      auVar2195[9] = uStack_1404;
      auVar2194._9_7_ = auVar2195._9_7_;
      auVar2194._0_8_ = local_1418._0_8_;
      auVar2194[8] = local_1418[4];
      Var19 = CONCAT91(CONCAT81(auVar2194._8_8_,uStack_1405),local_1418[3]);
      auVar31._2_10_ = Var19;
      auVar31[1] = uStack_1406;
      auVar31[0] = local_1418[2];
      auVar30._2_12_ = auVar31;
      auVar30[1] = uStack_1407;
      auVar30[0] = local_1418[1];
      auVar2060._0_14_ = local_13f8._0_14_;
      auVar2060[0xe] = local_13f8[7];
      auVar2060[0xf] = uStack_13e1;
      auVar2059._14_2_ = auVar2060._14_2_;
      auVar2059._0_13_ = local_13f8._0_13_;
      auVar2059[0xd] = uStack_13e2;
      auVar2058._13_3_ = auVar2059._13_3_;
      auVar2058._0_12_ = local_13f8._0_12_;
      auVar2058[0xc] = local_13f8[6];
      auVar2057._12_4_ = auVar2058._12_4_;
      auVar2057._0_11_ = local_13f8._0_11_;
      auVar2057[0xb] = uStack_13e3;
      auVar2056._11_5_ = auVar2057._11_5_;
      auVar2056._0_10_ = local_13f8._0_10_;
      auVar2056[10] = local_13f8[5];
      auVar2055._10_6_ = auVar2056._10_6_;
      auVar2055._0_9_ = local_13f8._0_9_;
      auVar2055[9] = uStack_13e4;
      auVar2054._9_7_ = auVar2055._9_7_;
      auVar2054._0_8_ = local_13f8._0_8_;
      auVar2054[8] = local_13f8[4];
      Var21 = CONCAT91(CONCAT81(auVar2054._8_8_,uStack_13e5),local_13f8[3]);
      auVar33._2_10_ = Var21;
      auVar33[1] = uStack_13e6;
      auVar33[0] = local_13f8[2];
      auVar32._2_12_ = auVar33;
      auVar32[1] = uStack_13e7;
      auVar32[0] = local_13f8[1];
      auVar2053._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
      auVar2053._2_14_ = auVar32;
      auVar2138._0_14_ = local_13d8._0_14_;
      auVar2138[0xe] = local_13d8[7];
      auVar2138[0xf] = uStack_13c1;
      auVar2137._14_2_ = auVar2138._14_2_;
      auVar2137._0_13_ = local_13d8._0_13_;
      auVar2137[0xd] = uStack_13c2;
      auVar2136._13_3_ = auVar2137._13_3_;
      auVar2136._0_12_ = local_13d8._0_12_;
      auVar2136[0xc] = local_13d8[6];
      auVar2135._12_4_ = auVar2136._12_4_;
      auVar2135._0_11_ = local_13d8._0_11_;
      auVar2135[0xb] = uStack_13c3;
      auVar2134._11_5_ = auVar2135._11_5_;
      auVar2134._0_10_ = local_13d8._0_10_;
      auVar2134[10] = local_13d8[5];
      auVar2133._10_6_ = auVar2134._10_6_;
      auVar2133._0_9_ = local_13d8._0_9_;
      auVar2133[9] = uStack_13c4;
      auVar2132._9_7_ = auVar2133._9_7_;
      auVar2132._0_8_ = local_13d8._0_8_;
      auVar2132[8] = local_13d8[4];
      Var23 = CONCAT91(CONCAT81(auVar2132._8_8_,uStack_13c5),local_13d8[3]);
      auVar35._2_10_ = Var23;
      auVar35[1] = uStack_13c6;
      auVar35[0] = local_13d8[2];
      auVar34._2_12_ = auVar35;
      auVar34[1] = uStack_13c7;
      auVar34[0] = local_13d8[1];
      auVar1938._0_12_ = auVar991._0_12_;
      auVar1938._12_2_ = (short)Var17;
      auVar1938._14_2_ = (short)Var19;
      auVar1937._12_4_ = auVar1938._12_4_;
      auVar1937._0_10_ = auVar991._0_10_;
      auVar1937._10_2_ = auVar31._0_2_;
      auVar1936._10_6_ = auVar1937._10_6_;
      auVar1936._0_8_ = auVar991._0_8_;
      auVar1936._8_2_ = auVar29._0_2_;
      auVar36._4_8_ = auVar1936._8_8_;
      auVar36._2_2_ = auVar30._0_2_;
      auVar36._0_2_ = auVar28._0_2_;
      auVar1935._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar991._0_2_);
      auVar1935._4_12_ = auVar36;
      auVar565._0_12_ = auVar2053._0_12_;
      auVar565._12_2_ = (short)Var21;
      auVar565._14_2_ = (short)Var23;
      auVar564._12_4_ = auVar565._12_4_;
      auVar564._0_10_ = auVar2053._0_10_;
      auVar564._10_2_ = auVar35._0_2_;
      auVar563._10_6_ = auVar564._10_6_;
      auVar563._0_8_ = auVar2053._0_8_;
      auVar563._8_2_ = auVar33._0_2_;
      auVar37._4_8_ = auVar563._8_8_;
      auVar37._2_2_ = auVar34._0_2_;
      auVar37._0_2_ = auVar32._0_2_;
      auVar822._0_8_ = auVar1935._0_8_;
      auVar822._8_4_ = auVar36._0_4_;
      auVar822._12_4_ = auVar37._0_4_;
      auVar1217._0_14_ = local_13b8._0_14_;
      auVar1217[0xe] = local_13b8[7];
      auVar1217[0xf] = uStack_13a1;
      auVar1216._14_2_ = auVar1217._14_2_;
      auVar1216._0_13_ = local_13b8._0_13_;
      auVar1216[0xd] = uStack_13a2;
      auVar1215._13_3_ = auVar1216._13_3_;
      auVar1215._0_12_ = local_13b8._0_12_;
      auVar1215[0xc] = local_13b8[6];
      auVar1214._12_4_ = auVar1215._12_4_;
      auVar1214._0_11_ = local_13b8._0_11_;
      auVar1214[0xb] = uStack_13a3;
      auVar1213._11_5_ = auVar1214._11_5_;
      auVar1213._0_10_ = local_13b8._0_10_;
      auVar1213[10] = local_13b8[5];
      auVar1212._10_6_ = auVar1213._10_6_;
      auVar1212._0_9_ = local_13b8._0_9_;
      auVar1212[9] = uStack_13a4;
      auVar1211._9_7_ = auVar1212._9_7_;
      auVar1211._0_8_ = local_13b8._0_8_;
      auVar1211[8] = local_13b8[4];
      Var17 = CONCAT91(CONCAT81(auVar1211._8_8_,uStack_13a5),local_13b8[3]);
      auVar39._2_10_ = Var17;
      auVar39[1] = uStack_13a6;
      auVar39[0] = local_13b8[2];
      auVar38._2_12_ = auVar39;
      auVar38[1] = uStack_13a7;
      auVar38[0] = local_13b8[1];
      auVar1210._0_2_ = CONCAT11(local_13a8,local_13b8[0]);
      auVar1210._2_14_ = auVar38;
      auVar1537._0_14_ = local_1398._0_14_;
      auVar1537[0xe] = local_1398[7];
      auVar1537[0xf] = uStack_1381;
      auVar1536._14_2_ = auVar1537._14_2_;
      auVar1536._0_13_ = local_1398._0_13_;
      auVar1536[0xd] = uStack_1382;
      auVar1535._13_3_ = auVar1536._13_3_;
      auVar1535._0_12_ = local_1398._0_12_;
      auVar1535[0xc] = local_1398[6];
      auVar1534._12_4_ = auVar1535._12_4_;
      auVar1534._0_11_ = local_1398._0_11_;
      auVar1534[0xb] = uStack_1383;
      auVar1533._11_5_ = auVar1534._11_5_;
      auVar1533._0_10_ = local_1398._0_10_;
      auVar1533[10] = local_1398[5];
      auVar1532._10_6_ = auVar1533._10_6_;
      auVar1532._0_9_ = local_1398._0_9_;
      auVar1532[9] = uStack_1384;
      auVar1531._9_7_ = auVar1532._9_7_;
      auVar1531._0_8_ = local_1398._0_8_;
      auVar1531[8] = local_1398[4];
      Var19 = CONCAT91(CONCAT81(auVar1531._8_8_,uStack_1385),local_1398[3]);
      auVar41._2_10_ = Var19;
      auVar41[1] = uStack_1386;
      auVar41[0] = local_1398[2];
      auVar40._2_12_ = auVar41;
      auVar40[1] = uStack_1387;
      auVar40[0] = local_1398[1];
      auVar1670._0_14_ = local_1378._0_14_;
      auVar1670[0xe] = local_1378[7];
      auVar1670[0xf] = uStack_1361;
      auVar1669._14_2_ = auVar1670._14_2_;
      auVar1669._0_13_ = local_1378._0_13_;
      auVar1669[0xd] = uStack_1362;
      auVar1668._13_3_ = auVar1669._13_3_;
      auVar1668._0_12_ = local_1378._0_12_;
      auVar1668[0xc] = local_1378[6];
      auVar1667._12_4_ = auVar1668._12_4_;
      auVar1667._0_11_ = local_1378._0_11_;
      auVar1667[0xb] = uStack_1363;
      auVar1666._11_5_ = auVar1667._11_5_;
      auVar1666._0_10_ = local_1378._0_10_;
      auVar1666[10] = local_1378[5];
      auVar1665._10_6_ = auVar1666._10_6_;
      auVar1665._0_9_ = local_1378._0_9_;
      auVar1665[9] = uStack_1364;
      auVar1664._9_7_ = auVar1665._9_7_;
      auVar1664._0_8_ = local_1378._0_8_;
      auVar1664[8] = local_1378[4];
      Var21 = CONCAT91(CONCAT81(auVar1664._8_8_,uStack_1365),local_1378[3]);
      auVar43._2_10_ = Var21;
      auVar43[1] = uStack_1366;
      auVar43[0] = local_1378[2];
      auVar42._2_12_ = auVar43;
      auVar42[1] = uStack_1367;
      auVar42[0] = local_1378[1];
      auVar1663._0_2_ = CONCAT11(local_1368,local_1378[0]);
      auVar1663._2_14_ = auVar42;
      auVar1841._0_14_ = local_1358._0_14_;
      auVar1841[0xe] = local_1358[7];
      auVar1841[0xf] = uStack_1341;
      auVar1840._14_2_ = auVar1841._14_2_;
      auVar1840._0_13_ = local_1358._0_13_;
      auVar1840[0xd] = uStack_1342;
      auVar1839._13_3_ = auVar1840._13_3_;
      auVar1839._0_12_ = local_1358._0_12_;
      auVar1839[0xc] = local_1358[6];
      auVar1838._12_4_ = auVar1839._12_4_;
      auVar1838._0_11_ = local_1358._0_11_;
      auVar1838[0xb] = uStack_1343;
      auVar1837._11_5_ = auVar1838._11_5_;
      auVar1837._0_10_ = local_1358._0_10_;
      auVar1837[10] = local_1358[5];
      auVar1836._10_6_ = auVar1837._10_6_;
      auVar1836._0_9_ = local_1358._0_9_;
      auVar1836[9] = uStack_1344;
      auVar1835._9_7_ = auVar1836._9_7_;
      auVar1835._0_8_ = local_1358._0_8_;
      auVar1835[8] = local_1358[4];
      Var23 = CONCAT91(CONCAT81(auVar1835._8_8_,uStack_1345),local_1358[3]);
      auVar45._2_10_ = Var23;
      auVar45[1] = uStack_1346;
      auVar45[0] = local_1358[2];
      auVar44._2_12_ = auVar45;
      auVar44[1] = uStack_1347;
      auVar44[0] = local_1358[1];
      auVar569._0_12_ = auVar1210._0_12_;
      auVar569._12_2_ = (short)Var17;
      auVar569._14_2_ = (short)Var19;
      auVar568._12_4_ = auVar569._12_4_;
      auVar568._0_10_ = auVar1210._0_10_;
      auVar568._10_2_ = auVar41._0_2_;
      auVar567._10_6_ = auVar568._10_6_;
      auVar567._0_8_ = auVar1210._0_8_;
      auVar567._8_2_ = auVar39._0_2_;
      auVar46._4_8_ = auVar567._8_8_;
      auVar46._2_2_ = auVar40._0_2_;
      auVar46._0_2_ = auVar38._0_2_;
      auVar566._0_4_ = CONCAT22(CONCAT11(local_1388,local_1398[0]),auVar1210._0_2_);
      auVar566._4_12_ = auVar46;
      auVar1362._0_12_ = auVar1663._0_12_;
      auVar1362._12_2_ = (short)Var21;
      auVar1362._14_2_ = (short)Var23;
      auVar1361._12_4_ = auVar1362._12_4_;
      auVar1361._0_10_ = auVar1663._0_10_;
      auVar1361._10_2_ = auVar45._0_2_;
      auVar1360._10_6_ = auVar1361._10_6_;
      auVar1360._0_8_ = auVar1663._0_8_;
      auVar1360._8_2_ = auVar43._0_2_;
      auVar47._4_8_ = auVar1360._8_8_;
      auVar47._2_2_ = auVar44._0_2_;
      auVar47._0_2_ = auVar42._0_2_;
      auVar341._0_8_ = auVar566._0_8_;
      auVar341._8_4_ = auVar46._0_4_;
      auVar341._12_4_ = auVar47._0_4_;
      local_1238[0] =
           CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2053._0_2_),auVar1935._0_4_);
      local_1238[1] =
           CONCAT44(CONCAT22(CONCAT11(local_1348,local_1358[0]),auVar1663._0_2_),auVar566._0_4_);
      local_1238[2] = auVar822._8_8_;
      local_1238[3] = auVar341._8_8_;
      local_1218 = auVar1936._8_4_;
      uStack_1214 = auVar563._8_4_;
      uStack_1210 = auVar567._8_4_;
      uStack_120c = auVar1360._8_4_;
      uStack_1200 = auVar1937._12_4_;
      uStack_11fc = auVar564._12_4_;
      auVar490._12_4_ = CONCAT22(auVar2194._8_2_,auVar992._8_2_);
      auVar941._0_8_ = CONCAT26(auVar2196._10_2_,CONCAT24(auVar994._10_2_,auVar490._12_4_));
      auVar941._8_2_ = auVar996._12_2_;
      auVar941._10_2_ = auVar2198._12_2_;
      auVar999._12_2_ = auVar997._14_2_;
      auVar999._0_12_ = auVar941;
      auVar999._14_2_ = auVar2199._14_2_;
      uVar936 = CONCAT22(auVar2132._8_2_,auVar2054._8_2_);
      auVar2039._0_8_ = CONCAT26(auVar2134._10_2_,CONCAT24(auVar2056._10_2_,uVar936));
      auVar2039._8_2_ = auVar2058._12_2_;
      auVar2039._10_2_ = auVar2136._12_2_;
      auVar2061._12_2_ = auVar2059._14_2_;
      auVar2061._0_12_ = auVar2039;
      auVar2061._14_2_ = auVar2137._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1531._8_2_,auVar1211._8_2_);
      auVar1172._0_8_ = CONCAT26(auVar1533._10_2_,CONCAT24(auVar1213._10_2_,auVar926._12_4_));
      auVar1172._8_2_ = auVar1215._12_2_;
      auVar1172._10_2_ = auVar1535._12_2_;
      uVar781 = CONCAT22(auVar1835._8_2_,auVar1664._8_2_);
      auVar1629._0_8_ = CONCAT26(auVar1837._10_2_,CONCAT24(auVar1666._10_2_,uVar781));
      auVar1629._8_2_ = auVar1668._12_2_;
      auVar1629._10_2_ = auVar1839._12_2_;
      auVar342._8_4_ = (int)((ulong)auVar941._0_8_ >> 0x20);
      auVar342._0_8_ = auVar941._0_8_;
      auVar342._12_4_ = (int)((ulong)auVar2039._0_8_ >> 0x20);
      auVar570._8_4_ = (int)((ulong)auVar1172._0_8_ >> 0x20);
      auVar570._0_8_ = auVar1172._0_8_;
      auVar570._12_4_ = (int)((ulong)auVar1629._0_8_ >> 0x20);
      local_11f8 = CONCAT44(uVar936,auVar490._12_4_);
      uStack_11f0 = CONCAT44(uVar781,auVar926._12_4_);
      local_11e8 = auVar342._8_8_;
      uStack_11e0 = auVar570._8_8_;
      local_11d8 = auVar941._8_4_;
      uStack_11d4 = auVar2039._8_4_;
      uStack_11d0 = auVar1172._8_4_;
      uStack_11cc = auVar1629._8_4_;
      uStack_11c0 = auVar999._12_4_;
      uStack_11bc = auVar2061._12_4_;
      uVar314 = CONCAT11(uStack_1420,(char)uStack_1430);
      uVar1431 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar314));
      uVar1432 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar1431));
      uVar1433 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar1432));
      auVar1436._0_10_ = CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar1433))
      ;
      auVar1436[10] = (char)((ulong)uStack_1430 >> 0x28);
      auVar1436[0xb] = uStack_141b;
      auVar1455[0xc] = (char)((ulong)uStack_1430 >> 0x30);
      auVar1455._0_12_ = auVar1436;
      auVar1455[0xd] = uStack_141a;
      auVar1466[0xe] = (char)((ulong)uStack_1430 >> 0x38);
      auVar1466._0_14_ = auVar1455;
      auVar1466[0xf] = uStack_1419;
      uStack_1640 = local_1418[8];
      uStack_163f = local_1418[9];
      uStack_163e = local_1418[10];
      uStack_163d = local_1418[0xb];
      uStack_163c = local_1418[0xc];
      uStack_163b = local_1418[0xd];
      uStack_163a = local_1418[0xe];
      uStack_1639 = local_1418[0xf];
      auVar490._12_4_ =
           CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
      uVar315 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar490._12_4_));
      uVar316 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar315));
      auVar508._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar316));
      auVar508[10] = uStack_163b;
      auVar508[0xb] = uStack_13fb;
      auVar535[0xc] = uStack_163a;
      auVar535._0_12_ = auVar508;
      auVar535[0xd] = uStack_13fa;
      auVar571[0xe] = uStack_1639;
      auVar571._0_14_ = auVar535;
      auVar571[0xf] = uStack_13f9;
      uStack_1670 = local_13f8[8];
      uStack_166f = local_13f8[9];
      uStack_166e = local_13f8[10];
      uStack_166d = local_13f8[0xb];
      uStack_166c = local_13f8[0xc];
      uStack_166b = local_13f8[0xd];
      uStack_166a = local_13f8[0xe];
      uStack_1669 = local_13f8[0xf];
      auVar926._12_4_ =
           CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
      uVar504 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar926._12_4_));
      uVar505 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar504));
      auVar785._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar505));
      auVar785[10] = uStack_166b;
      auVar785[0xb] = uStack_13db;
      auVar804[0xc] = uStack_166a;
      auVar804._0_12_ = auVar785;
      auVar804[0xd] = uStack_13da;
      auVar823[0xe] = uStack_1669;
      auVar823._0_14_ = auVar804;
      auVar823[0xf] = uStack_13d9;
      uStack_1690 = local_13d8[8];
      uStack_168f = local_13d8[9];
      uStack_168e = local_13d8[10];
      uStack_168d = local_13d8[0xb];
      uStack_168c = local_13d8[0xc];
      uStack_168b = local_13d8[0xd];
      uStack_168a = local_13d8[0xe];
      uStack_1689 = local_13d8[0xf];
      uVar781 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
      uVar782 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar781));
      uVar783 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar782));
      auVar942._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar783));
      auVar942[10] = uStack_168b;
      auVar942[0xb] = uStack_13bb;
      auVar965[0xc] = uStack_168a;
      auVar965._0_12_ = auVar942;
      auVar965[0xd] = uStack_13ba;
      auVar1000[0xe] = uStack_1689;
      auVar1000._0_14_ = auVar965;
      auVar1000[0xf] = uStack_13b9;
      uVar503 = CONCAT11(uStack_13a0,local_13b8[8]);
      uVar1759 = CONCAT13(uStack_139f,CONCAT12(local_13b8[9],uVar503));
      uVar1760 = CONCAT15(uStack_139e,CONCAT14(local_13b8[10],uVar1759));
      uVar1761 = CONCAT17(uStack_139d,CONCAT16(local_13b8[0xb],uVar1760));
      auVar1764._0_10_ = CONCAT19(uStack_139c,CONCAT18(local_13b8[0xc],uVar1761));
      auVar1764[10] = local_13b8[0xd];
      auVar1764[0xb] = uStack_139b;
      auVar1781[0xc] = local_13b8[0xe];
      auVar1781._0_12_ = auVar1764;
      auVar1781[0xd] = uStack_139a;
      uStack_16c0 = local_1398[8];
      uStack_16bf = local_1398[9];
      uStack_16be = local_1398[10];
      uStack_16bd = local_1398[0xb];
      uStack_16bc = local_1398[0xc];
      uStack_16bb = local_1398[0xd];
      uStack_16ba = local_1398[0xe];
      uVar936 = CONCAT13(uStack_137f,CONCAT12(uStack_16bf,CONCAT11(uStack_1380,uStack_16c0)));
      uVar937 = CONCAT15(uStack_137e,CONCAT14(uStack_16be,uVar936));
      uVar938 = CONCAT17(uStack_137d,CONCAT16(uStack_16bd,uVar937));
      auVar1173._0_10_ = CONCAT19(uStack_137c,CONCAT18(uStack_16bc,uVar938));
      auVar1173[10] = uStack_16bb;
      auVar1173[0xb] = uStack_137b;
      auVar1190[0xc] = uStack_16ba;
      auVar1190._0_12_ = auVar1173;
      auVar1190[0xd] = uStack_137a;
      uVar780 = CONCAT11(uStack_1360,local_1378[8]);
      uVar1990 = CONCAT13(uStack_135f,CONCAT12(local_1378[9],uVar780));
      uVar1991 = CONCAT15(uStack_135e,CONCAT14(local_1378[10],uVar1990));
      uVar1992 = CONCAT17(uStack_135d,CONCAT16(local_1378[0xb],uVar1991));
      auVar1995._0_10_ = CONCAT19(uStack_135c,CONCAT18(local_1378[0xc],uVar1992));
      auVar1995[10] = local_1378[0xd];
      auVar1995[0xb] = uStack_135b;
      auVar2012[0xc] = local_1378[0xe];
      auVar2012._0_12_ = auVar1995;
      auVar2012[0xd] = uStack_135a;
      uStack_16f0 = local_1358[8];
      uStack_16ef = local_1358[9];
      uStack_16ee = local_1358[10];
      uStack_16ed = local_1358[0xb];
      uStack_16ec = local_1358[0xc];
      uStack_16eb = local_1358[0xd];
      uStack_16ea = local_1358[0xe];
      uVar1911 = CONCAT13(uStack_133f,CONCAT12(uStack_16ef,CONCAT11(uStack_1340,uStack_16f0)));
      uVar1912 = CONCAT15(uStack_133e,CONCAT14(uStack_16ee,uVar1911));
      uVar1913 = CONCAT17(uStack_133d,CONCAT16(uStack_16ed,uVar1912));
      auVar1915._0_10_ = CONCAT19(uStack_133c,CONCAT18(uStack_16ec,uVar1913));
      auVar1915[10] = uStack_16eb;
      auVar1915[0xb] = uStack_133b;
      auVar1924[0xc] = uStack_16ea;
      auVar1924._0_12_ = auVar1915;
      auVar1924[0xd] = uStack_133a;
      auVar348._12_2_ = (short)((ulong)uVar1433 >> 0x30);
      auVar348._0_12_ = auVar1436;
      auVar348._14_2_ = (short)((ulong)uVar316 >> 0x30);
      auVar347._12_4_ = auVar348._12_4_;
      auVar347._10_2_ = (short)((uint6)uVar315 >> 0x20);
      auVar347._0_10_ = auVar1436._0_10_;
      auVar346._10_6_ = auVar347._10_6_;
      auVar346._8_2_ = (short)((uint6)uVar1432 >> 0x20);
      auVar346._0_8_ = uVar1433;
      auVar345._8_8_ = auVar346._8_8_;
      auVar345._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
      auVar345._0_6_ = uVar1432;
      auVar344._6_10_ = auVar345._6_10_;
      auVar344._4_2_ = (short)((uint)uVar1431 >> 0x10);
      auVar344._0_4_ = uVar1431;
      auVar343._4_12_ = auVar344._4_12_;
      auVar343._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar314);
      auVar576._12_2_ = (short)((ulong)uVar505 >> 0x30);
      auVar576._0_12_ = auVar785;
      auVar576._14_2_ = (short)((ulong)uVar783 >> 0x30);
      auVar575._12_4_ = auVar576._12_4_;
      auVar575._10_2_ = (short)((uint6)uVar782 >> 0x20);
      auVar575._0_10_ = auVar785._0_10_;
      auVar574._10_6_ = auVar575._10_6_;
      auVar574._8_2_ = (short)((uint6)uVar504 >> 0x20);
      auVar574._0_8_ = uVar505;
      auVar573._8_8_ = auVar574._8_8_;
      auVar573._6_2_ = (short)((uint)uVar781 >> 0x10);
      auVar573._0_6_ = uVar504;
      auVar572._6_10_ = auVar573._6_10_;
      auVar572._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
      auVar572._0_4_ = auVar926._12_4_;
      auVar829._12_2_ = (short)((ulong)uVar1761 >> 0x30);
      auVar829._0_12_ = auVar1764;
      auVar829._14_2_ = (short)((ulong)uVar938 >> 0x30);
      auVar828._12_4_ = auVar829._12_4_;
      auVar828._10_2_ = (short)((uint6)uVar937 >> 0x20);
      auVar828._0_10_ = auVar1764._0_10_;
      auVar827._10_6_ = auVar828._10_6_;
      auVar827._8_2_ = (short)((uint6)uVar1760 >> 0x20);
      auVar827._0_8_ = uVar1761;
      auVar826._8_8_ = auVar827._8_8_;
      auVar826._6_2_ = (short)((uint)uVar936 >> 0x10);
      auVar826._0_6_ = uVar1760;
      auVar825._6_10_ = auVar826._6_10_;
      auVar825._4_2_ = (short)((uint)uVar1759 >> 0x10);
      auVar825._0_4_ = uVar1759;
      auVar824._4_12_ = auVar825._4_12_;
      auVar824._0_4_ = CONCAT22(CONCAT11(uStack_1380,uStack_16c0),uVar503);
      auVar1005._12_2_ = (short)((ulong)uVar1992 >> 0x30);
      auVar1005._0_12_ = auVar1995;
      auVar1005._14_2_ = (short)((ulong)uVar1913 >> 0x30);
      auVar1004._12_4_ = auVar1005._12_4_;
      auVar1004._10_2_ = (short)((uint6)uVar1912 >> 0x20);
      auVar1004._0_10_ = auVar1995._0_10_;
      auVar1003._10_6_ = auVar1004._10_6_;
      auVar1003._8_2_ = (short)((uint6)uVar1991 >> 0x20);
      auVar1003._0_8_ = uVar1992;
      auVar1002._8_8_ = auVar1003._8_8_;
      auVar1002._6_2_ = (short)((uint)uVar1911 >> 0x10);
      auVar1002._0_6_ = uVar1991;
      auVar1001._6_10_ = auVar1002._6_10_;
      auVar1001._4_2_ = (short)((uint)uVar1990 >> 0x10);
      auVar1001._0_4_ = uVar1990;
      auVar1218._0_8_ = auVar343._0_8_;
      auVar1218._8_4_ = auVar344._4_4_;
      auVar1218._12_4_ = auVar572._4_4_;
      auVar577._0_8_ = auVar824._0_8_;
      auVar577._8_4_ = auVar825._4_4_;
      auVar577._12_4_ = auVar1001._4_4_;
      local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                     CONCAT11(uStack_13e0,uStack_1670)),auVar343._0_4_);
      uStack_11b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1340,uStack_16f0),uVar780),auVar824._0_4_);
      local_11a8 = auVar1218._8_8_;
      uStack_11a0 = auVar577._8_8_;
      local_1198 = auVar346._8_4_;
      uStack_1194 = auVar574._8_4_;
      uStack_1190 = auVar827._8_4_;
      uStack_118c = auVar1003._8_4_;
      uStack_1180 = auVar347._12_4_;
      uStack_117c = auVar575._12_4_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)auVar508._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1436._0_10_ >> 0x40));
      auVar1437._0_8_ = CONCAT26(auVar508._10_2_,CONCAT24(auVar1436._10_2_,auVar926._12_4_));
      auVar1437._8_2_ = auVar1455._12_2_;
      auVar1437._10_2_ = auVar535._12_2_;
      auVar1467._12_2_ = auVar1466._14_2_;
      auVar1467._0_12_ = auVar1437;
      auVar1467._14_2_ = auVar571._14_2_;
      auVar490._12_4_ =
           CONCAT22((short)((unkuint10)auVar942._0_10_ >> 0x40),
                    (short)((unkuint10)auVar785._0_10_ >> 0x40));
      auVar509._0_8_ = CONCAT26(auVar942._10_2_,CONCAT24(auVar785._10_2_,auVar490._12_4_));
      auVar509._8_2_ = auVar804._12_2_;
      auVar509._10_2_ = auVar965._12_2_;
      auVar578._12_2_ = auVar823._14_2_;
      auVar578._0_12_ = auVar509;
      auVar578._14_2_ = auVar1000._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)auVar1173._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1764._0_10_ >> 0x40));
      auVar1765._0_8_ = CONCAT26(auVar1173._10_2_,CONCAT24(auVar1764._10_2_,uVar781));
      auVar1765._8_2_ = auVar1781._12_2_;
      auVar1765._10_2_ = auVar1190._12_2_;
      uVar936 = CONCAT22((short)((unkuint10)auVar1915._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1995._0_10_ >> 0x40));
      auVar1996._0_8_ = CONCAT26(auVar1915._10_2_,CONCAT24(auVar1995._10_2_,uVar936));
      auVar1996._8_2_ = auVar2012._12_2_;
      auVar1996._10_2_ = auVar1924._12_2_;
      auVar349._8_4_ = (int)((ulong)auVar1437._0_8_ >> 0x20);
      auVar349._0_8_ = auVar1437._0_8_;
      auVar349._12_4_ = (int)((ulong)auVar509._0_8_ >> 0x20);
      auVar579._8_4_ = (int)((ulong)auVar1765._0_8_ >> 0x20);
      auVar579._0_8_ = auVar1765._0_8_;
      auVar579._12_4_ = (int)((ulong)auVar1996._0_8_ >> 0x20);
      local_1178 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
      uStack_1170 = CONCAT44(uVar936,uVar781);
      local_1168 = auVar349._8_8_;
      uStack_1160 = auVar579._8_8_;
      local_1158 = auVar1437._8_4_;
      uStack_1154 = auVar509._8_4_;
      uStack_1150 = auVar1765._8_4_;
      uStack_114c = auVar1996._8_4_;
      uStack_1140 = auVar1467._12_4_;
      uStack_113c = auVar578._12_4_;
      auVar1013._0_14_ = local_f38;
      auVar1013[0xe] = local_f38[7];
      auVar1013[0xf] = uStack_f21;
      auVar1012._14_2_ = auVar1013._14_2_;
      auVar1012._0_13_ = local_f38._0_13_;
      auVar1012[0xd] = uStack_f22;
      auVar1011._13_3_ = auVar1012._13_3_;
      auVar1011._0_12_ = local_f38._0_12_;
      auVar1011[0xc] = local_f38[6];
      auVar1010._12_4_ = auVar1011._12_4_;
      auVar1010._0_11_ = local_f38._0_11_;
      auVar1010[0xb] = uStack_f23;
      auVar1009._11_5_ = auVar1010._11_5_;
      auVar1009._0_10_ = local_f38._0_10_;
      auVar1009[10] = local_f38[5];
      auVar1008._10_6_ = auVar1009._10_6_;
      auVar1008._0_9_ = local_f38._0_9_;
      auVar1008[9] = uStack_f24;
      auVar1007._9_7_ = auVar1008._9_7_;
      auVar1007._0_8_ = local_f38._0_8_;
      auVar1007[8] = local_f38[4];
      Var17 = CONCAT91(CONCAT81(auVar1007._8_8_,uStack_f25),local_f38[3]);
      auVar49._2_10_ = Var17;
      auVar49[1] = uStack_f26;
      auVar49[0] = local_f38[2];
      auVar48._2_12_ = auVar49;
      auVar48[1] = uStack_f27;
      auVar48[0] = local_f38[1];
      auVar1006._0_2_ = CONCAT11(local_f28,local_f38[0]);
      auVar1006._2_14_ = auVar48;
      auVar2207._0_14_ = local_f18;
      auVar2207[0xe] = local_f18[7];
      auVar2207[0xf] = uStack_f01;
      auVar2206._14_2_ = auVar2207._14_2_;
      auVar2206._0_13_ = local_f18._0_13_;
      auVar2206[0xd] = uStack_f02;
      auVar2205._13_3_ = auVar2206._13_3_;
      auVar2205._0_12_ = local_f18._0_12_;
      auVar2205[0xc] = local_f18[6];
      auVar2204._12_4_ = auVar2205._12_4_;
      auVar2204._0_11_ = local_f18._0_11_;
      auVar2204[0xb] = uStack_f03;
      auVar2203._11_5_ = auVar2204._11_5_;
      auVar2203._0_10_ = local_f18._0_10_;
      auVar2203[10] = local_f18[5];
      auVar2202._10_6_ = auVar2203._10_6_;
      auVar2202._0_9_ = local_f18._0_9_;
      auVar2202[9] = uStack_f04;
      auVar2201._9_7_ = auVar2202._9_7_;
      auVar2201._0_8_ = local_f18._0_8_;
      auVar2201[8] = local_f18[4];
      Var19 = CONCAT91(CONCAT81(auVar2201._8_8_,uStack_f05),local_f18[3]);
      auVar51._2_10_ = Var19;
      auVar51[1] = uStack_f06;
      auVar51[0] = local_f18[2];
      auVar50._2_12_ = auVar51;
      auVar50[1] = uStack_f07;
      auVar50[0] = local_f18[1];
      auVar2069._0_14_ = local_ef8;
      auVar2069[0xe] = local_ef8[7];
      auVar2069[0xf] = uStack_ee1;
      auVar2068._14_2_ = auVar2069._14_2_;
      auVar2068._0_13_ = local_ef8._0_13_;
      auVar2068[0xd] = uStack_ee2;
      auVar2067._13_3_ = auVar2068._13_3_;
      auVar2067._0_12_ = local_ef8._0_12_;
      auVar2067[0xc] = local_ef8[6];
      auVar2066._12_4_ = auVar2067._12_4_;
      auVar2066._0_11_ = local_ef8._0_11_;
      auVar2066[0xb] = uStack_ee3;
      auVar2065._11_5_ = auVar2066._11_5_;
      auVar2065._0_10_ = local_ef8._0_10_;
      auVar2065[10] = local_ef8[5];
      auVar2064._10_6_ = auVar2065._10_6_;
      auVar2064._0_9_ = local_ef8._0_9_;
      auVar2064[9] = uStack_ee4;
      auVar2063._9_7_ = auVar2064._9_7_;
      auVar2063._0_8_ = local_ef8._0_8_;
      auVar2063[8] = local_ef8[4];
      Var21 = CONCAT91(CONCAT81(auVar2063._8_8_,uStack_ee5),local_ef8[3]);
      auVar53._2_10_ = Var21;
      auVar53[1] = uStack_ee6;
      auVar53[0] = local_ef8[2];
      auVar52._2_12_ = auVar53;
      auVar52[1] = uStack_ee7;
      auVar52[0] = local_ef8[1];
      auVar2062._0_2_ = CONCAT11(local_ee8,local_ef8[0]);
      auVar2062._2_14_ = auVar52;
      auVar2145._0_14_ = local_ed8;
      auVar2145[0xe] = local_ed8[7];
      auVar2145[0xf] = uStack_ec1;
      auVar2144._14_2_ = auVar2145._14_2_;
      auVar2144._0_13_ = local_ed8._0_13_;
      auVar2144[0xd] = uStack_ec2;
      auVar2143._13_3_ = auVar2144._13_3_;
      auVar2143._0_12_ = local_ed8._0_12_;
      auVar2143[0xc] = local_ed8[6];
      auVar2142._12_4_ = auVar2143._12_4_;
      auVar2142._0_11_ = local_ed8._0_11_;
      auVar2142[0xb] = uStack_ec3;
      auVar2141._11_5_ = auVar2142._11_5_;
      auVar2141._0_10_ = local_ed8._0_10_;
      auVar2141[10] = local_ed8[5];
      auVar2140._10_6_ = auVar2141._10_6_;
      auVar2140._0_9_ = local_ed8._0_9_;
      auVar2140[9] = uStack_ec4;
      auVar2139._9_7_ = auVar2140._9_7_;
      auVar2139._0_8_ = local_ed8._0_8_;
      auVar2139[8] = local_ed8[4];
      Var23 = CONCAT91(CONCAT81(auVar2139._8_8_,uStack_ec5),local_ed8[3]);
      auVar55._2_10_ = Var23;
      auVar55[1] = uStack_ec6;
      auVar55[0] = local_ed8[2];
      auVar54._2_12_ = auVar55;
      auVar54[1] = uStack_ec7;
      auVar54[0] = local_ed8[1];
      auVar1942._0_12_ = auVar1006._0_12_;
      auVar1942._12_2_ = (short)Var17;
      auVar1942._14_2_ = (short)Var19;
      auVar1941._12_4_ = auVar1942._12_4_;
      auVar1941._0_10_ = auVar1006._0_10_;
      auVar1941._10_2_ = auVar51._0_2_;
      auVar1940._10_6_ = auVar1941._10_6_;
      auVar1940._0_8_ = auVar1006._0_8_;
      auVar1940._8_2_ = auVar49._0_2_;
      auVar56._4_8_ = auVar1940._8_8_;
      auVar56._2_2_ = auVar50._0_2_;
      auVar56._0_2_ = auVar48._0_2_;
      auVar1939._0_4_ = CONCAT22(CONCAT11(local_f08,local_f18[0]),auVar1006._0_2_);
      auVar1939._4_12_ = auVar56;
      auVar582._0_12_ = auVar2062._0_12_;
      auVar582._12_2_ = (short)Var21;
      auVar582._14_2_ = (short)Var23;
      auVar581._12_4_ = auVar582._12_4_;
      auVar581._0_10_ = auVar2062._0_10_;
      auVar581._10_2_ = auVar55._0_2_;
      auVar580._10_6_ = auVar581._10_6_;
      auVar580._0_8_ = auVar2062._0_8_;
      auVar580._8_2_ = auVar53._0_2_;
      auVar57._4_8_ = auVar580._8_8_;
      auVar57._2_2_ = auVar54._0_2_;
      auVar57._0_2_ = auVar52._0_2_;
      auVar830._0_8_ = auVar1939._0_8_;
      auVar830._8_4_ = auVar56._0_4_;
      auVar830._12_4_ = auVar57._0_4_;
      auVar1226._0_14_ = local_eb8;
      auVar1226[0xe] = local_eb8[7];
      auVar1226[0xf] = uStack_ea1;
      auVar1225._14_2_ = auVar1226._14_2_;
      auVar1225._0_13_ = local_eb8._0_13_;
      auVar1225[0xd] = uStack_ea2;
      auVar1224._13_3_ = auVar1225._13_3_;
      auVar1224._0_12_ = local_eb8._0_12_;
      auVar1224[0xc] = local_eb8[6];
      auVar1223._12_4_ = auVar1224._12_4_;
      auVar1223._0_11_ = local_eb8._0_11_;
      auVar1223[0xb] = uStack_ea3;
      auVar1222._11_5_ = auVar1223._11_5_;
      auVar1222._0_10_ = local_eb8._0_10_;
      auVar1222[10] = local_eb8[5];
      auVar1221._10_6_ = auVar1222._10_6_;
      auVar1221._0_9_ = local_eb8._0_9_;
      auVar1221[9] = uStack_ea4;
      auVar1220._9_7_ = auVar1221._9_7_;
      auVar1220._0_8_ = local_eb8._0_8_;
      auVar1220[8] = local_eb8[4];
      Var17 = CONCAT91(CONCAT81(auVar1220._8_8_,uStack_ea5),local_eb8[3]);
      auVar59._2_10_ = Var17;
      auVar59[1] = uStack_ea6;
      auVar59[0] = local_eb8[2];
      auVar58._2_12_ = auVar59;
      auVar58[1] = uStack_ea7;
      auVar58[0] = local_eb8[1];
      auVar1219._0_2_ = CONCAT11(local_ea8,local_eb8[0]);
      auVar1219._2_14_ = auVar58;
      auVar1544._0_14_ = local_e98;
      auVar1544[0xe] = local_e98[7];
      auVar1544[0xf] = uStack_e81;
      auVar1543._14_2_ = auVar1544._14_2_;
      auVar1543._0_13_ = local_e98._0_13_;
      auVar1543[0xd] = uStack_e82;
      auVar1542._13_3_ = auVar1543._13_3_;
      auVar1542._0_12_ = local_e98._0_12_;
      auVar1542[0xc] = local_e98[6];
      auVar1541._12_4_ = auVar1542._12_4_;
      auVar1541._0_11_ = local_e98._0_11_;
      auVar1541[0xb] = uStack_e83;
      auVar1540._11_5_ = auVar1541._11_5_;
      auVar1540._0_10_ = local_e98._0_10_;
      auVar1540[10] = local_e98[5];
      auVar1539._10_6_ = auVar1540._10_6_;
      auVar1539._0_9_ = local_e98._0_9_;
      auVar1539[9] = uStack_e84;
      auVar1538._9_7_ = auVar1539._9_7_;
      auVar1538._0_8_ = local_e98._0_8_;
      auVar1538[8] = local_e98[4];
      Var19 = CONCAT91(CONCAT81(auVar1538._8_8_,uStack_e85),local_e98[3]);
      auVar61._2_10_ = Var19;
      auVar61[1] = uStack_e86;
      auVar61[0] = local_e98[2];
      auVar60._2_12_ = auVar61;
      auVar60[1] = uStack_e87;
      auVar60[0] = local_e98[1];
      auVar1678._0_14_ = local_e78;
      auVar1678[0xe] = local_e78[7];
      auVar1678[0xf] = uStack_e61;
      auVar1677._14_2_ = auVar1678._14_2_;
      auVar1677._0_13_ = local_e78._0_13_;
      auVar1677[0xd] = uStack_e62;
      auVar1676._13_3_ = auVar1677._13_3_;
      auVar1676._0_12_ = local_e78._0_12_;
      auVar1676[0xc] = local_e78[6];
      auVar1675._12_4_ = auVar1676._12_4_;
      auVar1675._0_11_ = local_e78._0_11_;
      auVar1675[0xb] = uStack_e63;
      auVar1674._11_5_ = auVar1675._11_5_;
      auVar1674._0_10_ = local_e78._0_10_;
      auVar1674[10] = local_e78[5];
      auVar1673._10_6_ = auVar1674._10_6_;
      auVar1673._0_9_ = local_e78._0_9_;
      auVar1673[9] = uStack_e64;
      auVar1672._9_7_ = auVar1673._9_7_;
      auVar1672._0_8_ = local_e78._0_8_;
      auVar1672[8] = local_e78[4];
      Var21 = CONCAT91(CONCAT81(auVar1672._8_8_,uStack_e65),local_e78[3]);
      auVar63._2_10_ = Var21;
      auVar63[1] = uStack_e66;
      auVar63[0] = local_e78[2];
      auVar62._2_12_ = auVar63;
      auVar62[1] = uStack_e67;
      auVar62[0] = local_e78[1];
      auVar1671._0_2_ = CONCAT11(local_e68,local_e78[0]);
      auVar1671._2_14_ = auVar62;
      auVar1848._0_14_ = local_e58;
      auVar1848[0xe] = local_e58[7];
      auVar1848[0xf] = uStack_e41;
      auVar1847._14_2_ = auVar1848._14_2_;
      auVar1847._0_13_ = local_e58._0_13_;
      auVar1847[0xd] = uStack_e42;
      auVar1846._13_3_ = auVar1847._13_3_;
      auVar1846._0_12_ = local_e58._0_12_;
      auVar1846[0xc] = local_e58[6];
      auVar1845._12_4_ = auVar1846._12_4_;
      auVar1845._0_11_ = local_e58._0_11_;
      auVar1845[0xb] = uStack_e43;
      auVar1844._11_5_ = auVar1845._11_5_;
      auVar1844._0_10_ = local_e58._0_10_;
      auVar1844[10] = local_e58[5];
      auVar1843._10_6_ = auVar1844._10_6_;
      auVar1843._0_9_ = local_e58._0_9_;
      auVar1843[9] = uStack_e44;
      auVar1842._9_7_ = auVar1843._9_7_;
      auVar1842._0_8_ = local_e58._0_8_;
      auVar1842[8] = local_e58[4];
      Var23 = CONCAT91(CONCAT81(auVar1842._8_8_,uStack_e45),local_e58[3]);
      auVar65._2_10_ = Var23;
      auVar65[1] = uStack_e46;
      auVar65[0] = local_e58[2];
      auVar64._2_12_ = auVar65;
      auVar64[1] = uStack_e47;
      auVar64[0] = local_e58[1];
      auVar586._0_12_ = auVar1219._0_12_;
      auVar586._12_2_ = (short)Var17;
      auVar586._14_2_ = (short)Var19;
      auVar585._12_4_ = auVar586._12_4_;
      auVar585._0_10_ = auVar1219._0_10_;
      auVar585._10_2_ = auVar61._0_2_;
      auVar584._10_6_ = auVar585._10_6_;
      auVar584._0_8_ = auVar1219._0_8_;
      auVar584._8_2_ = auVar59._0_2_;
      auVar66._4_8_ = auVar584._8_8_;
      auVar66._2_2_ = auVar60._0_2_;
      auVar66._0_2_ = auVar58._0_2_;
      auVar583._0_4_ = CONCAT22(CONCAT11(local_e88,local_e98[0]),auVar1219._0_2_);
      auVar583._4_12_ = auVar66;
      auVar1365._0_12_ = auVar1671._0_12_;
      auVar1365._12_2_ = (short)Var21;
      auVar1365._14_2_ = (short)Var23;
      auVar1364._12_4_ = auVar1365._12_4_;
      auVar1364._0_10_ = auVar1671._0_10_;
      auVar1364._10_2_ = auVar65._0_2_;
      auVar1363._10_6_ = auVar1364._10_6_;
      auVar1363._0_8_ = auVar1671._0_8_;
      auVar1363._8_2_ = auVar63._0_2_;
      auVar67._4_8_ = auVar1363._8_8_;
      auVar67._2_2_ = auVar64._0_2_;
      auVar67._0_2_ = auVar62._0_2_;
      auVar350._0_8_ = auVar583._0_8_;
      auVar350._8_4_ = auVar66._0_4_;
      auVar350._12_4_ = auVar67._0_4_;
      local_1538 = CONCAT44(CONCAT22(CONCAT11(local_ec8,local_ed8[0]),auVar2062._0_2_),
                            auVar1939._0_4_);
      auStack_1530[0] =
           CONCAT44(CONCAT22(CONCAT11(local_e48,local_e58[0]),auVar1671._0_2_),auVar583._0_4_);
      auStack_1530[1] = auVar830._8_8_;
      auStack_1530[2] = auVar350._8_8_;
      local_1518 = auVar1940._8_4_;
      uStack_1514 = auVar580._8_4_;
      uStack_1510 = auVar584._8_4_;
      uStack_150c = auVar1363._8_4_;
      uStack_1500 = auVar1941._12_4_;
      uStack_14fc = auVar581._12_4_;
      auVar490._12_4_ = CONCAT22(auVar2201._8_2_,auVar1007._8_2_);
      auVar943._0_8_ = CONCAT26(auVar2203._10_2_,CONCAT24(auVar1009._10_2_,auVar490._12_4_));
      auVar943._8_2_ = auVar1011._12_2_;
      auVar943._10_2_ = auVar2205._12_2_;
      auVar1014._12_2_ = auVar1012._14_2_;
      auVar1014._0_12_ = auVar943;
      auVar1014._14_2_ = auVar2206._14_2_;
      uVar936 = CONCAT22(auVar2139._8_2_,auVar2063._8_2_);
      auVar2040._0_8_ = CONCAT26(auVar2141._10_2_,CONCAT24(auVar2065._10_2_,uVar936));
      auVar2040._8_2_ = auVar2067._12_2_;
      auVar2040._10_2_ = auVar2143._12_2_;
      auVar2070._12_2_ = auVar2068._14_2_;
      auVar2070._0_12_ = auVar2040;
      auVar2070._14_2_ = auVar2144._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1538._8_2_,auVar1220._8_2_);
      auVar1174._0_8_ = CONCAT26(auVar1540._10_2_,CONCAT24(auVar1222._10_2_,auVar926._12_4_));
      auVar1174._8_2_ = auVar1224._12_2_;
      auVar1174._10_2_ = auVar1542._12_2_;
      uVar781 = CONCAT22(auVar1842._8_2_,auVar1672._8_2_);
      auVar1630._0_8_ = CONCAT26(auVar1844._10_2_,CONCAT24(auVar1674._10_2_,uVar781));
      auVar1630._8_2_ = auVar1676._12_2_;
      auVar1630._10_2_ = auVar1846._12_2_;
      auVar351._8_4_ = (int)((ulong)auVar943._0_8_ >> 0x20);
      auVar351._0_8_ = auVar943._0_8_;
      auVar351._12_4_ = (int)((ulong)auVar2040._0_8_ >> 0x20);
      auVar587._8_4_ = (int)((ulong)auVar1174._0_8_ >> 0x20);
      auVar587._0_8_ = auVar1174._0_8_;
      auVar587._12_4_ = (int)((ulong)auVar1630._0_8_ >> 0x20);
      local_14f8 = CONCAT44(uVar936,auVar490._12_4_);
      uStack_14f0 = CONCAT44(uVar781,auVar926._12_4_);
      local_14e8 = auVar351._8_8_;
      uStack_14e0 = auVar587._8_8_;
      local_14d8 = auVar943._8_4_;
      uStack_14d4 = auVar2040._8_4_;
      uStack_14d0 = auVar1174._8_4_;
      uStack_14cc = auVar1630._8_4_;
      uStack_14c0 = auVar1014._12_4_;
      uStack_14bc = auVar2070._12_4_;
      uVar314 = CONCAT11(uStack_f20,local_f38[8]);
      uVar1431 = CONCAT13(uStack_f1f,CONCAT12(local_f38[9],uVar314));
      uVar1432 = CONCAT15(uStack_f1e,CONCAT14(local_f38[10],uVar1431));
      uVar1433 = CONCAT17(uStack_f1d,CONCAT16(local_f38[0xb],uVar1432));
      auVar1438._0_10_ = CONCAT19(uStack_f1c,CONCAT18(local_f38[0xc],uVar1433));
      auVar1438[10] = local_f38[0xd];
      auVar1438[0xb] = uStack_f1b;
      auVar1456[0xc] = local_f38[0xe];
      auVar1456._0_12_ = auVar1438;
      auVar1456[0xd] = uStack_f1a;
      auVar1468[0xe] = local_f38[0xf];
      auVar1468._0_14_ = auVar1456;
      auVar1468[0xf] = uStack_f19;
      uStack_1640 = local_f18[8];
      uStack_163f = local_f18[9];
      uStack_163e = local_f18[10];
      uStack_163d = local_f18[0xb];
      uStack_163c = local_f18[0xc];
      uStack_163b = local_f18[0xd];
      uStack_163a = local_f18[0xe];
      uStack_1639 = local_f18[0xf];
      auVar490._12_4_ = CONCAT13(uStack_eff,CONCAT12(uStack_163f,CONCAT11(uStack_f00,uStack_1640)));
      uVar315 = CONCAT15(uStack_efe,CONCAT14(uStack_163e,auVar490._12_4_));
      uVar316 = CONCAT17(uStack_efd,CONCAT16(uStack_163d,uVar315));
      auVar510._0_10_ = CONCAT19(uStack_efc,CONCAT18(uStack_163c,uVar316));
      auVar510[10] = uStack_163b;
      auVar510[0xb] = uStack_efb;
      auVar536[0xc] = uStack_163a;
      auVar536._0_12_ = auVar510;
      auVar536[0xd] = uStack_efa;
      auVar588[0xe] = uStack_1639;
      auVar588._0_14_ = auVar536;
      auVar588[0xf] = uStack_ef9;
      uStack_1670 = local_ef8[8];
      uStack_166f = local_ef8[9];
      uStack_166e = local_ef8[10];
      uStack_166d = local_ef8[0xb];
      uStack_166c = local_ef8[0xc];
      uStack_166b = local_ef8[0xd];
      uStack_166a = local_ef8[0xe];
      uStack_1669 = local_ef8[0xf];
      auVar926._12_4_ = CONCAT13(uStack_edf,CONCAT12(uStack_166f,CONCAT11(uStack_ee0,uStack_1670)));
      uVar504 = CONCAT15(uStack_ede,CONCAT14(uStack_166e,auVar926._12_4_));
      uVar505 = CONCAT17(uStack_edd,CONCAT16(uStack_166d,uVar504));
      auVar786._0_10_ = CONCAT19(uStack_edc,CONCAT18(uStack_166c,uVar505));
      auVar786[10] = uStack_166b;
      auVar786[0xb] = uStack_edb;
      auVar805[0xc] = uStack_166a;
      auVar805._0_12_ = auVar786;
      auVar805[0xd] = uStack_eda;
      auVar831[0xe] = uStack_1669;
      auVar831._0_14_ = auVar805;
      auVar831[0xf] = uStack_ed9;
      uStack_1690 = local_ed8[8];
      uStack_168f = local_ed8[9];
      uStack_168e = local_ed8[10];
      uStack_168d = local_ed8[0xb];
      uStack_168c = local_ed8[0xc];
      uStack_168b = local_ed8[0xd];
      uStack_168a = local_ed8[0xe];
      uStack_1689 = local_ed8[0xf];
      uVar781 = CONCAT13(uStack_ebf,CONCAT12(uStack_168f,CONCAT11(uStack_ec0,uStack_1690)));
      uVar782 = CONCAT15(uStack_ebe,CONCAT14(uStack_168e,uVar781));
      uVar783 = CONCAT17(uStack_ebd,CONCAT16(uStack_168d,uVar782));
      auVar944._0_10_ = CONCAT19(uStack_ebc,CONCAT18(uStack_168c,uVar783));
      auVar944[10] = uStack_168b;
      auVar944[0xb] = uStack_ebb;
      auVar966[0xc] = uStack_168a;
      auVar966._0_12_ = auVar944;
      auVar966[0xd] = uStack_eba;
      auVar1015[0xe] = uStack_1689;
      auVar1015._0_14_ = auVar966;
      auVar1015[0xf] = uStack_eb9;
      uVar503 = CONCAT11(uStack_ea0,local_eb8[8]);
      uVar1759 = CONCAT13(uStack_e9f,CONCAT12(local_eb8[9],uVar503));
      uVar1760 = CONCAT15(uStack_e9e,CONCAT14(local_eb8[10],uVar1759));
      uVar1761 = CONCAT17(uStack_e9d,CONCAT16(local_eb8[0xb],uVar1760));
      auVar1766._0_10_ = CONCAT19(uStack_e9c,CONCAT18(local_eb8[0xc],uVar1761));
      auVar1766[10] = local_eb8[0xd];
      auVar1766[0xb] = uStack_e9b;
      auVar1782[0xc] = local_eb8[0xe];
      auVar1782._0_12_ = auVar1766;
      auVar1782[0xd] = uStack_e9a;
      auVar1789[0xe] = local_eb8[0xf];
      auVar1789._0_14_ = auVar1782;
      auVar1789[0xf] = uStack_e99;
      uStack_16c0 = local_e98[8];
      uStack_16bf = local_e98[9];
      uStack_16be = local_e98[10];
      uStack_16bd = local_e98[0xb];
      uStack_16bc = local_e98[0xc];
      uStack_16bb = local_e98[0xd];
      uStack_16ba = local_e98[0xe];
      uStack_16b9 = local_e98[0xf];
      uVar936 = CONCAT13(uStack_e7f,CONCAT12(uStack_16bf,CONCAT11(uStack_e80,uStack_16c0)));
      uVar937 = CONCAT15(uStack_e7e,CONCAT14(uStack_16be,uVar936));
      uVar938 = CONCAT17(uStack_e7d,CONCAT16(uStack_16bd,uVar937));
      auVar1175._0_10_ = CONCAT19(uStack_e7c,CONCAT18(uStack_16bc,uVar938));
      auVar1175[10] = uStack_16bb;
      auVar1175[0xb] = uStack_e7b;
      auVar1191[0xc] = uStack_16ba;
      auVar1191._0_12_ = auVar1175;
      auVar1191[0xd] = uStack_e7a;
      auVar1227[0xe] = uStack_16b9;
      auVar1227._0_14_ = auVar1191;
      auVar1227[0xf] = uStack_e79;
      uVar780 = CONCAT11(uStack_e60,local_e78[8]);
      uVar1990 = CONCAT13(uStack_e5f,CONCAT12(local_e78[9],uVar780));
      uVar1991 = CONCAT15(uStack_e5e,CONCAT14(local_e78[10],uVar1990));
      uVar1992 = CONCAT17(uStack_e5d,CONCAT16(local_e78[0xb],uVar1991));
      auVar1997._0_10_ = CONCAT19(uStack_e5c,CONCAT18(local_e78[0xc],uVar1992));
      auVar1997[10] = local_e78[0xd];
      auVar1997[0xb] = uStack_e5b;
      auVar2013[0xc] = local_e78[0xe];
      auVar2013._0_12_ = auVar1997;
      auVar2013[0xd] = uStack_e5a;
      auVar2020[0xe] = local_e78[0xf];
      auVar2020._0_14_ = auVar2013;
      auVar2020[0xf] = uStack_e59;
      uStack_16f0 = local_e58[8];
      uStack_16ef = local_e58[9];
      uStack_16ee = local_e58[10];
      uStack_16ed = local_e58[0xb];
      uStack_16ec = local_e58[0xc];
      uStack_16eb = local_e58[0xd];
      uStack_16ea = local_e58[0xe];
      uStack_16e9 = local_e58[0xf];
      uVar1911 = CONCAT13(uStack_e3f,CONCAT12(uStack_16ef,CONCAT11(uStack_e40,uStack_16f0)));
      uVar1912 = CONCAT15(uStack_e3e,CONCAT14(uStack_16ee,uVar1911));
      uVar1913 = CONCAT17(uStack_e3d,CONCAT16(uStack_16ed,uVar1912));
      auVar1916._0_10_ = CONCAT19(uStack_e3c,CONCAT18(uStack_16ec,uVar1913));
      auVar1916[10] = uStack_16eb;
      auVar1916[0xb] = uStack_e3b;
      auVar1925[0xc] = uStack_16ea;
      auVar1925._0_12_ = auVar1916;
      auVar1925[0xd] = uStack_e3a;
      auVar1943[0xe] = uStack_16e9;
      auVar1943._0_14_ = auVar1925;
      auVar1943[0xf] = uStack_e39;
      auVar357._12_2_ = (short)((ulong)uVar1433 >> 0x30);
      auVar357._0_12_ = auVar1438;
      auVar357._14_2_ = (short)((ulong)uVar316 >> 0x30);
      auVar356._12_4_ = auVar357._12_4_;
      auVar356._10_2_ = (short)((uint6)uVar315 >> 0x20);
      auVar356._0_10_ = auVar1438._0_10_;
      auVar355._10_6_ = auVar356._10_6_;
      auVar355._8_2_ = (short)((uint6)uVar1432 >> 0x20);
      auVar355._0_8_ = uVar1433;
      auVar354._8_8_ = auVar355._8_8_;
      auVar354._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
      auVar354._0_6_ = uVar1432;
      auVar353._6_10_ = auVar354._6_10_;
      auVar353._4_2_ = (short)((uint)uVar1431 >> 0x10);
      auVar353._0_4_ = uVar1431;
      auVar352._4_12_ = auVar353._4_12_;
      auVar352._0_4_ = CONCAT22(CONCAT11(uStack_f00,uStack_1640),uVar314);
      auVar593._12_2_ = (short)((ulong)uVar505 >> 0x30);
      auVar593._0_12_ = auVar786;
      auVar593._14_2_ = (short)((ulong)uVar783 >> 0x30);
      auVar592._12_4_ = auVar593._12_4_;
      auVar592._10_2_ = (short)((uint6)uVar782 >> 0x20);
      auVar592._0_10_ = auVar786._0_10_;
      auVar591._10_6_ = auVar592._10_6_;
      auVar591._8_2_ = (short)((uint6)uVar504 >> 0x20);
      auVar591._0_8_ = uVar505;
      auVar590._8_8_ = auVar591._8_8_;
      auVar590._6_2_ = (short)((uint)uVar781 >> 0x10);
      auVar590._0_6_ = uVar504;
      auVar589._6_10_ = auVar590._6_10_;
      auVar589._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
      auVar589._0_4_ = auVar926._12_4_;
      auVar837._12_2_ = (short)((ulong)uVar1761 >> 0x30);
      auVar837._0_12_ = auVar1766;
      auVar837._14_2_ = (short)((ulong)uVar938 >> 0x30);
      auVar836._12_4_ = auVar837._12_4_;
      auVar836._10_2_ = (short)((uint6)uVar937 >> 0x20);
      auVar836._0_10_ = auVar1766._0_10_;
      auVar835._10_6_ = auVar836._10_6_;
      auVar835._8_2_ = (short)((uint6)uVar1760 >> 0x20);
      auVar835._0_8_ = uVar1761;
      auVar834._8_8_ = auVar835._8_8_;
      auVar834._6_2_ = (short)((uint)uVar936 >> 0x10);
      auVar834._0_6_ = uVar1760;
      auVar833._6_10_ = auVar834._6_10_;
      auVar833._4_2_ = (short)((uint)uVar1759 >> 0x10);
      auVar833._0_4_ = uVar1759;
      auVar832._4_12_ = auVar833._4_12_;
      auVar832._0_4_ = CONCAT22(CONCAT11(uStack_e80,uStack_16c0),uVar503);
      auVar1020._12_2_ = (short)((ulong)uVar1992 >> 0x30);
      auVar1020._0_12_ = auVar1997;
      auVar1020._14_2_ = (short)((ulong)uVar1913 >> 0x30);
      auVar1019._12_4_ = auVar1020._12_4_;
      auVar1019._10_2_ = (short)((uint6)uVar1912 >> 0x20);
      auVar1019._0_10_ = auVar1997._0_10_;
      auVar1018._10_6_ = auVar1019._10_6_;
      auVar1018._8_2_ = (short)((uint6)uVar1991 >> 0x20);
      auVar1018._0_8_ = uVar1992;
      auVar1017._8_8_ = auVar1018._8_8_;
      auVar1017._6_2_ = (short)((uint)uVar1911 >> 0x10);
      auVar1017._0_6_ = uVar1991;
      auVar1016._6_10_ = auVar1017._6_10_;
      auVar1016._4_2_ = (short)((uint)uVar1990 >> 0x10);
      auVar1016._0_4_ = uVar1990;
      auVar1228._0_8_ = auVar352._0_8_;
      auVar1228._8_4_ = auVar353._4_4_;
      auVar1228._12_4_ = auVar589._4_4_;
      auVar594._0_8_ = auVar832._0_8_;
      auVar594._8_4_ = auVar833._4_4_;
      auVar594._12_4_ = auVar1016._4_4_;
      local_14b8 = CONCAT44(CONCAT22(CONCAT11(uStack_ec0,uStack_1690),
                                     CONCAT11(uStack_ee0,uStack_1670)),auVar352._0_4_);
      uStack_14b0 = CONCAT44(CONCAT22(CONCAT11(uStack_e40,uStack_16f0),uVar780),auVar832._0_4_);
      local_14a8 = auVar1228._8_8_;
      uStack_14a0 = auVar594._8_8_;
      local_1498 = auVar355._8_4_;
      uStack_1494 = auVar591._8_4_;
      uStack_1490 = auVar835._8_4_;
      uStack_148c = auVar1018._8_4_;
      uStack_1480 = auVar356._12_4_;
      uStack_147c = auVar592._12_4_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)auVar510._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1438._0_10_ >> 0x40));
      auVar1439._0_8_ = CONCAT26(auVar510._10_2_,CONCAT24(auVar1438._10_2_,auVar926._12_4_));
      auVar1439._8_2_ = auVar1456._12_2_;
      auVar1439._10_2_ = auVar536._12_2_;
      auVar1469._12_2_ = auVar1468._14_2_;
      auVar1469._0_12_ = auVar1439;
      auVar1469._14_2_ = auVar588._14_2_;
      auVar490._12_4_ =
           CONCAT22((short)((unkuint10)auVar944._0_10_ >> 0x40),
                    (short)((unkuint10)auVar786._0_10_ >> 0x40));
      auVar511._0_8_ = CONCAT26(auVar944._10_2_,CONCAT24(auVar786._10_2_,auVar490._12_4_));
      auVar511._8_2_ = auVar805._12_2_;
      auVar511._10_2_ = auVar966._12_2_;
      auVar595._12_2_ = auVar831._14_2_;
      auVar595._0_12_ = auVar511;
      auVar595._14_2_ = auVar1015._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)auVar1175._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1766._0_10_ >> 0x40));
      auVar1767._0_8_ = CONCAT26(auVar1175._10_2_,CONCAT24(auVar1766._10_2_,uVar781));
      auVar1767._8_2_ = auVar1782._12_2_;
      auVar1767._10_2_ = auVar1191._12_2_;
      auVar1790._12_2_ = auVar1789._14_2_;
      auVar1790._0_12_ = auVar1767;
      auVar1790._14_2_ = auVar1227._14_2_;
      uVar936 = CONCAT22((short)((unkuint10)auVar1916._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1997._0_10_ >> 0x40));
      auVar1998._0_8_ = CONCAT26(auVar1916._10_2_,CONCAT24(auVar1997._10_2_,uVar936));
      auVar1998._8_2_ = auVar2013._12_2_;
      auVar1998._10_2_ = auVar1925._12_2_;
      auVar2021._12_2_ = auVar2020._14_2_;
      auVar2021._0_12_ = auVar1998;
      auVar2021._14_2_ = auVar1943._14_2_;
      auVar358._8_4_ = (int)((ulong)auVar1439._0_8_ >> 0x20);
      auVar358._0_8_ = auVar1439._0_8_;
      auVar358._12_4_ = (int)((ulong)auVar511._0_8_ >> 0x20);
      auVar596._8_4_ = (int)((ulong)auVar1767._0_8_ >> 0x20);
      auVar596._0_8_ = auVar1767._0_8_;
      auVar596._12_4_ = (int)((ulong)auVar1998._0_8_ >> 0x20);
      local_1478 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
      uStack_1470 = CONCAT44(uVar936,uVar781);
      local_1468 = auVar358._8_8_;
      uStack_1460 = auVar596._8_8_;
      local_1458 = auVar1439._8_4_;
      uStack_1454 = auVar511._8_4_;
      uStack_1450 = auVar1767._8_4_;
      uStack_144c = auVar1998._8_4_;
      uStack_1440 = auVar1469._12_4_;
      uStack_143c = auVar595._12_4_;
      local_1438 = auVar1790._12_4_;
      uStack_1434 = auVar2021._12_4_;
      auVar1028._0_14_ = local_1338._0_14_;
      auVar1028[0xe] = local_1338[0]._7_1_;
      auVar1028[0xf] = uStack_1321;
      auVar1027._14_2_ = auVar1028._14_2_;
      auVar1027._0_13_ = local_1338._0_13_;
      auVar1027[0xd] = uStack_1322;
      auVar1026._13_3_ = auVar1027._13_3_;
      auVar1026._0_12_ = local_1338._0_12_;
      auVar1026[0xc] = local_1338[0]._6_1_;
      auVar1025._12_4_ = auVar1026._12_4_;
      auVar1025._0_11_ = local_1338._0_11_;
      auVar1025[0xb] = uStack_1323;
      auVar1024._11_5_ = auVar1025._11_5_;
      auVar1024._0_10_ = local_1338._0_10_;
      auVar1024[10] = local_1338[0]._5_1_;
      auVar1023._10_6_ = auVar1024._10_6_;
      auVar1023._0_9_ = local_1338._0_9_;
      auVar1023[9] = uStack_1324;
      auVar1022._9_7_ = auVar1023._9_7_;
      auVar1022._0_8_ = local_1338[0];
      auVar1022[8] = local_1338[0]._4_1_;
      Var17 = CONCAT91(CONCAT81(auVar1022._8_8_,uStack_1325),local_1338[0]._3_1_);
      auVar69._2_10_ = Var17;
      auVar69[1] = uStack_1326;
      auVar69[0] = local_1338[0]._2_1_;
      auVar68._2_12_ = auVar69;
      auVar68[1] = uStack_1327;
      auVar68[0] = local_1338[0]._1_1_;
      auVar1021._0_2_ = CONCAT11(local_1328,(char)local_1338[0]);
      auVar1021._2_14_ = auVar68;
      auVar2214._0_14_ = local_1318._0_14_;
      auVar2214[0xe] = local_1318[7];
      auVar2214[0xf] = uStack_1301;
      auVar2213._14_2_ = auVar2214._14_2_;
      auVar2213._0_13_ = local_1318._0_13_;
      auVar2213[0xd] = uStack_1302;
      auVar2212._13_3_ = auVar2213._13_3_;
      auVar2212._0_12_ = local_1318._0_12_;
      auVar2212[0xc] = local_1318[6];
      auVar2211._12_4_ = auVar2212._12_4_;
      auVar2211._0_11_ = local_1318._0_11_;
      auVar2211[0xb] = uStack_1303;
      auVar2210._11_5_ = auVar2211._11_5_;
      auVar2210._0_10_ = local_1318._0_10_;
      auVar2210[10] = local_1318[5];
      auVar2209._10_6_ = auVar2210._10_6_;
      auVar2209._0_9_ = local_1318._0_9_;
      auVar2209[9] = uStack_1304;
      auVar2208._9_7_ = auVar2209._9_7_;
      auVar2208._0_8_ = local_1318._0_8_;
      auVar2208[8] = local_1318[4];
      Var19 = CONCAT91(CONCAT81(auVar2208._8_8_,uStack_1305),local_1318[3]);
      auVar71._2_10_ = Var19;
      auVar71[1] = uStack_1306;
      auVar71[0] = local_1318[2];
      auVar70._2_12_ = auVar71;
      auVar70[1] = uStack_1307;
      auVar70[0] = local_1318[1];
      auVar2078._0_14_ = local_12f8._0_14_;
      auVar2078[0xe] = local_12f8[7];
      auVar2078[0xf] = uStack_12e1;
      auVar2077._14_2_ = auVar2078._14_2_;
      auVar2077._0_13_ = local_12f8._0_13_;
      auVar2077[0xd] = uStack_12e2;
      auVar2076._13_3_ = auVar2077._13_3_;
      auVar2076._0_12_ = local_12f8._0_12_;
      auVar2076[0xc] = local_12f8[6];
      auVar2075._12_4_ = auVar2076._12_4_;
      auVar2075._0_11_ = local_12f8._0_11_;
      auVar2075[0xb] = uStack_12e3;
      auVar2074._11_5_ = auVar2075._11_5_;
      auVar2074._0_10_ = local_12f8._0_10_;
      auVar2074[10] = local_12f8[5];
      auVar2073._10_6_ = auVar2074._10_6_;
      auVar2073._0_9_ = local_12f8._0_9_;
      auVar2073[9] = uStack_12e4;
      auVar2072._9_7_ = auVar2073._9_7_;
      auVar2072._0_8_ = local_12f8._0_8_;
      auVar2072[8] = local_12f8[4];
      Var21 = CONCAT91(CONCAT81(auVar2072._8_8_,uStack_12e5),local_12f8[3]);
      auVar73._2_10_ = Var21;
      auVar73[1] = uStack_12e6;
      auVar73[0] = local_12f8[2];
      auVar72._2_12_ = auVar73;
      auVar72[1] = uStack_12e7;
      auVar72[0] = local_12f8[1];
      auVar2071._0_2_ = CONCAT11(local_12e8,local_12f8[0]);
      auVar2071._2_14_ = auVar72;
      auVar2152._0_14_ = local_12d8._0_14_;
      auVar2152[0xe] = local_12d8[7];
      auVar2152[0xf] = uStack_12c1;
      auVar2151._14_2_ = auVar2152._14_2_;
      auVar2151._0_13_ = local_12d8._0_13_;
      auVar2151[0xd] = uStack_12c2;
      auVar2150._13_3_ = auVar2151._13_3_;
      auVar2150._0_12_ = local_12d8._0_12_;
      auVar2150[0xc] = local_12d8[6];
      auVar2149._12_4_ = auVar2150._12_4_;
      auVar2149._0_11_ = local_12d8._0_11_;
      auVar2149[0xb] = uStack_12c3;
      auVar2148._11_5_ = auVar2149._11_5_;
      auVar2148._0_10_ = local_12d8._0_10_;
      auVar2148[10] = local_12d8[5];
      auVar2147._10_6_ = auVar2148._10_6_;
      auVar2147._0_9_ = local_12d8._0_9_;
      auVar2147[9] = uStack_12c4;
      auVar2146._9_7_ = auVar2147._9_7_;
      auVar2146._0_8_ = local_12d8._0_8_;
      auVar2146[8] = local_12d8[4];
      Var23 = CONCAT91(CONCAT81(auVar2146._8_8_,uStack_12c5),local_12d8[3]);
      auVar75._2_10_ = Var23;
      auVar75[1] = uStack_12c6;
      auVar75[0] = local_12d8[2];
      auVar74._2_12_ = auVar75;
      auVar74[1] = uStack_12c7;
      auVar74[0] = local_12d8[1];
      auVar1947._0_12_ = auVar1021._0_12_;
      auVar1947._12_2_ = (short)Var17;
      auVar1947._14_2_ = (short)Var19;
      auVar1946._12_4_ = auVar1947._12_4_;
      auVar1946._0_10_ = auVar1021._0_10_;
      auVar1946._10_2_ = auVar71._0_2_;
      auVar1945._10_6_ = auVar1946._10_6_;
      auVar1945._0_8_ = auVar1021._0_8_;
      auVar1945._8_2_ = auVar69._0_2_;
      auVar76._4_8_ = auVar1945._8_8_;
      auVar76._2_2_ = auVar70._0_2_;
      auVar76._0_2_ = auVar68._0_2_;
      auVar1944._0_4_ = CONCAT22(CONCAT11(local_1308,local_1318[0]),auVar1021._0_2_);
      auVar1944._4_12_ = auVar76;
      auVar599._0_12_ = auVar2071._0_12_;
      auVar599._12_2_ = (short)Var21;
      auVar599._14_2_ = (short)Var23;
      auVar598._12_4_ = auVar599._12_4_;
      auVar598._0_10_ = auVar2071._0_10_;
      auVar598._10_2_ = auVar75._0_2_;
      auVar597._10_6_ = auVar598._10_6_;
      auVar597._0_8_ = auVar2071._0_8_;
      auVar597._8_2_ = auVar73._0_2_;
      auVar77._4_8_ = auVar597._8_8_;
      auVar77._2_2_ = auVar74._0_2_;
      auVar77._0_2_ = auVar72._0_2_;
      auVar838._0_8_ = auVar1944._0_8_;
      auVar838._8_4_ = auVar76._0_4_;
      auVar838._12_4_ = auVar77._0_4_;
      auVar1236._0_14_ = local_12b8._0_14_;
      auVar1236[0xe] = local_12b8[7];
      auVar1236[0xf] = uStack_12a1;
      auVar1235._14_2_ = auVar1236._14_2_;
      auVar1235._0_13_ = local_12b8._0_13_;
      auVar1235[0xd] = uStack_12a2;
      auVar1234._13_3_ = auVar1235._13_3_;
      auVar1234._0_12_ = local_12b8._0_12_;
      auVar1234[0xc] = local_12b8[6];
      auVar1233._12_4_ = auVar1234._12_4_;
      auVar1233._0_11_ = local_12b8._0_11_;
      auVar1233[0xb] = uStack_12a3;
      auVar1232._11_5_ = auVar1233._11_5_;
      auVar1232._0_10_ = local_12b8._0_10_;
      auVar1232[10] = local_12b8[5];
      auVar1231._10_6_ = auVar1232._10_6_;
      auVar1231._0_9_ = local_12b8._0_9_;
      auVar1231[9] = uStack_12a4;
      auVar1230._9_7_ = auVar1231._9_7_;
      auVar1230._0_8_ = local_12b8._0_8_;
      auVar1230[8] = local_12b8[4];
      Var17 = CONCAT91(CONCAT81(auVar1230._8_8_,uStack_12a5),local_12b8[3]);
      auVar79._2_10_ = Var17;
      auVar79[1] = uStack_12a6;
      auVar79[0] = local_12b8[2];
      auVar78._2_12_ = auVar79;
      auVar78[1] = uStack_12a7;
      auVar78[0] = local_12b8[1];
      auVar1229._0_2_ = CONCAT11(local_12a8,local_12b8[0]);
      auVar1229._2_14_ = auVar78;
      auVar1551._0_14_ = local_1298._0_14_;
      auVar1551[0xe] = local_1298[7];
      auVar1551[0xf] = uStack_1281;
      auVar1550._14_2_ = auVar1551._14_2_;
      auVar1550._0_13_ = local_1298._0_13_;
      auVar1550[0xd] = uStack_1282;
      auVar1549._13_3_ = auVar1550._13_3_;
      auVar1549._0_12_ = local_1298._0_12_;
      auVar1549[0xc] = local_1298[6];
      auVar1548._12_4_ = auVar1549._12_4_;
      auVar1548._0_11_ = local_1298._0_11_;
      auVar1548[0xb] = uStack_1283;
      auVar1547._11_5_ = auVar1548._11_5_;
      auVar1547._0_10_ = local_1298._0_10_;
      auVar1547[10] = local_1298[5];
      auVar1546._10_6_ = auVar1547._10_6_;
      auVar1546._0_9_ = local_1298._0_9_;
      auVar1546[9] = uStack_1284;
      auVar1545._9_7_ = auVar1546._9_7_;
      auVar1545._0_8_ = local_1298._0_8_;
      auVar1545[8] = local_1298[4];
      Var19 = CONCAT91(CONCAT81(auVar1545._8_8_,uStack_1285),local_1298[3]);
      auVar81._2_10_ = Var19;
      auVar81[1] = uStack_1286;
      auVar81[0] = local_1298[2];
      auVar80._2_12_ = auVar81;
      auVar80[1] = uStack_1287;
      auVar80[0] = local_1298[1];
      auVar1686._0_14_ = local_1278._0_14_;
      auVar1686[0xe] = local_1278[7];
      auVar1686[0xf] = uStack_1261;
      auVar1685._14_2_ = auVar1686._14_2_;
      auVar1685._0_13_ = local_1278._0_13_;
      auVar1685[0xd] = uStack_1262;
      auVar1684._13_3_ = auVar1685._13_3_;
      auVar1684._0_12_ = local_1278._0_12_;
      auVar1684[0xc] = local_1278[6];
      auVar1683._12_4_ = auVar1684._12_4_;
      auVar1683._0_11_ = local_1278._0_11_;
      auVar1683[0xb] = uStack_1263;
      auVar1682._11_5_ = auVar1683._11_5_;
      auVar1682._0_10_ = local_1278._0_10_;
      auVar1682[10] = local_1278[5];
      auVar1681._10_6_ = auVar1682._10_6_;
      auVar1681._0_9_ = local_1278._0_9_;
      auVar1681[9] = uStack_1264;
      auVar1680._9_7_ = auVar1681._9_7_;
      auVar1680._0_8_ = local_1278._0_8_;
      auVar1680[8] = local_1278[4];
      Var21 = CONCAT91(CONCAT81(auVar1680._8_8_,uStack_1265),local_1278[3]);
      auVar83._2_10_ = Var21;
      auVar83[1] = uStack_1266;
      auVar83[0] = local_1278[2];
      auVar82._2_12_ = auVar83;
      auVar82[1] = uStack_1267;
      auVar82[0] = local_1278[1];
      auVar1679._0_2_ = CONCAT11(local_1268,local_1278[0]);
      auVar1679._2_14_ = auVar82;
      auVar1855._0_14_ = local_1258._0_14_;
      auVar1855[0xe] = local_1258[7];
      auVar1855[0xf] = uStack_1241;
      auVar1854._14_2_ = auVar1855._14_2_;
      auVar1854._0_13_ = local_1258._0_13_;
      auVar1854[0xd] = uStack_1242;
      auVar1853._13_3_ = auVar1854._13_3_;
      auVar1853._0_12_ = local_1258._0_12_;
      auVar1853[0xc] = local_1258[6];
      auVar1852._12_4_ = auVar1853._12_4_;
      auVar1852._0_11_ = local_1258._0_11_;
      auVar1852[0xb] = uStack_1243;
      auVar1851._11_5_ = auVar1852._11_5_;
      auVar1851._0_10_ = local_1258._0_10_;
      auVar1851[10] = local_1258[5];
      auVar1850._10_6_ = auVar1851._10_6_;
      auVar1850._0_9_ = local_1258._0_9_;
      auVar1850[9] = uStack_1244;
      auVar1849._9_7_ = auVar1850._9_7_;
      auVar1849._0_8_ = local_1258._0_8_;
      auVar1849[8] = local_1258[4];
      Var23 = CONCAT91(CONCAT81(auVar1849._8_8_,uStack_1245),local_1258[3]);
      auVar85._2_10_ = Var23;
      auVar85[1] = uStack_1246;
      auVar85[0] = local_1258[2];
      auVar84._2_12_ = auVar85;
      auVar84[1] = uStack_1247;
      auVar84[0] = local_1258[1];
      auVar603._0_12_ = auVar1229._0_12_;
      auVar603._12_2_ = (short)Var17;
      auVar603._14_2_ = (short)Var19;
      auVar602._12_4_ = auVar603._12_4_;
      auVar602._0_10_ = auVar1229._0_10_;
      auVar602._10_2_ = auVar81._0_2_;
      auVar601._10_6_ = auVar602._10_6_;
      auVar601._0_8_ = auVar1229._0_8_;
      auVar601._8_2_ = auVar79._0_2_;
      auVar86._4_8_ = auVar601._8_8_;
      auVar86._2_2_ = auVar80._0_2_;
      auVar86._0_2_ = auVar78._0_2_;
      auVar600._0_4_ = CONCAT22(CONCAT11(local_1288,local_1298[0]),auVar1229._0_2_);
      auVar600._4_12_ = auVar86;
      auVar1368._0_12_ = auVar1679._0_12_;
      auVar1368._12_2_ = (short)Var21;
      auVar1368._14_2_ = (short)Var23;
      auVar1367._12_4_ = auVar1368._12_4_;
      auVar1367._0_10_ = auVar1679._0_10_;
      auVar1367._10_2_ = auVar85._0_2_;
      auVar1366._10_6_ = auVar1367._10_6_;
      auVar1366._0_8_ = auVar1679._0_8_;
      auVar1366._8_2_ = auVar83._0_2_;
      auVar87._4_8_ = auVar1366._8_8_;
      auVar87._2_2_ = auVar84._0_2_;
      auVar87._0_2_ = auVar82._0_2_;
      auVar359._0_8_ = auVar600._0_8_;
      auVar359._8_4_ = auVar86._0_4_;
      auVar359._12_4_ = auVar87._0_4_;
      local_1138 = CONCAT44(CONCAT22(CONCAT11(local_12c8,local_12d8[0]),auVar2071._0_2_),
                            auVar1944._0_4_);
      auStack_1130[0] =
           CONCAT44(CONCAT22(CONCAT11(local_1248,local_1258[0]),auVar1679._0_2_),auVar600._0_4_);
      auStack_1130[1] = auVar838._8_8_;
      auStack_1130[2] = auVar359._8_8_;
      local_1118 = auVar1945._8_4_;
      uStack_1114 = auVar597._8_4_;
      uStack_1110 = auVar601._8_4_;
      uStack_110c = auVar1366._8_4_;
      uStack_1100 = auVar1946._12_4_;
      uStack_10fc = auVar598._12_4_;
      auVar490._12_4_ = CONCAT22(auVar2208._8_2_,auVar1022._8_2_);
      auVar945._0_8_ = CONCAT26(auVar2210._10_2_,CONCAT24(auVar1024._10_2_,auVar490._12_4_));
      auVar945._8_2_ = auVar1026._12_2_;
      auVar945._10_2_ = auVar2212._12_2_;
      auVar1029._12_2_ = auVar1027._14_2_;
      auVar1029._0_12_ = auVar945;
      auVar1029._14_2_ = auVar2213._14_2_;
      uVar936 = CONCAT22(auVar2146._8_2_,auVar2072._8_2_);
      auVar2041._0_8_ = CONCAT26(auVar2148._10_2_,CONCAT24(auVar2074._10_2_,uVar936));
      auVar2041._8_2_ = auVar2076._12_2_;
      auVar2041._10_2_ = auVar2150._12_2_;
      auVar2079._12_2_ = auVar2077._14_2_;
      auVar2079._0_12_ = auVar2041;
      auVar2079._14_2_ = auVar2151._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1545._8_2_,auVar1230._8_2_);
      auVar1176._0_8_ = CONCAT26(auVar1547._10_2_,CONCAT24(auVar1232._10_2_,auVar926._12_4_));
      auVar1176._8_2_ = auVar1234._12_2_;
      auVar1176._10_2_ = auVar1549._12_2_;
      uVar781 = CONCAT22(auVar1849._8_2_,auVar1680._8_2_);
      auVar1631._0_8_ = CONCAT26(auVar1851._10_2_,CONCAT24(auVar1682._10_2_,uVar781));
      auVar1631._8_2_ = auVar1684._12_2_;
      auVar1631._10_2_ = auVar1853._12_2_;
      auVar360._8_4_ = (int)((ulong)auVar945._0_8_ >> 0x20);
      auVar360._0_8_ = auVar945._0_8_;
      auVar360._12_4_ = (int)((ulong)auVar2041._0_8_ >> 0x20);
      auVar604._8_4_ = (int)((ulong)auVar1176._0_8_ >> 0x20);
      auVar604._0_8_ = auVar1176._0_8_;
      auVar604._12_4_ = (int)((ulong)auVar1631._0_8_ >> 0x20);
      local_10f8 = CONCAT44(uVar936,auVar490._12_4_);
      uStack_10f0 = CONCAT44(uVar781,auVar926._12_4_);
      local_10e8 = auVar360._8_8_;
      uStack_10e0 = auVar604._8_8_;
      local_10d8 = auVar945._8_4_;
      uStack_10d4 = auVar2041._8_4_;
      uStack_10d0 = auVar1176._8_4_;
      uStack_10cc = auVar1631._8_4_;
      uStack_10c0 = auVar1029._12_4_;
      uStack_10bc = auVar2079._12_4_;
      uVar314 = CONCAT11(uStack_1320,(char)local_1338[1]);
      uVar1431 = CONCAT13(uStack_131f,CONCAT12(local_1338[1]._1_1_,uVar314));
      uVar1432 = CONCAT15(uStack_131e,CONCAT14(local_1338[1]._2_1_,uVar1431));
      uVar1433 = CONCAT17(uStack_131d,CONCAT16(local_1338[1]._3_1_,uVar1432));
      auVar1440._0_10_ = CONCAT19(uStack_131c,CONCAT18(local_1338[1]._4_1_,uVar1433));
      auVar1440[10] = local_1338[1]._5_1_;
      auVar1440[0xb] = uStack_131b;
      auVar1457[0xc] = local_1338[1]._6_1_;
      auVar1457._0_12_ = auVar1440;
      auVar1457[0xd] = uStack_131a;
      auVar1470[0xe] = local_1338[1]._7_1_;
      auVar1470._0_14_ = auVar1457;
      auVar1470[0xf] = uStack_1319;
      uStack_1640 = local_1318[8];
      uStack_163f = local_1318[9];
      uStack_163e = local_1318[10];
      uStack_163d = local_1318[0xb];
      uStack_163c = local_1318[0xc];
      uStack_163b = local_1318[0xd];
      uStack_163a = local_1318[0xe];
      uStack_1639 = local_1318[0xf];
      auVar490._12_4_ =
           CONCAT13(uStack_12ff,CONCAT12(uStack_163f,CONCAT11(uStack_1300,uStack_1640)));
      uVar315 = CONCAT15(uStack_12fe,CONCAT14(uStack_163e,auVar490._12_4_));
      uVar316 = CONCAT17(uStack_12fd,CONCAT16(uStack_163d,uVar315));
      auVar512._0_10_ = CONCAT19(uStack_12fc,CONCAT18(uStack_163c,uVar316));
      auVar512[10] = uStack_163b;
      auVar512[0xb] = uStack_12fb;
      auVar537[0xc] = uStack_163a;
      auVar537._0_12_ = auVar512;
      auVar537[0xd] = uStack_12fa;
      auVar605[0xe] = uStack_1639;
      auVar605._0_14_ = auVar537;
      auVar605[0xf] = uStack_12f9;
      uStack_1670 = local_12f8[8];
      uStack_166f = local_12f8[9];
      uStack_166e = local_12f8[10];
      uStack_166d = local_12f8[0xb];
      uStack_166c = local_12f8[0xc];
      uStack_166b = local_12f8[0xd];
      uStack_166a = local_12f8[0xe];
      uStack_1669 = local_12f8[0xf];
      auVar926._12_4_ =
           CONCAT13(uStack_12df,CONCAT12(uStack_166f,CONCAT11(uStack_12e0,uStack_1670)));
      uVar504 = CONCAT15(uStack_12de,CONCAT14(uStack_166e,auVar926._12_4_));
      uVar505 = CONCAT17(uStack_12dd,CONCAT16(uStack_166d,uVar504));
      auVar787._0_10_ = CONCAT19(uStack_12dc,CONCAT18(uStack_166c,uVar505));
      auVar787[10] = uStack_166b;
      auVar787[0xb] = uStack_12db;
      auVar806[0xc] = uStack_166a;
      auVar806._0_12_ = auVar787;
      auVar806[0xd] = uStack_12da;
      auVar839[0xe] = uStack_1669;
      auVar839._0_14_ = auVar806;
      auVar839[0xf] = uStack_12d9;
      uStack_1690 = local_12d8[8];
      uStack_168f = local_12d8[9];
      uStack_168e = local_12d8[10];
      uStack_168d = local_12d8[0xb];
      uStack_168c = local_12d8[0xc];
      uStack_168b = local_12d8[0xd];
      uStack_168a = local_12d8[0xe];
      uStack_1689 = local_12d8[0xf];
      uVar781 = CONCAT13(uStack_12bf,CONCAT12(uStack_168f,CONCAT11(uStack_12c0,uStack_1690)));
      uVar782 = CONCAT15(uStack_12be,CONCAT14(uStack_168e,uVar781));
      uVar783 = CONCAT17(uStack_12bd,CONCAT16(uStack_168d,uVar782));
      auVar946._0_10_ = CONCAT19(uStack_12bc,CONCAT18(uStack_168c,uVar783));
      auVar946[10] = uStack_168b;
      auVar946[0xb] = uStack_12bb;
      auVar967[0xc] = uStack_168a;
      auVar967._0_12_ = auVar946;
      auVar967[0xd] = uStack_12ba;
      auVar1030[0xe] = uStack_1689;
      auVar1030._0_14_ = auVar967;
      auVar1030[0xf] = uStack_12b9;
      uVar503 = CONCAT11(uStack_12a0,local_12b8[8]);
      uVar1759 = CONCAT13(uStack_129f,CONCAT12(local_12b8[9],uVar503));
      uVar1760 = CONCAT15(uStack_129e,CONCAT14(local_12b8[10],uVar1759));
      uVar1761 = CONCAT17(uStack_129d,CONCAT16(local_12b8[0xb],uVar1760));
      auVar1768._0_10_ = CONCAT19(uStack_129c,CONCAT18(local_12b8[0xc],uVar1761));
      auVar1768[10] = local_12b8[0xd];
      auVar1768[0xb] = uStack_129b;
      auVar1783[0xc] = local_12b8[0xe];
      auVar1783._0_12_ = auVar1768;
      auVar1783[0xd] = uStack_129a;
      auVar1791[0xe] = local_12b8[0xf];
      auVar1791._0_14_ = auVar1783;
      auVar1791[0xf] = uStack_1299;
      uStack_16c0 = local_1298[8];
      uStack_16bf = local_1298[9];
      uStack_16be = local_1298[10];
      uStack_16bd = local_1298[0xb];
      uStack_16bc = local_1298[0xc];
      uStack_16bb = local_1298[0xd];
      uStack_16ba = local_1298[0xe];
      uStack_16b9 = local_1298[0xf];
      uVar936 = CONCAT13(uStack_127f,CONCAT12(uStack_16bf,CONCAT11(uStack_1280,uStack_16c0)));
      uVar937 = CONCAT15(uStack_127e,CONCAT14(uStack_16be,uVar936));
      uVar938 = CONCAT17(uStack_127d,CONCAT16(uStack_16bd,uVar937));
      auVar1177._0_10_ = CONCAT19(uStack_127c,CONCAT18(uStack_16bc,uVar938));
      auVar1177[10] = uStack_16bb;
      auVar1177[0xb] = uStack_127b;
      auVar1192[0xc] = uStack_16ba;
      auVar1192._0_12_ = auVar1177;
      auVar1192[0xd] = uStack_127a;
      auVar1237[0xe] = uStack_16b9;
      auVar1237._0_14_ = auVar1192;
      auVar1237[0xf] = uStack_1279;
      uVar780 = CONCAT11(uStack_1260,local_1278[8]);
      uVar1990 = CONCAT13(uStack_125f,CONCAT12(local_1278[9],uVar780));
      uVar1991 = CONCAT15(uStack_125e,CONCAT14(local_1278[10],uVar1990));
      uVar1992 = CONCAT17(uStack_125d,CONCAT16(local_1278[0xb],uVar1991));
      auVar1999._0_10_ = CONCAT19(uStack_125c,CONCAT18(local_1278[0xc],uVar1992));
      auVar1999[10] = local_1278[0xd];
      auVar1999[0xb] = uStack_125b;
      auVar2014[0xc] = local_1278[0xe];
      auVar2014._0_12_ = auVar1999;
      auVar2014[0xd] = uStack_125a;
      auVar2022[0xe] = local_1278[0xf];
      auVar2022._0_14_ = auVar2014;
      auVar2022[0xf] = uStack_1259;
      uStack_16f0 = local_1258[8];
      uStack_16ef = local_1258[9];
      uStack_16ee = local_1258[10];
      uStack_16ed = local_1258[0xb];
      uStack_16ec = local_1258[0xc];
      uStack_16eb = local_1258[0xd];
      uStack_16ea = local_1258[0xe];
      uStack_16e9 = local_1258[0xf];
      uVar1911 = CONCAT13(uStack_123f,CONCAT12(uStack_16ef,CONCAT11(uStack_1240,uStack_16f0)));
      uVar1912 = CONCAT15(uStack_123e,CONCAT14(uStack_16ee,uVar1911));
      uVar1913 = CONCAT17(uStack_123d,CONCAT16(uStack_16ed,uVar1912));
      auVar1917._0_10_ = CONCAT19(uStack_123c,CONCAT18(uStack_16ec,uVar1913));
      auVar1917[10] = uStack_16eb;
      auVar1917[0xb] = uStack_123b;
      auVar1926[0xc] = uStack_16ea;
      auVar1926._0_12_ = auVar1917;
      auVar1926[0xd] = uStack_123a;
      auVar1948[0xe] = uStack_16e9;
      auVar1948._0_14_ = auVar1926;
      auVar1948[0xf] = uStack_1239;
      auVar366._12_2_ = (short)((ulong)uVar1433 >> 0x30);
      auVar366._0_12_ = auVar1440;
      auVar366._14_2_ = (short)((ulong)uVar316 >> 0x30);
      auVar365._12_4_ = auVar366._12_4_;
      auVar365._10_2_ = (short)((uint6)uVar315 >> 0x20);
      auVar365._0_10_ = auVar1440._0_10_;
      auVar364._10_6_ = auVar365._10_6_;
      auVar364._8_2_ = (short)((uint6)uVar1432 >> 0x20);
      auVar364._0_8_ = uVar1433;
      auVar363._8_8_ = auVar364._8_8_;
      auVar363._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
      auVar363._0_6_ = uVar1432;
      auVar362._6_10_ = auVar363._6_10_;
      auVar362._4_2_ = (short)((uint)uVar1431 >> 0x10);
      auVar362._0_4_ = uVar1431;
      auVar361._4_12_ = auVar362._4_12_;
      auVar361._0_4_ = CONCAT22(CONCAT11(uStack_1300,uStack_1640),uVar314);
      auVar610._12_2_ = (short)((ulong)uVar505 >> 0x30);
      auVar610._0_12_ = auVar787;
      auVar610._14_2_ = (short)((ulong)uVar783 >> 0x30);
      auVar609._12_4_ = auVar610._12_4_;
      auVar609._10_2_ = (short)((uint6)uVar782 >> 0x20);
      auVar609._0_10_ = auVar787._0_10_;
      auVar608._10_6_ = auVar609._10_6_;
      auVar608._8_2_ = (short)((uint6)uVar504 >> 0x20);
      auVar608._0_8_ = uVar505;
      auVar607._8_8_ = auVar608._8_8_;
      auVar607._6_2_ = (short)((uint)uVar781 >> 0x10);
      auVar607._0_6_ = uVar504;
      auVar606._6_10_ = auVar607._6_10_;
      auVar606._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
      auVar606._0_4_ = auVar926._12_4_;
      auVar845._12_2_ = (short)((ulong)uVar1761 >> 0x30);
      auVar845._0_12_ = auVar1768;
      auVar845._14_2_ = (short)((ulong)uVar938 >> 0x30);
      auVar844._12_4_ = auVar845._12_4_;
      auVar844._10_2_ = (short)((uint6)uVar937 >> 0x20);
      auVar844._0_10_ = auVar1768._0_10_;
      auVar843._10_6_ = auVar844._10_6_;
      auVar843._8_2_ = (short)((uint6)uVar1760 >> 0x20);
      auVar843._0_8_ = uVar1761;
      auVar842._8_8_ = auVar843._8_8_;
      auVar842._6_2_ = (short)((uint)uVar936 >> 0x10);
      auVar842._0_6_ = uVar1760;
      auVar841._6_10_ = auVar842._6_10_;
      auVar841._4_2_ = (short)((uint)uVar1759 >> 0x10);
      auVar841._0_4_ = uVar1759;
      auVar840._4_12_ = auVar841._4_12_;
      auVar840._0_4_ = CONCAT22(CONCAT11(uStack_1280,uStack_16c0),uVar503);
      auVar1035._12_2_ = (short)((ulong)uVar1992 >> 0x30);
      auVar1035._0_12_ = auVar1999;
      auVar1035._14_2_ = (short)((ulong)uVar1913 >> 0x30);
      auVar1034._12_4_ = auVar1035._12_4_;
      auVar1034._10_2_ = (short)((uint6)uVar1912 >> 0x20);
      auVar1034._0_10_ = auVar1999._0_10_;
      auVar1033._10_6_ = auVar1034._10_6_;
      auVar1033._8_2_ = (short)((uint6)uVar1991 >> 0x20);
      auVar1033._0_8_ = uVar1992;
      auVar1032._8_8_ = auVar1033._8_8_;
      auVar1032._6_2_ = (short)((uint)uVar1911 >> 0x10);
      auVar1032._0_6_ = uVar1991;
      auVar1031._6_10_ = auVar1032._6_10_;
      auVar1031._4_2_ = (short)((uint)uVar1990 >> 0x10);
      auVar1031._0_4_ = uVar1990;
      auVar1238._0_8_ = auVar361._0_8_;
      auVar1238._8_4_ = auVar362._4_4_;
      auVar1238._12_4_ = auVar606._4_4_;
      auVar611._0_8_ = auVar840._0_8_;
      auVar611._8_4_ = auVar841._4_4_;
      auVar611._12_4_ = auVar1031._4_4_;
      local_10b8 = CONCAT44(CONCAT22(CONCAT11(uStack_12c0,uStack_1690),
                                     CONCAT11(uStack_12e0,uStack_1670)),auVar361._0_4_);
      uStack_10b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1240,uStack_16f0),uVar780),auVar840._0_4_);
      local_10a8 = auVar1238._8_8_;
      uStack_10a0 = auVar611._8_8_;
      local_1098 = auVar364._8_4_;
      uStack_1094 = auVar608._8_4_;
      uStack_1090 = auVar843._8_4_;
      uStack_108c = auVar1033._8_4_;
      uStack_1080 = auVar365._12_4_;
      uStack_107c = auVar609._12_4_;
      auVar926._12_4_ =
           CONCAT22((short)((unkuint10)auVar512._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1440._0_10_ >> 0x40));
      auVar1441._0_8_ = CONCAT26(auVar512._10_2_,CONCAT24(auVar1440._10_2_,auVar926._12_4_));
      auVar1441._8_2_ = auVar1457._12_2_;
      auVar1441._10_2_ = auVar537._12_2_;
      auVar1471._12_2_ = auVar1470._14_2_;
      auVar1471._0_12_ = auVar1441;
      auVar1471._14_2_ = auVar605._14_2_;
      auVar490._12_4_ =
           CONCAT22((short)((unkuint10)auVar946._0_10_ >> 0x40),
                    (short)((unkuint10)auVar787._0_10_ >> 0x40));
      auVar513._0_8_ = CONCAT26(auVar946._10_2_,CONCAT24(auVar787._10_2_,auVar490._12_4_));
      auVar513._8_2_ = auVar806._12_2_;
      auVar513._10_2_ = auVar967._12_2_;
      auVar612._12_2_ = auVar839._14_2_;
      auVar612._0_12_ = auVar513;
      auVar612._14_2_ = auVar1030._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)auVar1177._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1768._0_10_ >> 0x40));
      auVar1769._0_8_ = CONCAT26(auVar1177._10_2_,CONCAT24(auVar1768._10_2_,uVar781));
      auVar1769._8_2_ = auVar1783._12_2_;
      auVar1769._10_2_ = auVar1192._12_2_;
      auVar1792._12_2_ = auVar1791._14_2_;
      auVar1792._0_12_ = auVar1769;
      auVar1792._14_2_ = auVar1237._14_2_;
      uVar936 = CONCAT22((short)((unkuint10)auVar1917._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1999._0_10_ >> 0x40));
      auVar2000._0_8_ = CONCAT26(auVar1917._10_2_,CONCAT24(auVar1999._10_2_,uVar936));
      auVar2000._8_2_ = auVar2014._12_2_;
      auVar2000._10_2_ = auVar1926._12_2_;
      auVar2023._12_2_ = auVar2022._14_2_;
      auVar2023._0_12_ = auVar2000;
      auVar2023._14_2_ = auVar1948._14_2_;
      auVar367._8_4_ = (int)((ulong)auVar1441._0_8_ >> 0x20);
      auVar367._0_8_ = auVar1441._0_8_;
      auVar367._12_4_ = (int)((ulong)auVar513._0_8_ >> 0x20);
      auVar613._8_4_ = (int)((ulong)auVar1769._0_8_ >> 0x20);
      auVar613._0_8_ = auVar1769._0_8_;
      auVar613._12_4_ = (int)((ulong)auVar2000._0_8_ >> 0x20);
      local_1078 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
      uStack_1070 = CONCAT44(uVar936,uVar781);
      local_1068 = auVar367._8_8_;
      uStack_1060 = auVar613._8_8_;
      local_1058 = auVar1441._8_4_;
      uStack_1054 = auVar513._8_4_;
      uStack_1050 = auVar1769._8_4_;
      uStack_104c = auVar2000._8_4_;
      uStack_1040 = auVar1471._12_4_;
      uStack_103c = auVar612._12_4_;
      local_1038._4_4_ = auVar2023._12_4_;
      local_1038._0_4_ = auVar1792._12_4_;
      puVar301 = dst + 0x10;
      lVar300 = 0x100;
      do {
        uVar316 = *(undefined8 *)((long)auStack_1738 + lVar300 + 8);
        *(undefined8 *)(puVar301 + -0x10) = *(undefined8 *)((long)auStack_1738 + lVar300);
        *(undefined8 *)(puVar301 + -8) = uVar316;
        uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
        *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1638 + lVar300);
        *(undefined8 *)(puVar301 + 8) = uVar316;
        lVar300 = lVar300 + 0x10;
        puVar301 = puVar301 + stride;
      } while (lVar300 != 0x200);
      puVar301 = dst + stride * 0x10 + 0x10;
      lVar300 = 0x100;
      do {
        uVar316 = *(undefined8 *)((long)local_1338 + lVar300 + 8);
        *(undefined8 *)(puVar301 + -0x10) = *(undefined8 *)((long)local_1338 + lVar300);
        *(undefined8 *)(puVar301 + -8) = uVar316;
        uVar316 = *(undefined8 *)((long)local_1238 + lVar300 + 8);
        *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1238 + lVar300);
        *(undefined8 *)(puVar301 + 8) = uVar316;
        lVar300 = lVar300 + 0x10;
        puVar301 = puVar301 + stride;
      } while (lVar300 != 0x200);
      return;
    }
    if (bw != 0x40) {
      return;
    }
    uStack_1710 = 0x33c64a;
    dr_prediction_z1_64xN_sse4_1(0x40,local_1038,0x40,left,dy,iVar307);
    iVar307 = 0x40;
LAB_0033fd13:
    pitchSrc = 0x40;
    iVar309 = 0x40;
LAB_0033fd19:
    uStack_1710 = 0x33fd1e;
    transpose(local_1038,pitchSrc,dst,stride,iVar307,iVar309);
  }
  else {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar307 = 0xb << (bVar302 & 0x1f);
          auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
          lVar300 = 0;
          auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar311 = 0;
          uVar305 = dy;
          do {
            iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
            uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
            if ((int)uVar308 < 1) {
              if (uVar311 < 4) {
                do {
                  *(undefined1 (*) [16])((long)local_1638 + lVar300) = auVar546;
                  lVar300 = lVar300 + 0x10;
                } while (lVar300 != 0x40);
              }
              break;
            }
            if (7 < uVar308) {
              uVar308 = 8;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar309);
            if (upsample_left == 0) {
              auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
              auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1639._0_4_ = auVar1198._0_4_;
              auVar1639._4_4_ = auVar1639._0_4_;
              auVar1639._8_4_ = auVar1639._0_4_;
              auVar1639._12_4_ = auVar1639._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_0050db80);
              auVar1522 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
              auVar1637._0_4_ = auVar1198._0_4_;
              auVar1637._4_4_ = auVar1637._0_4_;
              auVar1637._8_4_ = auVar1637._0_4_;
              auVar1637._12_4_ = auVar1637._0_4_;
              auVar1198 = psllw(auVar1637,ZEXT416((uint)upsample_left));
              auVar1638._0_2_ = auVar1198._0_2_ >> 1;
              auVar1638._2_2_ = auVar1198._2_2_ >> 1;
              auVar1638._4_2_ = auVar1198._4_2_ >> 1;
              auVar1638._6_2_ = auVar1198._6_2_ >> 1;
              auVar1638._8_2_ = auVar1198._8_2_ >> 1;
              auVar1638._10_2_ = auVar1198._10_2_ >> 1;
              auVar1638._12_2_ = auVar1198._12_2_ >> 1;
              auVar1638._14_2_ = auVar1198._14_2_ >> 1;
              auVar1639 = auVar1638 & auVar332;
            }
            auVar1198 = pmovzxbw(in_XMM9,auVar1356);
            auVar1523 = pmovzxbw(in_XMM10,auVar1522);
            auVar1199 = psllw(auVar1198,5);
            in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1639._0_2_;
            in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1639._2_2_;
            in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1639._4_2_;
            in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1639._6_2_;
            in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1639._8_2_;
            in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1639._10_2_;
            in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1639._12_2_;
            in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1639._14_2_;
            uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
            auVar326._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar326[2] = auVar1356[9];
            auVar326[3] = 0;
            auVar326[4] = auVar1356[10];
            auVar326[5] = 0;
            auVar326[6] = auVar1356[0xb];
            auVar326[7] = 0;
            auVar326[8] = auVar1356[0xc];
            auVar326[9] = 0;
            auVar326[10] = auVar1356[0xd];
            auVar326[0xb] = 0;
            auVar326[0xc] = auVar1356[0xe];
            auVar326[0xd] = 0;
            auVar326[0xe] = auVar1356[0xf];
            auVar326[0xf] = 0;
            auVar1198 = psllw(auVar326,5);
            uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                               (auVar1522[8] - auVar326._0_2_) * auVar1639._0_2_) >> 5;
            uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                               ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1639._2_2_) >> 5
            ;
            uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                               ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1639._4_2_) >>
                       5;
            uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                               ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1639._6_2_)
                       >> 5;
            uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                               ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1639._8_2_)
                       >> 5;
            uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                               ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1639._10_2_)
                       >> 5;
            uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                               ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1639._12_2_)
                       >> 5;
            uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                               ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1639._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
            in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
            in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
            in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
            in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
            in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
            in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
            in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
            in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348)
            ;
            in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349)
            ;
            in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350)
            ;
            in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351)
            ;
            in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352)
            ;
            auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
            *(undefined1 (*) [16])((long)local_1638 + lVar300) = auVar1356;
            uVar305 = uVar305 + dy;
            uVar311 = uVar311 + 1;
            lVar300 = lVar300 + 0x10;
          } while (uVar311 != 4);
          auVar5._8_8_ = local_1638[1];
          auVar5._0_8_ = local_1638[0];
          auVar12._8_4_ = uStack_1610;
          auVar12._0_8_ = CONCAT44(uStack_1614,local_1618);
          auVar11._12_4_ = uStack_160c;
          auVar11._0_12_ = auVar12;
          auVar479._0_14_ = auVar5._0_14_;
          auVar479[0xe] = (char)((ulong)local_1638[0] >> 0x38);
          auVar479[0xf] = uStack_1621;
          auVar478._14_2_ = auVar479._14_2_;
          auVar478._0_13_ = auVar5._0_13_;
          auVar478[0xd] = uStack_1622;
          auVar477._13_3_ = auVar478._13_3_;
          auVar477._0_12_ = auVar5._0_12_;
          auVar477[0xc] = (char)((ulong)local_1638[0] >> 0x30);
          auVar476._12_4_ = auVar477._12_4_;
          auVar476._0_11_ = auVar5._0_11_;
          auVar476[0xb] = uStack_1623;
          auVar475._11_5_ = auVar476._11_5_;
          auVar475._0_10_ = auVar5._0_10_;
          auVar475[10] = (char)((ulong)local_1638[0] >> 0x28);
          auVar474._10_6_ = auVar475._10_6_;
          auVar474._0_9_ = auVar5._0_9_;
          auVar474[9] = uStack_1624;
          auVar473._9_7_ = auVar474._9_7_;
          auVar473[8] = (char)((ulong)local_1638[0] >> 0x20);
          auVar473._0_8_ = local_1638[0];
          Var17 = CONCAT91(CONCAT81(auVar473._8_8_,uStack_1625),(char)((ulong)local_1638[0] >> 0x18)
                          );
          auVar215._2_10_ = Var17;
          auVar215[1] = uStack_1626;
          auVar215[0] = (char)((ulong)local_1638[0] >> 0x10);
          auVar214._2_12_ = auVar215;
          auVar214[1] = uStack_1627;
          auVar214[0] = (char)((ulong)local_1638[0] >> 8);
          auVar472._0_2_ = CONCAT11(local_1628,(char)local_1638[0]);
          auVar472._2_14_ = auVar214;
          auVar753._0_14_ = auVar11._0_14_;
          auVar753[0xe] = (char)((uint)uStack_1614 >> 0x18);
          auVar753[0xf] = local_1608[7];
          auVar752._14_2_ = auVar753._14_2_;
          auVar752._0_13_ = auVar11._0_13_;
          auVar752[0xd] = local_1608[6];
          auVar751._13_3_ = auVar752._13_3_;
          auVar751[0xc] = (char)((uint)uStack_1614 >> 0x10);
          auVar751._0_12_ = auVar12;
          auVar750._12_4_ = auVar751._12_4_;
          auVar750._0_11_ = auVar12._0_11_;
          auVar750[0xb] = local_1608[5];
          auVar749._11_5_ = auVar750._11_5_;
          auVar749._0_10_ = auVar12._0_10_;
          auVar749[10] = (char)((uint)uStack_1614 >> 8);
          auVar748._10_6_ = auVar749._10_6_;
          auVar748._0_9_ = auVar12._0_9_;
          auVar748[9] = local_1608[4];
          auVar747._9_7_ = auVar748._9_7_;
          auVar747[8] = (char)uStack_1614;
          auVar747._0_8_ = CONCAT44(uStack_1614,local_1618);
          Var19 = CONCAT91(CONCAT81(auVar747._8_8_,local_1608[3]),(char)((uint)local_1618 >> 0x18));
          auVar217._2_10_ = Var19;
          auVar217[1] = local_1608[2];
          auVar217[0] = (char)((uint)local_1618 >> 0x10);
          auVar216._2_12_ = auVar217;
          auVar216[1] = local_1608[1];
          auVar216[0] = (char)((uint)local_1618 >> 8);
          local_1038[3] = local_1608[0];
          local_1038[2] = (char)local_1618;
          auVar920._0_12_ = auVar472._0_12_;
          auVar920._12_2_ = (short)Var17;
          auVar920._14_2_ = (short)Var19;
          auVar919._12_4_ = auVar920._12_4_;
          auVar919._0_10_ = auVar472._0_10_;
          auVar919._10_2_ = auVar217._0_2_;
          auVar918._10_6_ = auVar919._10_6_;
          auVar918._0_8_ = auVar472._0_8_;
          auVar918._8_2_ = auVar215._0_2_;
          uVar311 = auVar918._8_8_;
          auVar218._4_8_ = uVar311;
          auVar218._2_2_ = auVar216._0_2_;
          auVar218._0_2_ = auVar214._0_2_;
          local_1038._0_2_ = auVar472._0_2_;
          local_1038._4_12_ = auVar218;
          uStack_ff0 = auVar477._12_2_;
          uStack_fee = auVar751._12_2_;
          local_1028._12_4_ = 0;
          local_1028._0_12_ = auVar218;
          local_1018._8_8_ = 0;
          local_1018._0_8_ = uVar311;
          local_1008._8_8_ = 0;
          local_1008._0_8_ = uVar311 >> 0x20;
          local_ff8 = auVar473._8_2_;
          uStack_ff6 = auVar747._8_2_;
          uStack_ff4 = auVar475._10_2_;
          uStack_ff2 = auVar749._10_2_;
          uStack_fec = auVar478._14_2_;
          uStack_fea = auVar752._14_2_;
          local_fe8 = CONCAT26(uStack_fee,
                               CONCAT24(uStack_ff0,CONCAT22(auVar749._10_2_,auVar475._10_2_)));
          uStack_fe0 = (ulong)CONCAT22(auVar752._14_2_,auVar478._14_2_);
          local_fd8 = uStack_ff0;
          uStack_fd6 = uStack_fee;
          uStack_fd4 = auVar478._14_2_;
          uStack_fd2 = auVar752._14_2_;
          uStack_fd0 = 0;
          uStack_fce = 0;
          uStack_fcc = 0;
          uStack_fca = 0;
          local_fc8 = (ulong)CONCAT22(auVar752._14_2_,auVar478._14_2_);
          uStack_fc0 = 0;
          lVar300 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1038 + lVar300);
            lVar300 = lVar300 + 0x10;
            dst = dst + stride;
          } while (lVar300 != 0x80);
          return;
        case 1:
          iVar307 = 0x17 << (bVar302 & 0x1f);
          auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
          lVar300 = 0;
          auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar311 = 0;
          uVar305 = dy;
          do {
            iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
            uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
            if ((int)uVar308 < 1) {
              if (uVar311 < 8) {
                do {
                  *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
                  lVar300 = lVar300 + 0x10;
                } while (lVar300 != 0x80);
              }
              break;
            }
            if (0xf < uVar308) {
              uVar308 = 0x10;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar309);
            if (upsample_left == 0) {
              auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
              auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1722._0_4_ = auVar1198._0_4_;
              auVar1722._4_4_ = auVar1722._0_4_;
              auVar1722._8_4_ = auVar1722._0_4_;
              auVar1722._12_4_ = auVar1722._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_0050db80);
              auVar1522 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
              auVar1720._0_4_ = auVar1198._0_4_;
              auVar1720._4_4_ = auVar1720._0_4_;
              auVar1720._8_4_ = auVar1720._0_4_;
              auVar1720._12_4_ = auVar1720._0_4_;
              auVar1198 = psllw(auVar1720,ZEXT416((uint)upsample_left));
              auVar1721._0_2_ = auVar1198._0_2_ >> 1;
              auVar1721._2_2_ = auVar1198._2_2_ >> 1;
              auVar1721._4_2_ = auVar1198._4_2_ >> 1;
              auVar1721._6_2_ = auVar1198._6_2_ >> 1;
              auVar1721._8_2_ = auVar1198._8_2_ >> 1;
              auVar1721._10_2_ = auVar1198._10_2_ >> 1;
              auVar1721._12_2_ = auVar1198._12_2_ >> 1;
              auVar1721._14_2_ = auVar1198._14_2_ >> 1;
              auVar1722 = auVar1721 & auVar332;
            }
            auVar1198 = pmovzxbw(in_XMM9,auVar1356);
            auVar1523 = pmovzxbw(in_XMM10,auVar1522);
            auVar1199 = psllw(auVar1198,5);
            in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1722._0_2_;
            in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1722._2_2_;
            in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1722._4_2_;
            in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1722._6_2_;
            in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1722._8_2_;
            in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1722._10_2_;
            in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1722._12_2_;
            in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1722._14_2_;
            uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
            auVar422._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar422[2] = auVar1356[9];
            auVar422[3] = 0;
            auVar422[4] = auVar1356[10];
            auVar422[5] = 0;
            auVar422[6] = auVar1356[0xb];
            auVar422[7] = 0;
            auVar422[8] = auVar1356[0xc];
            auVar422[9] = 0;
            auVar422[10] = auVar1356[0xd];
            auVar422[0xb] = 0;
            auVar422[0xc] = auVar1356[0xe];
            auVar422[0xd] = 0;
            auVar422[0xe] = auVar1356[0xf];
            auVar422[0xf] = 0;
            auVar1198 = psllw(auVar422,5);
            uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                               (auVar1522[8] - auVar422._0_2_) * auVar1722._0_2_) >> 5;
            uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                               ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1722._2_2_) >> 5
            ;
            uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                               ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1722._4_2_) >>
                       5;
            uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                               ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1722._6_2_)
                       >> 5;
            uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                               ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1722._8_2_)
                       >> 5;
            uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                               ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1722._10_2_)
                       >> 5;
            uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                               ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1722._12_2_)
                       >> 5;
            uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                               ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1722._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
            in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
            in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
            in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
            in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
            in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
            in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
            in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
            in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348)
            ;
            in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349)
            ;
            in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350)
            ;
            in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351)
            ;
            in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352)
            ;
            auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
            *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
            uVar305 = uVar305 + dy;
            uVar311 = uVar311 + 1;
            lVar300 = lVar300 + 0x10;
          } while (uVar311 != 8);
          uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
          auVar1416._0_9_ = (unkuint9)uVar305 << 0x30;
          uVar241 = CONCAT24(uStack_fee,uVar305);
          auVar265._6_5_ = 0;
          auVar265._0_6_ = uVar241;
          auVar1417._0_11_ = auVar265 << 0x30;
          auVar285._8_5_ = 0;
          auVar285._0_8_ = CONCAT26(uStack_fec,uVar241);
          auVar1418._0_13_ = auVar285 << 0x30;
          uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
          auVar1618._0_9_ = (unkuint9)uVar308 << 0x30;
          uVar242 = CONCAT24(uStack_fce,uVar308);
          auVar266._6_5_ = 0;
          auVar266._0_6_ = uVar242;
          auVar1619._0_11_ = auVar266 << 0x30;
          auVar286._8_5_ = 0;
          auVar286._0_8_ = CONCAT26(uStack_fcc,uVar242);
          auVar1620._0_13_ = auVar286 << 0x30;
          auVar769._0_14_ = local_1038._0_14_;
          auVar769[0xe] = local_1038[7];
          auVar769[0xf] = local_1028[7];
          auVar768._14_2_ = auVar769._14_2_;
          auVar768._0_13_ = local_1038._0_13_;
          auVar768[0xd] = local_1028[6];
          auVar767._13_3_ = auVar768._13_3_;
          auVar767._0_12_ = local_1038._0_12_;
          auVar767[0xc] = local_1038[6];
          auVar766._12_4_ = auVar767._12_4_;
          auVar766._0_11_ = local_1038._0_11_;
          auVar766[0xb] = local_1028[5];
          auVar765._11_5_ = auVar766._11_5_;
          auVar765._0_10_ = local_1038._0_10_;
          auVar765[10] = local_1038[5];
          auVar764._10_6_ = auVar765._10_6_;
          auVar764._0_9_ = local_1038._0_9_;
          auVar764[9] = local_1028[4];
          auVar763._9_7_ = auVar764._9_7_;
          auVar763._0_8_ = local_1038._0_8_;
          auVar763[8] = local_1038[4];
          Var17 = CONCAT91(CONCAT81(auVar763._8_8_,local_1028[3]),local_1038[3]);
          auVar229._2_10_ = Var17;
          auVar229[1] = local_1028[2];
          auVar229[0] = local_1038[2];
          auVar762._4_12_ = auVar229;
          auVar762[3] = local_1028[1];
          auVar762[2] = local_1038[1];
          auVar762._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
          auVar1513._0_14_ = local_1018._0_14_;
          auVar1513[0xe] = local_1018[7];
          auVar1513[0xf] = local_1008[7];
          auVar1512._14_2_ = auVar1513._14_2_;
          auVar1512._0_13_ = local_1018._0_13_;
          auVar1512[0xd] = local_1008[6];
          auVar1511._13_3_ = auVar1512._13_3_;
          auVar1511._0_12_ = local_1018._0_12_;
          auVar1511[0xc] = local_1018[6];
          auVar1510._12_4_ = auVar1511._12_4_;
          auVar1510._0_11_ = local_1018._0_11_;
          auVar1510[0xb] = local_1008[5];
          auVar1509._11_5_ = auVar1510._11_5_;
          auVar1509._0_10_ = local_1018._0_10_;
          auVar1509[10] = local_1018[5];
          auVar1508._10_6_ = auVar1509._10_6_;
          auVar1508._0_9_ = local_1018._0_9_;
          auVar1508[9] = local_1008[4];
          auVar1507._9_7_ = auVar1508._9_7_;
          auVar1507._0_8_ = local_1018._0_8_;
          auVar1507[8] = local_1018[4];
          Var19 = CONCAT91(CONCAT81(auVar1507._8_8_,local_1008[3]),local_1018[3]);
          auVar230._2_10_ = Var19;
          auVar230[1] = local_1008[2];
          auVar230[0] = local_1018[2];
          auVar1418._14_2_ =
               (undefined2)
               (CONCAT19(local_fe8._7_1_,
                         CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >>
               0x40);
          auVar1418[0xd] = local_fe8._6_1_;
          Var243 = CONCAT37(auVar1418._13_3_,CONCAT16((char)uStack_ff2,uVar241));
          auVar1417._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
          auVar1417[0xb] = local_fe8._5_1_;
          Var162 = CONCAT55(auVar1417._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
          auVar1416._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
          auVar1416[9] = local_fe8._4_1_;
          Var158 = CONCAT73(auVar1416._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
          Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                           (char)((ushort)uStack_ff6 >> 8));
          auVar231._2_10_ = Var21;
          auVar231[1] = local_fe8._2_1_;
          auVar231[0] = (char)uStack_ff6;
          auVar1415._4_12_ = auVar231;
          auVar1415[3] = local_fe8._1_1_;
          uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
          auVar1415[2] = uStack_1624;
          auVar1415._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
          auVar1620._14_2_ =
               (undefined2)
               (CONCAT19(local_fc8._7_1_,
                         CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >>
               0x40);
          auVar1620[0xd] = local_fc8._6_1_;
          Var244 = CONCAT37(auVar1620._13_3_,CONCAT16((char)uStack_fd2,uVar242));
          auVar1619._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
          auVar1619[0xb] = local_fc8._5_1_;
          Var164 = CONCAT55(auVar1619._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar308));
          auVar1618._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
          auVar1618[9] = local_fc8._4_1_;
          Var160 = CONCAT73(auVar1618._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
          Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                           (char)((ushort)uStack_fd6 >> 8));
          auVar232._2_10_ = Var23;
          auVar232[1] = local_fc8._2_1_;
          auVar232[0] = (char)uStack_fd6;
          uVar314 = CONCAT11(local_1028[10],local_1038[10]);
          auVar490._12_4_ = CONCAT13(local_1028[0xb],CONCAT12(local_1038[0xb],uVar314));
          uVar315 = CONCAT15(local_1028[0xc],CONCAT14(local_1038[0xc],auVar490._12_4_));
          uVar316 = CONCAT17(local_1028[0xd],CONCAT16(local_1038[0xd],uVar315));
          Var245 = CONCAT19(local_1028[0xe],CONCAT18(local_1038[0xe],uVar316));
          auVar295[10] = local_1038[0xf];
          auVar295._0_10_ = Var245;
          auVar295[0xb] = local_1028[0xf];
          uVar503 = CONCAT11(local_1008[10],local_1018[10]);
          auVar926._12_4_ = CONCAT13(local_1008[0xb],CONCAT12(local_1018[0xb],uVar503));
          uVar504 = CONCAT15(local_1008[0xc],CONCAT14(local_1018[0xc],auVar926._12_4_));
          uVar505 = CONCAT17(local_1008[0xd],CONCAT16(local_1018[0xd],uVar504));
          Var246 = CONCAT19(local_1008[0xe],CONCAT18(local_1018[0xe],uVar505));
          auVar296[10] = local_1018[0xf];
          auVar296._0_10_ = Var246;
          auVar296[0xb] = local_1008[0xf];
          uVar780 = CONCAT11(uStack_fe0._2_1_,(char)uStack_fee);
          uVar781 = CONCAT13(uStack_fe0._3_1_,CONCAT12((char)((ushort)uStack_fee >> 8),uVar780));
          uVar782 = CONCAT15(uStack_fe0._4_1_,CONCAT14((char)uStack_fec,uVar781));
          uVar783 = CONCAT17(uStack_fe0._5_1_,CONCAT16((char)((ushort)uStack_fec >> 8),uVar782));
          Var258 = CONCAT19(uStack_fe0._6_1_,CONCAT18((char)uStack_fea,uVar783));
          auVar297[10] = (char)((ushort)uStack_fea >> 8);
          auVar297._0_10_ = Var258;
          auVar297[0xb] = uStack_fe0._7_1_;
          uVar935 = CONCAT11(uStack_fc0._2_1_,(char)uStack_fce);
          uVar936 = CONCAT13(uStack_fc0._3_1_,CONCAT12((char)((ushort)uStack_fce >> 8),uVar935));
          uVar937 = CONCAT15(uStack_fc0._4_1_,CONCAT14((char)uStack_fcc,uVar936));
          uVar938 = CONCAT17(uStack_fc0._5_1_,CONCAT16((char)((ushort)uStack_fcc >> 8),uVar937));
          Var260 = CONCAT19(uStack_fc0._6_1_,CONCAT18((char)uStack_fca,uVar938));
          auVar298[10] = (char)((ushort)uStack_fca >> 8);
          auVar298._0_10_ = Var260;
          auVar298[0xb] = uStack_fc0._7_1_;
          auVar1754._0_12_ = auVar762._0_12_;
          auVar1754._12_2_ = (short)Var17;
          auVar1754._14_2_ = (short)Var19;
          auVar1753._12_4_ = auVar1754._12_4_;
          auVar1753._0_10_ = auVar762._0_10_;
          auVar1753._10_2_ = auVar230._0_2_;
          auVar1752._10_6_ = auVar1753._10_6_;
          auVar1752._0_8_ = auVar762._0_8_;
          auVar1752._8_2_ = auVar229._0_2_;
          auVar1823._0_12_ = auVar1415._0_12_;
          auVar1823._12_2_ = (short)Var21;
          auVar1823._14_2_ = (short)Var23;
          auVar1822._12_4_ = auVar1823._12_4_;
          auVar1822._0_10_ = auVar1415._0_10_;
          auVar1822._10_2_ = auVar232._0_2_;
          auVar1821._10_6_ = auVar1822._10_6_;
          auVar1821._0_8_ = auVar1415._0_8_;
          auVar1821._8_2_ = auVar231._0_2_;
          auVar293._8_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
          auVar293._0_8_ = uVar316;
          auVar293._10_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
          auVar291._6_2_ = uVar503;
          auVar291._0_6_ = uVar315;
          auVar291._8_4_ = auVar293._8_4_;
          auVar287._4_2_ = uVar314;
          auVar287._0_4_ = auVar490._12_4_;
          auVar287._6_6_ = auVar291._6_6_;
          auVar294._8_2_ = (short)((uint)uVar781 >> 0x10);
          auVar294._0_8_ = uVar783;
          auVar294._10_2_ = (short)((uint)uVar936 >> 0x10);
          auVar292._6_2_ = uVar935;
          auVar292._0_6_ = uVar782;
          auVar292._8_4_ = auVar294._8_4_;
          auVar288._4_2_ = uVar780;
          auVar288._0_4_ = uVar781;
          auVar288._6_6_ = auVar292._6_6_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar1415._0_2_),
                        CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar762._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_fc0,(char)uStack_fd0),
                                 CONCAT11((undefined1)uStack_fe0,(char)uStack_ff0)),
                        CONCAT22(CONCAT11(local_1008[8],local_1018[8]),
                                 CONCAT11(local_1028[8],local_1038[8])));
          local_1628 = local_1038[1];
          uStack_1627 = local_1028[1];
          uStack_1626 = local_1018[1];
          uStack_1625 = local_1008[1];
          uStack_1623 = local_fe8._1_1_;
          uStack_1622 = (char)((ushort)local_fd8 >> 8);
          uStack_1621 = local_fc8._1_1_;
          uStack_1620 = local_1038[9];
          uStack_161f = local_1028[9];
          uStack_161e = local_1018[9];
          uStack_161d = local_1008[9];
          uStack_161c = (char)((ushort)uStack_ff0 >> 8);
          uStack_161b = uStack_fe0._1_1_;
          uStack_161a = (char)((ushort)uStack_fd0 >> 8);
          uStack_1619 = uStack_fc0._1_1_;
          local_1618 = auVar1752._8_4_;
          uStack_1614 = auVar1821._8_4_;
          uStack_1610 = auVar287._4_4_;
          uStack_160c = auVar288._4_4_;
          local_1608._8_4_ = auVar1753._12_4_;
          local_1608._12_4_ = auVar1822._12_4_;
          auVar926._12_4_ = CONCAT22(auVar1507._8_2_,auVar763._8_2_);
          auVar532._0_8_ = CONCAT26(auVar1509._10_2_,CONCAT24(auVar765._10_2_,auVar926._12_4_));
          auVar532._8_2_ = auVar767._12_2_;
          auVar532._10_2_ = auVar1511._12_2_;
          auVar770._12_2_ = auVar768._14_2_;
          auVar770._0_12_ = auVar532;
          auVar770._14_2_ = auVar1512._14_2_;
          uVar936 = CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
          auVar1354._0_8_ =
               CONCAT26((short)((unkuint10)Var164 >> 0x20),
                        CONCAT24((short)((unkuint10)Var162 >> 0x20),uVar936));
          auVar1354._8_2_ = (short)((unkuint10)Var243 >> 0x30);
          auVar1354._10_2_ = (short)((unkuint10)Var244 >> 0x30);
          auVar1419._12_2_ = auVar1418._14_2_;
          auVar1419._0_12_ = auVar1354;
          auVar1419._14_2_ = auVar1620._14_2_;
          auVar490._12_4_ =
               CONCAT22((short)((uint6)uVar504 >> 0x20),(short)((uint6)uVar315 >> 0x20));
          auVar323._0_8_ =
               CONCAT26((short)((ulong)uVar505 >> 0x30),
                        CONCAT24((short)((ulong)uVar316 >> 0x30),auVar490._12_4_));
          auVar323._8_2_ = (short)((unkuint10)Var245 >> 0x40);
          auVar323._10_2_ = (short)((unkuint10)Var246 >> 0x40);
          auVar492._12_2_ = auVar295._10_2_;
          auVar492._0_12_ = auVar323;
          auVar492._14_2_ = auVar296._10_2_;
          uVar781 = CONCAT22((short)((uint6)uVar937 >> 0x20),(short)((uint6)uVar782 >> 0x20));
          auVar801._0_8_ =
               CONCAT26((short)((ulong)uVar938 >> 0x30),
                        CONCAT24((short)((ulong)uVar783 >> 0x30),uVar781));
          auVar801._8_2_ = (short)((unkuint10)Var258 >> 0x40);
          auVar801._10_2_ = (short)((unkuint10)Var260 >> 0x40);
          auVar928._12_2_ = auVar297._10_2_;
          auVar928._0_12_ = auVar801;
          auVar928._14_2_ = auVar298._10_2_;
          auVar1159._8_4_ = (int)((ulong)auVar532._0_8_ >> 0x20);
          auVar1159._0_8_ = auVar532._0_8_;
          auVar1159._12_4_ = (int)((ulong)auVar1354._0_8_ >> 0x20);
          auVar1337._8_4_ = (int)((ulong)auVar323._0_8_ >> 0x20);
          auVar1337._0_8_ = auVar323._0_8_;
          auVar1337._12_4_ = (int)((ulong)auVar801._0_8_ >> 0x20);
          local_15f8 = CONCAT44(uVar936,auVar926._12_4_);
          uStack_15f0 = CONCAT44(uVar781,auVar490._12_4_);
          local_15e8 = auVar1159._8_8_;
          uStack_15e0 = auVar1337._8_8_;
          local_15d8 = CONCAT44(auVar1354._8_4_,auVar532._8_4_);
          uStack_15d0 = CONCAT44(auVar801._8_4_,auVar323._8_4_);
          local_15c8._8_4_ = auVar770._12_4_;
          local_15c8._12_4_ = auVar1419._12_4_;
          local_15b8 = CONCAT44(auVar928._12_4_,auVar492._12_4_);
          lVar300 = 0;
          do {
            *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar300);
            *(undefined8 *)(dst + stride * 8) = *(undefined8 *)((long)local_1638 + lVar300 + 8);
            dst = dst + stride;
            lVar300 = lVar300 + 0x10;
          } while (lVar300 != 0x80);
          return;
        default:
          return;
        case 3:
          auVar546 = pshufb(ZEXT116(left[0x2f]),(undefined1  [16])0x0);
          lVar300 = 0;
          auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
          lVar304 = 0;
          uVar305 = dy;
          do {
            iVar307 = (int)uVar305 >> 6;
            lVar306 = lVar300;
            if (iVar307 < 0x2f) {
              uVar308 = -(iVar307 + -0x2f);
              auVar332 = ZEXT416(uVar305 >> 1 & 0x1f);
              auVar332 = pshuflw(auVar332,auVar332,0);
              lVar310 = 0;
              lVar306 = 0;
              do {
                auVar1262 = auVar546;
                if (lVar306 < (int)uVar308) {
                  auVar1356 = *(undefined1 (*) [16])(left + lVar306 + iVar307);
                  auVar1522 = *(undefined1 (*) [16])(left + lVar306 + (long)iVar307 + 1);
                  auVar1198 = pmovzxbw(auVar546,auVar1356);
                  auVar1523 = pmovzxbw(in_XMM7,auVar1522);
                  auVar1199 = psllw(auVar1198,5);
                  sVar313 = auVar332._0_2_;
                  in_XMM7._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * sVar313;
                  sVar502 = auVar332._2_2_;
                  in_XMM7._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * sVar502;
                  in_XMM7._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * sVar313;
                  in_XMM7._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * sVar502;
                  in_XMM7._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * sVar313;
                  in_XMM7._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * sVar502;
                  in_XMM7._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * sVar313;
                  in_XMM7._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * sVar502;
                  uVar1169 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM7._0_2_) >> 5;
                  uVar1346 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM7._2_2_) >> 5;
                  uVar1347 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM7._4_2_) >> 5;
                  uVar1348 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM7._6_2_) >> 5;
                  uVar1349 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM7._8_2_) >> 5;
                  uVar1350 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM7._10_2_) >> 5;
                  uVar1351 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM7._12_2_) >> 5;
                  uVar1352 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM7._14_2_) >> 5;
                  auVar1381._0_2_ = CONCAT11(0,auVar1356[8]);
                  auVar1381[2] = auVar1356[9];
                  auVar1381[3] = 0;
                  auVar1381[4] = auVar1356[10];
                  auVar1381[5] = 0;
                  auVar1381[6] = auVar1356[0xb];
                  auVar1381[7] = 0;
                  auVar1381[8] = auVar1356[0xc];
                  auVar1381[9] = 0;
                  auVar1381[10] = auVar1356[0xd];
                  auVar1381[0xb] = 0;
                  auVar1381[0xc] = auVar1356[0xe];
                  auVar1381[0xd] = 0;
                  auVar1381[0xe] = auVar1356[0xf];
                  auVar1381[0xf] = 0;
                  auVar1198 = psllw(auVar1381,5);
                  uVar1353 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                                     (auVar1522[8] - auVar1381._0_2_) * sVar313) >> 5;
                  uVar1423 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                                     ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * sVar502) >> 5;
                  uVar1424 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                                     ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * sVar313) >> 5
                  ;
                  uVar1425 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                                     ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * sVar502) >>
                             5;
                  uVar1426 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                                     ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * sVar313) >>
                             5;
                  uVar1427 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                                     ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * sVar502) >>
                             5;
                  uVar1428 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                                     ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * sVar313) >>
                             5;
                  uVar1429 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                                     ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * sVar502) >>
                             5;
                  auVar1262[1] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 -
                                 (0xff < uVar1346);
                  auVar1262[0] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 -
                                 (0xff < uVar1169);
                  auVar1262[2] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 -
                                 (0xff < uVar1347);
                  auVar1262[3] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 -
                                 (0xff < uVar1348);
                  auVar1262[4] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 -
                                 (0xff < uVar1349);
                  auVar1262[5] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 -
                                 (0xff < uVar1350);
                  auVar1262[6] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 -
                                 (0xff < uVar1351);
                  auVar1262[7] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 -
                                 (0xff < uVar1352);
                  auVar1262[8] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 -
                                 (0xff < uVar1353);
                  auVar1262[9] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 -
                                 (0xff < uVar1423);
                  auVar1262[10] =
                       (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
                  auVar1262[0xb] =
                       (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
                  auVar1262[0xc] =
                       (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
                  auVar1262[0xd] =
                       (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
                  auVar1262[0xe] =
                       (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
                  auVar1262[0xf] =
                       (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
                }
                *(undefined1 (*) [16])((long)local_1638 + lVar310) = auVar1262;
                lVar310 = lVar310 + 0x10;
                lVar306 = 0x10;
              } while (lVar310 != 0x20);
              if (0x1f < uVar308) {
                uVar308 = 0x20;
              }
              auVar3._8_8_ = local_1638[1];
              auVar3._0_8_ = local_1638[0];
              auVar332 = pblendvb(auVar546,auVar3,
                                  *(undefined1 (*) [16])(Mask[0][0] + (uVar308 << 4)));
              auVar8[1] = uStack_1627;
              auVar8[0] = local_1628;
              auVar8[2] = uStack_1626;
              auVar8[3] = uStack_1625;
              auVar8[4] = uStack_1624;
              auVar8[5] = uStack_1623;
              auVar8[6] = uStack_1622;
              auVar8[7] = uStack_1621;
              auVar8[8] = uStack_1620;
              auVar8[9] = uStack_161f;
              auVar8[10] = uStack_161e;
              auVar8[0xb] = uStack_161d;
              auVar8[0xc] = uStack_161c;
              auVar8[0xd] = uStack_161b;
              auVar8[0xe] = uStack_161a;
              auVar8[0xf] = uStack_1619;
              auVar1356 = pblendvb(auVar546,auVar8,
                                   *(undefined1 (*) [16])(Mask[1][0] + (uVar308 << 4)));
              *(undefined1 (*) [16])(local_1038 + lVar304 * 0x10) = auVar332;
              *(undefined1 (*) [16])(&local_1438 + lVar304 * 4) = auVar1356;
              uVar305 = uVar305 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar306) = auVar546;
                *(undefined1 (*) [16])((long)&local_1438 + lVar306) = auVar546;
                lVar306 = lVar306 + 0x10;
              } while (lVar306 != 0x100);
            }
            if (0x2e < iVar307) break;
            lVar304 = lVar304 + 1;
            lVar300 = lVar300 + 0x10;
          } while (lVar304 != 0x10);
          auVar1072._0_14_ = local_1038._0_14_;
          auVar1072[0xe] = local_1038[7];
          auVar1072[0xf] = local_1028[7];
          auVar1071._14_2_ = auVar1072._14_2_;
          auVar1071._0_13_ = local_1038._0_13_;
          auVar1071[0xd] = local_1028[6];
          auVar1070._13_3_ = auVar1071._13_3_;
          auVar1070._0_12_ = local_1038._0_12_;
          auVar1070[0xc] = local_1038[6];
          auVar1069._12_4_ = auVar1070._12_4_;
          auVar1069._0_11_ = local_1038._0_11_;
          auVar1069[0xb] = local_1028[5];
          auVar1068._11_5_ = auVar1069._11_5_;
          auVar1068._0_10_ = local_1038._0_10_;
          auVar1068[10] = local_1038[5];
          auVar1067._10_6_ = auVar1068._10_6_;
          auVar1067._0_9_ = local_1038._0_9_;
          auVar1067[9] = local_1028[4];
          auVar1066._9_7_ = auVar1067._9_7_;
          auVar1066._0_8_ = local_1038._0_8_;
          auVar1066[8] = local_1038[4];
          Var17 = CONCAT91(CONCAT81(auVar1066._8_8_,local_1028[3]),local_1038[3]);
          auVar125._2_10_ = Var17;
          auVar125[1] = local_1028[2];
          auVar125[0] = local_1038[2];
          auVar1065._4_12_ = auVar125;
          auVar1065[3] = local_1028[1];
          auVar1065[2] = local_1038[1];
          auVar1065._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
          auVar2235._0_14_ = local_1018._0_14_;
          auVar2235[0xe] = local_1018[7];
          auVar2235[0xf] = local_1008[7];
          auVar2234._14_2_ = auVar2235._14_2_;
          auVar2234._0_13_ = local_1018._0_13_;
          auVar2234[0xd] = local_1008[6];
          auVar2233._13_3_ = auVar2234._13_3_;
          auVar2233._0_12_ = local_1018._0_12_;
          auVar2233[0xc] = local_1018[6];
          auVar2232._12_4_ = auVar2233._12_4_;
          auVar2232._0_11_ = local_1018._0_11_;
          auVar2232[0xb] = local_1008[5];
          auVar2231._11_5_ = auVar2232._11_5_;
          auVar2231._0_10_ = local_1018._0_10_;
          auVar2231[10] = local_1018[5];
          auVar2230._10_6_ = auVar2231._10_6_;
          auVar2230._0_9_ = local_1018._0_9_;
          auVar2230[9] = local_1008[4];
          auVar2229._9_7_ = auVar2230._9_7_;
          auVar2229._0_8_ = local_1018._0_8_;
          auVar2229[8] = local_1018[4];
          Var19 = CONCAT91(CONCAT81(auVar2229._8_8_,local_1008[3]),local_1018[3]);
          auVar126._2_10_ = Var19;
          auVar126[1] = local_1008[2];
          auVar126[0] = local_1018[2];
          uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
          auVar2098._0_9_ = (unkuint9)uVar305 << 0x30;
          uVar241 = CONCAT24(uStack_fee,uVar305);
          auVar255._6_5_ = 0;
          auVar255._0_6_ = uVar241;
          auVar2099._0_11_ = auVar255 << 0x30;
          auVar277._8_5_ = 0;
          auVar277._0_8_ = CONCAT26(uStack_fec,uVar241);
          auVar2100._0_13_ = auVar277 << 0x30;
          auVar2100._14_2_ =
               (undefined2)
               (CONCAT19(local_fe8._7_1_,
                         CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >>
               0x40);
          auVar2100[0xd] = local_fe8._6_1_;
          Var243 = CONCAT37(auVar2100._13_3_,CONCAT16((char)uStack_ff2,uVar241));
          auVar2099._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
          auVar2099[0xb] = local_fe8._5_1_;
          Var162 = CONCAT55(auVar2099._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
          auVar2098._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
          auVar2098[9] = local_fe8._4_1_;
          Var158 = CONCAT73(auVar2098._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
          Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                           (char)((ushort)uStack_ff6 >> 8));
          auVar127._2_10_ = Var21;
          auVar127[1] = local_fe8._2_1_;
          auVar127[0] = (char)uStack_ff6;
          auVar2097._4_12_ = auVar127;
          auVar2097[3] = local_fe8._1_1_;
          uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
          auVar2097[2] = uStack_1624;
          auVar2097._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
          uVar305 = CONCAT22(uStack_fd0,uStack_fd2);
          auVar2163._0_9_ = (unkuint9)uVar305 << 0x30;
          uVar241 = CONCAT24(uStack_fce,uVar305);
          auVar256._6_5_ = 0;
          auVar256._0_6_ = uVar241;
          auVar2164._0_11_ = auVar256 << 0x30;
          auVar278._8_5_ = 0;
          auVar278._0_8_ = CONCAT26(uStack_fcc,uVar241);
          auVar2165._0_13_ = auVar278 << 0x30;
          auVar2165._14_2_ =
               (undefined2)
               (CONCAT19(local_fc8._7_1_,
                         CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar241))) >>
               0x40);
          auVar2165[0xd] = local_fc8._6_1_;
          Var244 = CONCAT37(auVar2165._13_3_,CONCAT16((char)uStack_fd2,uVar241));
          auVar2164._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
          auVar2164[0xb] = local_fc8._5_1_;
          Var164 = CONCAT55(auVar2164._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar305));
          auVar2163._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
          auVar2163[9] = local_fc8._4_1_;
          Var160 = CONCAT73(auVar2163._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
          Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                           (char)((ushort)uStack_fd6 >> 8));
          auVar128._2_10_ = Var23;
          auVar128[1] = local_fc8._2_1_;
          auVar128[0] = (char)uStack_fd6;
          auVar1962._0_12_ = auVar1065._0_12_;
          auVar1962._12_2_ = (short)Var17;
          auVar1962._14_2_ = (short)Var19;
          auVar1961._12_4_ = auVar1962._12_4_;
          auVar1961._0_10_ = auVar1065._0_10_;
          auVar1961._10_2_ = auVar126._0_2_;
          auVar1960._10_6_ = auVar1961._10_6_;
          auVar1960._0_8_ = auVar1065._0_8_;
          auVar1960._8_2_ = auVar125._0_2_;
          auVar656._0_12_ = auVar2097._0_12_;
          auVar656._12_2_ = (short)Var21;
          auVar656._14_2_ = (short)Var23;
          auVar655._12_4_ = auVar656._12_4_;
          auVar655._0_10_ = auVar2097._0_10_;
          auVar655._10_2_ = auVar128._0_2_;
          auVar654._10_6_ = auVar655._10_6_;
          auVar654._0_8_ = auVar2097._0_8_;
          auVar654._8_2_ = auVar127._0_2_;
          auVar1270._0_14_ = local_fb8._0_14_;
          auVar1270[0xe] = local_fb8[7];
          auVar1270[0xf] = local_fa8[7];
          auVar1269._14_2_ = auVar1270._14_2_;
          auVar1269._0_13_ = local_fb8._0_13_;
          auVar1269[0xd] = local_fa8[6];
          auVar1268._13_3_ = auVar1269._13_3_;
          auVar1268._0_12_ = local_fb8._0_12_;
          auVar1268[0xc] = local_fb8[6];
          auVar1267._12_4_ = auVar1268._12_4_;
          auVar1267._0_11_ = local_fb8._0_11_;
          auVar1267[0xb] = local_fa8[5];
          auVar1266._11_5_ = auVar1267._11_5_;
          auVar1266._0_10_ = local_fb8._0_10_;
          auVar1266[10] = local_fb8[5];
          auVar1265._10_6_ = auVar1266._10_6_;
          auVar1265._0_9_ = local_fb8._0_9_;
          auVar1265[9] = local_fa8[4];
          auVar1264._9_7_ = auVar1265._9_7_;
          auVar1264._0_8_ = local_fb8._0_8_;
          auVar1264[8] = local_fb8[4];
          Var17 = CONCAT91(CONCAT81(auVar1264._8_8_,local_fa8[3]),local_fb8[3]);
          auVar129._2_10_ = Var17;
          auVar129[1] = local_fa8[2];
          auVar129[0] = local_fb8[2];
          auVar1263._4_12_ = auVar129;
          auVar1263[3] = local_fa8[1];
          auVar1263[2] = local_fb8[1];
          auVar1263._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
          auVar1575._0_14_ = local_f98._0_14_;
          auVar1575[0xe] = local_f98[7];
          auVar1575[0xf] = local_f88[7];
          auVar1574._14_2_ = auVar1575._14_2_;
          auVar1574._0_13_ = local_f98._0_13_;
          auVar1574[0xd] = local_f88[6];
          auVar1573._13_3_ = auVar1574._13_3_;
          auVar1573._0_12_ = local_f98._0_12_;
          auVar1573[0xc] = local_f98[6];
          auVar1572._12_4_ = auVar1573._12_4_;
          auVar1572._0_11_ = local_f98._0_11_;
          auVar1572[0xb] = local_f88[5];
          auVar1571._11_5_ = auVar1572._11_5_;
          auVar1571._0_10_ = local_f98._0_10_;
          auVar1571[10] = local_f98[5];
          auVar1570._10_6_ = auVar1571._10_6_;
          auVar1570._0_9_ = local_f98._0_9_;
          auVar1570[9] = local_f88[4];
          auVar1569._9_7_ = auVar1570._9_7_;
          auVar1569._0_8_ = local_f98._0_8_;
          auVar1569[8] = local_f98[4];
          Var19 = CONCAT91(CONCAT81(auVar1569._8_8_,local_f88[3]),local_f98[3]);
          auVar130._2_10_ = Var19;
          auVar130[1] = local_f88[2];
          auVar130[0] = local_f98[2];
          auVar1708._0_14_ = local_f78._0_14_;
          auVar1708[0xe] = local_f78[7];
          auVar1708[0xf] = local_f68._7_1_;
          auVar1707._14_2_ = auVar1708._14_2_;
          auVar1707._0_13_ = local_f78._0_13_;
          auVar1707[0xd] = local_f68._6_1_;
          auVar1706._13_3_ = auVar1707._13_3_;
          auVar1706._0_12_ = local_f78._0_12_;
          auVar1706[0xc] = local_f78[6];
          auVar1705._12_4_ = auVar1706._12_4_;
          auVar1705._0_11_ = local_f78._0_11_;
          auVar1705[0xb] = local_f68._5_1_;
          auVar1704._11_5_ = auVar1705._11_5_;
          auVar1704._0_10_ = local_f78._0_10_;
          auVar1704[10] = local_f78[5];
          auVar1703._10_6_ = auVar1704._10_6_;
          auVar1703._0_9_ = local_f78._0_9_;
          auVar1703[9] = local_f68._4_1_;
          auVar1702._9_7_ = auVar1703._9_7_;
          auVar1702._0_8_ = local_f78._0_8_;
          auVar1702[8] = local_f78[4];
          Var21 = CONCAT91(CONCAT81(auVar1702._8_8_,local_f68._3_1_),local_f78[3]);
          auVar131._2_10_ = Var21;
          auVar131[1] = local_f68._2_1_;
          auVar131[0] = local_f78[2];
          auVar1701._4_12_ = auVar131;
          auVar1701[3] = local_f68._1_1_;
          auVar1701[2] = local_f78[1];
          auVar1701._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
          auVar1875._0_14_ = local_f58._0_14_;
          auVar1875[0xe] = local_f58[7];
          auVar1875[0xf] = local_f48._7_1_;
          auVar1874._14_2_ = auVar1875._14_2_;
          auVar1874._0_13_ = local_f58._0_13_;
          auVar1874[0xd] = local_f48._6_1_;
          auVar1873._13_3_ = auVar1874._13_3_;
          auVar1873._0_12_ = local_f58._0_12_;
          auVar1873[0xc] = local_f58[6];
          auVar1872._12_4_ = auVar1873._12_4_;
          auVar1872._0_11_ = local_f58._0_11_;
          auVar1872[0xb] = local_f48._5_1_;
          auVar1871._11_5_ = auVar1872._11_5_;
          auVar1871._0_10_ = local_f58._0_10_;
          auVar1871[10] = local_f58[5];
          auVar1870._10_6_ = auVar1871._10_6_;
          auVar1870._0_9_ = local_f58._0_9_;
          auVar1870[9] = local_f48._4_1_;
          auVar1869._9_7_ = auVar1870._9_7_;
          auVar1869._0_8_ = local_f58._0_8_;
          auVar1869[8] = local_f58[4];
          Var23 = CONCAT91(CONCAT81(auVar1869._8_8_,local_f48._3_1_),local_f58[3]);
          auVar132._2_10_ = Var23;
          auVar132[1] = local_f48._2_1_;
          auVar132[0] = local_f58[2];
          auVar659._0_12_ = auVar1263._0_12_;
          auVar659._12_2_ = (short)Var17;
          auVar659._14_2_ = (short)Var19;
          auVar658._12_4_ = auVar659._12_4_;
          auVar658._0_10_ = auVar1263._0_10_;
          auVar658._10_2_ = auVar130._0_2_;
          auVar657._10_6_ = auVar658._10_6_;
          auVar657._0_8_ = auVar1263._0_8_;
          auVar657._8_2_ = auVar129._0_2_;
          auVar1384._0_12_ = auVar1701._0_12_;
          auVar1384._12_2_ = (short)Var21;
          auVar1384._14_2_ = (short)Var23;
          auVar1383._12_4_ = auVar1384._12_4_;
          auVar1383._0_10_ = auVar1701._0_10_;
          auVar1383._10_2_ = auVar132._0_2_;
          auVar1382._10_6_ = auVar1383._10_6_;
          auVar1382._0_8_ = auVar1701._0_8_;
          auVar1382._8_2_ = auVar131._0_2_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar2097._0_2_),
                        CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar1065._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1701._0_2_),
                        CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1263._0_2_));
          local_1628 = local_1038[1];
          uStack_1627 = local_1028[1];
          uStack_1626 = local_1018[1];
          uStack_1625 = local_1008[1];
          uStack_1623 = local_fe8._1_1_;
          uStack_1622 = (char)((ushort)local_fd8 >> 8);
          uStack_1621 = local_fc8._1_1_;
          uStack_1620 = local_fb8[1];
          uStack_161f = local_fa8[1];
          uStack_161e = local_f98[1];
          uStack_161d = local_f88[1];
          uStack_161c = local_f78[1];
          uStack_161b = local_f68._1_1_;
          uStack_161a = local_f58[1];
          uStack_1619 = local_f48._1_1_;
          local_1618 = auVar1960._8_4_;
          uStack_1614 = auVar654._8_4_;
          uStack_1610 = auVar657._8_4_;
          uStack_160c = auVar1382._8_4_;
          local_1608._8_4_ = auVar1961._12_4_;
          local_1608._12_4_ = auVar655._12_4_;
          auVar490._12_4_ = CONCAT22(auVar2229._8_2_,auVar1066._8_2_);
          auVar952._0_8_ = CONCAT26(auVar2231._10_2_,CONCAT24(auVar1068._10_2_,auVar490._12_4_));
          auVar952._8_2_ = auVar1070._12_2_;
          auVar952._10_2_ = auVar2233._12_2_;
          auVar1073._12_2_ = auVar1071._14_2_;
          auVar1073._0_12_ = auVar952;
          auVar1073._14_2_ = auVar2234._14_2_;
          uVar936 = CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
          auVar2044._0_8_ =
               CONCAT26((short)((unkuint10)Var164 >> 0x20),
                        CONCAT24((short)((unkuint10)Var162 >> 0x20),uVar936));
          auVar2044._8_2_ = (short)((unkuint10)Var243 >> 0x30);
          auVar2044._10_2_ = (short)((unkuint10)Var244 >> 0x30);
          auVar2101._12_2_ = auVar2100._14_2_;
          auVar2101._0_12_ = auVar2044;
          auVar2101._14_2_ = auVar2165._14_2_;
          auVar926._12_4_ = CONCAT22(auVar1569._8_2_,auVar1264._8_2_);
          auVar1180._0_8_ = CONCAT26(auVar1571._10_2_,CONCAT24(auVar1266._10_2_,auVar926._12_4_));
          auVar1180._8_2_ = auVar1268._12_2_;
          auVar1180._10_2_ = auVar1573._12_2_;
          uVar781 = CONCAT22(auVar1869._8_2_,auVar1702._8_2_);
          auVar1633._0_8_ = CONCAT26(auVar1871._10_2_,CONCAT24(auVar1704._10_2_,uVar781));
          auVar1633._8_2_ = auVar1706._12_2_;
          auVar1633._10_2_ = auVar1873._12_2_;
          auVar404._8_4_ = (int)((ulong)auVar952._0_8_ >> 0x20);
          auVar404._0_8_ = auVar952._0_8_;
          auVar404._12_4_ = (int)((ulong)auVar2044._0_8_ >> 0x20);
          auVar660._8_4_ = (int)((ulong)auVar1180._0_8_ >> 0x20);
          auVar660._0_8_ = auVar1180._0_8_;
          auVar660._12_4_ = (int)((ulong)auVar1633._0_8_ >> 0x20);
          local_15f8 = CONCAT44(uVar936,auVar490._12_4_);
          uStack_15f0 = CONCAT44(uVar781,auVar926._12_4_);
          local_15e8 = auVar404._8_8_;
          uStack_15e0 = auVar660._8_8_;
          local_15d8 = CONCAT44(auVar2044._8_4_,auVar952._8_4_);
          uStack_15d0 = CONCAT44(auVar1633._8_4_,auVar1180._8_4_);
          local_15c8._8_4_ = auVar1073._12_4_;
          local_15c8._12_4_ = auVar2101._12_4_;
          uVar314 = CONCAT11(local_1028[8],local_1038[8]);
          uVar1431 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar314));
          uVar1432 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1431));
          uVar1433 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1432));
          auVar1446._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1433));
          auVar1446[10] = local_1038[0xd];
          auVar1446[0xb] = local_1028[0xd];
          auVar1460[0xc] = local_1038[0xe];
          auVar1460._0_12_ = auVar1446;
          auVar1460[0xd] = local_1028[0xe];
          auVar1478[0xe] = local_1038[0xf];
          auVar1478._0_14_ = auVar1460;
          auVar1478[0xf] = local_1028[0xf];
          uStack_1640 = local_1018[8];
          uStack_163f = local_1018[9];
          uStack_163e = local_1018[10];
          uStack_163d = local_1018[0xb];
          uStack_163c = local_1018[0xc];
          uStack_163b = local_1018[0xd];
          uStack_163a = local_1018[0xe];
          uStack_1639 = local_1018[0xf];
          auVar490._12_4_ =
               CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
          uVar315 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar490._12_4_));
          uVar316 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar315));
          auVar520._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar316));
          auVar520[10] = uStack_163b;
          auVar520[0xb] = local_1008[0xd];
          auVar541[0xc] = uStack_163a;
          auVar541._0_12_ = auVar520;
          auVar541[0xd] = local_1008[0xe];
          auVar661[0xe] = uStack_1639;
          auVar661._0_14_ = auVar541;
          auVar661[0xf] = local_1008[0xf];
          uStack_1670 = (undefined1)uStack_ff0;
          uStack_166f = (undefined1)((ushort)uStack_ff0 >> 8);
          uStack_166e = (undefined1)uStack_fee;
          uStack_166d = (undefined1)((ushort)uStack_fee >> 8);
          uStack_166c = (undefined1)uStack_fec;
          uStack_166b = (undefined1)((ushort)uStack_fec >> 8);
          uStack_166a = (undefined1)uStack_fea;
          uStack_1669 = (undefined1)((ushort)uStack_fea >> 8);
          auVar926._12_4_ =
               CONCAT13(uStack_fe0._1_1_,
                        CONCAT12(uStack_166f,CONCAT11((undefined1)uStack_fe0,uStack_1670)));
          uVar504 = CONCAT15(uStack_fe0._2_1_,CONCAT14(uStack_166e,auVar926._12_4_));
          uVar505 = CONCAT17(uStack_fe0._3_1_,CONCAT16(uStack_166d,uVar504));
          auVar792._0_10_ = CONCAT19(uStack_fe0._4_1_,CONCAT18(uStack_166c,uVar505));
          auVar792[10] = uStack_166b;
          auVar792[0xb] = uStack_fe0._5_1_;
          auVar810[0xc] = uStack_166a;
          auVar810._0_12_ = auVar792;
          auVar810[0xd] = uStack_fe0._6_1_;
          auVar865[0xe] = uStack_1669;
          auVar865._0_14_ = auVar810;
          auVar865[0xf] = uStack_fe0._7_1_;
          uStack_1690 = (undefined1)uStack_fd0;
          uStack_168f = (undefined1)((ushort)uStack_fd0 >> 8);
          uStack_168e = (undefined1)uStack_fce;
          uStack_168d = (undefined1)((ushort)uStack_fce >> 8);
          uStack_168c = (undefined1)uStack_fcc;
          uStack_168b = (undefined1)((ushort)uStack_fcc >> 8);
          uStack_168a = (undefined1)uStack_fca;
          uStack_1689 = (undefined1)((ushort)uStack_fca >> 8);
          uVar781 = CONCAT13(uStack_fc0._1_1_,
                             CONCAT12(uStack_168f,CONCAT11((undefined1)uStack_fc0,uStack_1690)));
          uVar782 = CONCAT15(uStack_fc0._2_1_,CONCAT14(uStack_168e,uVar781));
          uVar783 = CONCAT17(uStack_fc0._3_1_,CONCAT16(uStack_168d,uVar782));
          auVar953._0_10_ = CONCAT19(uStack_fc0._4_1_,CONCAT18(uStack_168c,uVar783));
          auVar953[10] = uStack_168b;
          auVar953[0xb] = uStack_fc0._5_1_;
          auVar971[0xc] = uStack_168a;
          auVar971._0_12_ = auVar953;
          auVar971[0xd] = uStack_fc0._6_1_;
          auVar1074[0xe] = uStack_1689;
          auVar1074._0_14_ = auVar971;
          auVar1074[0xf] = uStack_fc0._7_1_;
          uVar503 = CONCAT11(local_fa8[8],local_fb8[8]);
          uVar1759 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar503));
          uVar1760 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1759));
          uVar1761 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1760));
          auVar1772._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1761));
          auVar1772[10] = local_fb8[0xd];
          auVar1772[0xb] = local_fa8[0xd];
          auVar1785[0xc] = local_fb8[0xe];
          auVar1785._0_12_ = auVar1772;
          auVar1785[0xd] = local_fa8[0xe];
          auVar1803[0xe] = local_fb8[0xf];
          auVar1803._0_14_ = auVar1785;
          auVar1803[0xf] = local_fa8[0xf];
          uStack_16c0 = local_f98[8];
          uStack_16bf = local_f98[9];
          uStack_16be = local_f98[10];
          uStack_16bd = local_f98[0xb];
          uStack_16bc = local_f98[0xc];
          uStack_16bb = local_f98[0xd];
          uStack_16ba = local_f98[0xe];
          uStack_16b9 = local_f98[0xf];
          uVar936 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
          uVar937 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar936));
          uVar938 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar937));
          auVar1181._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar938));
          auVar1181[10] = uStack_16bb;
          auVar1181[0xb] = local_f88[0xd];
          auVar1194[0xc] = uStack_16ba;
          auVar1194._0_12_ = auVar1181;
          auVar1194[0xd] = local_f88[0xe];
          auVar1271[0xe] = uStack_16b9;
          auVar1271._0_14_ = auVar1194;
          auVar1271[0xf] = local_f88[0xf];
          uVar780 = CONCAT11((undefined1)uStack_f60,local_f78[8]);
          uVar1990 = CONCAT13(uStack_f60._1_1_,CONCAT12(local_f78[9],uVar780));
          uVar1991 = CONCAT15(uStack_f60._2_1_,CONCAT14(local_f78[10],uVar1990));
          uVar1992 = CONCAT17(uStack_f60._3_1_,CONCAT16(local_f78[0xb],uVar1991));
          auVar2003._0_10_ = CONCAT19(uStack_f60._4_1_,CONCAT18(local_f78[0xc],uVar1992));
          auVar2003[10] = local_f78[0xd];
          auVar2003[0xb] = uStack_f60._5_1_;
          auVar2016[0xc] = local_f78[0xe];
          auVar2016._0_12_ = auVar2003;
          auVar2016[0xd] = uStack_f60._6_1_;
          auVar2029[0xe] = local_f78[0xf];
          auVar2029._0_14_ = auVar2016;
          auVar2029[0xf] = uStack_f60._7_1_;
          uStack_16f0 = local_f58[8];
          uStack_16ef = local_f58[9];
          uStack_16ee = local_f58[10];
          uStack_16ed = local_f58[0xb];
          uStack_16ec = local_f58[0xc];
          uStack_16eb = local_f58[0xd];
          uStack_16ea = local_f58[0xe];
          uStack_16e9 = local_f58[0xf];
          uVar1911 = CONCAT13(uStack_f40._1_1_,
                              CONCAT12(uStack_16ef,CONCAT11((undefined1)uStack_f40,uStack_16f0)));
          uVar1912 = CONCAT15(uStack_f40._2_1_,CONCAT14(uStack_16ee,uVar1911));
          uVar1913 = CONCAT17(uStack_f40._3_1_,CONCAT16(uStack_16ed,uVar1912));
          auVar1919._0_10_ = CONCAT19(uStack_f40._4_1_,CONCAT18(uStack_16ec,uVar1913));
          auVar1919[10] = uStack_16eb;
          auVar1919[0xb] = uStack_f40._5_1_;
          auVar1928[0xc] = uStack_16ea;
          auVar1928._0_12_ = auVar1919;
          auVar1928[0xd] = uStack_f40._6_1_;
          auVar1963[0xe] = uStack_16e9;
          auVar1963._0_14_ = auVar1928;
          auVar1963[0xf] = uStack_f40._7_1_;
          auVar410._12_2_ = (short)((ulong)uVar1433 >> 0x30);
          auVar410._0_12_ = auVar1446;
          auVar410._14_2_ = (short)((ulong)uVar316 >> 0x30);
          auVar409._12_4_ = auVar410._12_4_;
          auVar409._10_2_ = (short)((uint6)uVar315 >> 0x20);
          auVar409._0_10_ = auVar1446._0_10_;
          auVar408._10_6_ = auVar409._10_6_;
          auVar408._8_2_ = (short)((uint6)uVar1432 >> 0x20);
          auVar408._0_8_ = uVar1433;
          auVar407._8_8_ = auVar408._8_8_;
          auVar407._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
          auVar407._0_6_ = uVar1432;
          auVar406._6_10_ = auVar407._6_10_;
          auVar406._4_2_ = (short)((uint)uVar1431 >> 0x10);
          auVar406._0_4_ = uVar1431;
          auVar405._4_12_ = auVar406._4_12_;
          auVar405._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar314);
          auVar666._12_2_ = (short)((ulong)uVar505 >> 0x30);
          auVar666._0_12_ = auVar792;
          auVar666._14_2_ = (short)((ulong)uVar783 >> 0x30);
          auVar665._12_4_ = auVar666._12_4_;
          auVar665._10_2_ = (short)((uint6)uVar782 >> 0x20);
          auVar665._0_10_ = auVar792._0_10_;
          auVar664._10_6_ = auVar665._10_6_;
          auVar664._8_2_ = (short)((uint6)uVar504 >> 0x20);
          auVar664._0_8_ = uVar505;
          auVar663._8_8_ = auVar664._8_8_;
          auVar663._6_2_ = (short)((uint)uVar781 >> 0x10);
          auVar663._0_6_ = uVar504;
          auVar662._6_10_ = auVar663._6_10_;
          auVar662._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
          auVar662._0_4_ = auVar926._12_4_;
          auVar871._12_2_ = (short)((ulong)uVar1761 >> 0x30);
          auVar871._0_12_ = auVar1772;
          auVar871._14_2_ = (short)((ulong)uVar938 >> 0x30);
          auVar870._12_4_ = auVar871._12_4_;
          auVar870._10_2_ = (short)((uint6)uVar937 >> 0x20);
          auVar870._0_10_ = auVar1772._0_10_;
          auVar869._10_6_ = auVar870._10_6_;
          auVar869._8_2_ = (short)((uint6)uVar1760 >> 0x20);
          auVar869._0_8_ = uVar1761;
          auVar868._8_8_ = auVar869._8_8_;
          auVar868._6_2_ = (short)((uint)uVar936 >> 0x10);
          auVar868._0_6_ = uVar1760;
          auVar867._6_10_ = auVar868._6_10_;
          auVar867._4_2_ = (short)((uint)uVar1759 >> 0x10);
          auVar867._0_4_ = uVar1759;
          auVar866._4_12_ = auVar867._4_12_;
          auVar866._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar503);
          auVar1079._12_2_ = (short)((ulong)uVar1992 >> 0x30);
          auVar1079._0_12_ = auVar2003;
          auVar1079._14_2_ = (short)((ulong)uVar1913 >> 0x30);
          auVar1078._12_4_ = auVar1079._12_4_;
          auVar1078._10_2_ = (short)((uint6)uVar1912 >> 0x20);
          auVar1078._0_10_ = auVar2003._0_10_;
          auVar1077._10_6_ = auVar1078._10_6_;
          auVar1077._8_2_ = (short)((uint6)uVar1991 >> 0x20);
          auVar1077._0_8_ = uVar1992;
          auVar1076._8_8_ = auVar1077._8_8_;
          auVar1076._6_2_ = (short)((uint)uVar1911 >> 0x10);
          auVar1076._0_6_ = uVar1991;
          auVar1075._6_10_ = auVar1076._6_10_;
          auVar1075._4_2_ = (short)((uint)uVar1990 >> 0x10);
          auVar1075._0_4_ = uVar1990;
          auVar1272._0_8_ = auVar405._0_8_;
          auVar1272._8_4_ = auVar406._4_4_;
          auVar1272._12_4_ = auVar662._4_4_;
          auVar667._0_8_ = auVar866._0_8_;
          auVar667._8_4_ = auVar867._4_4_;
          auVar667._12_4_ = auVar1075._4_4_;
          local_15b8 = CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_fc0,uStack_1690),
                                         CONCAT11((undefined1)uStack_fe0,uStack_1670)),
                                auVar405._0_4_);
          auStack_15b0[0] =
               CONCAT44(CONCAT22(CONCAT11((undefined1)uStack_f40,uStack_16f0),uVar780),
                        auVar866._0_4_);
          auStack_15b0[1] = auVar1272._8_8_;
          auStack_15b0[2] = auVar667._8_8_;
          local_1598 = CONCAT44(auVar664._8_4_,auVar408._8_4_);
          uStack_1590 = CONCAT44(auVar1077._8_4_,auVar869._8_4_);
          local_1588._8_4_ = auVar409._12_4_;
          local_1588._12_4_ = auVar665._12_4_;
          auVar926._12_4_ =
               CONCAT22((short)((unkuint10)auVar520._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1446._0_10_ >> 0x40));
          auVar1447._0_8_ = CONCAT26(auVar520._10_2_,CONCAT24(auVar1446._10_2_,auVar926._12_4_));
          auVar1447._8_2_ = auVar1460._12_2_;
          auVar1447._10_2_ = auVar541._12_2_;
          auVar1479._12_2_ = auVar1478._14_2_;
          auVar1479._0_12_ = auVar1447;
          auVar1479._14_2_ = auVar661._14_2_;
          auVar490._12_4_ =
               CONCAT22((short)((unkuint10)auVar953._0_10_ >> 0x40),
                        (short)((unkuint10)auVar792._0_10_ >> 0x40));
          auVar521._0_8_ = CONCAT26(auVar953._10_2_,CONCAT24(auVar792._10_2_,auVar490._12_4_));
          auVar521._8_2_ = auVar810._12_2_;
          auVar521._10_2_ = auVar971._12_2_;
          auVar668._12_2_ = auVar865._14_2_;
          auVar668._0_12_ = auVar521;
          auVar668._14_2_ = auVar1074._14_2_;
          uVar781 = CONCAT22((short)((unkuint10)auVar1181._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1772._0_10_ >> 0x40));
          auVar1773._0_8_ = CONCAT26(auVar1181._10_2_,CONCAT24(auVar1772._10_2_,uVar781));
          auVar1773._8_2_ = auVar1785._12_2_;
          auVar1773._10_2_ = auVar1194._12_2_;
          auVar1804._12_2_ = auVar1803._14_2_;
          auVar1804._0_12_ = auVar1773;
          auVar1804._14_2_ = auVar1271._14_2_;
          uVar936 = CONCAT22((short)((unkuint10)auVar1919._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2003._0_10_ >> 0x40));
          auVar2004._0_8_ = CONCAT26(auVar1919._10_2_,CONCAT24(auVar2003._10_2_,uVar936));
          auVar2004._8_2_ = auVar2016._12_2_;
          auVar2004._10_2_ = auVar1928._12_2_;
          auVar2030._12_2_ = auVar2029._14_2_;
          auVar2030._0_12_ = auVar2004;
          auVar2030._14_2_ = auVar1963._14_2_;
          auVar411._8_4_ = (int)((ulong)auVar1447._0_8_ >> 0x20);
          auVar411._0_8_ = auVar1447._0_8_;
          auVar411._12_4_ = (int)((ulong)auVar521._0_8_ >> 0x20);
          auVar669._8_4_ = (int)((ulong)auVar1773._0_8_ >> 0x20);
          auVar669._0_8_ = auVar1773._0_8_;
          auVar669._12_4_ = (int)((ulong)auVar2004._0_8_ >> 0x20);
          local_1578 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
          uStack_1570 = CONCAT44(uVar936,uVar781);
          local_1568 = auVar411._8_8_;
          uStack_1560 = auVar669._8_8_;
          local_1558 = CONCAT44(auVar521._8_4_,auVar1447._8_4_);
          uStack_1550 = CONCAT44(auVar2004._8_4_,auVar1773._8_4_);
          local_1548._8_4_ = auVar1479._12_4_;
          local_1548._12_4_ = auVar668._12_4_;
          local_1538 = CONCAT44(auVar2030._12_4_,auVar1804._12_4_);
          auVar15._8_8_ = uStack_1430;
          auVar15._0_8_ = CONCAT44(uStack_1434,local_1438);
          auVar1087._0_14_ = auVar15._0_14_;
          auVar1087[0xe] = (char)((uint)uStack_1434 >> 0x18);
          auVar1087[0xf] = uStack_1421;
          auVar1086._14_2_ = auVar1087._14_2_;
          auVar1086._0_13_ = auVar15._0_13_;
          auVar1086[0xd] = uStack_1422;
          auVar1085._13_3_ = auVar1086._13_3_;
          auVar1085._0_12_ = auVar15._0_12_;
          auVar1085[0xc] = (char)((uint)uStack_1434 >> 0x10);
          auVar1084._12_4_ = auVar1085._12_4_;
          auVar1084._0_11_ = auVar15._0_11_;
          auVar1084[0xb] = uStack_1423;
          auVar1083._11_5_ = auVar1084._11_5_;
          auVar1083._0_10_ = auVar15._0_10_;
          auVar1083[10] = (char)((uint)uStack_1434 >> 8);
          auVar1082._10_6_ = auVar1083._10_6_;
          auVar1082._0_9_ = auVar15._0_9_;
          auVar1082[9] = uStack_1424;
          auVar1081._9_7_ = auVar1082._9_7_;
          auVar1081[8] = (char)uStack_1434;
          auVar1081._0_8_ = CONCAT44(uStack_1434,local_1438);
          Var17 = CONCAT91(CONCAT81(auVar1081._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18));
          auVar134._2_10_ = Var17;
          auVar134[1] = uStack_1426;
          auVar134[0] = (char)((uint)local_1438 >> 0x10);
          auVar133._2_12_ = auVar134;
          auVar133[1] = uStack_1427;
          auVar133[0] = (char)((uint)local_1438 >> 8);
          auVar1080._0_2_ = CONCAT11(local_1428,(char)local_1438);
          auVar1080._2_14_ = auVar133;
          auVar2242._0_14_ = local_1418._0_14_;
          auVar2242[0xe] = local_1418[7];
          auVar2242[0xf] = uStack_1401;
          auVar2241._14_2_ = auVar2242._14_2_;
          auVar2241._0_13_ = local_1418._0_13_;
          auVar2241[0xd] = uStack_1402;
          auVar2240._13_3_ = auVar2241._13_3_;
          auVar2240._0_12_ = local_1418._0_12_;
          auVar2240[0xc] = local_1418[6];
          auVar2239._12_4_ = auVar2240._12_4_;
          auVar2239._0_11_ = local_1418._0_11_;
          auVar2239[0xb] = uStack_1403;
          auVar2238._11_5_ = auVar2239._11_5_;
          auVar2238._0_10_ = local_1418._0_10_;
          auVar2238[10] = local_1418[5];
          auVar2237._10_6_ = auVar2238._10_6_;
          auVar2237._0_9_ = local_1418._0_9_;
          auVar2237[9] = uStack_1404;
          auVar2236._9_7_ = auVar2237._9_7_;
          auVar2236._0_8_ = local_1418._0_8_;
          auVar2236[8] = local_1418[4];
          Var19 = CONCAT91(CONCAT81(auVar2236._8_8_,uStack_1405),local_1418[3]);
          auVar136._2_10_ = Var19;
          auVar136[1] = uStack_1406;
          auVar136[0] = local_1418[2];
          auVar135._2_12_ = auVar136;
          auVar135[1] = uStack_1407;
          auVar135[0] = local_1418[1];
          auVar2109._0_14_ = local_13f8._0_14_;
          auVar2109[0xe] = local_13f8[7];
          auVar2109[0xf] = uStack_13e1;
          auVar2108._14_2_ = auVar2109._14_2_;
          auVar2108._0_13_ = local_13f8._0_13_;
          auVar2108[0xd] = uStack_13e2;
          auVar2107._13_3_ = auVar2108._13_3_;
          auVar2107._0_12_ = local_13f8._0_12_;
          auVar2107[0xc] = local_13f8[6];
          auVar2106._12_4_ = auVar2107._12_4_;
          auVar2106._0_11_ = local_13f8._0_11_;
          auVar2106[0xb] = uStack_13e3;
          auVar2105._11_5_ = auVar2106._11_5_;
          auVar2105._0_10_ = local_13f8._0_10_;
          auVar2105[10] = local_13f8[5];
          auVar2104._10_6_ = auVar2105._10_6_;
          auVar2104._0_9_ = local_13f8._0_9_;
          auVar2104[9] = uStack_13e4;
          auVar2103._9_7_ = auVar2104._9_7_;
          auVar2103._0_8_ = local_13f8._0_8_;
          auVar2103[8] = local_13f8[4];
          Var21 = CONCAT91(CONCAT81(auVar2103._8_8_,uStack_13e5),local_13f8[3]);
          auVar138._2_10_ = Var21;
          auVar138[1] = uStack_13e6;
          auVar138[0] = local_13f8[2];
          auVar137._2_12_ = auVar138;
          auVar137[1] = uStack_13e7;
          auVar137[0] = local_13f8[1];
          auVar2102._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
          auVar2102._2_14_ = auVar137;
          auVar2172._0_14_ = local_13d8._0_14_;
          auVar2172[0xe] = local_13d8[7];
          auVar2172[0xf] = uStack_13c1;
          auVar2171._14_2_ = auVar2172._14_2_;
          auVar2171._0_13_ = local_13d8._0_13_;
          auVar2171[0xd] = uStack_13c2;
          auVar2170._13_3_ = auVar2171._13_3_;
          auVar2170._0_12_ = local_13d8._0_12_;
          auVar2170[0xc] = local_13d8[6];
          auVar2169._12_4_ = auVar2170._12_4_;
          auVar2169._0_11_ = local_13d8._0_11_;
          auVar2169[0xb] = uStack_13c3;
          auVar2168._11_5_ = auVar2169._11_5_;
          auVar2168._0_10_ = local_13d8._0_10_;
          auVar2168[10] = local_13d8[5];
          auVar2167._10_6_ = auVar2168._10_6_;
          auVar2167._0_9_ = local_13d8._0_9_;
          auVar2167[9] = uStack_13c4;
          auVar2166._9_7_ = auVar2167._9_7_;
          auVar2166._0_8_ = local_13d8._0_8_;
          auVar2166[8] = local_13d8[4];
          Var23 = CONCAT91(CONCAT81(auVar2166._8_8_,uStack_13c5),local_13d8[3]);
          auVar140._2_10_ = Var23;
          auVar140[1] = uStack_13c6;
          auVar140[0] = local_13d8[2];
          auVar139._2_12_ = auVar140;
          auVar139[1] = uStack_13c7;
          auVar139[0] = local_13d8[1];
          auVar1967._0_12_ = auVar1080._0_12_;
          auVar1967._12_2_ = (short)Var17;
          auVar1967._14_2_ = (short)Var19;
          auVar1966._12_4_ = auVar1967._12_4_;
          auVar1966._0_10_ = auVar1080._0_10_;
          auVar1966._10_2_ = auVar136._0_2_;
          auVar1965._10_6_ = auVar1966._10_6_;
          auVar1965._0_8_ = auVar1080._0_8_;
          auVar1965._8_2_ = auVar134._0_2_;
          auVar141._4_8_ = auVar1965._8_8_;
          auVar141._2_2_ = auVar135._0_2_;
          auVar141._0_2_ = auVar133._0_2_;
          auVar1964._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar1080._0_2_);
          auVar1964._4_12_ = auVar141;
          auVar672._0_12_ = auVar2102._0_12_;
          auVar672._12_2_ = (short)Var21;
          auVar672._14_2_ = (short)Var23;
          auVar671._12_4_ = auVar672._12_4_;
          auVar671._0_10_ = auVar2102._0_10_;
          auVar671._10_2_ = auVar140._0_2_;
          auVar670._10_6_ = auVar671._10_6_;
          auVar670._0_8_ = auVar2102._0_8_;
          auVar670._8_2_ = auVar138._0_2_;
          auVar142._4_8_ = auVar670._8_8_;
          auVar142._2_2_ = auVar139._0_2_;
          auVar142._0_2_ = auVar137._0_2_;
          auVar872._0_8_ = auVar1964._0_8_;
          auVar872._8_4_ = auVar141._0_4_;
          auVar872._12_4_ = auVar142._0_4_;
          auVar1280._0_14_ = local_13b8._0_14_;
          auVar1280[0xe] = local_13b8[7];
          auVar1280[0xf] = uStack_13a1;
          auVar1279._14_2_ = auVar1280._14_2_;
          auVar1279._0_13_ = local_13b8._0_13_;
          auVar1279[0xd] = uStack_13a2;
          auVar1278._13_3_ = auVar1279._13_3_;
          auVar1278._0_12_ = local_13b8._0_12_;
          auVar1278[0xc] = local_13b8[6];
          auVar1277._12_4_ = auVar1278._12_4_;
          auVar1277._0_11_ = local_13b8._0_11_;
          auVar1277[0xb] = uStack_13a3;
          auVar1276._11_5_ = auVar1277._11_5_;
          auVar1276._0_10_ = local_13b8._0_10_;
          auVar1276[10] = local_13b8[5];
          auVar1275._10_6_ = auVar1276._10_6_;
          auVar1275._0_9_ = local_13b8._0_9_;
          auVar1275[9] = uStack_13a4;
          auVar1274._9_7_ = auVar1275._9_7_;
          auVar1274._0_8_ = local_13b8._0_8_;
          auVar1274[8] = local_13b8[4];
          Var17 = CONCAT91(CONCAT81(auVar1274._8_8_,uStack_13a5),local_13b8[3]);
          auVar144._2_10_ = Var17;
          auVar144[1] = uStack_13a6;
          auVar144[0] = local_13b8[2];
          auVar143._2_12_ = auVar144;
          auVar143[1] = uStack_13a7;
          auVar143[0] = local_13b8[1];
          auVar1273._0_2_ = CONCAT11(local_13a8,local_13b8[0]);
          auVar1273._2_14_ = auVar143;
          auVar1582._0_14_ = local_1398._0_14_;
          auVar1582[0xe] = local_1398[7];
          auVar1582[0xf] = uStack_1381;
          auVar1581._14_2_ = auVar1582._14_2_;
          auVar1581._0_13_ = local_1398._0_13_;
          auVar1581[0xd] = uStack_1382;
          auVar1580._13_3_ = auVar1581._13_3_;
          auVar1580._0_12_ = local_1398._0_12_;
          auVar1580[0xc] = local_1398[6];
          auVar1579._12_4_ = auVar1580._12_4_;
          auVar1579._0_11_ = local_1398._0_11_;
          auVar1579[0xb] = uStack_1383;
          auVar1578._11_5_ = auVar1579._11_5_;
          auVar1578._0_10_ = local_1398._0_10_;
          auVar1578[10] = local_1398[5];
          auVar1577._10_6_ = auVar1578._10_6_;
          auVar1577._0_9_ = local_1398._0_9_;
          auVar1577[9] = uStack_1384;
          auVar1576._9_7_ = auVar1577._9_7_;
          auVar1576._0_8_ = local_1398._0_8_;
          auVar1576[8] = local_1398[4];
          Var19 = CONCAT91(CONCAT81(auVar1576._8_8_,uStack_1385),local_1398[3]);
          auVar146._2_10_ = Var19;
          auVar146[1] = uStack_1386;
          auVar146[0] = local_1398[2];
          auVar145._2_12_ = auVar146;
          auVar145[1] = uStack_1387;
          auVar145[0] = local_1398[1];
          auVar1716._0_14_ = local_1378._0_14_;
          auVar1716[0xe] = local_1378[7];
          auVar1716[0xf] = uStack_1361;
          auVar1715._14_2_ = auVar1716._14_2_;
          auVar1715._0_13_ = local_1378._0_13_;
          auVar1715[0xd] = uStack_1362;
          auVar1714._13_3_ = auVar1715._13_3_;
          auVar1714._0_12_ = local_1378._0_12_;
          auVar1714[0xc] = local_1378[6];
          auVar1713._12_4_ = auVar1714._12_4_;
          auVar1713._0_11_ = local_1378._0_11_;
          auVar1713[0xb] = uStack_1363;
          auVar1712._11_5_ = auVar1713._11_5_;
          auVar1712._0_10_ = local_1378._0_10_;
          auVar1712[10] = local_1378[5];
          auVar1711._10_6_ = auVar1712._10_6_;
          auVar1711._0_9_ = local_1378._0_9_;
          auVar1711[9] = uStack_1364;
          auVar1710._9_7_ = auVar1711._9_7_;
          auVar1710._0_8_ = local_1378._0_8_;
          auVar1710[8] = local_1378[4];
          Var21 = CONCAT91(CONCAT81(auVar1710._8_8_,uStack_1365),local_1378[3]);
          auVar148._2_10_ = Var21;
          auVar148[1] = uStack_1366;
          auVar148[0] = local_1378[2];
          auVar147._2_12_ = auVar148;
          auVar147[1] = uStack_1367;
          auVar147[0] = local_1378[1];
          auVar1709._0_2_ = CONCAT11(local_1368,local_1378[0]);
          auVar1709._2_14_ = auVar147;
          auVar1882._0_14_ = local_1358._0_14_;
          auVar1882[0xe] = local_1358[7];
          auVar1882[0xf] = uStack_1341;
          auVar1881._14_2_ = auVar1882._14_2_;
          auVar1881._0_13_ = local_1358._0_13_;
          auVar1881[0xd] = uStack_1342;
          auVar1880._13_3_ = auVar1881._13_3_;
          auVar1880._0_12_ = local_1358._0_12_;
          auVar1880[0xc] = local_1358[6];
          auVar1879._12_4_ = auVar1880._12_4_;
          auVar1879._0_11_ = local_1358._0_11_;
          auVar1879[0xb] = uStack_1343;
          auVar1878._11_5_ = auVar1879._11_5_;
          auVar1878._0_10_ = local_1358._0_10_;
          auVar1878[10] = local_1358[5];
          auVar1877._10_6_ = auVar1878._10_6_;
          auVar1877._0_9_ = local_1358._0_9_;
          auVar1877[9] = uStack_1344;
          auVar1876._9_7_ = auVar1877._9_7_;
          auVar1876._0_8_ = local_1358._0_8_;
          auVar1876[8] = local_1358[4];
          Var23 = CONCAT91(CONCAT81(auVar1876._8_8_,uStack_1345),local_1358[3]);
          auVar150._2_10_ = Var23;
          auVar150[1] = uStack_1346;
          auVar150[0] = local_1358[2];
          auVar149._2_12_ = auVar150;
          auVar149[1] = uStack_1347;
          auVar149[0] = local_1358[1];
          auVar676._0_12_ = auVar1273._0_12_;
          auVar676._12_2_ = (short)Var17;
          auVar676._14_2_ = (short)Var19;
          auVar675._12_4_ = auVar676._12_4_;
          auVar675._0_10_ = auVar1273._0_10_;
          auVar675._10_2_ = auVar146._0_2_;
          auVar674._10_6_ = auVar675._10_6_;
          auVar674._0_8_ = auVar1273._0_8_;
          auVar674._8_2_ = auVar144._0_2_;
          auVar151._4_8_ = auVar674._8_8_;
          auVar151._2_2_ = auVar145._0_2_;
          auVar151._0_2_ = auVar143._0_2_;
          auVar673._0_4_ = CONCAT22(CONCAT11(local_1388,local_1398[0]),auVar1273._0_2_);
          auVar673._4_12_ = auVar151;
          auVar1387._0_12_ = auVar1709._0_12_;
          auVar1387._12_2_ = (short)Var21;
          auVar1387._14_2_ = (short)Var23;
          auVar1386._12_4_ = auVar1387._12_4_;
          auVar1386._0_10_ = auVar1709._0_10_;
          auVar1386._10_2_ = auVar150._0_2_;
          auVar1385._10_6_ = auVar1386._10_6_;
          auVar1385._0_8_ = auVar1709._0_8_;
          auVar1385._8_2_ = auVar148._0_2_;
          auVar152._4_8_ = auVar1385._8_8_;
          auVar152._2_2_ = auVar149._0_2_;
          auVar152._0_2_ = auVar147._0_2_;
          auVar412._0_8_ = auVar673._0_8_;
          auVar412._8_4_ = auVar151._0_4_;
          auVar412._12_4_ = auVar152._0_4_;
          local_1238[0] =
               CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2102._0_2_),auVar1964._0_4_
                       );
          local_1238[1] =
               CONCAT44(CONCAT22(CONCAT11(local_1348,local_1358[0]),auVar1709._0_2_),auVar673._0_4_)
          ;
          local_1238[2] = auVar872._8_8_;
          local_1238[3] = auVar412._8_8_;
          local_1218 = auVar1965._8_4_;
          uStack_1214 = auVar670._8_4_;
          uStack_1210 = auVar674._8_4_;
          uStack_120c = auVar1385._8_4_;
          uStack_1200 = auVar1966._12_4_;
          uStack_11fc = auVar671._12_4_;
          auVar490._12_4_ = CONCAT22(auVar2236._8_2_,auVar1081._8_2_);
          auVar954._0_8_ = CONCAT26(auVar2238._10_2_,CONCAT24(auVar1083._10_2_,auVar490._12_4_));
          auVar954._8_2_ = auVar1085._12_2_;
          auVar954._10_2_ = auVar2240._12_2_;
          auVar1088._12_2_ = auVar1086._14_2_;
          auVar1088._0_12_ = auVar954;
          auVar1088._14_2_ = auVar2241._14_2_;
          uVar936 = CONCAT22(auVar2166._8_2_,auVar2103._8_2_);
          auVar2045._0_8_ = CONCAT26(auVar2168._10_2_,CONCAT24(auVar2105._10_2_,uVar936));
          auVar2045._8_2_ = auVar2107._12_2_;
          auVar2045._10_2_ = auVar2170._12_2_;
          auVar2110._12_2_ = auVar2108._14_2_;
          auVar2110._0_12_ = auVar2045;
          auVar2110._14_2_ = auVar2171._14_2_;
          auVar926._12_4_ = CONCAT22(auVar1576._8_2_,auVar1274._8_2_);
          auVar1182._0_8_ = CONCAT26(auVar1578._10_2_,CONCAT24(auVar1276._10_2_,auVar926._12_4_));
          auVar1182._8_2_ = auVar1278._12_2_;
          auVar1182._10_2_ = auVar1580._12_2_;
          uVar781 = CONCAT22(auVar1876._8_2_,auVar1710._8_2_);
          auVar1634._0_8_ = CONCAT26(auVar1878._10_2_,CONCAT24(auVar1712._10_2_,uVar781));
          auVar1634._8_2_ = auVar1714._12_2_;
          auVar1634._10_2_ = auVar1880._12_2_;
          auVar413._8_4_ = (int)((ulong)auVar954._0_8_ >> 0x20);
          auVar413._0_8_ = auVar954._0_8_;
          auVar413._12_4_ = (int)((ulong)auVar2045._0_8_ >> 0x20);
          auVar677._8_4_ = (int)((ulong)auVar1182._0_8_ >> 0x20);
          auVar677._0_8_ = auVar1182._0_8_;
          auVar677._12_4_ = (int)((ulong)auVar1634._0_8_ >> 0x20);
          local_11f8 = CONCAT44(uVar936,auVar490._12_4_);
          uStack_11f0 = CONCAT44(uVar781,auVar926._12_4_);
          local_11e8 = auVar413._8_8_;
          uStack_11e0 = auVar677._8_8_;
          local_11d8 = auVar954._8_4_;
          uStack_11d4 = auVar2045._8_4_;
          uStack_11d0 = auVar1182._8_4_;
          uStack_11cc = auVar1634._8_4_;
          uStack_11c0 = auVar1088._12_4_;
          uStack_11bc = auVar2110._12_4_;
          uVar314 = CONCAT11(uStack_1420,(char)uStack_1430);
          uVar1431 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar314));
          uVar1432 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar1431));
          uVar1433 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar1432));
          auVar1448._0_10_ =
               CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar1433));
          auVar1448[10] = (char)((ulong)uStack_1430 >> 0x28);
          auVar1448[0xb] = uStack_141b;
          auVar1461[0xc] = (char)((ulong)uStack_1430 >> 0x30);
          auVar1461._0_12_ = auVar1448;
          auVar1461[0xd] = uStack_141a;
          auVar1480[0xe] = (char)((ulong)uStack_1430 >> 0x38);
          auVar1480._0_14_ = auVar1461;
          auVar1480[0xf] = uStack_1419;
          uStack_1640 = local_1418[8];
          uStack_163f = local_1418[9];
          uStack_163e = local_1418[10];
          uStack_163d = local_1418[0xb];
          uStack_163c = local_1418[0xc];
          uStack_163b = local_1418[0xd];
          uStack_163a = local_1418[0xe];
          uStack_1639 = local_1418[0xf];
          auVar490._12_4_ =
               CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
          uVar315 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar490._12_4_));
          uVar316 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar315));
          auVar522._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar316));
          auVar522[10] = uStack_163b;
          auVar522[0xb] = uStack_13fb;
          auVar542[0xc] = uStack_163a;
          auVar542._0_12_ = auVar522;
          auVar542[0xd] = uStack_13fa;
          auVar678[0xe] = uStack_1639;
          auVar678._0_14_ = auVar542;
          auVar678[0xf] = uStack_13f9;
          uStack_1670 = local_13f8[8];
          uStack_166f = local_13f8[9];
          uStack_166e = local_13f8[10];
          uStack_166d = local_13f8[0xb];
          uStack_166c = local_13f8[0xc];
          uStack_166b = local_13f8[0xd];
          uStack_166a = local_13f8[0xe];
          uStack_1669 = local_13f8[0xf];
          auVar926._12_4_ =
               CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
          uVar504 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar926._12_4_));
          uVar505 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar504));
          auVar793._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar505));
          auVar793[10] = uStack_166b;
          auVar793[0xb] = uStack_13db;
          auVar811[0xc] = uStack_166a;
          auVar811._0_12_ = auVar793;
          auVar811[0xd] = uStack_13da;
          auVar873[0xe] = uStack_1669;
          auVar873._0_14_ = auVar811;
          auVar873[0xf] = uStack_13d9;
          uStack_1690 = local_13d8[8];
          uStack_168f = local_13d8[9];
          uStack_168e = local_13d8[10];
          uStack_168d = local_13d8[0xb];
          uStack_168c = local_13d8[0xc];
          uStack_168b = local_13d8[0xd];
          uStack_168a = local_13d8[0xe];
          uStack_1689 = local_13d8[0xf];
          uVar781 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
          uVar782 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar781));
          uVar783 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar782));
          auVar955._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar783));
          auVar955[10] = uStack_168b;
          auVar955[0xb] = uStack_13bb;
          auVar972[0xc] = uStack_168a;
          auVar972._0_12_ = auVar955;
          auVar972[0xd] = uStack_13ba;
          auVar1089[0xe] = uStack_1689;
          auVar1089._0_14_ = auVar972;
          auVar1089[0xf] = uStack_13b9;
          uVar503 = CONCAT11(uStack_13a0,local_13b8[8]);
          uVar1759 = CONCAT13(uStack_139f,CONCAT12(local_13b8[9],uVar503));
          uVar1760 = CONCAT15(uStack_139e,CONCAT14(local_13b8[10],uVar1759));
          uVar1761 = CONCAT17(uStack_139d,CONCAT16(local_13b8[0xb],uVar1760));
          auVar1774._0_10_ = CONCAT19(uStack_139c,CONCAT18(local_13b8[0xc],uVar1761));
          auVar1774[10] = local_13b8[0xd];
          auVar1774[0xb] = uStack_139b;
          auVar1786[0xc] = local_13b8[0xe];
          auVar1786._0_12_ = auVar1774;
          auVar1786[0xd] = uStack_139a;
          auVar1805[0xe] = local_13b8[0xf];
          auVar1805._0_14_ = auVar1786;
          auVar1805[0xf] = uStack_1399;
          uStack_16c0 = local_1398[8];
          uStack_16bf = local_1398[9];
          uStack_16be = local_1398[10];
          uStack_16bd = local_1398[0xb];
          uStack_16bc = local_1398[0xc];
          uStack_16bb = local_1398[0xd];
          uStack_16ba = local_1398[0xe];
          uStack_16b9 = local_1398[0xf];
          uVar936 = CONCAT13(uStack_137f,CONCAT12(uStack_16bf,CONCAT11(uStack_1380,uStack_16c0)));
          uVar937 = CONCAT15(uStack_137e,CONCAT14(uStack_16be,uVar936));
          uVar938 = CONCAT17(uStack_137d,CONCAT16(uStack_16bd,uVar937));
          auVar1183._0_10_ = CONCAT19(uStack_137c,CONCAT18(uStack_16bc,uVar938));
          auVar1183[10] = uStack_16bb;
          auVar1183[0xb] = uStack_137b;
          auVar1195[0xc] = uStack_16ba;
          auVar1195._0_12_ = auVar1183;
          auVar1195[0xd] = uStack_137a;
          auVar1281[0xe] = uStack_16b9;
          auVar1281._0_14_ = auVar1195;
          auVar1281[0xf] = uStack_1379;
          uVar780 = CONCAT11(uStack_1360,local_1378[8]);
          uVar1990 = CONCAT13(uStack_135f,CONCAT12(local_1378[9],uVar780));
          uVar1991 = CONCAT15(uStack_135e,CONCAT14(local_1378[10],uVar1990));
          uVar1992 = CONCAT17(uStack_135d,CONCAT16(local_1378[0xb],uVar1991));
          auVar2005._0_10_ = CONCAT19(uStack_135c,CONCAT18(local_1378[0xc],uVar1992));
          auVar2005[10] = local_1378[0xd];
          auVar2005[0xb] = uStack_135b;
          auVar2017[0xc] = local_1378[0xe];
          auVar2017._0_12_ = auVar2005;
          auVar2017[0xd] = uStack_135a;
          auVar2031[0xe] = local_1378[0xf];
          auVar2031._0_14_ = auVar2017;
          auVar2031[0xf] = uStack_1359;
          uStack_16f0 = local_1358[8];
          uStack_16ef = local_1358[9];
          uStack_16ee = local_1358[10];
          uStack_16ed = local_1358[0xb];
          uStack_16ec = local_1358[0xc];
          uStack_16eb = local_1358[0xd];
          uStack_16ea = local_1358[0xe];
          uStack_16e9 = local_1358[0xf];
          uVar1911 = CONCAT13(uStack_133f,CONCAT12(uStack_16ef,CONCAT11(uStack_1340,uStack_16f0)));
          uVar1912 = CONCAT15(uStack_133e,CONCAT14(uStack_16ee,uVar1911));
          uVar1913 = CONCAT17(uStack_133d,CONCAT16(uStack_16ed,uVar1912));
          auVar1920._0_10_ = CONCAT19(uStack_133c,CONCAT18(uStack_16ec,uVar1913));
          auVar1920[10] = uStack_16eb;
          auVar1920[0xb] = uStack_133b;
          auVar1929[0xc] = uStack_16ea;
          auVar1929._0_12_ = auVar1920;
          auVar1929[0xd] = uStack_133a;
          auVar1968[0xe] = uStack_16e9;
          auVar1968._0_14_ = auVar1929;
          auVar1968[0xf] = uStack_1339;
          auVar419._12_2_ = (short)((ulong)uVar1433 >> 0x30);
          auVar419._0_12_ = auVar1448;
          auVar419._14_2_ = (short)((ulong)uVar316 >> 0x30);
          auVar418._12_4_ = auVar419._12_4_;
          auVar418._10_2_ = (short)((uint6)uVar315 >> 0x20);
          auVar418._0_10_ = auVar1448._0_10_;
          auVar417._10_6_ = auVar418._10_6_;
          auVar417._8_2_ = (short)((uint6)uVar1432 >> 0x20);
          auVar417._0_8_ = uVar1433;
          auVar416._8_8_ = auVar417._8_8_;
          auVar416._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
          auVar416._0_6_ = uVar1432;
          auVar415._6_10_ = auVar416._6_10_;
          auVar415._4_2_ = (short)((uint)uVar1431 >> 0x10);
          auVar415._0_4_ = uVar1431;
          auVar414._4_12_ = auVar415._4_12_;
          auVar414._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar314);
          auVar683._12_2_ = (short)((ulong)uVar505 >> 0x30);
          auVar683._0_12_ = auVar793;
          auVar683._14_2_ = (short)((ulong)uVar783 >> 0x30);
          auVar682._12_4_ = auVar683._12_4_;
          auVar682._10_2_ = (short)((uint6)uVar782 >> 0x20);
          auVar682._0_10_ = auVar793._0_10_;
          auVar681._10_6_ = auVar682._10_6_;
          auVar681._8_2_ = (short)((uint6)uVar504 >> 0x20);
          auVar681._0_8_ = uVar505;
          auVar680._8_8_ = auVar681._8_8_;
          auVar680._6_2_ = (short)((uint)uVar781 >> 0x10);
          auVar680._0_6_ = uVar504;
          auVar679._6_10_ = auVar680._6_10_;
          auVar679._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
          auVar679._0_4_ = auVar926._12_4_;
          auVar879._12_2_ = (short)((ulong)uVar1761 >> 0x30);
          auVar879._0_12_ = auVar1774;
          auVar879._14_2_ = (short)((ulong)uVar938 >> 0x30);
          auVar878._12_4_ = auVar879._12_4_;
          auVar878._10_2_ = (short)((uint6)uVar937 >> 0x20);
          auVar878._0_10_ = auVar1774._0_10_;
          auVar877._10_6_ = auVar878._10_6_;
          auVar877._8_2_ = (short)((uint6)uVar1760 >> 0x20);
          auVar877._0_8_ = uVar1761;
          auVar876._8_8_ = auVar877._8_8_;
          auVar876._6_2_ = (short)((uint)uVar936 >> 0x10);
          auVar876._0_6_ = uVar1760;
          auVar875._6_10_ = auVar876._6_10_;
          auVar875._4_2_ = (short)((uint)uVar1759 >> 0x10);
          auVar875._0_4_ = uVar1759;
          auVar874._4_12_ = auVar875._4_12_;
          auVar874._0_4_ = CONCAT22(CONCAT11(uStack_1380,uStack_16c0),uVar503);
          auVar1094._12_2_ = (short)((ulong)uVar1992 >> 0x30);
          auVar1094._0_12_ = auVar2005;
          auVar1094._14_2_ = (short)((ulong)uVar1913 >> 0x30);
          auVar1093._12_4_ = auVar1094._12_4_;
          auVar1093._10_2_ = (short)((uint6)uVar1912 >> 0x20);
          auVar1093._0_10_ = auVar2005._0_10_;
          auVar1092._10_6_ = auVar1093._10_6_;
          auVar1092._8_2_ = (short)((uint6)uVar1991 >> 0x20);
          auVar1092._0_8_ = uVar1992;
          auVar1091._8_8_ = auVar1092._8_8_;
          auVar1091._6_2_ = (short)((uint)uVar1911 >> 0x10);
          auVar1091._0_6_ = uVar1991;
          auVar1090._6_10_ = auVar1091._6_10_;
          auVar1090._4_2_ = (short)((uint)uVar1990 >> 0x10);
          auVar1090._0_4_ = uVar1990;
          auVar1282._0_8_ = auVar414._0_8_;
          auVar1282._8_4_ = auVar415._4_4_;
          auVar1282._12_4_ = auVar679._4_4_;
          auVar684._0_8_ = auVar874._0_8_;
          auVar684._8_4_ = auVar875._4_4_;
          auVar684._12_4_ = auVar1090._4_4_;
          local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                         CONCAT11(uStack_13e0,uStack_1670)),auVar414._0_4_);
          uStack_11b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1340,uStack_16f0),uVar780),auVar874._0_4_)
          ;
          local_11a8 = auVar1282._8_8_;
          uStack_11a0 = auVar684._8_8_;
          local_1198 = auVar417._8_4_;
          uStack_1194 = auVar681._8_4_;
          uStack_1190 = auVar877._8_4_;
          uStack_118c = auVar1092._8_4_;
          uStack_1180 = auVar418._12_4_;
          uStack_117c = auVar682._12_4_;
          auVar926._12_4_ =
               CONCAT22((short)((unkuint10)auVar522._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1448._0_10_ >> 0x40));
          auVar1449._0_8_ = CONCAT26(auVar522._10_2_,CONCAT24(auVar1448._10_2_,auVar926._12_4_));
          auVar1449._8_2_ = auVar1461._12_2_;
          auVar1449._10_2_ = auVar542._12_2_;
          auVar1481._12_2_ = auVar1480._14_2_;
          auVar1481._0_12_ = auVar1449;
          auVar1481._14_2_ = auVar678._14_2_;
          auVar490._12_4_ =
               CONCAT22((short)((unkuint10)auVar955._0_10_ >> 0x40),
                        (short)((unkuint10)auVar793._0_10_ >> 0x40));
          auVar523._0_8_ = CONCAT26(auVar955._10_2_,CONCAT24(auVar793._10_2_,auVar490._12_4_));
          auVar523._8_2_ = auVar811._12_2_;
          auVar523._10_2_ = auVar972._12_2_;
          auVar685._12_2_ = auVar873._14_2_;
          auVar685._0_12_ = auVar523;
          auVar685._14_2_ = auVar1089._14_2_;
          uVar781 = CONCAT22((short)((unkuint10)auVar1183._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1774._0_10_ >> 0x40));
          auVar1775._0_8_ = CONCAT26(auVar1183._10_2_,CONCAT24(auVar1774._10_2_,uVar781));
          auVar1775._8_2_ = auVar1786._12_2_;
          auVar1775._10_2_ = auVar1195._12_2_;
          auVar1806._12_2_ = auVar1805._14_2_;
          auVar1806._0_12_ = auVar1775;
          auVar1806._14_2_ = auVar1281._14_2_;
          uVar936 = CONCAT22((short)((unkuint10)auVar1920._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2005._0_10_ >> 0x40));
          auVar2006._0_8_ = CONCAT26(auVar1920._10_2_,CONCAT24(auVar2005._10_2_,uVar936));
          auVar2006._8_2_ = auVar2017._12_2_;
          auVar2006._10_2_ = auVar1929._12_2_;
          auVar2032._12_2_ = auVar2031._14_2_;
          auVar2032._0_12_ = auVar2006;
          auVar2032._14_2_ = auVar1968._14_2_;
          auVar420._8_4_ = (int)((ulong)auVar1449._0_8_ >> 0x20);
          auVar420._0_8_ = auVar1449._0_8_;
          auVar420._12_4_ = (int)((ulong)auVar523._0_8_ >> 0x20);
          auVar686._8_4_ = (int)((ulong)auVar1775._0_8_ >> 0x20);
          auVar686._0_8_ = auVar1775._0_8_;
          auVar686._12_4_ = (int)((ulong)auVar2006._0_8_ >> 0x20);
          local_1178 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
          uStack_1170 = CONCAT44(uVar936,uVar781);
          local_1168 = auVar420._8_8_;
          uStack_1160 = auVar686._8_8_;
          local_1158 = auVar1449._8_4_;
          uStack_1154 = auVar523._8_4_;
          uStack_1150 = auVar1775._8_4_;
          uStack_114c = auVar2006._8_4_;
          uStack_1140 = auVar1481._12_4_;
          uStack_113c = auVar685._12_4_;
          local_1138 = CONCAT44(auVar2032._12_4_,auVar1806._12_4_);
          lVar300 = 0;
          do {
            uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
            *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar300);
            *(undefined8 *)(dst + 8) = uVar316;
            uVar316 = *(undefined8 *)((long)local_1238 + lVar300 + 8);
            *(undefined8 *)(dst + stride * 0x10) = *(undefined8 *)((long)local_1238 + lVar300);
            *(undefined8 *)(dst + stride * 0x10 + 8) = uVar316;
            dst = dst + stride;
            lVar300 = lVar300 + 0x10;
          } while (lVar300 != 0x100);
          return;
        case 7:
          uStack_1710 = 0x33fcff;
          dr_prediction_z1_64xN_sse4_1(0x20,local_1038,0x40,left,dy,iVar307);
          iVar307 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            auVar546 = pshufb(ZEXT116(left[0x27]),(undefined1  [16])0x0);
            lVar300 = 0;
            auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
            lVar304 = 0;
            uVar305 = dy;
            do {
              iVar307 = (int)uVar305 >> 6;
              lVar306 = lVar300;
              if (iVar307 < 0x27) {
                uVar308 = -(iVar307 + -0x27);
                auVar332 = ZEXT416(uVar305 >> 1 & 0x1f);
                auVar332 = pshuflw(auVar332,auVar332,0);
                lVar310 = 0;
                lVar306 = 0;
                do {
                  auVar1253 = auVar546;
                  if (lVar306 < (int)uVar308) {
                    auVar1356 = *(undefined1 (*) [16])(left + lVar306 + iVar307);
                    auVar1522 = *(undefined1 (*) [16])(left + lVar306 + (long)iVar307 + 1);
                    auVar1198 = pmovzxbw(auVar546,auVar1356);
                    auVar1523 = pmovzxbw(in_XMM7,auVar1522);
                    auVar1199 = psllw(auVar1198,5);
                    sVar313 = auVar332._0_2_;
                    in_XMM7._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * sVar313;
                    sVar502 = auVar332._2_2_;
                    in_XMM7._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * sVar502;
                    in_XMM7._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * sVar313;
                    in_XMM7._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * sVar502;
                    in_XMM7._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * sVar313;
                    in_XMM7._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * sVar502;
                    in_XMM7._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * sVar313;
                    in_XMM7._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * sVar502;
                    uVar1169 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM7._0_2_) >> 5;
                    uVar1346 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM7._2_2_) >> 5;
                    uVar1347 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM7._4_2_) >> 5;
                    uVar1348 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM7._6_2_) >> 5;
                    uVar1349 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM7._8_2_) >> 5;
                    uVar1350 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM7._10_2_) >> 5;
                    uVar1351 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM7._12_2_) >> 5;
                    uVar1352 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM7._14_2_) >> 5;
                    auVar1375._0_2_ = CONCAT11(0,auVar1356[8]);
                    auVar1375[2] = auVar1356[9];
                    auVar1375[3] = 0;
                    auVar1375[4] = auVar1356[10];
                    auVar1375[5] = 0;
                    auVar1375[6] = auVar1356[0xb];
                    auVar1375[7] = 0;
                    auVar1375[8] = auVar1356[0xc];
                    auVar1375[9] = 0;
                    auVar1375[10] = auVar1356[0xd];
                    auVar1375[0xb] = 0;
                    auVar1375[0xc] = auVar1356[0xe];
                    auVar1375[0xd] = 0;
                    auVar1375[0xe] = auVar1356[0xf];
                    auVar1375[0xf] = 0;
                    auVar1198 = psllw(auVar1375,5);
                    uVar1353 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                                       (auVar1522[8] - auVar1375._0_2_) * sVar313) >> 5;
                    uVar1423 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                                       ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * sVar502) >> 5
                    ;
                    uVar1424 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                                       ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * sVar313) >>
                               5;
                    uVar1425 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                                       ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * sVar502)
                               >> 5;
                    uVar1426 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                                       ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * sVar313)
                               >> 5;
                    uVar1427 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                                       ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * sVar502)
                               >> 5;
                    uVar1428 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                                       ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * sVar313)
                               >> 5;
                    uVar1429 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                                       ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * sVar502)
                               >> 5;
                    auVar1253[1] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 -
                                   (0xff < uVar1346);
                    auVar1253[0] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 -
                                   (0xff < uVar1169);
                    auVar1253[2] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 -
                                   (0xff < uVar1347);
                    auVar1253[3] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 -
                                   (0xff < uVar1348);
                    auVar1253[4] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 -
                                   (0xff < uVar1349);
                    auVar1253[5] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 -
                                   (0xff < uVar1350);
                    auVar1253[6] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 -
                                   (0xff < uVar1351);
                    auVar1253[7] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 -
                                   (0xff < uVar1352);
                    auVar1253[8] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 -
                                   (0xff < uVar1353);
                    auVar1253[9] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 -
                                   (0xff < uVar1423);
                    auVar1253[10] =
                         (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
                    auVar1253[0xb] =
                         (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
                    auVar1253[0xc] =
                         (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
                    auVar1253[0xd] =
                         (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
                    auVar1253[0xe] =
                         (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
                    auVar1253[0xf] =
                         (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
                  }
                  *(undefined1 (*) [16])((long)local_1638 + lVar310) = auVar1253;
                  lVar310 = lVar310 + 0x10;
                  lVar306 = 0x10;
                } while (lVar310 != 0x20);
                if (0x1f < uVar308) {
                  uVar308 = 0x20;
                }
                auVar2._8_8_ = local_1638[1];
                auVar2._0_8_ = local_1638[0];
                auVar332 = pblendvb(auVar546,auVar2,
                                    *(undefined1 (*) [16])(Mask[0][0] + (uVar308 << 4)));
                auVar7[1] = uStack_1627;
                auVar7[0] = local_1628;
                auVar7[2] = uStack_1626;
                auVar7[3] = uStack_1625;
                auVar7[4] = uStack_1624;
                auVar7[5] = uStack_1623;
                auVar7[6] = uStack_1622;
                auVar7[7] = uStack_1621;
                auVar7[8] = uStack_1620;
                auVar7[9] = uStack_161f;
                auVar7[10] = uStack_161e;
                auVar7[0xb] = uStack_161d;
                auVar7[0xc] = uStack_161c;
                auVar7[0xd] = uStack_161b;
                auVar7[0xe] = uStack_161a;
                auVar7[0xf] = uStack_1619;
                auVar1356 = pblendvb(auVar546,auVar7,
                                     *(undefined1 (*) [16])(Mask[1][0] + (uVar308 << 4)));
                *(undefined1 (*) [16])(local_1038 + lVar304 * 0x10) = auVar332;
                *(undefined1 (*) [16])(&local_1438 + lVar304 * 4) = auVar1356;
                uVar305 = uVar305 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [16])(local_1038 + lVar306) = auVar546;
                  *(undefined1 (*) [16])((long)&local_1438 + lVar306) = auVar546;
                  lVar306 = lVar306 + 0x10;
                } while (lVar306 != 0x80);
              }
              if (0x26 < iVar307) break;
              lVar304 = lVar304 + 1;
              lVar300 = lVar300 + 0x10;
            } while (lVar304 != 8);
            auVar1566._0_14_ = local_1038._0_14_;
            auVar1566[0xe] = local_1038[7];
            auVar1566[0xf] = local_1028[7];
            auVar1565._14_2_ = auVar1566._14_2_;
            auVar1565._0_13_ = local_1038._0_13_;
            auVar1565[0xd] = local_1028[6];
            auVar1564._13_3_ = auVar1565._13_3_;
            auVar1564._0_12_ = local_1038._0_12_;
            auVar1564[0xc] = local_1038[6];
            auVar1563._12_4_ = auVar1564._12_4_;
            auVar1563._0_11_ = local_1038._0_11_;
            auVar1563[0xb] = local_1028[5];
            auVar1562._11_5_ = auVar1563._11_5_;
            auVar1562._0_10_ = local_1038._0_10_;
            auVar1562[10] = local_1038[5];
            auVar1561._10_6_ = auVar1562._10_6_;
            auVar1561._0_9_ = local_1038._0_9_;
            auVar1561[9] = local_1028[4];
            auVar1560._9_7_ = auVar1561._9_7_;
            auVar1560._0_8_ = local_1038._0_8_;
            auVar1560[8] = local_1038[4];
            Var17 = CONCAT91(CONCAT81(auVar1560._8_8_,local_1028[3]),local_1038[3]);
            auVar111._2_10_ = Var17;
            auVar111[1] = local_1028[2];
            auVar111[0] = local_1038[2];
            auVar1559._4_12_ = auVar111;
            auVar1559[3] = local_1028[1];
            auVar1559[2] = local_1038[1];
            auVar1559._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
            auVar1801._0_14_ = local_1018._0_14_;
            auVar1801[0xe] = local_1018[7];
            auVar1801[0xf] = local_1008[7];
            auVar1800._14_2_ = auVar1801._14_2_;
            auVar1800._0_13_ = local_1018._0_13_;
            auVar1800[0xd] = local_1008[6];
            auVar1799._13_3_ = auVar1800._13_3_;
            auVar1799._0_12_ = local_1018._0_12_;
            auVar1799[0xc] = local_1018[6];
            auVar1798._12_4_ = auVar1799._12_4_;
            auVar1798._0_11_ = local_1018._0_11_;
            auVar1798[0xb] = local_1008[5];
            auVar1797._11_5_ = auVar1798._11_5_;
            auVar1797._0_10_ = local_1018._0_10_;
            auVar1797[10] = local_1018[5];
            auVar1796._10_6_ = auVar1797._10_6_;
            auVar1796._0_9_ = local_1018._0_9_;
            auVar1796[9] = local_1008[4];
            auVar1795._9_7_ = auVar1796._9_7_;
            auVar1795._0_8_ = local_1018._0_8_;
            auVar1795[8] = local_1018[4];
            Var19 = CONCAT91(CONCAT81(auVar1795._8_8_,local_1008[3]),local_1018[3]);
            auVar112._2_10_ = Var19;
            auVar112[1] = local_1008[2];
            auVar112[0] = local_1018[2];
            uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
            auVar1865._0_9_ = (unkuint9)uVar305 << 0x30;
            uVar241 = CONCAT24(uStack_fee,uVar305);
            auVar253._6_5_ = 0;
            auVar253._0_6_ = uVar241;
            auVar1866._0_11_ = auVar253 << 0x30;
            auVar275._8_5_ = 0;
            auVar275._0_8_ = CONCAT26(uStack_fec,uVar241);
            auVar1867._0_13_ = auVar275 << 0x30;
            auVar1867._14_2_ =
                 (undefined2)
                 (CONCAT19(local_fe8._7_1_,
                           CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241)))
                 >> 0x40);
            auVar1867[0xd] = local_fe8._6_1_;
            Var243 = CONCAT37(auVar1867._13_3_,CONCAT16((char)uStack_ff2,uVar241));
            auVar1866._12_4_ = (undefined4)((unkuint10)Var243 >> 0x30);
            auVar1866[0xb] = local_fe8._5_1_;
            Var162 = CONCAT55(auVar1866._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
            auVar1865._10_6_ = (undefined6)((unkuint10)Var162 >> 0x20);
            auVar1865[9] = local_fe8._4_1_;
            Var158 = CONCAT73(auVar1865._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
            Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var158 >> 0x10),local_fe8._3_1_),
                             (char)((ushort)uStack_ff6 >> 8));
            auVar113._2_10_ = Var21;
            auVar113[1] = local_fe8._2_1_;
            auVar113[0] = (char)uStack_ff6;
            auVar1864._4_12_ = auVar113;
            auVar1864[3] = local_fe8._1_1_;
            uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
            auVar1864[2] = uStack_1624;
            auVar1864._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
            uVar305 = CONCAT22(uStack_fd0,uStack_fd2);
            auVar1953._0_9_ = (unkuint9)uVar305 << 0x30;
            uVar241 = CONCAT24(uStack_fce,uVar305);
            auVar254._6_5_ = 0;
            auVar254._0_6_ = uVar241;
            auVar1954._0_11_ = auVar254 << 0x30;
            auVar276._8_5_ = 0;
            auVar276._0_8_ = CONCAT26(uStack_fcc,uVar241);
            auVar1955._0_13_ = auVar276 << 0x30;
            auVar1955._14_2_ =
                 (undefined2)
                 (CONCAT19(local_fc8._7_1_,
                           CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar241)))
                 >> 0x40);
            auVar1955[0xd] = local_fc8._6_1_;
            Var244 = CONCAT37(auVar1955._13_3_,CONCAT16((char)uStack_fd2,uVar241));
            auVar1954._12_4_ = (undefined4)((unkuint10)Var244 >> 0x30);
            auVar1954[0xb] = local_fc8._5_1_;
            Var164 = CONCAT55(auVar1954._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar305));
            auVar1953._10_6_ = (undefined6)((unkuint10)Var164 >> 0x20);
            auVar1953[9] = local_fc8._4_1_;
            Var160 = CONCAT73(auVar1953._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
            Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var160 >> 0x10),local_fc8._3_1_),
                             (char)((ushort)uStack_fd6 >> 8));
            auVar114._2_10_ = Var23;
            auVar114[1] = local_fc8._2_1_;
            auVar114[0] = (char)uStack_fd6;
            auVar2028._0_12_ = auVar1559._0_12_;
            auVar2028._12_2_ = (short)Var17;
            auVar2028._14_2_ = (short)Var19;
            auVar2027._12_4_ = auVar2028._12_4_;
            auVar2027._0_10_ = auVar1559._0_10_;
            auVar2027._10_2_ = auVar112._0_2_;
            auVar2026._10_6_ = auVar2027._10_6_;
            auVar2026._0_8_ = auVar1559._0_8_;
            auVar2026._8_2_ = auVar111._0_2_;
            auVar2087._0_12_ = auVar1864._0_12_;
            auVar2087._12_2_ = (short)Var21;
            auVar2087._14_2_ = (short)Var23;
            auVar2086._12_4_ = auVar2087._12_4_;
            auVar2086._0_10_ = auVar1864._0_10_;
            auVar2086._10_2_ = auVar114._0_2_;
            auVar2085._10_6_ = auVar2086._10_6_;
            auVar2085._0_8_ = auVar1864._0_8_;
            auVar2085._8_2_ = auVar113._0_2_;
            local_1608._4_4_ = auVar2086._12_4_;
            local_1608._0_4_ = auVar2027._12_4_;
            local_1638[0] =
                 CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar1864._0_2_),
                          CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar1559._0_2_));
            local_1638[1] = 0;
            local_1628 = local_1038[1];
            uStack_1627 = local_1028[1];
            uStack_1626 = local_1018[1];
            uStack_1625 = local_1008[1];
            uStack_1623 = local_fe8._1_1_;
            uStack_1622 = (char)((ushort)local_fd8 >> 8);
            uStack_1621 = local_fc8._1_1_;
            uStack_1620 = 0;
            uStack_161f = 0;
            uStack_161e = 0;
            uStack_161d = 0;
            uStack_161c = 0;
            uStack_161b = 0;
            uStack_161a = 0;
            uStack_1619 = 0;
            local_1618 = auVar2026._8_4_;
            uStack_1614 = auVar2085._8_4_;
            uStack_1610 = 0;
            uStack_160c = 0;
            local_1608._8_8_ = 0;
            auVar490._12_4_ = CONCAT22(auVar1795._8_2_,auVar1560._8_2_);
            auVar1521._0_8_ = CONCAT26(auVar1797._10_2_,CONCAT24(auVar1562._10_2_,auVar490._12_4_));
            auVar1521._8_2_ = auVar1564._12_2_;
            auVar1521._10_2_ = auVar1799._12_2_;
            auVar1567._12_2_ = auVar1565._14_2_;
            auVar1567._0_12_ = auVar1521;
            auVar1567._14_2_ = auVar1800._14_2_;
            auVar926._12_4_ =
                 CONCAT22((short)((unkuint10)Var160 >> 0x10),(short)((unkuint10)Var158 >> 0x10));
            auVar1827._0_8_ =
                 CONCAT26((short)((unkuint10)Var164 >> 0x20),
                          CONCAT24((short)((unkuint10)Var162 >> 0x20),auVar926._12_4_));
            auVar1827._8_2_ = (short)((unkuint10)Var243 >> 0x30);
            auVar1827._10_2_ = (short)((unkuint10)Var244 >> 0x30);
            auVar1868._12_2_ = auVar1867._14_2_;
            auVar1868._0_12_ = auVar1827;
            auVar1868._14_2_ = auVar1955._14_2_;
            auVar1802._8_4_ = (int)((ulong)auVar1521._0_8_ >> 0x20);
            auVar1802._0_8_ = auVar1521._0_8_;
            auVar1802._12_4_ = (int)((ulong)auVar1827._0_8_ >> 0x20);
            auVar1568._0_8_ = CONCAT44(auVar1827._8_4_,auVar1521._8_4_);
            auVar1568._8_4_ = auVar1567._12_4_;
            auVar1568._12_4_ = auVar1868._12_4_;
            local_15f8 = CONCAT44(auVar926._12_4_,auVar490._12_4_);
            uStack_15f0 = 0;
            local_15e8 = auVar1802._8_8_;
            uStack_15e0 = 0;
            local_15d8 = auVar1568._0_8_;
            uStack_15d0 = 0;
            local_15c8 = auVar1568 >> 0x40;
            uVar314 = CONCAT11(local_1028[8],local_1038[8]);
            auVar490._12_4_ = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar314));
            uVar315 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],auVar490._12_4_));
            uVar316 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar315));
            auVar318._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar316));
            auVar318[10] = local_1038[0xd];
            auVar318[0xb] = local_1028[0xd];
            auVar325[0xc] = local_1038[0xe];
            auVar325._0_12_ = auVar318;
            auVar325[0xd] = local_1028[0xe];
            auVar391[0xe] = local_1038[0xf];
            auVar391._0_14_ = auVar325;
            auVar391[0xf] = local_1028[0xf];
            uVar503 = CONCAT11(local_1008[8],local_1018[8]);
            auVar926._12_4_ = CONCAT13(local_1008[9],CONCAT12(local_1018[9],uVar503));
            uVar504 = CONCAT15(local_1008[10],CONCAT14(local_1018[10],auVar926._12_4_));
            uVar505 = CONCAT17(local_1008[0xb],CONCAT16(local_1018[0xb],uVar504));
            auVar517._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(local_1018[0xc],uVar505));
            auVar517[10] = local_1018[0xd];
            auVar517[0xb] = local_1008[0xd];
            auVar539[0xc] = local_1018[0xe];
            auVar539._0_12_ = auVar517;
            auVar539[0xd] = local_1008[0xe];
            auVar642[0xe] = local_1018[0xf];
            auVar642._0_14_ = auVar539;
            auVar642[0xf] = local_1008[0xf];
            uVar780 = CONCAT11((undefined1)uStack_fe0,(char)uStack_ff0);
            uVar781 = CONCAT13(uStack_fe0._1_1_,CONCAT12((char)((ushort)uStack_ff0 >> 8),uVar780));
            uVar782 = CONCAT15(uStack_fe0._2_1_,CONCAT14((char)uStack_fee,uVar781));
            uVar783 = CONCAT17(uStack_fe0._3_1_,CONCAT16((char)((ushort)uStack_fee >> 8),uVar782));
            auVar789._0_10_ = CONCAT19(uStack_fe0._4_1_,CONCAT18((char)uStack_fec,uVar783));
            auVar789[10] = (char)((ushort)uStack_fec >> 8);
            auVar789[0xb] = uStack_fe0._5_1_;
            auVar808[0xc] = (char)uStack_fea;
            auVar808._0_12_ = auVar789;
            auVar808[0xd] = uStack_fe0._6_1_;
            auVar861[0xe] = (char)((ushort)uStack_fea >> 8);
            auVar861._0_14_ = auVar808;
            auVar861[0xf] = uStack_fe0._7_1_;
            uVar935 = CONCAT11((undefined1)uStack_fc0,(char)uStack_fd0);
            uVar936 = CONCAT13(uStack_fc0._1_1_,CONCAT12((char)((ushort)uStack_fd0 >> 8),uVar935));
            uVar937 = CONCAT15(uStack_fc0._2_1_,CONCAT14((char)uStack_fce,uVar936));
            uVar938 = CONCAT17(uStack_fc0._3_1_,CONCAT16((char)((ushort)uStack_fce >> 8),uVar937));
            auVar949._0_10_ = CONCAT19(uStack_fc0._4_1_,CONCAT18((char)uStack_fcc,uVar938));
            auVar949[10] = (char)((ushort)uStack_fcc >> 8);
            auVar949[0xb] = uStack_fc0._5_1_;
            auVar969[0xc] = (char)uStack_fca;
            auVar969._0_12_ = auVar949;
            auVar969[0xd] = uStack_fc0._6_1_;
            auVar1054[0xe] = (char)((ushort)uStack_fca >> 8);
            auVar1054._0_14_ = auVar969;
            auVar1054[0xf] = uStack_fc0._7_1_;
            auVar1259._12_2_ = (short)((ulong)uVar316 >> 0x30);
            auVar1259._0_12_ = auVar318;
            auVar1259._14_2_ = (short)((ulong)uVar505 >> 0x30);
            auVar1258._12_4_ = auVar1259._12_4_;
            auVar1258._10_2_ = (short)((uint6)uVar504 >> 0x20);
            auVar1258._0_10_ = auVar318._0_10_;
            auVar1257._10_6_ = auVar1258._10_6_;
            auVar1257._8_2_ = (short)((uint6)uVar315 >> 0x20);
            auVar1257._0_8_ = uVar316;
            auVar1256._8_8_ = auVar1257._8_8_;
            auVar1256._6_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
            auVar1256._0_6_ = uVar315;
            auVar1255._6_10_ = auVar1256._6_10_;
            auVar1255._4_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
            auVar1255._0_4_ = auVar490._12_4_;
            auVar1254._4_12_ = auVar1255._4_12_;
            auVar1254._0_4_ = CONCAT22(uVar503,uVar314);
            auVar1380._12_2_ = (short)((ulong)uVar783 >> 0x30);
            auVar1380._0_12_ = auVar789;
            auVar1380._14_2_ = (short)((ulong)uVar938 >> 0x30);
            auVar1379._12_4_ = auVar1380._12_4_;
            auVar1379._10_2_ = (short)((uint6)uVar937 >> 0x20);
            auVar1379._0_10_ = auVar789._0_10_;
            auVar1378._10_6_ = auVar1379._10_6_;
            auVar1378._8_2_ = (short)((uint6)uVar782 >> 0x20);
            auVar1378._0_8_ = uVar783;
            auVar1377._8_8_ = auVar1378._8_8_;
            auVar1377._6_2_ = (short)((uint)uVar936 >> 0x10);
            auVar1377._0_6_ = uVar782;
            auVar1376._6_10_ = auVar1377._6_10_;
            auVar1376._4_2_ = (short)((uint)uVar781 >> 0x10);
            auVar1376._0_4_ = uVar781;
            auVar1475._0_8_ = auVar1254._0_8_;
            auVar1475._8_4_ = auVar1255._4_4_;
            auVar1475._12_4_ = auVar1376._4_4_;
            auVar1260._0_8_ = CONCAT44(auVar1378._8_4_,auVar1257._8_4_);
            auVar1260._8_4_ = auVar1258._12_4_;
            auVar1260._12_4_ = auVar1379._12_4_;
            local_15b8 = CONCAT44(CONCAT22(uVar935,uVar780),auVar1254._0_4_);
            auStack_15b0[0] = 0;
            auStack_15b0[1] = auVar1475._8_8_;
            auStack_15b0[2] = 0;
            local_1598 = auVar1260._0_8_;
            uStack_1590 = 0;
            local_1588 = auVar1260 >> 0x40;
            auVar490._12_4_ =
                 CONCAT22((short)((unkuint10)auVar517._0_10_ >> 0x40),
                          (short)((unkuint10)auVar318._0_10_ >> 0x40));
            auVar319._0_8_ = CONCAT26(auVar517._10_2_,CONCAT24(auVar318._10_2_,auVar490._12_4_));
            auVar319._8_2_ = auVar325._12_2_;
            auVar319._10_2_ = auVar539._12_2_;
            auVar392._12_2_ = auVar391._14_2_;
            auVar392._0_12_ = auVar319;
            auVar392._14_2_ = auVar642._14_2_;
            auVar926._12_4_ =
                 CONCAT22((short)((unkuint10)auVar949._0_10_ >> 0x40),
                          (short)((unkuint10)auVar789._0_10_ >> 0x40));
            auVar790._0_8_ = CONCAT26(auVar949._10_2_,CONCAT24(auVar789._10_2_,auVar926._12_4_));
            auVar790._8_2_ = auVar808._12_2_;
            auVar790._10_2_ = auVar969._12_2_;
            auVar862._12_2_ = auVar861._14_2_;
            auVar862._0_12_ = auVar790;
            auVar862._14_2_ = auVar1054._14_2_;
            auVar643._8_4_ = (int)((ulong)auVar319._0_8_ >> 0x20);
            auVar643._0_8_ = auVar319._0_8_;
            auVar643._12_4_ = (int)((ulong)auVar790._0_8_ >> 0x20);
            auVar393._0_8_ = CONCAT44(auVar790._8_4_,auVar319._8_4_);
            auVar393._8_4_ = auVar392._12_4_;
            auVar393._12_4_ = auVar862._12_4_;
            local_1578 = CONCAT44(auVar926._12_4_,auVar490._12_4_);
            uStack_1570 = 0;
            local_1568 = auVar643._8_8_;
            uStack_1560 = 0;
            local_1558 = auVar393._0_8_;
            uStack_1550 = 0;
            local_1548 = auVar393 >> 0x40;
            auVar14._8_8_ = uStack_1430;
            auVar14._0_8_ = CONCAT44(uStack_1434,local_1438);
            auVar1062._0_14_ = auVar14._0_14_;
            auVar1062[0xe] = (char)((uint)uStack_1434 >> 0x18);
            auVar1062[0xf] = uStack_1421;
            auVar1061._14_2_ = auVar1062._14_2_;
            auVar1061._0_13_ = auVar14._0_13_;
            auVar1061[0xd] = uStack_1422;
            auVar1060._13_3_ = auVar1061._13_3_;
            auVar1060._0_12_ = auVar14._0_12_;
            auVar1060[0xc] = (char)((uint)uStack_1434 >> 0x10);
            auVar1059._12_4_ = auVar1060._12_4_;
            auVar1059._0_11_ = auVar14._0_11_;
            auVar1059[0xb] = uStack_1423;
            auVar1058._11_5_ = auVar1059._11_5_;
            auVar1058._0_10_ = auVar14._0_10_;
            auVar1058[10] = (char)((uint)uStack_1434 >> 8);
            auVar1057._10_6_ = auVar1058._10_6_;
            auVar1057._0_9_ = auVar14._0_9_;
            auVar1057[9] = uStack_1424;
            auVar1056._9_7_ = auVar1057._9_7_;
            auVar1056[8] = (char)uStack_1434;
            auVar1056._0_8_ = CONCAT44(uStack_1434,local_1438);
            Var17 = CONCAT91(CONCAT81(auVar1056._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18))
            ;
            auVar116._2_10_ = Var17;
            auVar116[1] = uStack_1426;
            auVar116[0] = (char)((uint)local_1438 >> 0x10);
            auVar115._2_12_ = auVar116;
            auVar115[1] = uStack_1427;
            auVar115[0] = (char)((uint)local_1438 >> 8);
            auVar1055._0_2_ = CONCAT11(local_1428,(char)local_1438);
            auVar1055._2_14_ = auVar115;
            auVar2228._0_14_ = local_1418._0_14_;
            auVar2228[0xe] = local_1418[7];
            auVar2228[0xf] = uStack_1401;
            auVar2227._14_2_ = auVar2228._14_2_;
            auVar2227._0_13_ = local_1418._0_13_;
            auVar2227[0xd] = uStack_1402;
            auVar2226._13_3_ = auVar2227._13_3_;
            auVar2226._0_12_ = local_1418._0_12_;
            auVar2226[0xc] = local_1418[6];
            auVar2225._12_4_ = auVar2226._12_4_;
            auVar2225._0_11_ = local_1418._0_11_;
            auVar2225[0xb] = uStack_1403;
            auVar2224._11_5_ = auVar2225._11_5_;
            auVar2224._0_10_ = local_1418._0_10_;
            auVar2224[10] = local_1418[5];
            auVar2223._10_6_ = auVar2224._10_6_;
            auVar2223._0_9_ = local_1418._0_9_;
            auVar2223[9] = uStack_1404;
            auVar2222._9_7_ = auVar2223._9_7_;
            auVar2222._0_8_ = local_1418._0_8_;
            auVar2222[8] = local_1418[4];
            Var19 = CONCAT91(CONCAT81(auVar2222._8_8_,uStack_1405),local_1418[3]);
            auVar118._2_10_ = Var19;
            auVar118[1] = uStack_1406;
            auVar118[0] = local_1418[2];
            auVar117._2_12_ = auVar118;
            auVar117[1] = uStack_1407;
            auVar117[0] = local_1418[1];
            auVar2095._0_14_ = local_13f8._0_14_;
            auVar2095[0xe] = local_13f8[7];
            auVar2095[0xf] = uStack_13e1;
            auVar2094._14_2_ = auVar2095._14_2_;
            auVar2094._0_13_ = local_13f8._0_13_;
            auVar2094[0xd] = uStack_13e2;
            auVar2093._13_3_ = auVar2094._13_3_;
            auVar2093._0_12_ = local_13f8._0_12_;
            auVar2093[0xc] = local_13f8[6];
            auVar2092._12_4_ = auVar2093._12_4_;
            auVar2092._0_11_ = local_13f8._0_11_;
            auVar2092[0xb] = uStack_13e3;
            auVar2091._11_5_ = auVar2092._11_5_;
            auVar2091._0_10_ = local_13f8._0_10_;
            auVar2091[10] = local_13f8[5];
            auVar2090._10_6_ = auVar2091._10_6_;
            auVar2090._0_9_ = local_13f8._0_9_;
            auVar2090[9] = uStack_13e4;
            auVar2089._9_7_ = auVar2090._9_7_;
            auVar2089._0_8_ = local_13f8._0_8_;
            auVar2089[8] = local_13f8[4];
            Var21 = CONCAT91(CONCAT81(auVar2089._8_8_,uStack_13e5),local_13f8[3]);
            auVar120._2_10_ = Var21;
            auVar120[1] = uStack_13e6;
            auVar120[0] = local_13f8[2];
            auVar119._2_12_ = auVar120;
            auVar119[1] = uStack_13e7;
            auVar119[0] = local_13f8[1];
            auVar2088._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
            auVar2088._2_14_ = auVar119;
            auVar2162._0_14_ = local_13d8._0_14_;
            auVar2162[0xe] = local_13d8[7];
            auVar2162[0xf] = uStack_13c1;
            auVar2161._14_2_ = auVar2162._14_2_;
            auVar2161._0_13_ = local_13d8._0_13_;
            auVar2161[0xd] = uStack_13c2;
            auVar2160._13_3_ = auVar2161._13_3_;
            auVar2160._0_12_ = local_13d8._0_12_;
            auVar2160[0xc] = local_13d8[6];
            auVar2159._12_4_ = auVar2160._12_4_;
            auVar2159._0_11_ = local_13d8._0_11_;
            auVar2159[0xb] = uStack_13c3;
            auVar2158._11_5_ = auVar2159._11_5_;
            auVar2158._0_10_ = local_13d8._0_10_;
            auVar2158[10] = local_13d8[5];
            auVar2157._10_6_ = auVar2158._10_6_;
            auVar2157._0_9_ = local_13d8._0_9_;
            auVar2157[9] = uStack_13c4;
            auVar2156._9_7_ = auVar2157._9_7_;
            auVar2156._0_8_ = local_13d8._0_8_;
            auVar2156[8] = local_13d8[4];
            Var23 = CONCAT91(CONCAT81(auVar2156._8_8_,uStack_13c5),local_13d8[3]);
            auVar122._2_10_ = Var23;
            auVar122[1] = uStack_13c6;
            auVar122[0] = local_13d8[2];
            auVar121._2_12_ = auVar122;
            auVar121[1] = uStack_13c7;
            auVar121[0] = local_13d8[1];
            auVar1959._0_12_ = auVar1055._0_12_;
            auVar1959._12_2_ = (short)Var17;
            auVar1959._14_2_ = (short)Var19;
            auVar1958._12_4_ = auVar1959._12_4_;
            auVar1958._0_10_ = auVar1055._0_10_;
            auVar1958._10_2_ = auVar118._0_2_;
            auVar1957._10_6_ = auVar1958._10_6_;
            auVar1957._0_8_ = auVar1055._0_8_;
            auVar1957._8_2_ = auVar116._0_2_;
            auVar123._4_8_ = auVar1957._8_8_;
            auVar123._2_2_ = auVar117._0_2_;
            auVar123._0_2_ = auVar115._0_2_;
            auVar1956._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar1055._0_2_);
            auVar1956._4_12_ = auVar123;
            auVar646._0_12_ = auVar2088._0_12_;
            auVar646._12_2_ = (short)Var21;
            auVar646._14_2_ = (short)Var23;
            auVar645._12_4_ = auVar646._12_4_;
            auVar645._0_10_ = auVar2088._0_10_;
            auVar645._10_2_ = auVar122._0_2_;
            auVar644._10_6_ = auVar645._10_6_;
            auVar644._0_8_ = auVar2088._0_8_;
            auVar644._8_2_ = auVar120._0_2_;
            auVar124._4_8_ = auVar644._8_8_;
            auVar124._2_2_ = auVar121._0_2_;
            auVar124._0_2_ = auVar119._0_2_;
            auVar863._0_8_ = auVar1956._0_8_;
            auVar863._8_4_ = auVar123._0_4_;
            auVar863._12_4_ = auVar124._0_4_;
            local_1238[0] =
                 CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2088._0_2_),
                          auVar1956._0_4_);
            local_1238[1] = 0;
            local_1238[2] = auVar863._8_8_;
            local_1238[3] = 0;
            local_1218 = auVar1957._8_4_;
            uStack_1214 = auVar644._8_4_;
            uStack_1210 = 0;
            uStack_120c = 0;
            uStack_1200 = auVar1958._12_4_;
            uStack_11fc = auVar645._12_4_;
            auVar490._12_4_ = CONCAT22(auVar2222._8_2_,auVar1056._8_2_);
            auVar950._0_8_ = CONCAT26(auVar2224._10_2_,CONCAT24(auVar1058._10_2_,auVar490._12_4_));
            auVar950._8_2_ = auVar1060._12_2_;
            auVar950._10_2_ = auVar2226._12_2_;
            auVar1063._12_2_ = auVar1061._14_2_;
            auVar1063._0_12_ = auVar950;
            auVar1063._14_2_ = auVar2227._14_2_;
            auVar926._12_4_ = CONCAT22(auVar2156._8_2_,auVar2089._8_2_);
            auVar2043._0_8_ = CONCAT26(auVar2158._10_2_,CONCAT24(auVar2091._10_2_,auVar926._12_4_));
            auVar2043._8_2_ = auVar2093._12_2_;
            auVar2043._10_2_ = auVar2160._12_2_;
            auVar2096._12_2_ = auVar2094._14_2_;
            auVar2096._0_12_ = auVar2043;
            auVar2096._14_2_ = auVar2161._14_2_;
            auVar394._8_4_ = (int)((ulong)auVar950._0_8_ >> 0x20);
            auVar394._0_8_ = auVar950._0_8_;
            auVar394._12_4_ = (int)((ulong)auVar2043._0_8_ >> 0x20);
            local_11f8 = CONCAT44(auVar926._12_4_,auVar490._12_4_);
            uStack_11f0 = 0;
            local_11e8 = auVar394._8_8_;
            uStack_11e0 = 0;
            local_11d8 = auVar950._8_4_;
            uStack_11d4 = auVar2043._8_4_;
            uStack_11d0 = 0;
            uStack_11cc = 0;
            uStack_11c0 = auVar1063._12_4_;
            uStack_11bc = auVar2096._12_4_;
            uVar314 = CONCAT11(uStack_1420,(char)uStack_1430);
            uVar936 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar314));
            uVar937 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar936));
            uVar938 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar937));
            auVar1444._0_10_ =
                 CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar938));
            auVar1444[10] = (char)((ulong)uStack_1430 >> 0x28);
            auVar1444[0xb] = uStack_141b;
            auVar1459[0xc] = (char)((ulong)uStack_1430 >> 0x30);
            auVar1459._0_12_ = auVar1444;
            auVar1459[0xd] = uStack_141a;
            auVar1476[0xe] = (char)((ulong)uStack_1430 >> 0x38);
            auVar1476._0_14_ = auVar1459;
            auVar1476[0xf] = uStack_1419;
            uStack_1640 = local_1418[8];
            uStack_163f = local_1418[9];
            uStack_163e = local_1418[10];
            uStack_163d = local_1418[0xb];
            uStack_163c = local_1418[0xc];
            uStack_163b = local_1418[0xd];
            uStack_163a = local_1418[0xe];
            uStack_1639 = local_1418[0xf];
            auVar490._12_4_ =
                 CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
            uVar315 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar490._12_4_));
            uVar316 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar315));
            auVar518._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar316));
            auVar518[10] = uStack_163b;
            auVar518[0xb] = uStack_13fb;
            auVar540[0xc] = uStack_163a;
            auVar540._0_12_ = auVar518;
            auVar540[0xd] = uStack_13fa;
            auVar647[0xe] = uStack_1639;
            auVar647._0_14_ = auVar540;
            auVar647[0xf] = uStack_13f9;
            uStack_1670 = local_13f8[8];
            uStack_166f = local_13f8[9];
            uStack_166e = local_13f8[10];
            uStack_166d = local_13f8[0xb];
            uStack_166c = local_13f8[0xc];
            uStack_166b = local_13f8[0xd];
            uStack_166a = local_13f8[0xe];
            uStack_1669 = local_13f8[0xf];
            auVar926._12_4_ =
                 CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
            uVar504 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar926._12_4_));
            uVar505 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar504));
            auVar791._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar505));
            auVar791[10] = uStack_166b;
            auVar791[0xb] = uStack_13db;
            auVar809[0xc] = uStack_166a;
            auVar809._0_12_ = auVar791;
            auVar809[0xd] = uStack_13da;
            auVar864[0xe] = uStack_1669;
            auVar864._0_14_ = auVar809;
            auVar864[0xf] = uStack_13d9;
            uStack_1690 = local_13d8[8];
            uStack_168f = local_13d8[9];
            uStack_168e = local_13d8[10];
            uStack_168d = local_13d8[0xb];
            uStack_168c = local_13d8[0xc];
            uStack_168b = local_13d8[0xd];
            uStack_168a = local_13d8[0xe];
            uStack_1689 = local_13d8[0xf];
            uVar781 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
            uVar782 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar781));
            uVar783 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar782));
            auVar951._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar783));
            auVar951[10] = uStack_168b;
            auVar951[0xb] = uStack_13bb;
            auVar970[0xc] = uStack_168a;
            auVar970._0_12_ = auVar951;
            auVar970[0xd] = uStack_13ba;
            auVar1064[0xe] = uStack_1689;
            auVar1064._0_14_ = auVar970;
            auVar1064[0xf] = uStack_13b9;
            auVar400._12_2_ = (short)((ulong)uVar938 >> 0x30);
            auVar400._0_12_ = auVar1444;
            auVar400._14_2_ = (short)((ulong)uVar316 >> 0x30);
            auVar399._12_4_ = auVar400._12_4_;
            auVar399._10_2_ = (short)((uint6)uVar315 >> 0x20);
            auVar399._0_10_ = auVar1444._0_10_;
            auVar398._10_6_ = auVar399._10_6_;
            auVar398._8_2_ = (short)((uint6)uVar937 >> 0x20);
            auVar398._0_8_ = uVar938;
            auVar397._8_8_ = auVar398._8_8_;
            auVar397._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
            auVar397._0_6_ = uVar937;
            auVar396._6_10_ = auVar397._6_10_;
            auVar396._4_2_ = (short)((uint)uVar936 >> 0x10);
            auVar396._0_4_ = uVar936;
            auVar395._4_12_ = auVar396._4_12_;
            auVar395._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar314);
            auVar652._12_2_ = (short)((ulong)uVar505 >> 0x30);
            auVar652._0_12_ = auVar791;
            auVar652._14_2_ = (short)((ulong)uVar783 >> 0x30);
            auVar651._12_4_ = auVar652._12_4_;
            auVar651._10_2_ = (short)((uint6)uVar782 >> 0x20);
            auVar651._0_10_ = auVar791._0_10_;
            auVar650._10_6_ = auVar651._10_6_;
            auVar650._8_2_ = (short)((uint6)uVar504 >> 0x20);
            auVar650._0_8_ = uVar505;
            auVar649._8_8_ = auVar650._8_8_;
            auVar649._6_2_ = (short)((uint)uVar781 >> 0x10);
            auVar649._0_6_ = uVar504;
            auVar648._6_10_ = auVar649._6_10_;
            auVar648._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
            auVar648._0_4_ = auVar926._12_4_;
            auVar1261._0_8_ = auVar395._0_8_;
            auVar1261._8_4_ = auVar396._4_4_;
            auVar1261._12_4_ = auVar648._4_4_;
            local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                           CONCAT11(uStack_13e0,uStack_1670)),auVar395._0_4_);
            uStack_11b0 = 0;
            local_11a8 = auVar1261._8_8_;
            uStack_11a0 = 0;
            local_1198 = auVar398._8_4_;
            uStack_1194 = auVar650._8_4_;
            uStack_1190 = 0;
            uStack_118c = 0;
            uStack_1180 = auVar399._12_4_;
            uStack_117c = auVar651._12_4_;
            auVar926._12_4_ =
                 CONCAT22((short)((unkuint10)auVar518._0_10_ >> 0x40),
                          (short)((unkuint10)auVar1444._0_10_ >> 0x40));
            auVar1445._0_8_ = CONCAT26(auVar518._10_2_,CONCAT24(auVar1444._10_2_,auVar926._12_4_));
            auVar1445._8_2_ = auVar1459._12_2_;
            auVar1445._10_2_ = auVar540._12_2_;
            auVar1477._12_2_ = auVar1476._14_2_;
            auVar1477._0_12_ = auVar1445;
            auVar1477._14_2_ = auVar647._14_2_;
            auVar490._12_4_ =
                 CONCAT22((short)((unkuint10)auVar951._0_10_ >> 0x40),
                          (short)((unkuint10)auVar791._0_10_ >> 0x40));
            auVar519._0_8_ = CONCAT26(auVar951._10_2_,CONCAT24(auVar791._10_2_,auVar490._12_4_));
            auVar519._8_2_ = auVar809._12_2_;
            auVar519._10_2_ = auVar970._12_2_;
            auVar653._12_2_ = auVar864._14_2_;
            auVar653._0_12_ = auVar519;
            auVar653._14_2_ = auVar1064._14_2_;
            auVar401._8_4_ = (int)((ulong)auVar1445._0_8_ >> 0x20);
            auVar401._0_8_ = auVar1445._0_8_;
            auVar401._12_4_ = (int)((ulong)auVar519._0_8_ >> 0x20);
            local_1178 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
            uStack_1170 = 0;
            local_1168 = auVar401._8_8_;
            uStack_1160 = 0;
            local_1158 = auVar1445._8_4_;
            uStack_1154 = auVar519._8_4_;
            uStack_1150 = 0;
            uStack_114c = 0;
            uStack_1140 = auVar1477._12_4_;
            uStack_113c = auVar653._12_4_;
            local_1138 = 0;
            lVar300 = 0;
            puVar301 = dst;
            do {
              *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1638 + lVar300);
              lVar300 = lVar300 + 0x10;
              puVar301 = puVar301 + stride;
            } while (lVar300 != 0x100);
            puVar301 = dst + stride * 0x10;
            lVar300 = 0;
            do {
              *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1238 + lVar300);
              puVar301 = puVar301 + stride;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x100);
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar307 = 0x13 << (bVar302 & 0x1f);
          auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
          lVar300 = 0;
          auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar311 = 0;
          uVar305 = dy;
          do {
            iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
            uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
            if ((int)uVar308 < 1) {
              if (uVar311 < 4) {
                do {
                  *(undefined1 (*) [16])((long)local_1638 + lVar300) = auVar546;
                  lVar300 = lVar300 + 0x10;
                } while (lVar300 != 0x40);
              }
              break;
            }
            if (0xf < uVar308) {
              uVar308 = 0x10;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar309);
            if (upsample_left == 0) {
              auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
              auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1648._0_4_ = auVar1198._0_4_;
              auVar1648._4_4_ = auVar1648._0_4_;
              auVar1648._8_4_ = auVar1648._0_4_;
              auVar1648._12_4_ = auVar1648._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_0050db80);
              auVar1522 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
              auVar1646._0_4_ = auVar1198._0_4_;
              auVar1646._4_4_ = auVar1646._0_4_;
              auVar1646._8_4_ = auVar1646._0_4_;
              auVar1646._12_4_ = auVar1646._0_4_;
              auVar1198 = psllw(auVar1646,ZEXT416((uint)upsample_left));
              auVar1647._0_2_ = auVar1198._0_2_ >> 1;
              auVar1647._2_2_ = auVar1198._2_2_ >> 1;
              auVar1647._4_2_ = auVar1198._4_2_ >> 1;
              auVar1647._6_2_ = auVar1198._6_2_ >> 1;
              auVar1647._8_2_ = auVar1198._8_2_ >> 1;
              auVar1647._10_2_ = auVar1198._10_2_ >> 1;
              auVar1647._12_2_ = auVar1198._12_2_ >> 1;
              auVar1647._14_2_ = auVar1198._14_2_ >> 1;
              auVar1648 = auVar1647 & auVar332;
            }
            auVar1198 = pmovzxbw(in_XMM9,auVar1356);
            auVar1523 = pmovzxbw(in_XMM10,auVar1522);
            auVar1199 = psllw(auVar1198,5);
            in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1648._0_2_;
            in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1648._2_2_;
            in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1648._4_2_;
            in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1648._6_2_;
            in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1648._8_2_;
            in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1648._10_2_;
            in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1648._12_2_;
            in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1648._14_2_;
            uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
            auVar329._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar329[2] = auVar1356[9];
            auVar329[3] = 0;
            auVar329[4] = auVar1356[10];
            auVar329[5] = 0;
            auVar329[6] = auVar1356[0xb];
            auVar329[7] = 0;
            auVar329[8] = auVar1356[0xc];
            auVar329[9] = 0;
            auVar329[10] = auVar1356[0xd];
            auVar329[0xb] = 0;
            auVar329[0xc] = auVar1356[0xe];
            auVar329[0xd] = 0;
            auVar329[0xe] = auVar1356[0xf];
            auVar329[0xf] = 0;
            auVar1198 = psllw(auVar329,5);
            uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                               (auVar1522[8] - auVar329._0_2_) * auVar1648._0_2_) >> 5;
            uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                               ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1648._2_2_) >> 5
            ;
            uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                               ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1648._4_2_) >>
                       5;
            uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                               ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1648._6_2_)
                       >> 5;
            uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                               ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1648._8_2_)
                       >> 5;
            uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                               ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1648._10_2_)
                       >> 5;
            uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                               ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1648._12_2_)
                       >> 5;
            uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                               ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1648._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
            in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
            in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
            in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
            in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
            in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
            in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
            in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
            in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348)
            ;
            in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349)
            ;
            in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350)
            ;
            in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351)
            ;
            in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352)
            ;
            auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
            *(undefined1 (*) [16])((long)local_1638 + lVar300) = auVar1356;
            uVar305 = uVar305 + dy;
            uVar311 = uVar311 + 1;
            lVar300 = lVar300 + 0x10;
          } while (uVar311 != 4);
          auVar4._8_8_ = local_1638[1];
          auVar4._0_8_ = local_1638[0];
          auVar10._8_4_ = uStack_1610;
          auVar10._0_8_ = CONCAT44(uStack_1614,local_1618);
          auVar9._12_4_ = uStack_160c;
          auVar9._0_12_ = auVar10;
          auVar1316._0_14_ = auVar4._0_14_;
          auVar1316[0xe] = (char)((ulong)local_1638[0] >> 0x38);
          auVar1316[0xf] = uStack_1621;
          auVar1315._14_2_ = auVar1316._14_2_;
          auVar1315._0_13_ = auVar4._0_13_;
          auVar1315[0xd] = uStack_1622;
          auVar1314._13_3_ = auVar1315._13_3_;
          auVar1314._0_12_ = auVar4._0_12_;
          auVar1314[0xc] = (char)((ulong)local_1638[0] >> 0x30);
          auVar1313._12_4_ = auVar1314._12_4_;
          auVar1313._0_11_ = auVar4._0_11_;
          auVar1313[0xb] = uStack_1623;
          auVar1312._11_5_ = auVar1313._11_5_;
          auVar1312._0_10_ = auVar4._0_10_;
          auVar1312[10] = (char)((ulong)local_1638[0] >> 0x28);
          auVar1311._10_6_ = auVar1312._10_6_;
          auVar1311._0_9_ = auVar4._0_9_;
          auVar1311[9] = uStack_1624;
          auVar1310._9_7_ = auVar1311._9_7_;
          auVar1310[8] = (char)((ulong)local_1638[0] >> 0x20);
          auVar1310._0_8_ = local_1638[0];
          Var17 = CONCAT91(CONCAT81(auVar1310._8_8_,uStack_1625),
                           (char)((ulong)local_1638[0] >> 0x18));
          auVar194._2_10_ = Var17;
          auVar194[1] = uStack_1626;
          auVar194[0] = (char)((ulong)local_1638[0] >> 0x10);
          auVar193._2_12_ = auVar194;
          auVar193[1] = uStack_1627;
          auVar193[0] = (char)((ulong)local_1638[0] >> 8);
          auVar1309._0_2_ = CONCAT11(local_1628,(char)local_1638[0]);
          auVar1309._2_14_ = auVar193;
          auVar1407._0_14_ = auVar9._0_14_;
          auVar1407[0xe] = (char)((uint)uStack_1614 >> 0x18);
          auVar1407[0xf] = local_1608[7];
          auVar1406._14_2_ = auVar1407._14_2_;
          auVar1406._0_13_ = auVar9._0_13_;
          auVar1406[0xd] = local_1608[6];
          auVar1405._13_3_ = auVar1406._13_3_;
          auVar1405[0xc] = (char)((uint)uStack_1614 >> 0x10);
          auVar1405._0_12_ = auVar10;
          auVar1404._12_4_ = auVar1405._12_4_;
          auVar1404._0_11_ = auVar10._0_11_;
          auVar1404[0xb] = local_1608[5];
          auVar1403._11_5_ = auVar1404._11_5_;
          auVar1403._0_10_ = auVar10._0_10_;
          auVar1403[10] = (char)((uint)uStack_1614 >> 8);
          auVar1402._10_6_ = auVar1403._10_6_;
          auVar1402._0_9_ = auVar10._0_9_;
          auVar1402[9] = local_1608[4];
          auVar1401._9_7_ = auVar1402._9_7_;
          auVar1401[8] = (char)uStack_1614;
          auVar1401._0_8_ = CONCAT44(uStack_1614,local_1618);
          Var19 = CONCAT91(CONCAT81(auVar1401._8_8_,local_1608[3]),(char)((uint)local_1618 >> 0x18))
          ;
          auVar196._2_10_ = Var19;
          auVar196[1] = local_1608[2];
          auVar196[0] = (char)((uint)local_1618 >> 0x10);
          auVar195._2_12_ = auVar196;
          auVar195[1] = local_1608[1];
          auVar195[0] = (char)((uint)local_1618 >> 8);
          uVar503 = CONCAT11(uStack_1620,(char)local_1638[1]);
          auVar926._12_4_ =
               CONCAT13(uStack_161f,CONCAT12((char)((ulong)local_1638[1] >> 8),uVar503));
          uVar504 = CONCAT15(uStack_161e,
                             CONCAT14((char)((ulong)local_1638[1] >> 0x10),auVar926._12_4_));
          uVar505 = CONCAT17(uStack_161d,CONCAT16((char)((ulong)local_1638[1] >> 0x18),uVar504));
          auVar797._0_10_ =
               CONCAT19(uStack_161c,CONCAT18((char)((ulong)local_1638[1] >> 0x20),uVar505));
          auVar797[10] = (char)((ulong)local_1638[1] >> 0x28);
          auVar797[0xb] = uStack_161b;
          auVar813[0xc] = (char)((ulong)local_1638[1] >> 0x30);
          auVar813._0_12_ = auVar797;
          auVar813[0xd] = uStack_161a;
          auVar903[0xe] = (char)((ulong)local_1638[1] >> 0x38);
          auVar903._0_14_ = auVar813;
          auVar903[0xf] = uStack_1619;
          uVar314 = CONCAT11(local_1608[8],(char)uStack_1610);
          auVar490._12_4_ = CONCAT13(local_1608[9],CONCAT12((char)((uint)uStack_1610 >> 8),uVar314))
          ;
          uVar315 = CONCAT15(local_1608[10],
                             CONCAT14((char)((uint)uStack_1610 >> 0x10),auVar490._12_4_));
          uVar316 = CONCAT17(local_1608[0xb],CONCAT16((char)((uint)uStack_1610 >> 0x18),uVar315));
          auVar528._0_10_ = CONCAT19(local_1608[0xc],CONCAT18((char)uStack_160c,uVar316));
          auVar528[10] = (char)((uint)uStack_160c >> 8);
          auVar528[0xb] = local_1608[0xd];
          auVar544[0xc] = (char)((uint)uStack_160c >> 0x10);
          auVar544._0_12_ = auVar528;
          auVar544[0xd] = local_1608[0xe];
          auVar720[0xe] = (char)((uint)uStack_160c >> 0x18);
          auVar720._0_14_ = auVar544;
          auVar720[0xf] = local_1608[0xf];
          auVar453._0_12_ = auVar1309._0_12_;
          auVar453._12_2_ = (short)Var17;
          auVar453._14_2_ = (short)Var19;
          auVar452._12_4_ = auVar453._12_4_;
          auVar452._0_10_ = auVar1309._0_10_;
          auVar452._10_2_ = auVar196._0_2_;
          auVar451._10_6_ = auVar452._10_6_;
          auVar451._0_8_ = auVar1309._0_8_;
          auVar451._8_2_ = auVar194._0_2_;
          auVar197._4_8_ = auVar451._8_8_;
          auVar197._2_2_ = auVar195._0_2_;
          auVar197._0_2_ = auVar193._0_2_;
          auVar450._0_4_ = CONCAT22(CONCAT11(local_1608[0],(char)local_1618),auVar1309._0_2_);
          auVar450._4_12_ = auVar197;
          auVar1131._12_2_ = (short)((ulong)uVar505 >> 0x30);
          auVar1131._0_12_ = auVar797;
          auVar1131._14_2_ = (short)((ulong)uVar316 >> 0x30);
          auVar1130._12_4_ = auVar1131._12_4_;
          auVar1130._10_2_ = (short)((uint6)uVar315 >> 0x20);
          auVar1130._0_10_ = auVar797._0_10_;
          auVar1129._10_6_ = auVar1130._10_6_;
          auVar1129._8_2_ = (short)((uint6)uVar504 >> 0x20);
          auVar1129._0_8_ = uVar505;
          auVar1128._8_8_ = auVar1129._8_8_;
          auVar1128._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
          auVar1128._0_6_ = uVar504;
          auVar1127._6_10_ = auVar1128._6_10_;
          auVar1127._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
          auVar1127._0_4_ = auVar926._12_4_;
          local_1038._6_2_ = uVar314;
          local_1038._4_2_ = uVar503;
          auVar490._12_4_ = CONCAT22(auVar1401._8_2_,auVar1310._8_2_);
          auVar1186._0_8_ = CONCAT26(auVar1403._10_2_,CONCAT24(auVar1312._10_2_,auVar490._12_4_));
          auVar1186._8_2_ = auVar1314._12_2_;
          auVar1186._10_2_ = auVar1405._12_2_;
          auVar1317._12_2_ = auVar1315._14_2_;
          auVar1317._0_12_ = auVar1186;
          auVar1317._14_2_ = auVar1406._14_2_;
          uStack_ff4 = (undefined2)((unkuint10)auVar797._0_10_ >> 0x40);
          uStack_ff2 = (undefined2)((unkuint10)auVar528._0_10_ >> 0x40);
          uVar305 = CONCAT22(uStack_ff2,uStack_ff4);
          auVar798._0_8_ = CONCAT26(auVar528._10_2_,CONCAT24(auVar797._10_2_,uVar305));
          auVar798._8_2_ = auVar813._12_2_;
          auVar798._10_2_ = auVar544._12_2_;
          auVar904._12_2_ = auVar903._14_2_;
          auVar904._0_12_ = auVar798;
          auVar904._14_2_ = auVar720._14_2_;
          auVar721._0_8_ = auVar450._0_8_;
          auVar721._8_4_ = auVar197._0_4_;
          auVar721._12_4_ = auVar1127._4_4_;
          local_1038._0_4_ = auVar450._0_4_;
          auVar1408._8_4_ = (int)((ulong)auVar1186._0_8_ >> 0x20);
          auVar1408._0_8_ = auVar1186._0_8_;
          auVar1408._12_4_ = (int)((ulong)auVar798._0_8_ >> 0x20);
          local_fe8 = auVar1408._8_8_;
          local_1038._12_4_ = uVar305;
          local_1038._8_4_ = auVar490._12_4_;
          auVar454._0_8_ = CONCAT44(auVar1129._8_4_,auVar451._8_4_);
          auVar454._8_4_ = auVar452._12_4_;
          auVar454._12_4_ = auVar1130._12_4_;
          auVar1318._0_8_ = CONCAT44(auVar798._8_4_,auVar1186._8_4_);
          auVar1318._8_4_ = auVar1317._12_4_;
          auVar1318._12_4_ = auVar904._12_4_;
          local_1028._8_8_ = local_fe8;
          local_1028._0_8_ = auVar721._8_8_;
          local_1018._8_8_ = auVar1318._0_8_;
          local_1018._0_8_ = auVar454._0_8_;
          local_fc8 = auVar1318._8_8_;
          local_1008._8_8_ = local_fc8;
          local_1008._0_8_ = auVar454._8_8_;
          local_ff8 = auVar1310._8_2_;
          uStack_ff6 = auVar1401._8_2_;
          uStack_ff0 = 0;
          uStack_fee = 0;
          uStack_fec = 0;
          uStack_fea = 0;
          uStack_fe0 = 0;
          local_fd8 = auVar1314._12_2_;
          uStack_fd6 = auVar1405._12_2_;
          uStack_fd4 = auVar813._12_2_;
          uStack_fd2 = auVar544._12_2_;
          uStack_fd0 = 0;
          uStack_fce = 0;
          uStack_fcc = 0;
          uStack_fca = 0;
          uStack_fc0 = 0;
          local_fb8 = local_1038 >> 0x20;
          local_fa8 = local_1028 >> 0x20;
          local_f98 = local_1018 >> 0x20;
          local_f88 = local_1008 >> 0x20;
          local_f78 = ZEXT416(uVar305);
          local_f68 = local_fe8 >> 0x20;
          uStack_f60 = 0;
          local_f58 = ZEXT416(auVar798._8_4_);
          local_f48 = local_fc8 >> 0x20;
          uStack_f40 = 0;
          lVar300 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1038 + lVar300);
            lVar300 = lVar300 + 0x10;
            dst = dst + stride;
          } while (lVar300 != 0x100);
          return;
        }
        uStack_1710 = 0x33ee70;
        dr_prediction_z1_64xN_sse4_1(0x10,local_1038,0x40,left,dy,iVar307);
        iVar307 = 0x10;
      }
      goto LAB_0033fd13;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar307 = 0x4f << (bVar302 & 0x1f);
        auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
        lVar300 = 0;
        auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar311 = 0;
        uVar305 = dy;
        do {
          iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
          uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
          if ((int)uVar308 < 1) {
            if (uVar311 < 0x40) {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
                lVar300 = lVar300 + 0x10;
              } while (lVar300 != 0x400);
            }
            break;
          }
          if (0xf < uVar308) {
            uVar308 = 0x10;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar309);
          if (upsample_left == 0) {
            auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
            auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1700._0_4_ = auVar1198._0_4_;
            auVar1700._4_4_ = auVar1700._0_4_;
            auVar1700._8_4_ = auVar1700._0_4_;
            auVar1700._12_4_ = auVar1700._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_0050db80);
            auVar1522 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
            auVar1698._0_4_ = auVar1198._0_4_;
            auVar1698._4_4_ = auVar1698._0_4_;
            auVar1698._8_4_ = auVar1698._0_4_;
            auVar1698._12_4_ = auVar1698._0_4_;
            auVar1198 = psllw(auVar1698,ZEXT416((uint)upsample_left));
            auVar1699._0_2_ = auVar1198._0_2_ >> 1;
            auVar1699._2_2_ = auVar1198._2_2_ >> 1;
            auVar1699._4_2_ = auVar1198._4_2_ >> 1;
            auVar1699._6_2_ = auVar1198._6_2_ >> 1;
            auVar1699._8_2_ = auVar1198._8_2_ >> 1;
            auVar1699._10_2_ = auVar1198._10_2_ >> 1;
            auVar1699._12_2_ = auVar1198._12_2_ >> 1;
            auVar1699._14_2_ = auVar1198._14_2_ >> 1;
            auVar1700 = auVar1699 & auVar332;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1523 = pmovzxbw(in_XMM10,auVar1522);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1700._0_2_;
          in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1700._2_2_;
          in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1700._4_2_;
          in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1700._6_2_;
          in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1700._8_2_;
          in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1700._10_2_;
          in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1700._12_2_;
          in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1700._14_2_;
          uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
          auVar403._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar403[2] = auVar1356[9];
          auVar403[3] = 0;
          auVar403[4] = auVar1356[10];
          auVar403[5] = 0;
          auVar403[6] = auVar1356[0xb];
          auVar403[7] = 0;
          auVar403[8] = auVar1356[0xc];
          auVar403[9] = 0;
          auVar403[10] = auVar1356[0xd];
          auVar403[0xb] = 0;
          auVar403[0xc] = auVar1356[0xe];
          auVar403[0xd] = 0;
          auVar403[0xe] = auVar1356[0xf];
          auVar403[0xf] = 0;
          auVar1198 = psllw(auVar403,5);
          uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                             (auVar1522[8] - auVar403._0_2_) * auVar1700._0_2_) >> 5;
          uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                             ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1700._2_2_) >> 5;
          uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                             ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1700._4_2_) >> 5
          ;
          uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                             ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1700._6_2_) >>
                     5;
          uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                             ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1700._8_2_) >>
                     5;
          uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                             ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1700._10_2_)
                     >> 5;
          uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                             ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1700._12_2_)
                     >> 5;
          uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                             ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1700._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
          in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
          in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
          in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
          in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
          in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
          in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
          in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
          in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
          in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
          in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
          in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
          in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
          auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
          *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
          uVar305 = uVar305 + dy;
          uVar311 = uVar311 + 1;
          lVar300 = lVar300 + 0x10;
        } while (uVar311 != 0x40);
        uVar311 = 0;
        do {
          lVar300 = uVar311 * 0x10;
          auVar546 = *(undefined1 (*) [16])(local_1038 + lVar300);
          auVar975 = *(undefined1 (*) [16])(local_1018 + lVar300);
          auVar1119._0_14_ = auVar546._0_14_;
          auVar1119[0xe] = auVar546[7];
          auVar1119[0xf] = local_1028[lVar300 + 7];
          auVar1118._14_2_ = auVar1119._14_2_;
          auVar1118._0_13_ = auVar546._0_13_;
          auVar1118[0xd] = local_1028[lVar300 + 6];
          auVar1117._13_3_ = auVar1118._13_3_;
          auVar1117._0_12_ = auVar546._0_12_;
          auVar1117[0xc] = auVar546[6];
          auVar1116._12_4_ = auVar1117._12_4_;
          auVar1116._0_11_ = auVar546._0_11_;
          auVar1116[0xb] = local_1028[lVar300 + 5];
          auVar1115._11_5_ = auVar1116._11_5_;
          auVar1115._0_10_ = auVar546._0_10_;
          auVar1115[10] = auVar546[5];
          auVar1114._10_6_ = auVar1115._10_6_;
          auVar1114._0_9_ = auVar546._0_9_;
          auVar1114[9] = local_1028[lVar300 + 4];
          auVar1113._9_7_ = auVar1114._9_7_;
          auVar1113._0_8_ = auVar546._0_8_;
          auVar1113[8] = auVar546[4];
          Var17 = CONCAT91(CONCAT81(auVar1113._8_8_,local_1028[lVar300 + 3]),auVar546[3]);
          auVar185._2_10_ = Var17;
          auVar185[1] = local_1028[lVar300 + 2];
          auVar185[0] = auVar546[2];
          auVar1112._4_12_ = auVar185;
          auVar1112[3] = local_1028[lVar300 + 1];
          auVar1112[2] = auVar546[1];
          auVar1112._0_2_ = CONCAT11(local_1028[lVar300],auVar546[0]);
          auVar2249._0_14_ = auVar975._0_14_;
          auVar2249[0xe] = auVar975[7];
          auVar2249[0xf] = local_1008[lVar300 + 7];
          auVar2248._14_2_ = auVar2249._14_2_;
          auVar2248._0_13_ = auVar975._0_13_;
          auVar2248[0xd] = local_1008[lVar300 + 6];
          auVar2247._13_3_ = auVar2248._13_3_;
          auVar2247._0_12_ = auVar975._0_12_;
          auVar2247[0xc] = auVar975[6];
          auVar2246._12_4_ = auVar2247._12_4_;
          auVar2246._0_11_ = auVar975._0_11_;
          auVar2246[0xb] = local_1008[lVar300 + 5];
          auVar2245._11_5_ = auVar2246._11_5_;
          auVar2245._0_10_ = auVar975._0_10_;
          auVar2245[10] = auVar975[5];
          auVar2244._10_6_ = auVar2245._10_6_;
          auVar2244._0_9_ = auVar975._0_9_;
          auVar2244[9] = local_1008[lVar300 + 4];
          auVar2243._9_7_ = auVar2244._9_7_;
          auVar2243._0_8_ = auVar975._0_8_;
          auVar2243[8] = auVar975[4];
          Var19 = CONCAT91(CONCAT81(auVar2243._8_8_,local_1008[lVar300 + 3]),auVar975[3]);
          auVar186._2_10_ = Var19;
          auVar186[1] = local_1008[lVar300 + 2];
          auVar186[0] = auVar975[2];
          auVar332 = *(undefined1 (*) [16])(&local_ff8 + uVar311 * 8);
          uStack_1623 = *(undefined1 *)((long)&local_fe8 + lVar300 + 1);
          auVar2118._0_14_ = auVar332._0_14_;
          auVar2118[0xe] = auVar332[7];
          auVar2118[0xf] = *(undefined1 *)((long)&local_fe8 + lVar300 + 7);
          auVar2117._14_2_ = auVar2118._14_2_;
          auVar2117._0_13_ = auVar332._0_13_;
          auVar2117[0xd] = *(undefined1 *)((long)&local_fe8 + lVar300 + 6);
          auVar2116._13_3_ = auVar2117._13_3_;
          auVar2116._0_12_ = auVar332._0_12_;
          auVar2116[0xc] = auVar332[6];
          auVar2115._12_4_ = auVar2116._12_4_;
          auVar2115._0_11_ = auVar332._0_11_;
          auVar2115[0xb] = *(undefined1 *)((long)&local_fe8 + lVar300 + 5);
          auVar2114._11_5_ = auVar2115._11_5_;
          auVar2114._0_10_ = auVar332._0_10_;
          auVar2114[10] = auVar332[5];
          auVar2113._10_6_ = auVar2114._10_6_;
          auVar2113._0_9_ = auVar332._0_9_;
          auVar2113[9] = *(undefined1 *)((long)&local_fe8 + lVar300 + 4);
          auVar2112._9_7_ = auVar2113._9_7_;
          auVar2112._0_8_ = auVar332._0_8_;
          auVar2112[8] = auVar332[4];
          Var21 = CONCAT91(CONCAT81(auVar2112._8_8_,*(undefined1 *)((long)&local_fe8 + lVar300 + 3))
                           ,auVar332[3]);
          auVar187._2_10_ = Var21;
          auVar187[1] = *(undefined1 *)((long)&local_fe8 + lVar300 + 2);
          auVar187[0] = auVar332[2];
          auVar2111._4_12_ = auVar187;
          auVar2111[3] = uStack_1623;
          auVar2111[2] = auVar332[1];
          auVar2111._0_2_ = CONCAT11(*(undefined1 *)(&local_fe8 + uVar311 * 2),auVar332[0]);
          auVar1356 = *(undefined1 (*) [16])(&local_fd8 + uVar311 * 8);
          auVar2179._0_14_ = auVar1356._0_14_;
          auVar2179[0xe] = auVar1356[7];
          auVar2179[0xf] = *(undefined1 *)((long)&local_fc8 + lVar300 + 7);
          auVar2178._14_2_ = auVar2179._14_2_;
          auVar2178._0_13_ = auVar1356._0_13_;
          auVar2178[0xd] = *(undefined1 *)((long)&local_fc8 + lVar300 + 6);
          auVar2177._13_3_ = auVar2178._13_3_;
          auVar2177._0_12_ = auVar1356._0_12_;
          auVar2177[0xc] = auVar1356[6];
          auVar2176._12_4_ = auVar2177._12_4_;
          auVar2176._0_11_ = auVar1356._0_11_;
          auVar2176[0xb] = *(undefined1 *)((long)&local_fc8 + lVar300 + 5);
          auVar2175._11_5_ = auVar2176._11_5_;
          auVar2175._0_10_ = auVar1356._0_10_;
          auVar2175[10] = auVar1356[5];
          auVar2174._10_6_ = auVar2175._10_6_;
          auVar2174._0_9_ = auVar1356._0_9_;
          auVar2174[9] = *(undefined1 *)((long)&local_fc8 + lVar300 + 4);
          auVar2173._9_7_ = auVar2174._9_7_;
          auVar2173._0_8_ = auVar1356._0_8_;
          auVar2173[8] = auVar1356[4];
          Var23 = CONCAT91(CONCAT81(auVar2173._8_8_,*(undefined1 *)((long)&local_fc8 + lVar300 + 3))
                           ,auVar1356[3]);
          auVar188._2_10_ = Var23;
          auVar188[1] = *(undefined1 *)((long)&local_fc8 + lVar300 + 2);
          auVar188[0] = auVar1356[2];
          auVar1522 = *(undefined1 (*) [16])(local_fb8 + lVar300);
          auVar1977._0_12_ = auVar1112._0_12_;
          auVar1977._12_2_ = (short)Var17;
          auVar1977._14_2_ = (short)Var19;
          auVar1976._12_4_ = auVar1977._12_4_;
          auVar1976._0_10_ = auVar1112._0_10_;
          auVar1976._10_2_ = auVar186._0_2_;
          auVar1975._10_6_ = auVar1976._10_6_;
          auVar1975._0_8_ = auVar1112._0_8_;
          auVar1975._8_2_ = auVar185._0_2_;
          auVar706._0_12_ = auVar2111._0_12_;
          auVar706._12_2_ = (short)Var21;
          auVar706._14_2_ = (short)Var23;
          auVar705._12_4_ = auVar706._12_4_;
          auVar705._0_10_ = auVar2111._0_10_;
          auVar705._10_2_ = auVar188._0_2_;
          auVar704._10_6_ = auVar705._10_6_;
          auVar704._0_8_ = auVar2111._0_8_;
          auVar704._8_2_ = auVar187._0_2_;
          auVar1306._0_14_ = auVar1522._0_14_;
          auVar1306[0xe] = auVar1522[7];
          auVar1306[0xf] = local_fa8[lVar300 + 7];
          auVar1305._14_2_ = auVar1306._14_2_;
          auVar1305._0_13_ = auVar1522._0_13_;
          auVar1305[0xd] = local_fa8[lVar300 + 6];
          auVar1304._13_3_ = auVar1305._13_3_;
          auVar1304._0_12_ = auVar1522._0_12_;
          auVar1304[0xc] = auVar1522[6];
          auVar1303._12_4_ = auVar1304._12_4_;
          auVar1303._0_11_ = auVar1522._0_11_;
          auVar1303[0xb] = local_fa8[lVar300 + 5];
          auVar1302._11_5_ = auVar1303._11_5_;
          auVar1302._0_10_ = auVar1522._0_10_;
          auVar1302[10] = auVar1522[5];
          auVar1301._10_6_ = auVar1302._10_6_;
          auVar1301._0_9_ = auVar1522._0_9_;
          auVar1301[9] = local_fa8[lVar300 + 4];
          auVar1300._9_7_ = auVar1301._9_7_;
          auVar1300._0_8_ = auVar1522._0_8_;
          auVar1300[8] = auVar1522[4];
          Var17 = CONCAT91(CONCAT81(auVar1300._8_8_,local_fa8[lVar300 + 3]),auVar1522[3]);
          auVar189._2_10_ = Var17;
          auVar189[1] = local_fa8[lVar300 + 2];
          auVar189[0] = auVar1522[2];
          auVar1299._4_12_ = auVar189;
          auVar1299[3] = local_fa8[lVar300 + 1];
          auVar1299[2] = auVar1522[1];
          auVar1299._0_2_ = CONCAT11(local_fa8[lVar300],auVar1522[0]);
          auVar1198 = *(undefined1 (*) [16])(local_f98 + lVar300);
          auVar1603._0_14_ = auVar1198._0_14_;
          auVar1603[0xe] = auVar1198[7];
          auVar1603[0xf] = local_f88[lVar300 + 7];
          auVar1602._14_2_ = auVar1603._14_2_;
          auVar1602._0_13_ = auVar1198._0_13_;
          auVar1602[0xd] = local_f88[lVar300 + 6];
          auVar1601._13_3_ = auVar1602._13_3_;
          auVar1601._0_12_ = auVar1198._0_12_;
          auVar1601[0xc] = auVar1198[6];
          auVar1600._12_4_ = auVar1601._12_4_;
          auVar1600._0_11_ = auVar1198._0_11_;
          auVar1600[0xb] = local_f88[lVar300 + 5];
          auVar1599._11_5_ = auVar1600._11_5_;
          auVar1599._0_10_ = auVar1198._0_10_;
          auVar1599[10] = auVar1198[5];
          auVar1598._10_6_ = auVar1599._10_6_;
          auVar1598._0_9_ = auVar1198._0_9_;
          auVar1598[9] = local_f88[lVar300 + 4];
          auVar1597._9_7_ = auVar1598._9_7_;
          auVar1597._0_8_ = auVar1198._0_8_;
          auVar1597[8] = auVar1198[4];
          Var19 = CONCAT91(CONCAT81(auVar1597._8_8_,local_f88[lVar300 + 3]),auVar1198[3]);
          auVar190._2_10_ = Var19;
          auVar190[1] = local_f88[lVar300 + 2];
          auVar190[0] = auVar1198[2];
          auVar1199 = *(undefined1 (*) [16])(local_f78 + lVar300);
          uStack_161b = *(undefined1 *)((long)&local_f68 + lVar300 + 1);
          auVar1740._0_14_ = auVar1199._0_14_;
          auVar1740[0xe] = auVar1199[7];
          auVar1740[0xf] = *(undefined1 *)((long)&local_f68 + lVar300 + 7);
          auVar1739._14_2_ = auVar1740._14_2_;
          auVar1739._0_13_ = auVar1199._0_13_;
          auVar1739[0xd] = *(undefined1 *)((long)&local_f68 + lVar300 + 6);
          auVar1738._13_3_ = auVar1739._13_3_;
          auVar1738._0_12_ = auVar1199._0_12_;
          auVar1738[0xc] = auVar1199[6];
          auVar1737._12_4_ = auVar1738._12_4_;
          auVar1737._0_11_ = auVar1199._0_11_;
          auVar1737[0xb] = *(undefined1 *)((long)&local_f68 + lVar300 + 5);
          auVar1736._11_5_ = auVar1737._11_5_;
          auVar1736._0_10_ = auVar1199._0_10_;
          auVar1736[10] = auVar1199[5];
          auVar1735._10_6_ = auVar1736._10_6_;
          auVar1735._0_9_ = auVar1199._0_9_;
          auVar1735[9] = *(undefined1 *)((long)&local_f68 + lVar300 + 4);
          auVar1734._9_7_ = auVar1735._9_7_;
          auVar1734._0_8_ = auVar1199._0_8_;
          auVar1734[8] = auVar1199[4];
          Var21 = CONCAT91(CONCAT81(auVar1734._8_8_,*(undefined1 *)((long)&local_f68 + lVar300 + 3))
                           ,auVar1199[3]);
          auVar191._2_10_ = Var21;
          auVar191[1] = *(undefined1 *)((long)&local_f68 + lVar300 + 2);
          auVar191[0] = auVar1199[2];
          auVar1733._4_12_ = auVar191;
          auVar1733[3] = uStack_161b;
          auVar1733[2] = auVar1199[1];
          auVar1733._0_2_ = CONCAT11(*(undefined1 *)(&local_f68 + uVar311 * 2),auVar1199[0]);
          auVar1523 = *(undefined1 (*) [16])(local_f58 + lVar300);
          auVar1896._0_14_ = auVar1523._0_14_;
          auVar1896[0xe] = auVar1523[7];
          auVar1896[0xf] = *(undefined1 *)((long)&local_f48 + lVar300 + 7);
          auVar1895._14_2_ = auVar1896._14_2_;
          auVar1895._0_13_ = auVar1523._0_13_;
          auVar1895[0xd] = *(undefined1 *)((long)&local_f48 + lVar300 + 6);
          auVar1894._13_3_ = auVar1895._13_3_;
          auVar1894._0_12_ = auVar1523._0_12_;
          auVar1894[0xc] = auVar1523[6];
          auVar1893._12_4_ = auVar1894._12_4_;
          auVar1893._0_11_ = auVar1523._0_11_;
          auVar1893[0xb] = *(undefined1 *)((long)&local_f48 + lVar300 + 5);
          auVar1892._11_5_ = auVar1893._11_5_;
          auVar1892._0_10_ = auVar1523._0_10_;
          auVar1892[10] = auVar1523[5];
          auVar1891._10_6_ = auVar1892._10_6_;
          auVar1891._0_9_ = auVar1523._0_9_;
          auVar1891[9] = *(undefined1 *)((long)&local_f48 + lVar300 + 4);
          auVar1890._9_7_ = auVar1891._9_7_;
          auVar1890._0_8_ = auVar1523._0_8_;
          auVar1890[8] = auVar1523[4];
          Var23 = CONCAT91(CONCAT81(auVar1890._8_8_,*(undefined1 *)((long)&local_f48 + lVar300 + 3))
                           ,auVar1523[3]);
          auVar192._2_10_ = Var23;
          auVar192[1] = *(undefined1 *)((long)&local_f48 + lVar300 + 2);
          auVar192[0] = auVar1523[2];
          auVar709._0_12_ = auVar1299._0_12_;
          auVar709._12_2_ = (short)Var17;
          auVar709._14_2_ = (short)Var19;
          auVar708._12_4_ = auVar709._12_4_;
          auVar708._0_10_ = auVar1299._0_10_;
          auVar708._10_2_ = auVar190._0_2_;
          auVar707._10_6_ = auVar708._10_6_;
          auVar707._0_8_ = auVar1299._0_8_;
          auVar707._8_2_ = auVar189._0_2_;
          auVar1400._0_12_ = auVar1733._0_12_;
          auVar1400._12_2_ = (short)Var21;
          auVar1400._14_2_ = (short)Var23;
          auVar1399._12_4_ = auVar1400._12_4_;
          auVar1399._0_10_ = auVar1733._0_10_;
          auVar1399._10_2_ = auVar192._0_2_;
          auVar1398._10_6_ = auVar1399._10_6_;
          auVar1398._0_8_ = auVar1733._0_8_;
          auVar1398._8_2_ = auVar191._0_2_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11(*(undefined1 *)(&local_fc8 + uVar311 * 2),auVar1356[0]),
                                 auVar2111._0_2_),
                        CONCAT22(CONCAT11(local_1008[lVar300],auVar975[0]),auVar1112._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11(*(undefined1 *)(&local_f48 + uVar311 * 2),auVar1523[0]),
                                 auVar1733._0_2_),
                        CONCAT22(CONCAT11(local_f88[lVar300],auVar1198[0]),auVar1299._0_2_));
          local_1628 = auVar546[1];
          uStack_1627 = local_1028[lVar300 + 1];
          uStack_1626 = auVar975[1];
          uStack_1625 = local_1008[lVar300 + 1];
          uStack_1624 = auVar332[1];
          uStack_1622 = auVar1356[1];
          uStack_1621 = *(undefined1 *)((long)&local_fc8 + lVar300 + 1);
          uStack_1620 = auVar1522[1];
          uStack_161f = local_fa8[lVar300 + 1];
          uStack_161e = auVar1198[1];
          uStack_161d = local_f88[lVar300 + 1];
          uStack_161c = auVar1199[1];
          uStack_161a = auVar1523[1];
          uStack_1619 = *(undefined1 *)((long)&local_f48 + lVar300 + 1);
          local_1618 = auVar1975._8_4_;
          uStack_1614 = auVar704._8_4_;
          uStack_1610 = auVar707._8_4_;
          uStack_160c = auVar1398._8_4_;
          local_1608._8_4_ = auVar1976._12_4_;
          local_1608._12_4_ = auVar705._12_4_;
          auVar490._12_4_ = CONCAT22(auVar2243._8_2_,auVar1113._8_2_);
          auVar958._0_8_ = CONCAT26(auVar2245._10_2_,CONCAT24(auVar1115._10_2_,auVar490._12_4_));
          auVar958._8_2_ = auVar1117._12_2_;
          auVar958._10_2_ = auVar2247._12_2_;
          auVar1120._12_2_ = auVar1118._14_2_;
          auVar1120._0_12_ = auVar958;
          auVar1120._14_2_ = auVar2248._14_2_;
          uVar936 = CONCAT22(auVar2173._8_2_,auVar2112._8_2_);
          auVar2046._0_8_ = CONCAT26(auVar2175._10_2_,CONCAT24(auVar2114._10_2_,uVar936));
          auVar2046._8_2_ = auVar2116._12_2_;
          auVar2046._10_2_ = auVar2177._12_2_;
          auVar2119._12_2_ = auVar2117._14_2_;
          auVar2119._0_12_ = auVar2046;
          auVar2119._14_2_ = auVar2178._14_2_;
          auVar926._12_4_ = CONCAT22(auVar1597._8_2_,auVar1300._8_2_);
          auVar1184._0_8_ = CONCAT26(auVar1599._10_2_,CONCAT24(auVar1302._10_2_,auVar926._12_4_));
          auVar1184._8_2_ = auVar1304._12_2_;
          auVar1184._10_2_ = auVar1601._12_2_;
          uVar781 = CONCAT22(auVar1890._8_2_,auVar1734._8_2_);
          auVar1635._0_8_ = CONCAT26(auVar1892._10_2_,CONCAT24(auVar1736._10_2_,uVar781));
          auVar1635._8_2_ = auVar1738._12_2_;
          auVar1635._10_2_ = auVar1894._12_2_;
          auVar442._8_4_ = (int)((ulong)auVar958._0_8_ >> 0x20);
          auVar442._0_8_ = auVar958._0_8_;
          auVar442._12_4_ = (int)((ulong)auVar2046._0_8_ >> 0x20);
          auVar710._8_4_ = (int)((ulong)auVar1184._0_8_ >> 0x20);
          auVar710._0_8_ = auVar1184._0_8_;
          auVar710._12_4_ = (int)((ulong)auVar1635._0_8_ >> 0x20);
          local_15f8 = CONCAT44(uVar936,auVar490._12_4_);
          uStack_15f0 = CONCAT44(uVar781,auVar926._12_4_);
          local_15e8 = auVar442._8_8_;
          uStack_15e0 = auVar710._8_8_;
          local_15d8 = CONCAT44(auVar2046._8_4_,auVar958._8_4_);
          uStack_15d0 = CONCAT44(auVar1635._8_4_,auVar1184._8_4_);
          local_15c8._8_4_ = auVar1120._12_4_;
          local_15c8._12_4_ = auVar2119._12_4_;
          uVar314 = CONCAT11(local_1028[lVar300 + 8],auVar546[8]);
          uVar1431 = CONCAT13(local_1018[lVar300 + -7],CONCAT12(auVar546[9],uVar314));
          uVar1432 = CONCAT15(local_1018[lVar300 + -6],CONCAT14(auVar546[10],uVar1431));
          uVar1433 = CONCAT17(local_1018[lVar300 + -5],CONCAT16(auVar546[0xb],uVar1432));
          auVar1450._0_10_ = CONCAT19(local_1018[lVar300 + -4],CONCAT18(auVar546[0xc],uVar1433));
          auVar1450[10] = auVar546[0xd];
          auVar1450[0xb] = local_1018[lVar300 + -3];
          auVar1462[0xc] = auVar546[0xe];
          auVar1462._0_12_ = auVar1450;
          auVar1462[0xd] = local_1018[lVar300 + -2];
          auVar1496[0xe] = auVar546[0xf];
          auVar1496._0_14_ = auVar1462;
          auVar1496[0xf] = local_1018[lVar300 + -1];
          uStack_1640 = auVar975[8];
          uStack_163f = auVar975[9];
          uStack_163e = auVar975[10];
          uStack_163d = auVar975[0xb];
          uStack_163c = auVar975[0xc];
          uStack_163b = auVar975[0xd];
          uStack_163a = auVar975[0xe];
          uStack_1639 = auVar975[0xf];
          auVar490._12_4_ =
               CONCAT13(local_1008[lVar300 + 9],
                        CONCAT12(uStack_163f,CONCAT11(local_1008[lVar300 + 8],uStack_1640)));
          uVar315 = CONCAT15(local_1008[lVar300 + 10],CONCAT14(uStack_163e,auVar490._12_4_));
          uVar316 = CONCAT17(local_1008[lVar300 + 0xb],CONCAT16(uStack_163d,uVar315));
          auVar526._0_10_ = CONCAT19(local_1008[lVar300 + 0xc],CONCAT18(uStack_163c,uVar316));
          auVar526[10] = uStack_163b;
          auVar526[0xb] = local_1008[lVar300 + 0xd];
          auVar543[0xc] = uStack_163a;
          auVar543._0_12_ = auVar526;
          auVar543[0xd] = local_1008[lVar300 + 0xe];
          auVar711[0xe] = uStack_1639;
          auVar711._0_14_ = auVar543;
          auVar711[0xf] = local_1008[lVar300 + 0xf];
          uStack_1670 = auVar332[8];
          uStack_166f = auVar332[9];
          uStack_166e = auVar332[10];
          uStack_166d = auVar332[0xb];
          uStack_166c = auVar332[0xc];
          uStack_166b = auVar332[0xd];
          uStack_166a = auVar332[0xe];
          uStack_1669 = auVar332[0xf];
          auVar926._12_4_ =
               CONCAT13(*(undefined1 *)((long)&uStack_fe0 + lVar300 + 1),
                        CONCAT12(uStack_166f,
                                 CONCAT11(*(undefined1 *)(&uStack_fe0 + uVar311 * 2),uStack_1670)));
          uVar504 = CONCAT15(*(undefined1 *)((long)&uStack_fe0 + lVar300 + 2),
                             CONCAT14(uStack_166e,auVar926._12_4_));
          uVar505 = CONCAT17(*(undefined1 *)((long)&uStack_fe0 + lVar300 + 3),
                             CONCAT16(uStack_166d,uVar504));
          auVar796._0_10_ =
               CONCAT19(*(undefined1 *)((long)&uStack_fe0 + lVar300 + 4),
                        CONCAT18(uStack_166c,uVar505));
          auVar796[10] = uStack_166b;
          auVar796[0xb] = *(undefined1 *)((long)&uStack_fe0 + lVar300 + 5);
          auVar812[0xc] = uStack_166a;
          auVar812._0_12_ = auVar796;
          auVar812[0xd] = *(undefined1 *)((long)&uStack_fe0 + lVar300 + 6);
          auVar896[0xe] = uStack_1669;
          auVar896._0_14_ = auVar812;
          auVar896[0xf] = *(undefined1 *)((long)&uStack_fe0 + lVar300 + 7);
          uStack_1690 = auVar1356[8];
          uStack_168f = auVar1356[9];
          uStack_168e = auVar1356[10];
          uStack_168d = auVar1356[0xb];
          uStack_168c = auVar1356[0xc];
          uStack_168b = auVar1356[0xd];
          uStack_168a = auVar1356[0xe];
          uStack_1689 = auVar1356[0xf];
          uVar781 = CONCAT13(local_fb8[lVar300 + -7],
                             CONCAT12(uStack_168f,CONCAT11(local_fb8[lVar300 + -8],uStack_1690)));
          uVar782 = CONCAT15(local_fb8[lVar300 + -6],CONCAT14(uStack_168e,uVar781));
          uVar783 = CONCAT17(local_fb8[lVar300 + -5],CONCAT16(uStack_168d,uVar782));
          auVar959._0_10_ = CONCAT19(local_fb8[lVar300 + -4],CONCAT18(uStack_168c,uVar783));
          auVar959[10] = uStack_168b;
          auVar959[0xb] = local_fb8[lVar300 + -3];
          auVar973[0xc] = uStack_168a;
          auVar973._0_12_ = auVar959;
          auVar973[0xd] = local_fb8[lVar300 + -2];
          auVar1121[0xe] = uStack_1689;
          auVar1121._0_14_ = auVar973;
          auVar1121[0xf] = local_fb8[lVar300 + -1];
          uVar503 = CONCAT11(local_fa8[lVar300 + 8],auVar1522[8]);
          uVar1759 = CONCAT13(local_f98[lVar300 + -7],CONCAT12(auVar1522[9],uVar503));
          uVar1760 = CONCAT15(local_f98[lVar300 + -6],CONCAT14(auVar1522[10],uVar1759));
          uVar1761 = CONCAT17(local_f98[lVar300 + -5],CONCAT16(auVar1522[0xb],uVar1760));
          auVar1776._0_10_ = CONCAT19(local_f98[lVar300 + -4],CONCAT18(auVar1522[0xc],uVar1761));
          auVar1776[10] = auVar1522[0xd];
          auVar1776[0xb] = local_f98[lVar300 + -3];
          auVar1787[0xc] = auVar1522[0xe];
          auVar1787._0_12_ = auVar1776;
          auVar1787[0xd] = local_f98[lVar300 + -2];
          auVar1814[0xe] = auVar1522[0xf];
          auVar1814._0_14_ = auVar1787;
          auVar1814[0xf] = local_f98[lVar300 + -1];
          uStack_16c0 = auVar1198[8];
          uStack_16bf = auVar1198[9];
          uStack_16be = auVar1198[10];
          uStack_16bd = auVar1198[0xb];
          uStack_16bc = auVar1198[0xc];
          uStack_16bb = auVar1198[0xd];
          uStack_16ba = auVar1198[0xe];
          uStack_16b9 = auVar1198[0xf];
          uVar936 = CONCAT13(local_f78[lVar300 + -7],
                             CONCAT12(uStack_16bf,CONCAT11(local_f88[lVar300 + 8],uStack_16c0)));
          uVar937 = CONCAT15(local_f78[lVar300 + -6],CONCAT14(uStack_16be,uVar936));
          uVar938 = CONCAT17(local_f78[lVar300 + -5],CONCAT16(uStack_16bd,uVar937));
          auVar1185._0_10_ = CONCAT19(local_f78[lVar300 + -4],CONCAT18(uStack_16bc,uVar938));
          auVar1185[10] = uStack_16bb;
          auVar1185[0xb] = local_f78[lVar300 + -3];
          auVar1196[0xc] = uStack_16ba;
          auVar1196._0_12_ = auVar1185;
          auVar1196[0xd] = local_f78[lVar300 + -2];
          auVar1307[0xe] = uStack_16b9;
          auVar1307._0_14_ = auVar1196;
          auVar1307[0xf] = local_f78[lVar300 + -1];
          uVar780 = CONCAT11(local_f58[lVar300 + -8],auVar1199[8]);
          uVar1990 = CONCAT13(local_f58[lVar300 + -7],CONCAT12(auVar1199[9],uVar780));
          uVar1991 = CONCAT15(local_f58[lVar300 + -6],CONCAT14(auVar1199[10],uVar1990));
          uVar1992 = CONCAT17(local_f58[lVar300 + -5],CONCAT16(auVar1199[0xb],uVar1991));
          auVar2007._0_10_ = CONCAT19(local_f58[lVar300 + -4],CONCAT18(auVar1199[0xc],uVar1992));
          auVar2007[10] = auVar1199[0xd];
          auVar2007[0xb] = local_f58[lVar300 + -3];
          auVar2018[0xc] = auVar1199[0xe];
          auVar2018._0_12_ = auVar2007;
          auVar2018[0xd] = local_f58[lVar300 + -2];
          auVar2034[0xe] = auVar1199[0xf];
          auVar2034._0_14_ = auVar2018;
          auVar2034[0xf] = local_f58[lVar300 + -1];
          uStack_16f0 = auVar1523[8];
          uStack_16ef = auVar1523[9];
          uStack_16ee = auVar1523[10];
          uStack_16ed = auVar1523[0xb];
          uStack_16ec = auVar1523[0xc];
          uStack_16eb = auVar1523[0xd];
          uStack_16ea = auVar1523[0xe];
          uStack_16e9 = auVar1523[0xf];
          uVar1911 = CONCAT13(local_f38[lVar300 + -7],
                              CONCAT12(uStack_16ef,CONCAT11(local_f38[lVar300 + -8],uStack_16f0)));
          uVar1912 = CONCAT15(local_f38[lVar300 + -6],CONCAT14(uStack_16ee,uVar1911));
          uVar1913 = CONCAT17(local_f38[lVar300 + -5],CONCAT16(uStack_16ed,uVar1912));
          auVar1921._0_10_ = CONCAT19(local_f38[lVar300 + -4],CONCAT18(uStack_16ec,uVar1913));
          auVar1921[10] = uStack_16eb;
          auVar1921[0xb] = local_f38[lVar300 + -3];
          auVar1930[0xc] = uStack_16ea;
          auVar1930._0_12_ = auVar1921;
          auVar1930[0xd] = local_f38[lVar300 + -2];
          auVar1978[0xe] = uStack_16e9;
          auVar1978._0_14_ = auVar1930;
          auVar1978[0xf] = local_f38[lVar300 + -1];
          auVar448._12_2_ = (short)((ulong)uVar1433 >> 0x30);
          auVar448._0_12_ = auVar1450;
          auVar448._14_2_ = (short)((ulong)uVar316 >> 0x30);
          auVar447._12_4_ = auVar448._12_4_;
          auVar447._10_2_ = (short)((uint6)uVar315 >> 0x20);
          auVar447._0_10_ = auVar1450._0_10_;
          auVar446._10_6_ = auVar447._10_6_;
          auVar446._8_2_ = (short)((uint6)uVar1432 >> 0x20);
          auVar446._0_8_ = uVar1433;
          auVar445._8_8_ = auVar446._8_8_;
          auVar445._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
          auVar445._0_6_ = uVar1432;
          auVar444._6_10_ = auVar445._6_10_;
          auVar444._4_2_ = (short)((uint)uVar1431 >> 0x10);
          auVar444._0_4_ = uVar1431;
          auVar443._4_12_ = auVar444._4_12_;
          auVar443._0_4_ = CONCAT22(CONCAT11(local_1008[lVar300 + 8],uStack_1640),uVar314);
          auVar716._12_2_ = (short)((ulong)uVar505 >> 0x30);
          auVar716._0_12_ = auVar796;
          auVar716._14_2_ = (short)((ulong)uVar783 >> 0x30);
          auVar715._12_4_ = auVar716._12_4_;
          auVar715._10_2_ = (short)((uint6)uVar782 >> 0x20);
          auVar715._0_10_ = auVar796._0_10_;
          auVar714._10_6_ = auVar715._10_6_;
          auVar714._8_2_ = (short)((uint6)uVar504 >> 0x20);
          auVar714._0_8_ = uVar505;
          auVar713._8_8_ = auVar714._8_8_;
          auVar713._6_2_ = (short)((uint)uVar781 >> 0x10);
          auVar713._0_6_ = uVar504;
          auVar712._6_10_ = auVar713._6_10_;
          auVar712._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
          auVar712._0_4_ = auVar926._12_4_;
          auVar902._12_2_ = (short)((ulong)uVar1761 >> 0x30);
          auVar902._0_12_ = auVar1776;
          auVar902._14_2_ = (short)((ulong)uVar938 >> 0x30);
          auVar901._12_4_ = auVar902._12_4_;
          auVar901._10_2_ = (short)((uint6)uVar937 >> 0x20);
          auVar901._0_10_ = auVar1776._0_10_;
          auVar900._10_6_ = auVar901._10_6_;
          auVar900._8_2_ = (short)((uint6)uVar1760 >> 0x20);
          auVar900._0_8_ = uVar1761;
          auVar899._8_8_ = auVar900._8_8_;
          auVar899._6_2_ = (short)((uint)uVar936 >> 0x10);
          auVar899._0_6_ = uVar1760;
          auVar898._6_10_ = auVar899._6_10_;
          auVar898._4_2_ = (short)((uint)uVar1759 >> 0x10);
          auVar898._0_4_ = uVar1759;
          auVar897._4_12_ = auVar898._4_12_;
          auVar897._0_4_ = CONCAT22(CONCAT11(local_f88[lVar300 + 8],uStack_16c0),uVar503);
          auVar1126._12_2_ = (short)((ulong)uVar1992 >> 0x30);
          auVar1126._0_12_ = auVar2007;
          auVar1126._14_2_ = (short)((ulong)uVar1913 >> 0x30);
          auVar1125._12_4_ = auVar1126._12_4_;
          auVar1125._10_2_ = (short)((uint6)uVar1912 >> 0x20);
          auVar1125._0_10_ = auVar2007._0_10_;
          auVar1124._10_6_ = auVar1125._10_6_;
          auVar1124._8_2_ = (short)((uint6)uVar1991 >> 0x20);
          auVar1124._0_8_ = uVar1992;
          auVar1123._8_8_ = auVar1124._8_8_;
          auVar1123._6_2_ = (short)((uint)uVar1911 >> 0x10);
          auVar1123._0_6_ = uVar1991;
          auVar1122._6_10_ = auVar1123._6_10_;
          auVar1122._4_2_ = (short)((uint)uVar1990 >> 0x10);
          auVar1122._0_4_ = uVar1990;
          auVar1308._0_8_ = auVar443._0_8_;
          auVar1308._8_4_ = auVar444._4_4_;
          auVar1308._12_4_ = auVar712._4_4_;
          auVar717._0_8_ = auVar897._0_8_;
          auVar717._8_4_ = auVar898._4_4_;
          auVar717._12_4_ = auVar1122._4_4_;
          local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fb8[lVar300 + -8],uStack_1690),
                                         CONCAT11(*(undefined1 *)(&uStack_fe0 + uVar311 * 2),
                                                  uStack_1670)),auVar443._0_4_);
          auStack_15b0[0] =
               CONCAT44(CONCAT22(CONCAT11(local_f38[lVar300 + -8],uStack_16f0),uVar780),
                        auVar897._0_4_);
          auStack_15b0[1] = auVar1308._8_8_;
          auStack_15b0[2] = auVar717._8_8_;
          local_1598 = CONCAT44(auVar714._8_4_,auVar446._8_4_);
          uStack_1590 = CONCAT44(auVar1124._8_4_,auVar900._8_4_);
          local_1588._8_4_ = auVar447._12_4_;
          local_1588._12_4_ = auVar715._12_4_;
          auVar926._12_4_ =
               CONCAT22((short)((unkuint10)auVar526._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1450._0_10_ >> 0x40));
          auVar1451._0_8_ = CONCAT26(auVar526._10_2_,CONCAT24(auVar1450._10_2_,auVar926._12_4_));
          auVar1451._8_2_ = auVar1462._12_2_;
          auVar1451._10_2_ = auVar543._12_2_;
          auVar1497._12_2_ = auVar1496._14_2_;
          auVar1497._0_12_ = auVar1451;
          auVar1497._14_2_ = auVar711._14_2_;
          auVar490._12_4_ =
               CONCAT22((short)((unkuint10)auVar959._0_10_ >> 0x40),
                        (short)((unkuint10)auVar796._0_10_ >> 0x40));
          auVar527._0_8_ = CONCAT26(auVar959._10_2_,CONCAT24(auVar796._10_2_,auVar490._12_4_));
          auVar527._8_2_ = auVar812._12_2_;
          auVar527._10_2_ = auVar973._12_2_;
          auVar718._12_2_ = auVar896._14_2_;
          auVar718._0_12_ = auVar527;
          auVar718._14_2_ = auVar1121._14_2_;
          uVar781 = CONCAT22((short)((unkuint10)auVar1185._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1776._0_10_ >> 0x40));
          auVar1777._0_8_ = CONCAT26(auVar1185._10_2_,CONCAT24(auVar1776._10_2_,uVar781));
          auVar1777._8_2_ = auVar1787._12_2_;
          auVar1777._10_2_ = auVar1196._12_2_;
          auVar1815._12_2_ = auVar1814._14_2_;
          auVar1815._0_12_ = auVar1777;
          auVar1815._14_2_ = auVar1307._14_2_;
          uVar936 = CONCAT22((short)((unkuint10)auVar1921._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2007._0_10_ >> 0x40));
          auVar2008._0_8_ = CONCAT26(auVar1921._10_2_,CONCAT24(auVar2007._10_2_,uVar936));
          auVar2008._8_2_ = auVar2018._12_2_;
          auVar2008._10_2_ = auVar1930._12_2_;
          auVar2035._12_2_ = auVar2034._14_2_;
          auVar2035._0_12_ = auVar2008;
          auVar2035._14_2_ = auVar1978._14_2_;
          auVar449._8_4_ = (int)((ulong)auVar1451._0_8_ >> 0x20);
          auVar449._0_8_ = auVar1451._0_8_;
          auVar449._12_4_ = (int)((ulong)auVar527._0_8_ >> 0x20);
          auVar719._8_4_ = (int)((ulong)auVar1777._0_8_ >> 0x20);
          auVar719._0_8_ = auVar1777._0_8_;
          auVar719._12_4_ = (int)((ulong)auVar2008._0_8_ >> 0x20);
          local_1578 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
          uStack_1570 = CONCAT44(uVar936,uVar781);
          local_1568 = auVar449._8_8_;
          uStack_1560 = auVar719._8_8_;
          local_1558 = CONCAT44(auVar527._8_4_,auVar1451._8_4_);
          uStack_1550 = CONCAT44(auVar2008._8_4_,auVar1777._8_4_);
          local_1548._8_4_ = auVar1497._12_4_;
          local_1548._12_4_ = auVar718._12_4_;
          local_1538 = CONCAT44(auVar2035._12_4_,auVar1815._12_4_);
          lVar300 = 0;
          puVar301 = dst;
          do {
            uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
            *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1638 + lVar300);
            *(undefined8 *)(puVar301 + 8) = uVar316;
            lVar300 = lVar300 + 0x10;
            puVar301 = puVar301 + stride;
          } while (lVar300 != 0x100);
          dst = dst + 0x10;
          bVar312 = uVar311 < 0x30;
          uVar311 = uVar311 + 0x10;
        } while (bVar312);
        return;
      }
      if (bh == 8) {
        iVar307 = 0x27 << (bVar302 & 0x1f);
        auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
        lVar300 = 0;
        auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar311 = 0;
        uVar305 = dy;
        do {
          iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
          uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
          if ((int)uVar308 < 1) {
            if (uVar311 < 0x20) {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
                lVar300 = lVar300 + 0x10;
              } while (lVar300 != 0x200);
            }
            break;
          }
          if (7 < uVar308) {
            uVar308 = 8;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar309);
          if (upsample_left == 0) {
            auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
            auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1697._0_4_ = auVar1198._0_4_;
            auVar1697._4_4_ = auVar1697._0_4_;
            auVar1697._8_4_ = auVar1697._0_4_;
            auVar1697._12_4_ = auVar1697._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_0050db80);
            auVar1522 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
            auVar1695._0_4_ = auVar1198._0_4_;
            auVar1695._4_4_ = auVar1695._0_4_;
            auVar1695._8_4_ = auVar1695._0_4_;
            auVar1695._12_4_ = auVar1695._0_4_;
            auVar1198 = psllw(auVar1695,ZEXT416((uint)upsample_left));
            auVar1696._0_2_ = auVar1198._0_2_ >> 1;
            auVar1696._2_2_ = auVar1198._2_2_ >> 1;
            auVar1696._4_2_ = auVar1198._4_2_ >> 1;
            auVar1696._6_2_ = auVar1198._6_2_ >> 1;
            auVar1696._8_2_ = auVar1198._8_2_ >> 1;
            auVar1696._10_2_ = auVar1198._10_2_ >> 1;
            auVar1696._12_2_ = auVar1198._12_2_ >> 1;
            auVar1696._14_2_ = auVar1198._14_2_ >> 1;
            auVar1697 = auVar1696 & auVar332;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1523 = pmovzxbw(in_XMM10,auVar1522);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1697._0_2_;
          in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1697._2_2_;
          in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1697._4_2_;
          in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1697._6_2_;
          in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1697._8_2_;
          in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1697._10_2_;
          in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1697._12_2_;
          in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1697._14_2_;
          uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
          auVar402._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar402[2] = auVar1356[9];
          auVar402[3] = 0;
          auVar402[4] = auVar1356[10];
          auVar402[5] = 0;
          auVar402[6] = auVar1356[0xb];
          auVar402[7] = 0;
          auVar402[8] = auVar1356[0xc];
          auVar402[9] = 0;
          auVar402[10] = auVar1356[0xd];
          auVar402[0xb] = 0;
          auVar402[0xc] = auVar1356[0xe];
          auVar402[0xd] = 0;
          auVar402[0xe] = auVar1356[0xf];
          auVar402[0xf] = 0;
          auVar1198 = psllw(auVar402,5);
          uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                             (auVar1522[8] - auVar402._0_2_) * auVar1697._0_2_) >> 5;
          uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                             ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1697._2_2_) >> 5;
          uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                             ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1697._4_2_) >> 5
          ;
          uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                             ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1697._6_2_) >>
                     5;
          uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                             ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1697._8_2_) >>
                     5;
          uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                             ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1697._10_2_)
                     >> 5;
          uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                             ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1697._12_2_)
                     >> 5;
          uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                             ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1697._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
          in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
          in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
          in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
          in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
          in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
          in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
          in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
          in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
          in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
          in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
          in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
          in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
          auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
          *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
          uVar305 = uVar305 + dy;
          uVar311 = uVar311 + 1;
          lVar300 = lVar300 + 0x10;
        } while (uVar311 != 0x20);
        uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
        auVar881._0_9_ = (unkuint9)uVar305 << 0x30;
        uVar241 = CONCAT24(uStack_fee,uVar305);
        auVar257._6_5_ = 0;
        auVar257._0_6_ = uVar241;
        auVar882._0_11_ = auVar257 << 0x30;
        auVar279._8_5_ = 0;
        auVar279._0_8_ = CONCAT26(uStack_fec,uVar241);
        auVar883._0_13_ = auVar279 << 0x30;
        uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
        auVar1388._0_9_ = (unkuint9)uVar308 << 0x30;
        uVar242 = CONCAT24(uStack_fce,uVar308);
        auVar259._6_5_ = 0;
        auVar259._0_6_ = uVar242;
        auVar1389._0_11_ = auVar259 << 0x30;
        auVar280._8_5_ = 0;
        auVar280._0_8_ = CONCAT26(uStack_fcc,uVar242);
        auVar1390._0_13_ = auVar280 << 0x30;
        auVar431[0xe] = local_1038[7];
        auVar431._0_14_ = local_1038._0_14_;
        auVar431[0xf] = local_1028[7];
        auVar430._14_2_ = auVar431._14_2_;
        auVar430._0_13_ = local_1038._0_13_;
        auVar430[0xd] = local_1028[6];
        auVar429._13_3_ = auVar430._13_3_;
        auVar429._0_12_ = local_1038._0_12_;
        auVar429[0xc] = local_1038[6];
        auVar428._12_4_ = auVar429._12_4_;
        auVar428._0_11_ = local_1038._0_11_;
        auVar428[0xb] = local_1028[5];
        auVar427._11_5_ = auVar428._11_5_;
        auVar427._0_10_ = local_1038._0_10_;
        auVar427[10] = local_1038[5];
        auVar426._10_6_ = auVar427._10_6_;
        auVar426._0_9_ = local_1038._0_9_;
        auVar426[9] = local_1028[4];
        auVar425._9_7_ = auVar426._9_7_;
        auVar425._0_8_ = local_1038._0_8_;
        auVar425[8] = local_1038[4];
        Var17 = CONCAT91(CONCAT81(auVar425._8_8_,local_1028[3]),local_1038[3]);
        auVar153._2_10_ = Var17;
        auVar153[1] = local_1028[2];
        auVar153[0] = local_1038[2];
        auVar424._4_12_ = auVar153;
        auVar424[3] = local_1028[1];
        auVar424[2] = local_1038[1];
        auVar424._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
        auVar1289[0xe] = local_1018[7];
        auVar1289._0_14_ = local_1018._0_14_;
        auVar1289[0xf] = local_1008[7];
        auVar1288._14_2_ = auVar1289._14_2_;
        auVar1288._0_13_ = local_1018._0_13_;
        auVar1288[0xd] = local_1008[6];
        auVar1287._13_3_ = auVar1288._13_3_;
        auVar1287._0_12_ = local_1018._0_12_;
        auVar1287[0xc] = local_1018[6];
        auVar1286._12_4_ = auVar1287._12_4_;
        auVar1286._0_11_ = local_1018._0_11_;
        auVar1286[0xb] = local_1008[5];
        auVar1285._11_5_ = auVar1286._11_5_;
        auVar1285._0_10_ = local_1018._0_10_;
        auVar1285[10] = local_1018[5];
        auVar1284._10_6_ = auVar1285._10_6_;
        auVar1284._0_9_ = local_1018._0_9_;
        auVar1284[9] = local_1008[4];
        auVar1283._9_7_ = auVar1284._9_7_;
        auVar1283._0_8_ = local_1018._0_8_;
        auVar1283[8] = local_1018[4];
        Var19 = CONCAT91(CONCAT81(auVar1283._8_8_,local_1008[3]),local_1018[3]);
        auVar154._2_10_ = Var19;
        auVar154[1] = local_1008[2];
        auVar154[0] = local_1018[2];
        auVar883._14_2_ =
             (undefined2)
             (CONCAT19(local_fe8._7_1_,
                       CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >>
             0x40);
        auVar883[0xd] = local_fe8._6_1_;
        Var258 = CONCAT37(auVar883._13_3_,CONCAT16((char)uStack_ff2,uVar241));
        auVar882._12_4_ = (undefined4)((unkuint10)Var258 >> 0x30);
        auVar882[0xb] = local_fe8._5_1_;
        Var245 = CONCAT55(auVar882._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
        auVar881._10_6_ = (undefined6)((unkuint10)Var245 >> 0x20);
        auVar881[9] = local_fe8._4_1_;
        Var243 = CONCAT73(auVar881._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
        Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var243 >> 0x10),local_fe8._3_1_),
                         (char)((ushort)uStack_ff6 >> 8));
        auVar155._2_10_ = Var21;
        auVar155[1] = local_fe8._2_1_;
        auVar155[0] = (char)uStack_ff6;
        auVar880._4_12_ = auVar155;
        auVar880[3] = local_fe8._1_1_;
        uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
        auVar880[2] = uStack_1624;
        auVar880._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
        auVar1390._14_2_ =
             (undefined2)
             (CONCAT19(local_fc8._7_1_,
                       CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >>
             0x40);
        auVar1390[0xd] = local_fc8._6_1_;
        Var260 = CONCAT37(auVar1390._13_3_,CONCAT16((char)uStack_fd2,uVar242));
        auVar1389._12_4_ = (undefined4)((unkuint10)Var260 >> 0x30);
        auVar1389[0xb] = local_fc8._5_1_;
        Var246 = CONCAT55(auVar1389._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar308));
        auVar1388._10_6_ = (undefined6)((unkuint10)Var246 >> 0x20);
        auVar1388[9] = local_fc8._4_1_;
        Var244 = CONCAT73(auVar1388._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
        Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var244 >> 0x10),local_fc8._3_1_),
                         (char)((ushort)uStack_fd6 >> 8));
        auVar156._2_10_ = Var23;
        auVar156[1] = local_fc8._2_1_;
        auVar156[0] = (char)uStack_fd6;
        auVar694[0xe] = local_fb8[7];
        auVar694._0_14_ = local_fb8._0_14_;
        auVar694[0xf] = local_fa8[7];
        auVar693._14_2_ = auVar694._14_2_;
        auVar693._0_13_ = local_fb8._0_13_;
        auVar693[0xd] = local_fa8[6];
        auVar692._13_3_ = auVar693._13_3_;
        auVar692._0_12_ = local_fb8._0_12_;
        auVar692[0xc] = local_fb8[6];
        auVar691._12_4_ = auVar692._12_4_;
        auVar691._0_11_ = local_fb8._0_11_;
        auVar691[0xb] = local_fa8[5];
        auVar690._11_5_ = auVar691._11_5_;
        auVar690._0_10_ = local_fb8._0_10_;
        auVar690[10] = local_fb8[5];
        auVar689._10_6_ = auVar690._10_6_;
        auVar689._0_9_ = local_fb8._0_9_;
        auVar689[9] = local_fa8[4];
        auVar688._9_7_ = auVar689._9_7_;
        auVar688._0_8_ = local_fb8._0_8_;
        auVar688[8] = local_fb8[4];
        Var158 = CONCAT91(CONCAT81(auVar688._8_8_,local_fa8[3]),local_fb8[3]);
        auVar157._2_10_ = Var158;
        auVar157[1] = local_fa8[2];
        auVar157[0] = local_fb8[2];
        auVar687._4_12_ = auVar157;
        auVar687[3] = local_fa8[1];
        auVar687[2] = local_fb8[1];
        auVar687._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
        auVar1488[0xe] = local_f98[7];
        auVar1488._0_14_ = local_f98._0_14_;
        auVar1488[0xf] = local_f88[7];
        auVar1487._14_2_ = auVar1488._14_2_;
        auVar1487._0_13_ = local_f98._0_13_;
        auVar1487[0xd] = local_f88[6];
        auVar1486._13_3_ = auVar1487._13_3_;
        auVar1486._0_12_ = local_f98._0_12_;
        auVar1486[0xc] = local_f98[6];
        auVar1485._12_4_ = auVar1486._12_4_;
        auVar1485._0_11_ = local_f98._0_11_;
        auVar1485[0xb] = local_f88[5];
        auVar1484._11_5_ = auVar1485._11_5_;
        auVar1484._0_10_ = local_f98._0_10_;
        auVar1484[10] = local_f98[5];
        auVar1483._10_6_ = auVar1484._10_6_;
        auVar1483._0_9_ = local_f98._0_9_;
        auVar1483[9] = local_f88[4];
        auVar1482._9_7_ = auVar1483._9_7_;
        auVar1482._0_8_ = local_f98._0_8_;
        auVar1482[8] = local_f98[4];
        Var160 = CONCAT91(CONCAT81(auVar1482._8_8_,local_f88[3]),local_f98[3]);
        auVar159._2_10_ = Var160;
        auVar159[1] = local_f88[2];
        auVar159[0] = local_f98[2];
        auVar1102[0xe] = local_f78[7];
        auVar1102._0_14_ = local_f78._0_14_;
        auVar1102[0xf] = local_f68._7_1_;
        auVar1101._14_2_ = auVar1102._14_2_;
        auVar1101._0_13_ = local_f78._0_13_;
        auVar1101[0xd] = local_f68._6_1_;
        auVar1100._13_3_ = auVar1101._13_3_;
        auVar1100._0_12_ = local_f78._0_12_;
        auVar1100[0xc] = local_f78[6];
        auVar1099._12_4_ = auVar1100._12_4_;
        auVar1099._0_11_ = local_f78._0_11_;
        auVar1099[0xb] = local_f68._5_1_;
        auVar1098._11_5_ = auVar1099._11_5_;
        auVar1098._0_10_ = local_f78._0_10_;
        auVar1098[10] = local_f78[5];
        auVar1097._10_6_ = auVar1098._10_6_;
        auVar1097._0_9_ = local_f78._0_9_;
        auVar1097[9] = local_f68._4_1_;
        auVar1096._9_7_ = auVar1097._9_7_;
        auVar1096._0_8_ = local_f78._0_8_;
        auVar1096[8] = local_f78[4];
        Var162 = CONCAT91(CONCAT81(auVar1096._8_8_,local_f68._3_1_),local_f78[3]);
        auVar161._2_10_ = Var162;
        auVar161[1] = local_f68._2_1_;
        auVar161[0] = local_f78[2];
        auVar1095._4_12_ = auVar161;
        auVar1095[3] = local_f68._1_1_;
        auVar1095[2] = local_f78[1];
        auVar1095._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
        auVar1589[0xe] = local_f58[7];
        auVar1589._0_14_ = local_f58._0_14_;
        auVar1589[0xf] = local_f48._7_1_;
        auVar1588._14_2_ = auVar1589._14_2_;
        auVar1588._0_13_ = local_f58._0_13_;
        auVar1588[0xd] = local_f48._6_1_;
        auVar1587._13_3_ = auVar1588._13_3_;
        auVar1587._0_12_ = local_f58._0_12_;
        auVar1587[0xc] = local_f58[6];
        auVar1586._12_4_ = auVar1587._12_4_;
        auVar1586._0_11_ = local_f58._0_11_;
        auVar1586[0xb] = local_f48._5_1_;
        auVar1585._11_5_ = auVar1586._11_5_;
        auVar1585._0_10_ = local_f58._0_10_;
        auVar1585[10] = local_f58[5];
        auVar1584._10_6_ = auVar1585._10_6_;
        auVar1584._0_9_ = local_f58._0_9_;
        auVar1584[9] = local_f48._4_1_;
        auVar1583._9_7_ = auVar1584._9_7_;
        auVar1583._0_8_ = local_f58._0_8_;
        auVar1583[8] = local_f58[4];
        Var164 = CONCAT91(CONCAT81(auVar1583._8_8_,local_f48._3_1_),local_f58[3]);
        auVar163._2_10_ = Var164;
        auVar163[1] = local_f48._2_1_;
        auVar163[0] = local_f58[2];
        auVar1728._0_12_ = auVar424._0_12_;
        auVar1728._12_2_ = (short)Var17;
        auVar1728._14_2_ = (short)Var19;
        auVar1727._12_4_ = auVar1728._12_4_;
        auVar1727._0_10_ = auVar424._0_10_;
        auVar1727._10_2_ = auVar154._0_2_;
        auVar1726._10_6_ = auVar1727._10_6_;
        auVar1726._0_8_ = auVar424._0_8_;
        auVar1726._8_2_ = auVar153._0_2_;
        auVar1809._0_12_ = auVar880._0_12_;
        auVar1809._12_2_ = (short)Var21;
        auVar1809._14_2_ = (short)Var23;
        auVar1808._12_4_ = auVar1809._12_4_;
        auVar1808._0_10_ = auVar880._0_10_;
        auVar1808._10_2_ = auVar156._0_2_;
        auVar1807._10_6_ = auVar1808._10_6_;
        auVar1807._0_8_ = auVar880._0_8_;
        auVar1807._8_2_ = auVar155._0_2_;
        auVar1885._0_12_ = auVar687._0_12_;
        auVar1885._12_2_ = (short)Var158;
        auVar1885._14_2_ = (short)Var160;
        auVar1884._12_4_ = auVar1885._12_4_;
        auVar1884._0_10_ = auVar687._0_10_;
        auVar1884._10_2_ = auVar159._0_2_;
        auVar1883._10_6_ = auVar1884._10_6_;
        auVar1883._0_8_ = auVar687._0_8_;
        auVar1883._8_2_ = auVar157._0_2_;
        auVar1971._0_12_ = auVar1095._0_12_;
        auVar1971._12_2_ = (short)Var162;
        auVar1971._14_2_ = (short)Var164;
        auVar1970._12_4_ = auVar1971._12_4_;
        auVar1970._0_10_ = auVar1095._0_10_;
        auVar1970._10_2_ = auVar163._0_2_;
        auVar1969._10_6_ = auVar1970._10_6_;
        auVar1969._0_8_ = auVar1095._0_8_;
        auVar1969._8_2_ = auVar161._0_2_;
        local_1638[0] =
             CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar880._0_2_),
                      CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar424._0_2_));
        local_1638[1] =
             CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1095._0_2_),
                      CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar687._0_2_));
        local_1628 = local_1038[1];
        uStack_1627 = local_1028[1];
        uStack_1626 = local_1018[1];
        uStack_1625 = local_1008[1];
        uStack_1623 = local_fe8._1_1_;
        uStack_1622 = (char)((ushort)local_fd8 >> 8);
        uStack_1621 = local_fc8._1_1_;
        uStack_1620 = local_fb8[1];
        uStack_161f = local_fa8[1];
        uStack_161e = local_f98[1];
        uStack_161d = local_f88[1];
        uStack_161c = local_f78[1];
        uStack_161b = local_f68._1_1_;
        uStack_161a = local_f58[1];
        uStack_1619 = local_f48._1_1_;
        local_1618 = auVar1726._8_4_;
        uStack_1614 = auVar1807._8_4_;
        uStack_1610 = auVar1883._8_4_;
        uStack_160c = auVar1969._8_4_;
        local_1608._8_4_ = auVar1727._12_4_;
        local_1608._12_4_ = auVar1808._12_4_;
        auVar490._12_4_ = CONCAT22(auVar1283._8_2_,auVar425._8_2_);
        auVar320._0_8_ = CONCAT26(auVar1285._10_2_,CONCAT24(auVar427._10_2_,auVar490._12_4_));
        auVar320._8_2_ = auVar429._12_2_;
        auVar320._10_2_ = auVar1287._12_2_;
        auVar432._12_2_ = auVar430._14_2_;
        auVar432._0_12_ = auVar320;
        auVar432._14_2_ = auVar1288._14_2_;
        uVar781 = CONCAT22((short)((unkuint10)Var244 >> 0x10),(short)((unkuint10)Var243 >> 0x10));
        auVar794._0_8_ =
             CONCAT26((short)((unkuint10)Var246 >> 0x20),
                      CONCAT24((short)((unkuint10)Var245 >> 0x20),uVar781));
        auVar794._8_2_ = (short)((unkuint10)Var258 >> 0x30);
        auVar794._10_2_ = (short)((unkuint10)Var260 >> 0x30);
        auVar884._12_2_ = auVar883._14_2_;
        auVar884._0_12_ = auVar794;
        auVar884._14_2_ = auVar1390._14_2_;
        auVar926._12_4_ = CONCAT22(auVar1482._8_2_,auVar688._8_2_);
        auVar524._0_8_ = CONCAT26(auVar1484._10_2_,CONCAT24(auVar690._10_2_,auVar926._12_4_));
        auVar524._8_2_ = auVar692._12_2_;
        auVar524._10_2_ = auVar1486._12_2_;
        uVar936 = CONCAT22(auVar1583._8_2_,auVar1096._8_2_);
        auVar956._0_8_ = CONCAT26(auVar1585._10_2_,CONCAT24(auVar1098._10_2_,uVar936));
        auVar956._8_2_ = auVar1100._12_2_;
        auVar956._10_2_ = auVar1587._12_2_;
        auVar1290._8_4_ = (int)((ulong)auVar320._0_8_ >> 0x20);
        auVar1290._0_8_ = auVar320._0_8_;
        auVar1290._12_4_ = (int)((ulong)auVar794._0_8_ >> 0x20);
        auVar885._8_4_ = (int)((ulong)auVar524._0_8_ >> 0x20);
        auVar885._0_8_ = auVar524._0_8_;
        auVar885._12_4_ = (int)((ulong)auVar956._0_8_ >> 0x20);
        local_15f8 = CONCAT44(uVar781,auVar490._12_4_);
        uStack_15f0 = CONCAT44(uVar936,auVar926._12_4_);
        local_15e8 = auVar1290._8_8_;
        uStack_15e0 = auVar885._8_8_;
        local_15d8 = CONCAT44(auVar794._8_4_,auVar320._8_4_);
        uStack_15d0 = CONCAT44(auVar956._8_4_,auVar524._8_4_);
        local_15c8._8_4_ = auVar432._12_4_;
        local_15c8._12_4_ = auVar884._12_4_;
        auVar440[0xe] = local_f38[7];
        auVar440._0_14_ = local_f38;
        auVar440[0xf] = uStack_f21;
        auVar439._14_2_ = auVar440._14_2_;
        auVar439._0_13_ = local_f38._0_13_;
        auVar439[0xd] = uStack_f22;
        auVar438._13_3_ = auVar439._13_3_;
        auVar438._0_12_ = local_f38._0_12_;
        auVar438[0xc] = local_f38[6];
        auVar437._12_4_ = auVar438._12_4_;
        auVar437._0_11_ = local_f38._0_11_;
        auVar437[0xb] = uStack_f23;
        auVar436._11_5_ = auVar437._11_5_;
        auVar436._0_10_ = local_f38._0_10_;
        auVar436[10] = local_f38[5];
        auVar435._10_6_ = auVar436._10_6_;
        auVar435._0_9_ = local_f38._0_9_;
        auVar435[9] = uStack_f24;
        auVar434._9_7_ = auVar435._9_7_;
        auVar434._0_8_ = local_f38._0_8_;
        auVar434[8] = local_f38[4];
        Var17 = CONCAT91(CONCAT81(auVar434._8_8_,uStack_f25),local_f38[3]);
        auVar166._2_10_ = Var17;
        auVar166[1] = uStack_f26;
        auVar166[0] = local_f38[2];
        auVar165._2_12_ = auVar166;
        auVar165[1] = uStack_f27;
        auVar165[0] = local_f38[1];
        auVar433._0_2_ = CONCAT11(local_f28,local_f38[0]);
        auVar433._2_14_ = auVar165;
        auVar1297[0xe] = local_f18[7];
        auVar1297._0_14_ = local_f18;
        auVar1297[0xf] = uStack_f01;
        auVar1296._14_2_ = auVar1297._14_2_;
        auVar1296._0_13_ = local_f18._0_13_;
        auVar1296[0xd] = uStack_f02;
        auVar1295._13_3_ = auVar1296._13_3_;
        auVar1295._0_12_ = local_f18._0_12_;
        auVar1295[0xc] = local_f18[6];
        auVar1294._12_4_ = auVar1295._12_4_;
        auVar1294._0_11_ = local_f18._0_11_;
        auVar1294[0xb] = uStack_f03;
        auVar1293._11_5_ = auVar1294._11_5_;
        auVar1293._0_10_ = local_f18._0_10_;
        auVar1293[10] = local_f18[5];
        auVar1292._10_6_ = auVar1293._10_6_;
        auVar1292._0_9_ = local_f18._0_9_;
        auVar1292[9] = uStack_f04;
        auVar1291._9_7_ = auVar1292._9_7_;
        auVar1291._0_8_ = local_f18._0_8_;
        auVar1291[8] = local_f18[4];
        Var19 = CONCAT91(CONCAT81(auVar1291._8_8_,uStack_f05),local_f18[3]);
        auVar168._2_10_ = Var19;
        auVar168[1] = uStack_f06;
        auVar168[0] = local_f18[2];
        auVar167._2_12_ = auVar168;
        auVar167[1] = uStack_f07;
        auVar167[0] = local_f18[1];
        auVar893[0xe] = local_ef8[7];
        auVar893._0_14_ = local_ef8;
        auVar893[0xf] = uStack_ee1;
        auVar892._14_2_ = auVar893._14_2_;
        auVar892._0_13_ = local_ef8._0_13_;
        auVar892[0xd] = uStack_ee2;
        auVar891._13_3_ = auVar892._13_3_;
        auVar891._0_12_ = local_ef8._0_12_;
        auVar891[0xc] = local_ef8[6];
        auVar890._12_4_ = auVar891._12_4_;
        auVar890._0_11_ = local_ef8._0_11_;
        auVar890[0xb] = uStack_ee3;
        auVar889._11_5_ = auVar890._11_5_;
        auVar889._0_10_ = local_ef8._0_10_;
        auVar889[10] = local_ef8[5];
        auVar888._10_6_ = auVar889._10_6_;
        auVar888._0_9_ = local_ef8._0_9_;
        auVar888[9] = uStack_ee4;
        auVar887._9_7_ = auVar888._9_7_;
        auVar887._0_8_ = local_ef8._0_8_;
        auVar887[8] = local_ef8[4];
        Var21 = CONCAT91(CONCAT81(auVar887._8_8_,uStack_ee5),local_ef8[3]);
        auVar170._2_10_ = Var21;
        auVar170[1] = uStack_ee6;
        auVar170[0] = local_ef8[2];
        auVar169._2_12_ = auVar170;
        auVar169[1] = uStack_ee7;
        auVar169[0] = local_ef8[1];
        auVar886._0_2_ = CONCAT11(local_ee8,local_ef8[0]);
        auVar886._2_14_ = auVar169;
        auVar1397[0xe] = local_ed8[7];
        auVar1397._0_14_ = local_ed8;
        auVar1397[0xf] = uStack_ec1;
        auVar1396._14_2_ = auVar1397._14_2_;
        auVar1396._0_13_ = local_ed8._0_13_;
        auVar1396[0xd] = uStack_ec2;
        auVar1395._13_3_ = auVar1396._13_3_;
        auVar1395._0_12_ = local_ed8._0_12_;
        auVar1395[0xc] = local_ed8[6];
        auVar1394._12_4_ = auVar1395._12_4_;
        auVar1394._0_11_ = local_ed8._0_11_;
        auVar1394[0xb] = uStack_ec3;
        auVar1393._11_5_ = auVar1394._11_5_;
        auVar1393._0_10_ = local_ed8._0_10_;
        auVar1393[10] = local_ed8[5];
        auVar1392._10_6_ = auVar1393._10_6_;
        auVar1392._0_9_ = local_ed8._0_9_;
        auVar1392[9] = uStack_ec4;
        auVar1391._9_7_ = auVar1392._9_7_;
        auVar1391._0_8_ = local_ed8._0_8_;
        auVar1391[8] = local_ed8[4];
        Var23 = CONCAT91(CONCAT81(auVar1391._8_8_,uStack_ec5),local_ed8[3]);
        auVar172._2_10_ = Var23;
        auVar172[1] = uStack_ec6;
        auVar172[0] = local_ed8[2];
        auVar171._2_12_ = auVar172;
        auVar171[1] = uStack_ec7;
        auVar171[0] = local_ed8[1];
        auVar702[0xe] = local_eb8[7];
        auVar702._0_14_ = local_eb8;
        auVar702[0xf] = uStack_ea1;
        auVar701._14_2_ = auVar702._14_2_;
        auVar701._0_13_ = local_eb8._0_13_;
        auVar701[0xd] = uStack_ea2;
        auVar700._13_3_ = auVar701._13_3_;
        auVar700._0_12_ = local_eb8._0_12_;
        auVar700[0xc] = local_eb8[6];
        auVar699._12_4_ = auVar700._12_4_;
        auVar699._0_11_ = local_eb8._0_11_;
        auVar699[0xb] = uStack_ea3;
        auVar698._11_5_ = auVar699._11_5_;
        auVar698._0_10_ = local_eb8._0_10_;
        auVar698[10] = local_eb8[5];
        auVar697._10_6_ = auVar698._10_6_;
        auVar697._0_9_ = local_eb8._0_9_;
        auVar697[9] = uStack_ea4;
        auVar696._9_7_ = auVar697._9_7_;
        auVar696._0_8_ = local_eb8._0_8_;
        auVar696[8] = local_eb8[4];
        Var158 = CONCAT91(CONCAT81(auVar696._8_8_,uStack_ea5),local_eb8[3]);
        auVar174._2_10_ = Var158;
        auVar174[1] = uStack_ea6;
        auVar174[0] = local_eb8[2];
        auVar173._2_12_ = auVar174;
        auVar173[1] = uStack_ea7;
        auVar173[0] = local_eb8[1];
        auVar695._0_2_ = CONCAT11(local_ea8,local_eb8[0]);
        auVar695._2_14_ = auVar173;
        auVar1495[0xe] = local_e98[7];
        auVar1495._0_14_ = local_e98;
        auVar1495[0xf] = uStack_e81;
        auVar1494._14_2_ = auVar1495._14_2_;
        auVar1494._0_13_ = local_e98._0_13_;
        auVar1494[0xd] = uStack_e82;
        auVar1493._13_3_ = auVar1494._13_3_;
        auVar1493._0_12_ = local_e98._0_12_;
        auVar1493[0xc] = local_e98[6];
        auVar1492._12_4_ = auVar1493._12_4_;
        auVar1492._0_11_ = local_e98._0_11_;
        auVar1492[0xb] = uStack_e83;
        auVar1491._11_5_ = auVar1492._11_5_;
        auVar1491._0_10_ = local_e98._0_10_;
        auVar1491[10] = local_e98[5];
        auVar1490._10_6_ = auVar1491._10_6_;
        auVar1490._0_9_ = local_e98._0_9_;
        auVar1490[9] = uStack_e84;
        auVar1489._9_7_ = auVar1490._9_7_;
        auVar1489._0_8_ = local_e98._0_8_;
        auVar1489[8] = local_e98[4];
        Var160 = CONCAT91(CONCAT81(auVar1489._8_8_,uStack_e85),local_e98[3]);
        auVar176._2_10_ = Var160;
        auVar176[1] = uStack_e86;
        auVar176[0] = local_e98[2];
        auVar175._2_12_ = auVar176;
        auVar175[1] = uStack_e87;
        auVar175[0] = local_e98[1];
        auVar1110[0xe] = local_e78[7];
        auVar1110._0_14_ = local_e78;
        auVar1110[0xf] = uStack_e61;
        auVar1109._14_2_ = auVar1110._14_2_;
        auVar1109._0_13_ = local_e78._0_13_;
        auVar1109[0xd] = uStack_e62;
        auVar1108._13_3_ = auVar1109._13_3_;
        auVar1108._0_12_ = local_e78._0_12_;
        auVar1108[0xc] = local_e78[6];
        auVar1107._12_4_ = auVar1108._12_4_;
        auVar1107._0_11_ = local_e78._0_11_;
        auVar1107[0xb] = uStack_e63;
        auVar1106._11_5_ = auVar1107._11_5_;
        auVar1106._0_10_ = local_e78._0_10_;
        auVar1106[10] = local_e78[5];
        auVar1105._10_6_ = auVar1106._10_6_;
        auVar1105._0_9_ = local_e78._0_9_;
        auVar1105[9] = uStack_e64;
        auVar1104._9_7_ = auVar1105._9_7_;
        auVar1104._0_8_ = local_e78._0_8_;
        auVar1104[8] = local_e78[4];
        Var162 = CONCAT91(CONCAT81(auVar1104._8_8_,uStack_e65),local_e78[3]);
        auVar178._2_10_ = Var162;
        auVar178[1] = uStack_e66;
        auVar178[0] = local_e78[2];
        auVar177._2_12_ = auVar178;
        auVar177[1] = uStack_e67;
        auVar177[0] = local_e78[1];
        auVar1103._0_2_ = CONCAT11(local_e68,local_e78[0]);
        auVar1103._2_14_ = auVar177;
        auVar1596[0xe] = local_e58[7];
        auVar1596._0_14_ = local_e58;
        auVar1596[0xf] = uStack_e41;
        auVar1595._14_2_ = auVar1596._14_2_;
        auVar1595._0_13_ = local_e58._0_13_;
        auVar1595[0xd] = uStack_e42;
        auVar1594._13_3_ = auVar1595._13_3_;
        auVar1594._0_12_ = local_e58._0_12_;
        auVar1594[0xc] = local_e58[6];
        auVar1593._12_4_ = auVar1594._12_4_;
        auVar1593._0_11_ = local_e58._0_11_;
        auVar1593[0xb] = uStack_e43;
        auVar1592._11_5_ = auVar1593._11_5_;
        auVar1592._0_10_ = local_e58._0_10_;
        auVar1592[10] = local_e58[5];
        auVar1591._10_6_ = auVar1592._10_6_;
        auVar1591._0_9_ = local_e58._0_9_;
        auVar1591[9] = uStack_e44;
        auVar1590._9_7_ = auVar1591._9_7_;
        auVar1590._0_8_ = local_e58._0_8_;
        auVar1590[8] = local_e58[4];
        Var164 = CONCAT91(CONCAT81(auVar1590._8_8_,uStack_e45),local_e58[3]);
        auVar180._2_10_ = Var164;
        auVar180[1] = uStack_e46;
        auVar180[0] = local_e58[2];
        auVar179._2_12_ = auVar180;
        auVar179[1] = uStack_e47;
        auVar179[0] = local_e58[1];
        auVar1732._0_12_ = auVar433._0_12_;
        auVar1732._12_2_ = (short)Var17;
        auVar1732._14_2_ = (short)Var19;
        auVar1731._12_4_ = auVar1732._12_4_;
        auVar1731._0_10_ = auVar433._0_10_;
        auVar1731._10_2_ = auVar168._0_2_;
        auVar1730._10_6_ = auVar1731._10_6_;
        auVar1730._0_8_ = auVar433._0_8_;
        auVar1730._8_2_ = auVar166._0_2_;
        auVar181._4_8_ = auVar1730._8_8_;
        auVar181._2_2_ = auVar167._0_2_;
        auVar181._0_2_ = auVar165._0_2_;
        auVar1729._0_4_ = CONCAT22(CONCAT11(local_f08,local_f18[0]),auVar433._0_2_);
        auVar1729._4_12_ = auVar181;
        auVar1812._0_12_ = auVar886._0_12_;
        auVar1812._12_2_ = (short)Var21;
        auVar1812._14_2_ = (short)Var23;
        auVar1811._12_4_ = auVar1812._12_4_;
        auVar1811._0_10_ = auVar886._0_10_;
        auVar1811._10_2_ = auVar172._0_2_;
        auVar1810._10_6_ = auVar1811._10_6_;
        auVar1810._0_8_ = auVar886._0_8_;
        auVar1810._8_2_ = auVar170._0_2_;
        auVar182._4_8_ = auVar1810._8_8_;
        auVar182._2_2_ = auVar171._0_2_;
        auVar182._0_2_ = auVar169._0_2_;
        auVar1889._0_12_ = auVar695._0_12_;
        auVar1889._12_2_ = (short)Var158;
        auVar1889._14_2_ = (short)Var160;
        auVar1888._12_4_ = auVar1889._12_4_;
        auVar1888._0_10_ = auVar695._0_10_;
        auVar1888._10_2_ = auVar176._0_2_;
        auVar1887._10_6_ = auVar1888._10_6_;
        auVar1887._0_8_ = auVar695._0_8_;
        auVar1887._8_2_ = auVar174._0_2_;
        auVar183._4_8_ = auVar1887._8_8_;
        auVar183._2_2_ = auVar175._0_2_;
        auVar183._0_2_ = auVar173._0_2_;
        auVar1886._0_4_ = CONCAT22(CONCAT11(local_e88,local_e98[0]),auVar695._0_2_);
        auVar1886._4_12_ = auVar183;
        auVar1974._0_12_ = auVar1103._0_12_;
        auVar1974._12_2_ = (short)Var162;
        auVar1974._14_2_ = (short)Var164;
        auVar1973._12_4_ = auVar1974._12_4_;
        auVar1973._0_10_ = auVar1103._0_10_;
        auVar1973._10_2_ = auVar180._0_2_;
        auVar1972._10_6_ = auVar1973._10_6_;
        auVar1972._0_8_ = auVar1103._0_8_;
        auVar1972._8_2_ = auVar178._0_2_;
        auVar184._4_8_ = auVar1972._8_8_;
        auVar184._2_2_ = auVar179._0_2_;
        auVar184._0_2_ = auVar177._0_2_;
        auVar2033._0_8_ = auVar1729._0_8_;
        auVar2033._8_4_ = auVar181._0_4_;
        auVar2033._12_4_ = auVar182._0_4_;
        auVar1813._0_8_ = auVar1886._0_8_;
        auVar1813._8_4_ = auVar183._0_4_;
        auVar1813._12_4_ = auVar184._0_4_;
        local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_ec8,local_ed8[0]),auVar886._0_2_),
                              auVar1729._0_4_);
        auStack_15b0[0] =
             CONCAT44(CONCAT22(CONCAT11(local_e48,local_e58[0]),auVar1103._0_2_),auVar1886._0_4_);
        auStack_15b0[1] = auVar2033._8_8_;
        auStack_15b0[2] = auVar1813._8_8_;
        local_1598 = CONCAT44(auVar1810._8_4_,auVar1730._8_4_);
        uStack_1590 = CONCAT44(auVar1972._8_4_,auVar1887._8_4_);
        local_1588._8_4_ = auVar1731._12_4_;
        local_1588._12_4_ = auVar1811._12_4_;
        auVar490._12_4_ = CONCAT22(auVar1291._8_2_,auVar434._8_2_);
        auVar321._0_8_ = CONCAT26(auVar1293._10_2_,CONCAT24(auVar436._10_2_,auVar490._12_4_));
        auVar321._8_2_ = auVar438._12_2_;
        auVar321._10_2_ = auVar1295._12_2_;
        auVar441._12_2_ = auVar439._14_2_;
        auVar441._0_12_ = auVar321;
        auVar441._14_2_ = auVar1296._14_2_;
        uVar781 = CONCAT22(auVar1391._8_2_,auVar887._8_2_);
        auVar795._0_8_ = CONCAT26(auVar1393._10_2_,CONCAT24(auVar889._10_2_,uVar781));
        auVar795._8_2_ = auVar891._12_2_;
        auVar795._10_2_ = auVar1395._12_2_;
        auVar894._12_2_ = auVar892._14_2_;
        auVar894._0_12_ = auVar795;
        auVar894._14_2_ = auVar1396._14_2_;
        auVar926._12_4_ = CONCAT22(auVar1489._8_2_,auVar696._8_2_);
        auVar525._0_8_ = CONCAT26(auVar1491._10_2_,CONCAT24(auVar698._10_2_,auVar926._12_4_));
        auVar525._8_2_ = auVar700._12_2_;
        auVar525._10_2_ = auVar1493._12_2_;
        auVar703._12_2_ = auVar701._14_2_;
        auVar703._0_12_ = auVar525;
        auVar703._14_2_ = auVar1494._14_2_;
        uVar936 = CONCAT22(auVar1590._8_2_,auVar1104._8_2_);
        auVar957._0_8_ = CONCAT26(auVar1592._10_2_,CONCAT24(auVar1106._10_2_,uVar936));
        auVar957._8_2_ = auVar1108._12_2_;
        auVar957._10_2_ = auVar1594._12_2_;
        auVar1111._12_2_ = auVar1109._14_2_;
        auVar1111._0_12_ = auVar957;
        auVar1111._14_2_ = auVar1595._14_2_;
        auVar1298._8_4_ = (int)((ulong)auVar321._0_8_ >> 0x20);
        auVar1298._0_8_ = auVar321._0_8_;
        auVar1298._12_4_ = (int)((ulong)auVar795._0_8_ >> 0x20);
        auVar895._8_4_ = (int)((ulong)auVar525._0_8_ >> 0x20);
        auVar895._0_8_ = auVar525._0_8_;
        auVar895._12_4_ = (int)((ulong)auVar957._0_8_ >> 0x20);
        local_1578 = CONCAT44(uVar781,auVar490._12_4_);
        uStack_1570 = CONCAT44(uVar936,auVar926._12_4_);
        local_1568 = auVar1298._8_8_;
        uStack_1560 = auVar895._8_8_;
        local_1558 = CONCAT44(auVar795._8_4_,auVar321._8_4_);
        uStack_1550 = CONCAT44(auVar957._8_4_,auVar525._8_4_);
        local_1548._8_4_ = auVar441._12_4_;
        local_1548._12_4_ = auVar894._12_4_;
        local_1538 = CONCAT44(auVar1111._12_4_,auVar703._12_4_);
        puVar301 = dst + 0x10;
        lVar300 = 0x80;
        do {
          uVar316 = *(undefined8 *)((long)local_16b8 + lVar300 + 8);
          *(undefined8 *)(puVar301 + -0x10) = *(undefined8 *)((long)local_16b8 + lVar300);
          *(undefined8 *)(puVar301 + -8) = uVar316;
          uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
          *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1638 + lVar300);
          *(undefined8 *)(puVar301 + 8) = uVar316;
          lVar300 = lVar300 + 0x10;
          puVar301 = puVar301 + stride;
        } while (lVar300 != 0x100);
        return;
      }
      if (bh != 4) {
        return;
      }
      iVar307 = 0x13 << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x100);
          }
          break;
        }
        if (3 < uVar308) {
          uVar308 = 4;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1651._0_4_ = auVar1198._0_4_;
          auVar1651._4_4_ = auVar1651._0_4_;
          auVar1651._8_4_ = auVar1651._0_4_;
          auVar1651._12_4_ = auVar1651._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1649._0_4_ = auVar1198._0_4_;
          auVar1649._4_4_ = auVar1649._0_4_;
          auVar1649._8_4_ = auVar1649._0_4_;
          auVar1649._12_4_ = auVar1649._0_4_;
          auVar1198 = psllw(auVar1649,ZEXT416((uint)upsample_left));
          auVar1650._0_2_ = auVar1198._0_2_ >> 1;
          auVar1650._2_2_ = auVar1198._2_2_ >> 1;
          auVar1650._4_2_ = auVar1198._4_2_ >> 1;
          auVar1650._6_2_ = auVar1198._6_2_ >> 1;
          auVar1650._8_2_ = auVar1198._8_2_ >> 1;
          auVar1650._10_2_ = auVar1198._10_2_ >> 1;
          auVar1650._12_2_ = auVar1198._12_2_ >> 1;
          auVar1650._14_2_ = auVar1198._14_2_ >> 1;
          auVar1651 = auVar1650 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1651._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1651._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1651._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1651._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1651._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1651._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1651._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1651._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar330._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar330[2] = auVar1356[9];
        auVar330[3] = 0;
        auVar330[4] = auVar1356[10];
        auVar330[5] = 0;
        auVar330[6] = auVar1356[0xb];
        auVar330[7] = 0;
        auVar330[8] = auVar1356[0xc];
        auVar330[9] = 0;
        auVar330[10] = auVar1356[0xd];
        auVar330[0xb] = 0;
        auVar330[0xc] = auVar1356[0xe];
        auVar330[0xd] = 0;
        auVar330[0xe] = auVar1356[0xf];
        auVar330[0xf] = 0;
        auVar1198 = psllw(auVar330,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar330._0_2_) * auVar1651._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1651._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1651._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1651._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1651._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1651._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1651._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1651._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 0x10);
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar906._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar261._6_5_ = 0;
      auVar261._0_6_ = uVar241;
      auVar907._0_11_ = auVar261 << 0x30;
      auVar281._8_5_ = 0;
      auVar281._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar908._0_13_ = auVar281 << 0x30;
      uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar1409._0_9_ = (unkuint9)uVar308 << 0x30;
      uVar242 = CONCAT24(uStack_fce,uVar308);
      auVar262._6_5_ = 0;
      auVar262._0_6_ = uVar242;
      auVar1410._0_11_ = auVar262 << 0x30;
      auVar282._8_5_ = 0;
      auVar282._0_8_ = CONCAT26(uStack_fcc,uVar242);
      auVar1411._0_13_ = auVar282 << 0x30;
      auVar462[0xe] = local_1038[7];
      auVar462._0_14_ = local_1038._0_14_;
      auVar462[0xf] = local_1028[7];
      auVar461._14_2_ = auVar462._14_2_;
      auVar461._0_13_ = local_1038._0_13_;
      auVar461[0xd] = local_1028[6];
      auVar460._13_3_ = auVar461._13_3_;
      auVar460._0_12_ = local_1038._0_12_;
      auVar460[0xc] = local_1038[6];
      auVar459._12_4_ = auVar460._12_4_;
      auVar459._0_11_ = local_1038._0_11_;
      auVar459[0xb] = local_1028[5];
      auVar458._11_5_ = auVar459._11_5_;
      auVar458._0_10_ = local_1038._0_10_;
      auVar458[10] = local_1038[5];
      auVar457._10_6_ = auVar458._10_6_;
      auVar457._0_9_ = local_1038._0_9_;
      auVar457[9] = local_1028[4];
      auVar456._9_7_ = auVar457._9_7_;
      auVar456._0_8_ = local_1038._0_8_;
      auVar456[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar456._8_8_,local_1028[3]),local_1038[3]);
      auVar198._2_10_ = Var17;
      auVar198[1] = local_1028[2];
      auVar198[0] = local_1038[2];
      auVar455._4_12_ = auVar198;
      auVar455[3] = local_1028[1];
      auVar455[2] = local_1038[1];
      auVar455._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar1325[0xe] = local_1018[7];
      auVar1325._0_14_ = local_1018._0_14_;
      auVar1325[0xf] = local_1008[7];
      auVar1324._14_2_ = auVar1325._14_2_;
      auVar1324._0_13_ = local_1018._0_13_;
      auVar1324[0xd] = local_1008[6];
      auVar1323._13_3_ = auVar1324._13_3_;
      auVar1323._0_12_ = local_1018._0_12_;
      auVar1323[0xc] = local_1018[6];
      auVar1322._12_4_ = auVar1323._12_4_;
      auVar1322._0_11_ = local_1018._0_11_;
      auVar1322[0xb] = local_1008[5];
      auVar1321._11_5_ = auVar1322._11_5_;
      auVar1321._0_10_ = local_1018._0_10_;
      auVar1321[10] = local_1018[5];
      auVar1320._10_6_ = auVar1321._10_6_;
      auVar1320._0_9_ = local_1018._0_9_;
      auVar1320[9] = local_1008[4];
      auVar1319._9_7_ = auVar1320._9_7_;
      auVar1319._0_8_ = local_1018._0_8_;
      auVar1319[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar1319._8_8_,local_1008[3]),local_1018[3]);
      auVar199._2_10_ = Var19;
      auVar199[1] = local_1008[2];
      auVar199[0] = local_1018[2];
      auVar908._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar908[0xd] = local_fe8._6_1_;
      Var258 = CONCAT37(auVar908._13_3_,CONCAT16((char)uStack_ff2,uVar241));
      auVar907._12_4_ = (undefined4)((unkuint10)Var258 >> 0x30);
      auVar907[0xb] = local_fe8._5_1_;
      Var245 = CONCAT55(auVar907._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
      auVar906._10_6_ = (undefined6)((unkuint10)Var245 >> 0x20);
      auVar906[9] = local_fe8._4_1_;
      Var243 = CONCAT73(auVar906._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
      Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var243 >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar200._2_10_ = Var21;
      auVar200[1] = local_fe8._2_1_;
      auVar200[0] = (char)uStack_ff6;
      auVar905._4_12_ = auVar200;
      auVar905[3] = local_fe8._1_1_;
      uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
      auVar905[2] = uStack_1624;
      auVar905._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      auVar1411._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >> 0x40
           );
      auVar1411[0xd] = local_fc8._6_1_;
      Var260 = CONCAT37(auVar1411._13_3_,CONCAT16((char)uStack_fd2,uVar242));
      auVar1410._12_4_ = (undefined4)((unkuint10)Var260 >> 0x30);
      auVar1410[0xb] = local_fc8._5_1_;
      Var246 = CONCAT55(auVar1410._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar308));
      auVar1409._10_6_ = (undefined6)((unkuint10)Var246 >> 0x20);
      auVar1409[9] = local_fc8._4_1_;
      Var244 = CONCAT73(auVar1409._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
      Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var244 >> 0x10),local_fc8._3_1_),
                       (char)((ushort)uStack_fd6 >> 8));
      auVar201._2_10_ = Var23;
      auVar201[1] = local_fc8._2_1_;
      auVar201[0] = (char)uStack_fd6;
      auVar729[0xe] = local_fb8[7];
      auVar729._0_14_ = local_fb8._0_14_;
      auVar729[0xf] = local_fa8[7];
      auVar728._14_2_ = auVar729._14_2_;
      auVar728._0_13_ = local_fb8._0_13_;
      auVar728[0xd] = local_fa8[6];
      auVar727._13_3_ = auVar728._13_3_;
      auVar727._0_12_ = local_fb8._0_12_;
      auVar727[0xc] = local_fb8[6];
      auVar726._12_4_ = auVar727._12_4_;
      auVar726._0_11_ = local_fb8._0_11_;
      auVar726[0xb] = local_fa8[5];
      auVar725._11_5_ = auVar726._11_5_;
      auVar725._0_10_ = local_fb8._0_10_;
      auVar725[10] = local_fb8[5];
      auVar724._10_6_ = auVar725._10_6_;
      auVar724._0_9_ = local_fb8._0_9_;
      auVar724[9] = local_fa8[4];
      auVar723._9_7_ = auVar724._9_7_;
      auVar723._0_8_ = local_fb8._0_8_;
      auVar723[8] = local_fb8[4];
      Var158 = CONCAT91(CONCAT81(auVar723._8_8_,local_fa8[3]),local_fb8[3]);
      auVar202._2_10_ = Var158;
      auVar202[1] = local_fa8[2];
      auVar202[0] = local_fb8[2];
      auVar722._4_12_ = auVar202;
      auVar722[3] = local_fa8[1];
      auVar722[2] = local_fb8[1];
      auVar722._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1504[0xe] = local_f98[7];
      auVar1504._0_14_ = local_f98._0_14_;
      auVar1504[0xf] = local_f88[7];
      auVar1503._14_2_ = auVar1504._14_2_;
      auVar1503._0_13_ = local_f98._0_13_;
      auVar1503[0xd] = local_f88[6];
      auVar1502._13_3_ = auVar1503._13_3_;
      auVar1502._0_12_ = local_f98._0_12_;
      auVar1502[0xc] = local_f98[6];
      auVar1501._12_4_ = auVar1502._12_4_;
      auVar1501._0_11_ = local_f98._0_11_;
      auVar1501[0xb] = local_f88[5];
      auVar1500._11_5_ = auVar1501._11_5_;
      auVar1500._0_10_ = local_f98._0_10_;
      auVar1500[10] = local_f98[5];
      auVar1499._10_6_ = auVar1500._10_6_;
      auVar1499._0_9_ = local_f98._0_9_;
      auVar1499[9] = local_f88[4];
      auVar1498._9_7_ = auVar1499._9_7_;
      auVar1498._0_8_ = local_f98._0_8_;
      auVar1498[8] = local_f98[4];
      Var160 = CONCAT91(CONCAT81(auVar1498._8_8_,local_f88[3]),local_f98[3]);
      auVar203._2_10_ = Var160;
      auVar203[1] = local_f88[2];
      auVar203[0] = local_f98[2];
      auVar1139[0xe] = local_f78[7];
      auVar1139._0_14_ = local_f78._0_14_;
      auVar1139[0xf] = local_f68._7_1_;
      auVar1138._14_2_ = auVar1139._14_2_;
      auVar1138._0_13_ = local_f78._0_13_;
      auVar1138[0xd] = local_f68._6_1_;
      auVar1137._13_3_ = auVar1138._13_3_;
      auVar1137._0_12_ = local_f78._0_12_;
      auVar1137[0xc] = local_f78[6];
      auVar1136._12_4_ = auVar1137._12_4_;
      auVar1136._0_11_ = local_f78._0_11_;
      auVar1136[0xb] = local_f68._5_1_;
      auVar1135._11_5_ = auVar1136._11_5_;
      auVar1135._0_10_ = local_f78._0_10_;
      auVar1135[10] = local_f78[5];
      auVar1134._10_6_ = auVar1135._10_6_;
      auVar1134._0_9_ = local_f78._0_9_;
      auVar1134[9] = local_f68._4_1_;
      auVar1133._9_7_ = auVar1134._9_7_;
      auVar1133._0_8_ = local_f78._0_8_;
      auVar1133[8] = local_f78[4];
      Var162 = CONCAT91(CONCAT81(auVar1133._8_8_,local_f68._3_1_),local_f78[3]);
      auVar204._2_10_ = Var162;
      auVar204[1] = local_f68._2_1_;
      auVar204[0] = local_f78[2];
      auVar1132._4_12_ = auVar204;
      auVar1132[3] = local_f68._1_1_;
      auVar1132[2] = local_f78[1];
      auVar1132._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
      auVar1610[0xe] = local_f58[7];
      auVar1610._0_14_ = local_f58._0_14_;
      auVar1610[0xf] = local_f48._7_1_;
      auVar1609._14_2_ = auVar1610._14_2_;
      auVar1609._0_13_ = local_f58._0_13_;
      auVar1609[0xd] = local_f48._6_1_;
      auVar1608._13_3_ = auVar1609._13_3_;
      auVar1608._0_12_ = local_f58._0_12_;
      auVar1608[0xc] = local_f58[6];
      auVar1607._12_4_ = auVar1608._12_4_;
      auVar1607._0_11_ = local_f58._0_11_;
      auVar1607[0xb] = local_f48._5_1_;
      auVar1606._11_5_ = auVar1607._11_5_;
      auVar1606._0_10_ = local_f58._0_10_;
      auVar1606[10] = local_f58[5];
      auVar1605._10_6_ = auVar1606._10_6_;
      auVar1605._0_9_ = local_f58._0_9_;
      auVar1605[9] = local_f48._4_1_;
      auVar1604._9_7_ = auVar1605._9_7_;
      auVar1604._0_8_ = local_f58._0_8_;
      auVar1604[8] = local_f58[4];
      Var164 = CONCAT91(CONCAT81(auVar1604._8_8_,local_f48._3_1_),local_f58[3]);
      auVar205._2_10_ = Var164;
      auVar205[1] = local_f48._2_1_;
      auVar205[0] = local_f58[2];
      auVar1743._0_12_ = auVar455._0_12_;
      auVar1743._12_2_ = (short)Var17;
      auVar1743._14_2_ = (short)Var19;
      auVar1742._12_4_ = auVar1743._12_4_;
      auVar1742._0_10_ = auVar455._0_10_;
      auVar1742._10_2_ = auVar199._0_2_;
      auVar1741._10_6_ = auVar1742._10_6_;
      auVar1741._0_8_ = auVar455._0_8_;
      auVar1741._8_2_ = auVar198._0_2_;
      auVar1818._0_12_ = auVar905._0_12_;
      auVar1818._12_2_ = (short)Var21;
      auVar1818._14_2_ = (short)Var23;
      auVar1817._12_4_ = auVar1818._12_4_;
      auVar1817._0_10_ = auVar905._0_10_;
      auVar1817._10_2_ = auVar201._0_2_;
      auVar1816._10_6_ = auVar1817._10_6_;
      auVar1816._0_8_ = auVar905._0_8_;
      auVar1816._8_2_ = auVar200._0_2_;
      auVar1899._0_12_ = auVar722._0_12_;
      auVar1899._12_2_ = (short)Var158;
      auVar1899._14_2_ = (short)Var160;
      auVar1898._12_4_ = auVar1899._12_4_;
      auVar1898._0_10_ = auVar722._0_10_;
      auVar1898._10_2_ = auVar203._0_2_;
      auVar1897._10_6_ = auVar1898._10_6_;
      auVar1897._0_8_ = auVar722._0_8_;
      auVar1897._8_2_ = auVar202._0_2_;
      auVar1981._0_12_ = auVar1132._0_12_;
      auVar1981._12_2_ = (short)Var162;
      auVar1981._14_2_ = (short)Var164;
      auVar1980._12_4_ = auVar1981._12_4_;
      auVar1980._0_10_ = auVar1132._0_10_;
      auVar1980._10_2_ = auVar205._0_2_;
      auVar1979._10_6_ = auVar1980._10_6_;
      auVar1979._0_8_ = auVar1132._0_8_;
      auVar1979._8_2_ = auVar204._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar905._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar455._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1132._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar722._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1623 = local_fe8._1_1_;
      uStack_1622 = (char)((ushort)local_fd8 >> 8);
      uStack_1621 = local_fc8._1_1_;
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68._1_1_;
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48._1_1_;
      local_1618 = auVar1741._8_4_;
      uStack_1614 = auVar1816._8_4_;
      uStack_1610 = auVar1897._8_4_;
      uStack_160c = auVar1979._8_4_;
      local_1608._8_4_ = auVar1742._12_4_;
      local_1608._12_4_ = auVar1817._12_4_;
      auVar490._12_4_ = CONCAT22(auVar1319._8_2_,auVar456._8_2_);
      auVar322._0_8_ = CONCAT26(auVar1321._10_2_,CONCAT24(auVar458._10_2_,auVar490._12_4_));
      auVar322._8_2_ = auVar460._12_2_;
      auVar322._10_2_ = auVar1323._12_2_;
      auVar463._12_2_ = auVar461._14_2_;
      auVar463._0_12_ = auVar322;
      auVar463._14_2_ = auVar1324._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)Var244 >> 0x10),(short)((unkuint10)Var243 >> 0x10));
      auVar799._0_8_ =
           CONCAT26((short)((unkuint10)Var246 >> 0x20),
                    CONCAT24((short)((unkuint10)Var245 >> 0x20),uVar781));
      auVar799._8_2_ = (short)((unkuint10)Var258 >> 0x30);
      auVar799._10_2_ = (short)((unkuint10)Var260 >> 0x30);
      auVar909._12_2_ = auVar908._14_2_;
      auVar909._0_12_ = auVar799;
      auVar909._14_2_ = auVar1411._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1498._8_2_,auVar723._8_2_);
      auVar529._0_8_ = CONCAT26(auVar1500._10_2_,CONCAT24(auVar725._10_2_,auVar926._12_4_));
      auVar529._8_2_ = auVar727._12_2_;
      auVar529._10_2_ = auVar1502._12_2_;
      auVar730._12_2_ = auVar728._14_2_;
      auVar730._0_12_ = auVar529;
      auVar730._14_2_ = auVar1503._14_2_;
      uVar936 = CONCAT22(auVar1604._8_2_,auVar1133._8_2_);
      auVar960._0_8_ = CONCAT26(auVar1606._10_2_,CONCAT24(auVar1135._10_2_,uVar936));
      auVar960._8_2_ = auVar1137._12_2_;
      auVar960._10_2_ = auVar1608._12_2_;
      auVar1140._12_2_ = auVar1138._14_2_;
      auVar1140._0_12_ = auVar960;
      auVar1140._14_2_ = auVar1609._14_2_;
      auVar1326._8_4_ = (int)((ulong)auVar322._0_8_ >> 0x20);
      auVar1326._0_8_ = auVar322._0_8_;
      auVar1326._12_4_ = (int)((ulong)auVar799._0_8_ >> 0x20);
      auVar910._8_4_ = (int)((ulong)auVar529._0_8_ >> 0x20);
      auVar910._0_8_ = auVar529._0_8_;
      auVar910._12_4_ = (int)((ulong)auVar960._0_8_ >> 0x20);
      local_15f8 = CONCAT44(uVar781,auVar490._12_4_);
      uStack_15f0 = CONCAT44(uVar936,auVar926._12_4_);
      local_15e8 = auVar1326._8_8_;
      uStack_15e0 = auVar910._8_8_;
      local_15d8 = CONCAT44(auVar799._8_4_,auVar322._8_4_);
      uStack_15d0 = CONCAT44(auVar960._8_4_,auVar529._8_4_);
      local_15c8._8_4_ = auVar463._12_4_;
      local_15c8._12_4_ = auVar909._12_4_;
      local_15b8 = CONCAT44(auVar1140._12_4_,auVar730._12_4_);
      lVar300 = 0;
      do {
        uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar300);
        *(undefined8 *)(dst + 8) = uVar316;
        lVar300 = lVar300 + 0x10;
        dst = dst + stride;
      } while (lVar300 != 0x40);
      return;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar307 = 0xb << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 8) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x80);
          }
          break;
        }
        if (3 < uVar308) {
          uVar308 = 4;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1642._0_4_ = auVar1198._0_4_;
          auVar1642._4_4_ = auVar1642._0_4_;
          auVar1642._8_4_ = auVar1642._0_4_;
          auVar1642._12_4_ = auVar1642._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1640._0_4_ = auVar1198._0_4_;
          auVar1640._4_4_ = auVar1640._0_4_;
          auVar1640._8_4_ = auVar1640._0_4_;
          auVar1640._12_4_ = auVar1640._0_4_;
          auVar1198 = psllw(auVar1640,ZEXT416((uint)upsample_left));
          auVar1641._0_2_ = auVar1198._0_2_ >> 1;
          auVar1641._2_2_ = auVar1198._2_2_ >> 1;
          auVar1641._4_2_ = auVar1198._4_2_ >> 1;
          auVar1641._6_2_ = auVar1198._6_2_ >> 1;
          auVar1641._8_2_ = auVar1198._8_2_ >> 1;
          auVar1641._10_2_ = auVar1198._10_2_ >> 1;
          auVar1641._12_2_ = auVar1198._12_2_ >> 1;
          auVar1641._14_2_ = auVar1198._14_2_ >> 1;
          auVar1642 = auVar1641 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1642._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1642._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1642._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1642._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1642._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1642._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1642._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1642._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar327._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar327[2] = auVar1356[9];
        auVar327[3] = 0;
        auVar327[4] = auVar1356[10];
        auVar327[5] = 0;
        auVar327[6] = auVar1356[0xb];
        auVar327[7] = 0;
        auVar327[8] = auVar1356[0xc];
        auVar327[9] = 0;
        auVar327[10] = auVar1356[0xd];
        auVar327[0xb] = 0;
        auVar327[0xc] = auVar1356[0xe];
        auVar327[0xd] = 0;
        auVar327[0xe] = auVar1356[0xf];
        auVar327[0xf] = 0;
        auVar1198 = psllw(auVar327,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar327._0_2_) * auVar1642._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1642._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1642._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1642._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1642._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1642._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1642._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1642._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 8);
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar922._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar263._6_5_ = 0;
      auVar263._0_6_ = uVar241;
      auVar923._0_11_ = auVar263 << 0x30;
      auVar283._8_5_ = 0;
      auVar283._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar924._0_13_ = auVar283 << 0x30;
      auVar487[0xe] = local_1038[7];
      auVar487._0_14_ = local_1038._0_14_;
      auVar487[0xf] = local_1028[7];
      auVar486._14_2_ = auVar487._14_2_;
      auVar486._0_13_ = local_1038._0_13_;
      auVar486[0xd] = local_1028[6];
      auVar485._13_3_ = auVar486._13_3_;
      auVar485._0_12_ = local_1038._0_12_;
      auVar485[0xc] = local_1038[6];
      auVar484._12_4_ = auVar485._12_4_;
      auVar484._0_11_ = local_1038._0_11_;
      auVar484[0xb] = local_1028[5];
      auVar483._11_5_ = auVar484._11_5_;
      auVar483._0_10_ = local_1038._0_10_;
      auVar483[10] = local_1038[5];
      auVar482._10_6_ = auVar483._10_6_;
      auVar482._0_9_ = local_1038._0_9_;
      auVar482[9] = local_1028[4];
      auVar481._9_7_ = auVar482._9_7_;
      auVar481._0_8_ = local_1038._0_8_;
      auVar481[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar481._8_8_,local_1028[3]),local_1038[3]);
      auVar220._2_10_ = Var17;
      auVar220[1] = local_1028[2];
      auVar220[0] = local_1038[2];
      auVar219._2_12_ = auVar220;
      auVar219[1] = local_1028[1];
      auVar219[0] = local_1038[1];
      uVar2258 = CONCAT11(local_1028[0],local_1038[0]);
      auVar480._2_14_ = auVar219;
      uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar1156._0_9_ = (unkuint9)uVar308 << 0x30;
      uVar242 = CONCAT24(uStack_fce,uVar308);
      auVar264._6_5_ = 0;
      auVar264._0_6_ = uVar242;
      auVar1157._0_11_ = auVar264 << 0x30;
      auVar284._8_5_ = 0;
      auVar284._0_8_ = CONCAT26(uStack_fcc,uVar242);
      auVar1158._0_13_ = auVar284 << 0x30;
      auVar760[0xe] = local_1018[7];
      auVar760._0_14_ = local_1018._0_14_;
      auVar760[0xf] = local_1008[7];
      auVar759._14_2_ = auVar760._14_2_;
      auVar759._0_13_ = local_1018._0_13_;
      auVar759[0xd] = local_1008[6];
      auVar758._13_3_ = auVar759._13_3_;
      auVar758._0_12_ = local_1018._0_12_;
      auVar758[0xc] = local_1018[6];
      auVar757._12_4_ = auVar758._12_4_;
      auVar757._0_11_ = local_1018._0_11_;
      auVar757[0xb] = local_1008[5];
      auVar756._11_5_ = auVar757._11_5_;
      auVar756._0_10_ = local_1018._0_10_;
      auVar756[10] = local_1018[5];
      auVar755._10_6_ = auVar756._10_6_;
      auVar755._0_9_ = local_1018._0_9_;
      auVar755[9] = local_1008[4];
      auVar754._9_7_ = auVar755._9_7_;
      auVar754._0_8_ = local_1018._0_8_;
      auVar754[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar754._8_8_,local_1008[3]),local_1018[3]);
      auVar222._2_10_ = Var19;
      auVar222[1] = local_1008[2];
      auVar222[0] = local_1018[2];
      auVar221._2_12_ = auVar222;
      auVar221[1] = local_1008[1];
      auVar221[0] = local_1018[1];
      auVar491._0_12_ = auVar480._0_12_;
      auVar491._12_2_ = (short)Var17;
      auVar491._14_2_ = (short)Var19;
      auVar490._12_4_ = auVar491._12_4_;
      auVar490._0_10_ = auVar480._0_10_;
      auVar490._10_2_ = auVar222._0_2_;
      auVar489._10_6_ = auVar490._10_6_;
      auVar489._0_8_ = auVar480._0_8_;
      auVar489._8_2_ = auVar220._0_2_;
      auVar223._4_8_ = auVar489._8_8_;
      auVar223._2_2_ = auVar221._0_2_;
      auVar223._0_2_ = auVar219._0_2_;
      auVar488._0_4_ = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),uVar2258);
      auVar488._4_12_ = auVar223;
      auVar924._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar924[0xd] = local_fe8._6_1_;
      auVar923._12_4_ =
           (undefined4)(CONCAT37(auVar924._13_3_,CONCAT16((char)uStack_ff2,uVar241)) >> 0x30);
      auVar923[0xb] = local_fe8._5_1_;
      auVar922._10_6_ =
           (undefined6)
           (CONCAT55(auVar923._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305)) >> 0x20);
      auVar922[9] = local_fe8._4_1_;
      Var17 = CONCAT91(CONCAT81((long)(CONCAT73(auVar922._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2)
                                               ) >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar225._2_10_ = Var17;
      auVar225[1] = local_fe8._2_1_;
      auVar225[0] = (char)uStack_ff6;
      auVar224._2_12_ = auVar225;
      auVar224[1] = local_fe8._1_1_;
      auVar224[0] = (char)((ushort)local_ff8 >> 8);
      uVar2259 = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      auVar921._2_14_ = auVar224;
      auVar1158._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >> 0x40
           );
      auVar1158[0xd] = local_fc8._6_1_;
      auVar1157._12_4_ =
           (undefined4)(CONCAT37(auVar1158._13_3_,CONCAT16((char)uStack_fd2,uVar242)) >> 0x30);
      auVar1157[0xb] = local_fc8._5_1_;
      auVar1156._10_6_ =
           (undefined6)(CONCAT55(auVar1157._11_5_,CONCAT14(uStack_fd4._1_1_,uVar308)) >> 0x20);
      auVar1156[9] = local_fc8._4_1_;
      Var19 = CONCAT91(CONCAT81((long)(((unkuint10)auVar1156._9_7_ << 0x18) >> 0x10),local_fc8._3_1_
                               ),(char)((ushort)uStack_fd6 >> 8));
      auVar227._2_10_ = Var19;
      auVar227[1] = local_fc8._2_1_;
      auVar227[0] = (char)uStack_fd6;
      auVar226._2_12_ = auVar227;
      auVar226[1] = local_fc8._1_1_;
      auVar226[0] = (char)((ushort)local_fd8 >> 8);
      auVar927._0_12_ = auVar921._0_12_;
      auVar927._12_2_ = (short)Var17;
      auVar927._14_2_ = (short)Var19;
      auVar926._12_4_ = auVar927._12_4_;
      auVar926._0_10_ = auVar921._0_10_;
      auVar926._10_2_ = auVar227._0_2_;
      auVar925._10_6_ = auVar926._10_6_;
      auVar925._0_8_ = auVar921._0_8_;
      auVar925._8_2_ = auVar225._0_2_;
      auVar228._4_8_ = auVar925._8_8_;
      auVar228._2_2_ = auVar226._0_2_;
      auVar228._0_2_ = auVar224._0_2_;
      auVar761._0_8_ = auVar488._0_8_;
      auVar761._8_4_ = auVar223._0_4_;
      auVar761._12_4_ = auVar228._0_4_;
      *(ulong *)dst =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),uVar2259),
                    auVar488._0_4_);
      *(long *)(dst + stride) = auVar761._8_8_;
      *(int *)(dst + stride * 2) = auVar489._8_4_;
      *(int *)(dst + stride * 2 + 4) = auVar925._8_4_;
      lVar300 = stride * 3;
      goto LAB_00340cfe;
    case 1:
      iVar307 = 0x17 << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 0x10) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x100);
          }
          break;
        }
        if (7 < uVar308) {
          uVar308 = 8;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1725._0_4_ = auVar1198._0_4_;
          auVar1725._4_4_ = auVar1725._0_4_;
          auVar1725._8_4_ = auVar1725._0_4_;
          auVar1725._12_4_ = auVar1725._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1723._0_4_ = auVar1198._0_4_;
          auVar1723._4_4_ = auVar1723._0_4_;
          auVar1723._8_4_ = auVar1723._0_4_;
          auVar1723._12_4_ = auVar1723._0_4_;
          auVar1198 = psllw(auVar1723,ZEXT416((uint)upsample_left));
          auVar1724._0_2_ = auVar1198._0_2_ >> 1;
          auVar1724._2_2_ = auVar1198._2_2_ >> 1;
          auVar1724._4_2_ = auVar1198._4_2_ >> 1;
          auVar1724._6_2_ = auVar1198._6_2_ >> 1;
          auVar1724._8_2_ = auVar1198._8_2_ >> 1;
          auVar1724._10_2_ = auVar1198._10_2_ >> 1;
          auVar1724._12_2_ = auVar1198._12_2_ >> 1;
          auVar1724._14_2_ = auVar1198._14_2_ >> 1;
          auVar1725 = auVar1724 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1725._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1725._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1725._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1725._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1725._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1725._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1725._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1725._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar423._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar423[2] = auVar1356[9];
        auVar423[3] = 0;
        auVar423[4] = auVar1356[10];
        auVar423[5] = 0;
        auVar423[6] = auVar1356[0xb];
        auVar423[7] = 0;
        auVar423[8] = auVar1356[0xc];
        auVar423[9] = 0;
        auVar423[10] = auVar1356[0xd];
        auVar423[0xb] = 0;
        auVar423[0xc] = auVar1356[0xe];
        auVar423[0xd] = 0;
        auVar423[0xe] = auVar1356[0xf];
        auVar423[0xf] = 0;
        auVar1198 = psllw(auVar423,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar423._0_2_) * auVar1725._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1725._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1725._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1725._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1725._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1725._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1725._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1725._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 0x10);
      uVar305 = CONCAT22(uStack_ff0,uStack_ff2);
      auVar930._0_9_ = (unkuint9)uVar305 << 0x30;
      uVar241 = CONCAT24(uStack_fee,uVar305);
      auVar267._6_5_ = 0;
      auVar267._0_6_ = uVar241;
      auVar931._0_11_ = auVar267 << 0x30;
      auVar289._8_5_ = 0;
      auVar289._0_8_ = CONCAT26(uStack_fec,uVar241);
      auVar932._0_13_ = auVar289 << 0x30;
      uVar308 = CONCAT22(uStack_fd0,uStack_fd2);
      auVar1420._0_9_ = (unkuint9)uVar308 << 0x30;
      uVar242 = CONCAT24(uStack_fce,uVar308);
      auVar268._6_5_ = 0;
      auVar268._0_6_ = uVar242;
      auVar1421._0_11_ = auVar268 << 0x30;
      auVar290._8_5_ = 0;
      auVar290._0_8_ = CONCAT26(uStack_fcc,uVar242);
      auVar1422._0_13_ = auVar290 << 0x30;
      auVar500[0xe] = local_1038[7];
      auVar500._0_14_ = local_1038._0_14_;
      auVar500[0xf] = local_1028[7];
      auVar499._14_2_ = auVar500._14_2_;
      auVar499._0_13_ = local_1038._0_13_;
      auVar499[0xd] = local_1028[6];
      auVar498._13_3_ = auVar499._13_3_;
      auVar498._0_12_ = local_1038._0_12_;
      auVar498[0xc] = local_1038[6];
      auVar497._12_4_ = auVar498._12_4_;
      auVar497._0_11_ = local_1038._0_11_;
      auVar497[0xb] = local_1028[5];
      auVar496._11_5_ = auVar497._11_5_;
      auVar496._0_10_ = local_1038._0_10_;
      auVar496[10] = local_1038[5];
      auVar495._10_6_ = auVar496._10_6_;
      auVar495._0_9_ = local_1038._0_9_;
      auVar495[9] = local_1028[4];
      auVar494._9_7_ = auVar495._9_7_;
      auVar494._0_8_ = local_1038._0_8_;
      auVar494[8] = local_1038[4];
      Var17 = CONCAT91(CONCAT81(auVar494._8_8_,local_1028[3]),local_1038[3]);
      auVar233._2_10_ = Var17;
      auVar233[1] = local_1028[2];
      auVar233[0] = local_1038[2];
      auVar493._4_12_ = auVar233;
      auVar493[3] = local_1028[1];
      auVar493[2] = local_1038[1];
      auVar493._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar1344[0xe] = local_1018[7];
      auVar1344._0_14_ = local_1018._0_14_;
      auVar1344[0xf] = local_1008[7];
      auVar1343._14_2_ = auVar1344._14_2_;
      auVar1343._0_13_ = local_1018._0_13_;
      auVar1343[0xd] = local_1008[6];
      auVar1342._13_3_ = auVar1343._13_3_;
      auVar1342._0_12_ = local_1018._0_12_;
      auVar1342[0xc] = local_1018[6];
      auVar1341._12_4_ = auVar1342._12_4_;
      auVar1341._0_11_ = local_1018._0_11_;
      auVar1341[0xb] = local_1008[5];
      auVar1340._11_5_ = auVar1341._11_5_;
      auVar1340._0_10_ = local_1018._0_10_;
      auVar1340[10] = local_1018[5];
      auVar1339._10_6_ = auVar1340._10_6_;
      auVar1339._0_9_ = local_1018._0_9_;
      auVar1339[9] = local_1008[4];
      auVar1338._9_7_ = auVar1339._9_7_;
      auVar1338._0_8_ = local_1018._0_8_;
      auVar1338[8] = local_1018[4];
      Var19 = CONCAT91(CONCAT81(auVar1338._8_8_,local_1008[3]),local_1018[3]);
      auVar234._2_10_ = Var19;
      auVar234[1] = local_1008[2];
      auVar234[0] = local_1018[2];
      auVar932._14_2_ =
           (undefined2)
           (CONCAT19(local_fe8._7_1_,
                     CONCAT18((char)((ushort)uStack_ff2 >> 8),CONCAT26(uStack_fec,uVar241))) >> 0x40
           );
      auVar932[0xd] = local_fe8._6_1_;
      Var258 = CONCAT37(auVar932._13_3_,CONCAT16((char)uStack_ff2,uVar241));
      auVar931._12_4_ = (undefined4)((unkuint10)Var258 >> 0x30);
      auVar931[0xb] = local_fe8._5_1_;
      Var245 = CONCAT55(auVar931._11_5_,CONCAT14((char)((ushort)uStack_ff4 >> 8),uVar305));
      auVar930._10_6_ = (undefined6)((unkuint10)Var245 >> 0x20);
      auVar930[9] = local_fe8._4_1_;
      Var243 = CONCAT73(auVar930._9_7_,CONCAT12((char)uStack_ff4,uStack_ff2));
      Var21 = CONCAT91(CONCAT81((long)((unkuint10)Var243 >> 0x10),local_fe8._3_1_),
                       (char)((ushort)uStack_ff6 >> 8));
      auVar235._2_10_ = Var21;
      auVar235[1] = local_fe8._2_1_;
      auVar235[0] = (char)uStack_ff6;
      auVar929._4_12_ = auVar235;
      auVar929[3] = local_fe8._1_1_;
      uStack_1624 = (undefined1)((ushort)local_ff8 >> 8);
      auVar929[2] = uStack_1624;
      auVar929._0_2_ = CONCAT11((undefined1)local_fe8,(char)local_ff8);
      auVar1422._14_2_ =
           (undefined2)
           (CONCAT19(local_fc8._7_1_,
                     CONCAT18((char)((ushort)uStack_fd2 >> 8),CONCAT26(uStack_fcc,uVar242))) >> 0x40
           );
      auVar1422[0xd] = local_fc8._6_1_;
      Var260 = CONCAT37(auVar1422._13_3_,CONCAT16((char)uStack_fd2,uVar242));
      auVar1421._12_4_ = (undefined4)((unkuint10)Var260 >> 0x30);
      auVar1421[0xb] = local_fc8._5_1_;
      Var246 = CONCAT55(auVar1421._11_5_,CONCAT14((char)((ushort)uStack_fd4 >> 8),uVar308));
      auVar1420._10_6_ = (undefined6)((unkuint10)Var246 >> 0x20);
      auVar1420[9] = local_fc8._4_1_;
      Var244 = CONCAT73(auVar1420._9_7_,CONCAT12((char)uStack_fd4,uStack_fd2));
      Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var244 >> 0x10),local_fc8._3_1_),
                       (char)((ushort)uStack_fd6 >> 8));
      auVar236._2_10_ = Var23;
      auVar236[1] = local_fc8._2_1_;
      auVar236[0] = (char)uStack_fd6;
      auVar778[0xe] = local_fb8[7];
      auVar778._0_14_ = local_fb8._0_14_;
      auVar778[0xf] = local_fa8[7];
      auVar777._14_2_ = auVar778._14_2_;
      auVar777._0_13_ = local_fb8._0_13_;
      auVar777[0xd] = local_fa8[6];
      auVar776._13_3_ = auVar777._13_3_;
      auVar776._0_12_ = local_fb8._0_12_;
      auVar776[0xc] = local_fb8[6];
      auVar775._12_4_ = auVar776._12_4_;
      auVar775._0_11_ = local_fb8._0_11_;
      auVar775[0xb] = local_fa8[5];
      auVar774._11_5_ = auVar775._11_5_;
      auVar774._0_10_ = local_fb8._0_10_;
      auVar774[10] = local_fb8[5];
      auVar773._10_6_ = auVar774._10_6_;
      auVar773._0_9_ = local_fb8._0_9_;
      auVar773[9] = local_fa8[4];
      auVar772._9_7_ = auVar773._9_7_;
      auVar772._0_8_ = local_fb8._0_8_;
      auVar772[8] = local_fb8[4];
      Var158 = CONCAT91(CONCAT81(auVar772._8_8_,local_fa8[3]),local_fb8[3]);
      auVar237._2_10_ = Var158;
      auVar237[1] = local_fa8[2];
      auVar237[0] = local_fb8[2];
      auVar771._4_12_ = auVar237;
      auVar771[3] = local_fa8[1];
      auVar771[2] = local_fb8[1];
      auVar771._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1520[0xe] = local_f98[7];
      auVar1520._0_14_ = local_f98._0_14_;
      auVar1520[0xf] = local_f88[7];
      auVar1519._14_2_ = auVar1520._14_2_;
      auVar1519._0_13_ = local_f98._0_13_;
      auVar1519[0xd] = local_f88[6];
      auVar1518._13_3_ = auVar1519._13_3_;
      auVar1518._0_12_ = local_f98._0_12_;
      auVar1518[0xc] = local_f98[6];
      auVar1517._12_4_ = auVar1518._12_4_;
      auVar1517._0_11_ = local_f98._0_11_;
      auVar1517[0xb] = local_f88[5];
      auVar1516._11_5_ = auVar1517._11_5_;
      auVar1516._0_10_ = local_f98._0_10_;
      auVar1516[10] = local_f98[5];
      auVar1515._10_6_ = auVar1516._10_6_;
      auVar1515._0_9_ = local_f98._0_9_;
      auVar1515[9] = local_f88[4];
      auVar1514._9_7_ = auVar1515._9_7_;
      auVar1514._0_8_ = local_f98._0_8_;
      auVar1514[8] = local_f98[4];
      Var160 = CONCAT91(CONCAT81(auVar1514._8_8_,local_f88[3]),local_f98[3]);
      auVar238._2_10_ = Var160;
      auVar238[1] = local_f88[2];
      auVar238[0] = local_f98[2];
      auVar1167[0xe] = local_f78[7];
      auVar1167._0_14_ = local_f78._0_14_;
      auVar1167[0xf] = local_f68._7_1_;
      auVar1166._14_2_ = auVar1167._14_2_;
      auVar1166._0_13_ = local_f78._0_13_;
      auVar1166[0xd] = local_f68._6_1_;
      auVar1165._13_3_ = auVar1166._13_3_;
      auVar1165._0_12_ = local_f78._0_12_;
      auVar1165[0xc] = local_f78[6];
      auVar1164._12_4_ = auVar1165._12_4_;
      auVar1164._0_11_ = local_f78._0_11_;
      auVar1164[0xb] = local_f68._5_1_;
      auVar1163._11_5_ = auVar1164._11_5_;
      auVar1163._0_10_ = local_f78._0_10_;
      auVar1163[10] = local_f78[5];
      auVar1162._10_6_ = auVar1163._10_6_;
      auVar1162._0_9_ = local_f78._0_9_;
      auVar1162[9] = local_f68._4_1_;
      auVar1161._9_7_ = auVar1162._9_7_;
      auVar1161._0_8_ = local_f78._0_8_;
      auVar1161[8] = local_f78[4];
      Var162 = CONCAT91(CONCAT81(auVar1161._8_8_,local_f68._3_1_),local_f78[3]);
      auVar239._2_10_ = Var162;
      auVar239[1] = local_f68._2_1_;
      auVar239[0] = local_f78[2];
      auVar1160._4_12_ = auVar239;
      auVar1160[3] = local_f68._1_1_;
      auVar1160[2] = local_f78[1];
      auVar1160._0_2_ = CONCAT11((undefined1)local_f68,local_f78[0]);
      auVar1627[0xe] = local_f58[7];
      auVar1627._0_14_ = local_f58._0_14_;
      auVar1627[0xf] = local_f48._7_1_;
      auVar1626._14_2_ = auVar1627._14_2_;
      auVar1626._0_13_ = local_f58._0_13_;
      auVar1626[0xd] = local_f48._6_1_;
      auVar1625._13_3_ = auVar1626._13_3_;
      auVar1625._0_12_ = local_f58._0_12_;
      auVar1625[0xc] = local_f58[6];
      auVar1624._12_4_ = auVar1625._12_4_;
      auVar1624._0_11_ = local_f58._0_11_;
      auVar1624[0xb] = local_f48._5_1_;
      auVar1623._11_5_ = auVar1624._11_5_;
      auVar1623._0_10_ = local_f58._0_10_;
      auVar1623[10] = local_f58[5];
      auVar1622._10_6_ = auVar1623._10_6_;
      auVar1622._0_9_ = local_f58._0_9_;
      auVar1622[9] = local_f48._4_1_;
      auVar1621._9_7_ = auVar1622._9_7_;
      auVar1621._0_8_ = local_f58._0_8_;
      auVar1621[8] = local_f58[4];
      Var164 = CONCAT91(CONCAT81(auVar1621._8_8_,local_f48._3_1_),local_f58[3]);
      auVar240._2_10_ = Var164;
      auVar240[1] = local_f48._2_1_;
      auVar240[0] = local_f58[2];
      auVar1757._0_12_ = auVar493._0_12_;
      auVar1757._12_2_ = (short)Var17;
      auVar1757._14_2_ = (short)Var19;
      auVar1756._12_4_ = auVar1757._12_4_;
      auVar1756._0_10_ = auVar493._0_10_;
      auVar1756._10_2_ = auVar234._0_2_;
      auVar1755._10_6_ = auVar1756._10_6_;
      auVar1755._0_8_ = auVar493._0_8_;
      auVar1755._8_2_ = auVar233._0_2_;
      auVar1826._0_12_ = auVar929._0_12_;
      auVar1826._12_2_ = (short)Var21;
      auVar1826._14_2_ = (short)Var23;
      auVar1825._12_4_ = auVar1826._12_4_;
      auVar1825._0_10_ = auVar929._0_10_;
      auVar1825._10_2_ = auVar236._0_2_;
      auVar1824._10_6_ = auVar1825._10_6_;
      auVar1824._0_8_ = auVar929._0_8_;
      auVar1824._8_2_ = auVar235._0_2_;
      auVar1909._0_12_ = auVar771._0_12_;
      auVar1909._12_2_ = (short)Var158;
      auVar1909._14_2_ = (short)Var160;
      auVar1908._12_4_ = auVar1909._12_4_;
      auVar1908._0_10_ = auVar771._0_10_;
      auVar1908._10_2_ = auVar238._0_2_;
      auVar1907._10_6_ = auVar1908._10_6_;
      auVar1907._0_8_ = auVar771._0_8_;
      auVar1907._8_2_ = auVar237._0_2_;
      auVar1988._0_12_ = auVar1160._0_12_;
      auVar1988._12_2_ = (short)Var162;
      auVar1988._14_2_ = (short)Var164;
      auVar1987._12_4_ = auVar1988._12_4_;
      auVar1987._0_10_ = auVar1160._0_10_;
      auVar1987._10_2_ = auVar240._0_2_;
      auVar1986._10_6_ = auVar1987._10_6_;
      auVar1986._0_8_ = auVar1160._0_8_;
      auVar1986._8_2_ = auVar239._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_fc8,(char)local_fd8),auVar929._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar493._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11((undefined1)local_f48,local_f58[0]),auVar1160._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar771._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1623 = local_fe8._1_1_;
      uStack_1622 = (char)((ushort)local_fd8 >> 8);
      uStack_1621 = local_fc8._1_1_;
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68._1_1_;
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48._1_1_;
      local_1618 = auVar1755._8_4_;
      uStack_1614 = auVar1824._8_4_;
      uStack_1610 = auVar1907._8_4_;
      uStack_160c = auVar1986._8_4_;
      local_1608._8_4_ = auVar1756._12_4_;
      local_1608._12_4_ = auVar1825._12_4_;
      auVar490._12_4_ = CONCAT22(auVar1338._8_2_,auVar494._8_2_);
      auVar324._0_8_ = CONCAT26(auVar1340._10_2_,CONCAT24(auVar496._10_2_,auVar490._12_4_));
      auVar324._8_2_ = auVar498._12_2_;
      auVar324._10_2_ = auVar1342._12_2_;
      auVar501._12_2_ = auVar499._14_2_;
      auVar501._0_12_ = auVar324;
      auVar501._14_2_ = auVar1343._14_2_;
      uVar781 = CONCAT22((short)((unkuint10)Var244 >> 0x10),(short)((unkuint10)Var243 >> 0x10));
      auVar802._0_8_ =
           CONCAT26((short)((unkuint10)Var246 >> 0x20),
                    CONCAT24((short)((unkuint10)Var245 >> 0x20),uVar781));
      auVar802._8_2_ = (short)((unkuint10)Var258 >> 0x30);
      auVar802._10_2_ = (short)((unkuint10)Var260 >> 0x30);
      auVar933._12_2_ = auVar932._14_2_;
      auVar933._0_12_ = auVar802;
      auVar933._14_2_ = auVar1422._14_2_;
      auVar926._12_4_ = CONCAT22(auVar1514._8_2_,auVar772._8_2_);
      auVar533._0_8_ = CONCAT26(auVar1516._10_2_,CONCAT24(auVar774._10_2_,auVar926._12_4_));
      auVar533._8_2_ = auVar776._12_2_;
      auVar533._10_2_ = auVar1518._12_2_;
      auVar779._12_2_ = auVar777._14_2_;
      auVar779._0_12_ = auVar533;
      auVar779._14_2_ = auVar1519._14_2_;
      uVar936 = CONCAT22(auVar1621._8_2_,auVar1161._8_2_);
      auVar963._0_8_ = CONCAT26(auVar1623._10_2_,CONCAT24(auVar1163._10_2_,uVar936));
      auVar963._8_2_ = auVar1165._12_2_;
      auVar963._10_2_ = auVar1625._12_2_;
      auVar1168._12_2_ = auVar1166._14_2_;
      auVar1168._0_12_ = auVar963;
      auVar1168._14_2_ = auVar1626._14_2_;
      auVar1345._8_4_ = (int)((ulong)auVar324._0_8_ >> 0x20);
      auVar1345._0_8_ = auVar324._0_8_;
      auVar1345._12_4_ = (int)((ulong)auVar802._0_8_ >> 0x20);
      auVar934._8_4_ = (int)((ulong)auVar533._0_8_ >> 0x20);
      auVar934._0_8_ = auVar533._0_8_;
      auVar934._12_4_ = (int)((ulong)auVar963._0_8_ >> 0x20);
      local_15f8 = CONCAT44(uVar781,auVar490._12_4_);
      uStack_15f0 = CONCAT44(uVar936,auVar926._12_4_);
      local_15e8 = auVar1345._8_8_;
      uStack_15e0 = auVar934._8_8_;
      local_15d8 = CONCAT44(auVar802._8_4_,auVar324._8_4_);
      uStack_15d0 = CONCAT44(auVar963._8_4_,auVar533._8_4_);
      local_15c8._8_4_ = auVar501._12_4_;
      local_15c8._12_4_ = auVar933._12_4_;
      local_15b8 = CONCAT44(auVar1168._12_4_,auVar779._12_4_);
      lVar300 = 0;
      do {
        uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar300);
        *(undefined8 *)(dst + 8) = uVar316;
        lVar300 = lVar300 + 0x10;
        dst = dst + stride;
      } while (lVar300 != 0x80);
      break;
    case 3:
      iVar307 = 0x2f << (bVar302 & 0x1f);
      auVar546 = pshufb(ZEXT116(left[iVar307]),(undefined1  [16])0x0);
      lVar300 = 0;
      auVar975 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar332 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar311 = 0;
      uVar305 = dy;
      do {
        iVar309 = (int)uVar305 >> (6 - bVar302 & 0x1f);
        uVar308 = iVar307 - iVar309 >> (bVar302 & 0x1f);
        if ((int)uVar308 < 1) {
          if (uVar311 < 0x20) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar300) = auVar546;
              lVar300 = lVar300 + 0x10;
            } while (lVar300 != 0x200);
          }
          break;
        }
        if (0xf < uVar308) {
          uVar308 = 0x10;
        }
        auVar1356 = *(undefined1 (*) [16])(left + iVar309);
        if (upsample_left == 0) {
          auVar1522 = *(undefined1 (*) [16])(left + (long)iVar309 + 1);
          auVar1198 = ZEXT416(uVar305 >> 1 & 0x1f);
          auVar1198 = pshuflw(auVar1198,auVar1198,0);
          auVar1719._0_4_ = auVar1198._0_4_;
          auVar1719._4_4_ = auVar1719._0_4_;
          auVar1719._8_4_ = auVar1719._0_4_;
          auVar1719._12_4_ = auVar1719._0_4_;
        }
        else {
          auVar1356 = pshufb(auVar1356,_DAT_0050db80);
          auVar1522 = auVar1356 >> 0x40;
          auVar1198 = pshuflw(ZEXT416(uVar305),ZEXT416(uVar305),0);
          auVar1717._0_4_ = auVar1198._0_4_;
          auVar1717._4_4_ = auVar1717._0_4_;
          auVar1717._8_4_ = auVar1717._0_4_;
          auVar1717._12_4_ = auVar1717._0_4_;
          auVar1198 = psllw(auVar1717,ZEXT416((uint)upsample_left));
          auVar1718._0_2_ = auVar1198._0_2_ >> 1;
          auVar1718._2_2_ = auVar1198._2_2_ >> 1;
          auVar1718._4_2_ = auVar1198._4_2_ >> 1;
          auVar1718._6_2_ = auVar1198._6_2_ >> 1;
          auVar1718._8_2_ = auVar1198._8_2_ >> 1;
          auVar1718._10_2_ = auVar1198._10_2_ >> 1;
          auVar1718._12_2_ = auVar1198._12_2_ >> 1;
          auVar1718._14_2_ = auVar1198._14_2_ >> 1;
          auVar1719 = auVar1718 & auVar332;
        }
        auVar1198 = pmovzxbw(in_XMM9,auVar1356);
        auVar1523 = pmovzxbw(in_XMM10,auVar1522);
        auVar1199 = psllw(auVar1198,5);
        in_XMM10._0_2_ = (auVar1523._0_2_ - auVar1198._0_2_) * auVar1719._0_2_;
        in_XMM10._2_2_ = (auVar1523._2_2_ - auVar1198._2_2_) * auVar1719._2_2_;
        in_XMM10._4_2_ = (auVar1523._4_2_ - auVar1198._4_2_) * auVar1719._4_2_;
        in_XMM10._6_2_ = (auVar1523._6_2_ - auVar1198._6_2_) * auVar1719._6_2_;
        in_XMM10._8_2_ = (auVar1523._8_2_ - auVar1198._8_2_) * auVar1719._8_2_;
        in_XMM10._10_2_ = (auVar1523._10_2_ - auVar1198._10_2_) * auVar1719._10_2_;
        in_XMM10._12_2_ = (auVar1523._12_2_ - auVar1198._12_2_) * auVar1719._12_2_;
        in_XMM10._14_2_ = (auVar1523._14_2_ - auVar1198._14_2_) * auVar1719._14_2_;
        uVar1353 = (ushort)(auVar1199._0_2_ + auVar975._0_2_ + in_XMM10._0_2_) >> 5;
        uVar1423 = (ushort)(auVar1199._2_2_ + auVar975._2_2_ + in_XMM10._2_2_) >> 5;
        uVar1424 = (ushort)(auVar1199._4_2_ + auVar975._4_2_ + in_XMM10._4_2_) >> 5;
        uVar1425 = (ushort)(auVar1199._6_2_ + auVar975._6_2_ + in_XMM10._6_2_) >> 5;
        uVar1426 = (ushort)(auVar1199._8_2_ + auVar975._8_2_ + in_XMM10._8_2_) >> 5;
        uVar1427 = (ushort)(auVar1199._10_2_ + auVar975._10_2_ + in_XMM10._10_2_) >> 5;
        uVar1428 = (ushort)(auVar1199._12_2_ + auVar975._12_2_ + in_XMM10._12_2_) >> 5;
        uVar1429 = (ushort)(auVar1199._14_2_ + auVar975._14_2_ + in_XMM10._14_2_) >> 5;
        auVar421._0_2_ = CONCAT11(0,auVar1356[8]);
        auVar421[2] = auVar1356[9];
        auVar421[3] = 0;
        auVar421[4] = auVar1356[10];
        auVar421[5] = 0;
        auVar421[6] = auVar1356[0xb];
        auVar421[7] = 0;
        auVar421[8] = auVar1356[0xc];
        auVar421[9] = 0;
        auVar421[10] = auVar1356[0xd];
        auVar421[0xb] = 0;
        auVar421[0xc] = auVar1356[0xe];
        auVar421[0xd] = 0;
        auVar421[0xe] = auVar1356[0xf];
        auVar421[0xf] = 0;
        auVar1198 = psllw(auVar421,5);
        uVar1169 = (ushort)(auVar1198._0_2_ + auVar975._0_2_ +
                           (auVar1522[8] - auVar421._0_2_) * auVar1719._0_2_) >> 5;
        uVar1346 = (ushort)(auVar1198._2_2_ + auVar975._2_2_ +
                           ((ushort)auVar1522[9] - (ushort)auVar1356[9]) * auVar1719._2_2_) >> 5;
        uVar1347 = (ushort)(auVar1198._4_2_ + auVar975._4_2_ +
                           ((ushort)auVar1522[10] - (ushort)auVar1356[10]) * auVar1719._4_2_) >> 5;
        uVar1348 = (ushort)(auVar1198._6_2_ + auVar975._6_2_ +
                           ((ushort)auVar1522[0xb] - (ushort)auVar1356[0xb]) * auVar1719._6_2_) >> 5
        ;
        uVar1349 = (ushort)(auVar1198._8_2_ + auVar975._8_2_ +
                           ((ushort)auVar1522[0xc] - (ushort)auVar1356[0xc]) * auVar1719._8_2_) >> 5
        ;
        uVar1350 = (ushort)(auVar1198._10_2_ + auVar975._10_2_ +
                           ((ushort)auVar1522[0xd] - (ushort)auVar1356[0xd]) * auVar1719._10_2_) >>
                   5;
        uVar1351 = (ushort)(auVar1198._12_2_ + auVar975._12_2_ +
                           ((ushort)auVar1522[0xe] - (ushort)auVar1356[0xe]) * auVar1719._12_2_) >>
                   5;
        uVar1352 = (ushort)(auVar1198._14_2_ + auVar975._14_2_ +
                           ((ushort)auVar1522[0xf] - (ushort)auVar1356[0xf]) * auVar1719._14_2_) >>
                   5;
        in_XMM9[1] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
        in_XMM9[0] = (uVar1353 != 0) * (uVar1353 < 0x100) * (char)uVar1353 - (0xff < uVar1353);
        in_XMM9[2] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
        in_XMM9[3] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
        in_XMM9[4] = (uVar1426 != 0) * (uVar1426 < 0x100) * (char)uVar1426 - (0xff < uVar1426);
        in_XMM9[5] = (uVar1427 != 0) * (uVar1427 < 0x100) * (char)uVar1427 - (0xff < uVar1427);
        in_XMM9[6] = (uVar1428 != 0) * (uVar1428 < 0x100) * (char)uVar1428 - (0xff < uVar1428);
        in_XMM9[7] = (uVar1429 != 0) * (uVar1429 < 0x100) * (char)uVar1429 - (0xff < uVar1429);
        in_XMM9[8] = (uVar1169 != 0) * (uVar1169 < 0x100) * (char)uVar1169 - (0xff < uVar1169);
        in_XMM9[9] = (uVar1346 != 0) * (uVar1346 < 0x100) * (char)uVar1346 - (0xff < uVar1346);
        in_XMM9[10] = (uVar1347 != 0) * (uVar1347 < 0x100) * (char)uVar1347 - (0xff < uVar1347);
        in_XMM9[0xb] = (uVar1348 != 0) * (uVar1348 < 0x100) * (char)uVar1348 - (0xff < uVar1348);
        in_XMM9[0xc] = (uVar1349 != 0) * (uVar1349 < 0x100) * (char)uVar1349 - (0xff < uVar1349);
        in_XMM9[0xd] = (uVar1350 != 0) * (uVar1350 < 0x100) * (char)uVar1350 - (0xff < uVar1350);
        in_XMM9[0xe] = (uVar1351 != 0) * (uVar1351 < 0x100) * (char)uVar1351 - (0xff < uVar1351);
        in_XMM9[0xf] = (uVar1352 != 0) * (uVar1352 < 0x100) * (char)uVar1352 - (0xff < uVar1352);
        auVar1356 = pblendvb(auVar546,in_XMM9,(undefined1  [16])Mask[0][uVar308]);
        *(undefined1 (*) [16])(local_1038 + lVar300) = auVar1356;
        uVar305 = uVar305 + dy;
        uVar311 = uVar311 + 1;
        lVar300 = lVar300 + 0x10;
      } while (uVar311 != 0x20);
      lVar300 = 0;
      pauVar303 = &local_1038;
      bVar312 = true;
      do {
        bVar299 = bVar312;
        auVar546 = *pauVar303;
        auVar975 = pauVar303[2];
        auVar1148._0_14_ = auVar546._0_14_;
        auVar1148[0xe] = auVar546[7];
        auVar1148[0xf] = pauVar303[1][7];
        auVar1147._14_2_ = auVar1148._14_2_;
        auVar1147._0_13_ = auVar546._0_13_;
        auVar1147[0xd] = pauVar303[1][6];
        auVar1146._13_3_ = auVar1147._13_3_;
        auVar1146._0_12_ = auVar546._0_12_;
        auVar1146[0xc] = auVar546[6];
        auVar1145._12_4_ = auVar1146._12_4_;
        auVar1145._0_11_ = auVar546._0_11_;
        auVar1145[0xb] = pauVar303[1][5];
        auVar1144._11_5_ = auVar1145._11_5_;
        auVar1144._0_10_ = auVar546._0_10_;
        auVar1144[10] = auVar546[5];
        auVar1143._10_6_ = auVar1144._10_6_;
        auVar1143._0_9_ = auVar546._0_9_;
        auVar1143[9] = pauVar303[1][4];
        auVar1142._9_7_ = auVar1143._9_7_;
        auVar1142._0_8_ = auVar546._0_8_;
        auVar1142[8] = auVar546[4];
        Var17 = CONCAT91(CONCAT81(auVar1142._8_8_,pauVar303[1][3]),auVar546[3]);
        auVar206._2_10_ = Var17;
        auVar206[1] = pauVar303[1][2];
        auVar206[0] = auVar546[2];
        auVar1141._4_12_ = auVar206;
        auVar1141[3] = pauVar303[1][1];
        auVar1141[2] = auVar546[1];
        auVar1141._0_2_ = CONCAT11(pauVar303[1][0],auVar546[0]);
        auVar2256._0_14_ = auVar975._0_14_;
        auVar2256[0xe] = auVar975[7];
        auVar2256[0xf] = pauVar303[3][7];
        auVar2255._14_2_ = auVar2256._14_2_;
        auVar2255._0_13_ = auVar975._0_13_;
        auVar2255[0xd] = pauVar303[3][6];
        auVar2254._13_3_ = auVar2255._13_3_;
        auVar2254._0_12_ = auVar975._0_12_;
        auVar2254[0xc] = auVar975[6];
        auVar2253._12_4_ = auVar2254._12_4_;
        auVar2253._0_11_ = auVar975._0_11_;
        auVar2253[0xb] = pauVar303[3][5];
        auVar2252._11_5_ = auVar2253._11_5_;
        auVar2252._0_10_ = auVar975._0_10_;
        auVar2252[10] = auVar975[5];
        auVar2251._10_6_ = auVar2252._10_6_;
        auVar2251._0_9_ = auVar975._0_9_;
        auVar2251[9] = pauVar303[3][4];
        auVar2250._9_7_ = auVar2251._9_7_;
        auVar2250._0_8_ = auVar975._0_8_;
        auVar2250[8] = auVar975[4];
        Var19 = CONCAT91(CONCAT81(auVar2250._8_8_,pauVar303[3][3]),auVar975[3]);
        auVar207._2_10_ = Var19;
        auVar207[1] = pauVar303[3][2];
        auVar207[0] = auVar975[2];
        auVar332 = pauVar303[4];
        auVar2127._0_14_ = auVar332._0_14_;
        auVar2127[0xe] = auVar332[7];
        auVar2127[0xf] = pauVar303[5][7];
        auVar2126._14_2_ = auVar2127._14_2_;
        auVar2126._0_13_ = auVar332._0_13_;
        auVar2126[0xd] = pauVar303[5][6];
        auVar2125._13_3_ = auVar2126._13_3_;
        auVar2125._0_12_ = auVar332._0_12_;
        auVar2125[0xc] = auVar332[6];
        auVar2124._12_4_ = auVar2125._12_4_;
        auVar2124._0_11_ = auVar332._0_11_;
        auVar2124[0xb] = pauVar303[5][5];
        auVar2123._11_5_ = auVar2124._11_5_;
        auVar2123._0_10_ = auVar332._0_10_;
        auVar2123[10] = auVar332[5];
        auVar2122._10_6_ = auVar2123._10_6_;
        auVar2122._0_9_ = auVar332._0_9_;
        auVar2122[9] = pauVar303[5][4];
        auVar2121._9_7_ = auVar2122._9_7_;
        auVar2121._0_8_ = auVar332._0_8_;
        auVar2121[8] = auVar332[4];
        Var21 = CONCAT91(CONCAT81(auVar2121._8_8_,pauVar303[5][3]),auVar332[3]);
        auVar208._2_10_ = Var21;
        auVar208[1] = pauVar303[5][2];
        auVar208[0] = auVar332[2];
        auVar2120._4_12_ = auVar208;
        auVar2120[3] = pauVar303[5][1];
        auVar2120[2] = auVar332[1];
        auVar2120._0_2_ = CONCAT11(pauVar303[5][0],auVar332[0]);
        auVar1356 = pauVar303[6];
        auVar2186._0_14_ = auVar1356._0_14_;
        auVar2186[0xe] = auVar1356[7];
        auVar2186[0xf] = pauVar303[7][7];
        auVar2185._14_2_ = auVar2186._14_2_;
        auVar2185._0_13_ = auVar1356._0_13_;
        auVar2185[0xd] = pauVar303[7][6];
        auVar2184._13_3_ = auVar2185._13_3_;
        auVar2184._0_12_ = auVar1356._0_12_;
        auVar2184[0xc] = auVar1356[6];
        auVar2183._12_4_ = auVar2184._12_4_;
        auVar2183._0_11_ = auVar1356._0_11_;
        auVar2183[0xb] = pauVar303[7][5];
        auVar2182._11_5_ = auVar2183._11_5_;
        auVar2182._0_10_ = auVar1356._0_10_;
        auVar2182[10] = auVar1356[5];
        auVar2181._10_6_ = auVar2182._10_6_;
        auVar2181._0_9_ = auVar1356._0_9_;
        auVar2181[9] = pauVar303[7][4];
        auVar2180._9_7_ = auVar2181._9_7_;
        auVar2180._0_8_ = auVar1356._0_8_;
        auVar2180[8] = auVar1356[4];
        Var23 = CONCAT91(CONCAT81(auVar2180._8_8_,pauVar303[7][3]),auVar1356[3]);
        auVar209._2_10_ = Var23;
        auVar209[1] = pauVar303[7][2];
        auVar209[0] = auVar1356[2];
        auVar1522 = pauVar303[8];
        auVar1984._0_12_ = auVar1141._0_12_;
        auVar1984._12_2_ = (short)Var17;
        auVar1984._14_2_ = (short)Var19;
        auVar1983._12_4_ = auVar1984._12_4_;
        auVar1983._0_10_ = auVar1141._0_10_;
        auVar1983._10_2_ = auVar207._0_2_;
        auVar1982._10_6_ = auVar1983._10_6_;
        auVar1982._0_8_ = auVar1141._0_8_;
        auVar1982._8_2_ = auVar206._0_2_;
        auVar733._0_12_ = auVar2120._0_12_;
        auVar733._12_2_ = (short)Var21;
        auVar733._14_2_ = (short)Var23;
        auVar732._12_4_ = auVar733._12_4_;
        auVar732._0_10_ = auVar2120._0_10_;
        auVar732._10_2_ = auVar209._0_2_;
        auVar731._10_6_ = auVar732._10_6_;
        auVar731._0_8_ = auVar2120._0_8_;
        auVar731._8_2_ = auVar208._0_2_;
        auVar1334._0_14_ = auVar1522._0_14_;
        auVar1334[0xe] = auVar1522[7];
        auVar1334[0xf] = pauVar303[9][7];
        auVar1333._14_2_ = auVar1334._14_2_;
        auVar1333._0_13_ = auVar1522._0_13_;
        auVar1333[0xd] = pauVar303[9][6];
        auVar1332._13_3_ = auVar1333._13_3_;
        auVar1332._0_12_ = auVar1522._0_12_;
        auVar1332[0xc] = auVar1522[6];
        auVar1331._12_4_ = auVar1332._12_4_;
        auVar1331._0_11_ = auVar1522._0_11_;
        auVar1331[0xb] = pauVar303[9][5];
        auVar1330._11_5_ = auVar1331._11_5_;
        auVar1330._0_10_ = auVar1522._0_10_;
        auVar1330[10] = auVar1522[5];
        auVar1329._10_6_ = auVar1330._10_6_;
        auVar1329._0_9_ = auVar1522._0_9_;
        auVar1329[9] = pauVar303[9][4];
        auVar1328._9_7_ = auVar1329._9_7_;
        auVar1328._0_8_ = auVar1522._0_8_;
        auVar1328[8] = auVar1522[4];
        Var17 = CONCAT91(CONCAT81(auVar1328._8_8_,pauVar303[9][3]),auVar1522[3]);
        auVar210._2_10_ = Var17;
        auVar210[1] = pauVar303[9][2];
        auVar210[0] = auVar1522[2];
        auVar1327._4_12_ = auVar210;
        auVar1327[3] = pauVar303[9][1];
        auVar1327[2] = auVar1522[1];
        auVar1327._0_2_ = CONCAT11(pauVar303[9][0],auVar1522[0]);
        auVar1198 = pauVar303[10];
        auVar1617._0_14_ = auVar1198._0_14_;
        auVar1617[0xe] = auVar1198[7];
        auVar1617[0xf] = pauVar303[0xb][7];
        auVar1616._14_2_ = auVar1617._14_2_;
        auVar1616._0_13_ = auVar1198._0_13_;
        auVar1616[0xd] = pauVar303[0xb][6];
        auVar1615._13_3_ = auVar1616._13_3_;
        auVar1615._0_12_ = auVar1198._0_12_;
        auVar1615[0xc] = auVar1198[6];
        auVar1614._12_4_ = auVar1615._12_4_;
        auVar1614._0_11_ = auVar1198._0_11_;
        auVar1614[0xb] = pauVar303[0xb][5];
        auVar1613._11_5_ = auVar1614._11_5_;
        auVar1613._0_10_ = auVar1198._0_10_;
        auVar1613[10] = auVar1198[5];
        auVar1612._10_6_ = auVar1613._10_6_;
        auVar1612._0_9_ = auVar1198._0_9_;
        auVar1612[9] = pauVar303[0xb][4];
        auVar1611._9_7_ = auVar1612._9_7_;
        auVar1611._0_8_ = auVar1198._0_8_;
        auVar1611[8] = auVar1198[4];
        Var19 = CONCAT91(CONCAT81(auVar1611._8_8_,pauVar303[0xb][3]),auVar1198[3]);
        auVar211._2_10_ = Var19;
        auVar211[1] = pauVar303[0xb][2];
        auVar211[0] = auVar1198[2];
        auVar1199 = pauVar303[0xc];
        auVar1751._0_14_ = auVar1199._0_14_;
        auVar1751[0xe] = auVar1199[7];
        auVar1751[0xf] = pauVar303[0xd][7];
        auVar1750._14_2_ = auVar1751._14_2_;
        auVar1750._0_13_ = auVar1199._0_13_;
        auVar1750[0xd] = pauVar303[0xd][6];
        auVar1749._13_3_ = auVar1750._13_3_;
        auVar1749._0_12_ = auVar1199._0_12_;
        auVar1749[0xc] = auVar1199[6];
        auVar1748._12_4_ = auVar1749._12_4_;
        auVar1748._0_11_ = auVar1199._0_11_;
        auVar1748[0xb] = pauVar303[0xd][5];
        auVar1747._11_5_ = auVar1748._11_5_;
        auVar1747._0_10_ = auVar1199._0_10_;
        auVar1747[10] = auVar1199[5];
        auVar1746._10_6_ = auVar1747._10_6_;
        auVar1746._0_9_ = auVar1199._0_9_;
        auVar1746[9] = pauVar303[0xd][4];
        auVar1745._9_7_ = auVar1746._9_7_;
        auVar1745._0_8_ = auVar1199._0_8_;
        auVar1745[8] = auVar1199[4];
        Var21 = CONCAT91(CONCAT81(auVar1745._8_8_,pauVar303[0xd][3]),auVar1199[3]);
        auVar212._2_10_ = Var21;
        auVar212[1] = pauVar303[0xd][2];
        auVar212[0] = auVar1199[2];
        auVar1744._4_12_ = auVar212;
        auVar1744[3] = pauVar303[0xd][1];
        auVar1744[2] = auVar1199[1];
        auVar1744._0_2_ = CONCAT11(pauVar303[0xd][0],auVar1199[0]);
        auVar1523 = pauVar303[0xe];
        auVar1906._0_14_ = auVar1523._0_14_;
        auVar1906[0xe] = auVar1523[7];
        auVar1906[0xf] = pauVar303[0xf][7];
        auVar1905._14_2_ = auVar1906._14_2_;
        auVar1905._0_13_ = auVar1523._0_13_;
        auVar1905[0xd] = pauVar303[0xf][6];
        auVar1904._13_3_ = auVar1905._13_3_;
        auVar1904._0_12_ = auVar1523._0_12_;
        auVar1904[0xc] = auVar1523[6];
        auVar1903._12_4_ = auVar1904._12_4_;
        auVar1903._0_11_ = auVar1523._0_11_;
        auVar1903[0xb] = pauVar303[0xf][5];
        auVar1902._11_5_ = auVar1903._11_5_;
        auVar1902._0_10_ = auVar1523._0_10_;
        auVar1902[10] = auVar1523[5];
        auVar1901._10_6_ = auVar1902._10_6_;
        auVar1901._0_9_ = auVar1523._0_9_;
        auVar1901[9] = pauVar303[0xf][4];
        auVar1900._9_7_ = auVar1901._9_7_;
        auVar1900._0_8_ = auVar1523._0_8_;
        auVar1900[8] = auVar1523[4];
        Var23 = CONCAT91(CONCAT81(auVar1900._8_8_,pauVar303[0xf][3]),auVar1523[3]);
        auVar213._2_10_ = Var23;
        auVar213[1] = pauVar303[0xf][2];
        auVar213[0] = auVar1523[2];
        auVar736._0_12_ = auVar1327._0_12_;
        auVar736._12_2_ = (short)Var17;
        auVar736._14_2_ = (short)Var19;
        auVar735._12_4_ = auVar736._12_4_;
        auVar735._0_10_ = auVar1327._0_10_;
        auVar735._10_2_ = auVar211._0_2_;
        auVar734._10_6_ = auVar735._10_6_;
        auVar734._0_8_ = auVar1327._0_8_;
        auVar734._8_2_ = auVar210._0_2_;
        auVar1414._0_12_ = auVar1744._0_12_;
        auVar1414._12_2_ = (short)Var21;
        auVar1414._14_2_ = (short)Var23;
        auVar1413._12_4_ = auVar1414._12_4_;
        auVar1413._0_10_ = auVar1744._0_10_;
        auVar1413._10_2_ = auVar213._0_2_;
        auVar1412._10_6_ = auVar1413._10_6_;
        auVar1412._0_8_ = auVar1744._0_8_;
        auVar1412._8_2_ = auVar212._0_2_;
        local_1638[0] =
             CONCAT44(CONCAT22(CONCAT11(pauVar303[7][0],auVar1356[0]),auVar2120._0_2_),
                      CONCAT22(CONCAT11(pauVar303[3][0],auVar975[0]),auVar1141._0_2_));
        local_1638[1] =
             CONCAT44(CONCAT22(CONCAT11(pauVar303[0xf][0],auVar1523[0]),auVar1744._0_2_),
                      CONCAT22(CONCAT11(pauVar303[0xb][0],auVar1198[0]),auVar1327._0_2_));
        local_1628 = auVar546[1];
        uStack_1627 = pauVar303[1][1];
        uStack_1626 = auVar975[1];
        uStack_1625 = pauVar303[3][1];
        uStack_1624 = auVar332[1];
        uStack_1623 = pauVar303[5][1];
        uStack_1622 = auVar1356[1];
        uStack_1621 = pauVar303[7][1];
        uStack_1620 = auVar1522[1];
        uStack_161f = pauVar303[9][1];
        uStack_161e = auVar1198[1];
        uStack_161d = pauVar303[0xb][1];
        uStack_161c = auVar1199[1];
        uStack_161b = pauVar303[0xd][1];
        uStack_161a = auVar1523[1];
        uStack_1619 = pauVar303[0xf][1];
        local_1618 = auVar1982._8_4_;
        uStack_1614 = auVar731._8_4_;
        uStack_1610 = auVar734._8_4_;
        uStack_160c = auVar1412._8_4_;
        local_1608._8_4_ = auVar1983._12_4_;
        local_1608._12_4_ = auVar732._12_4_;
        auVar490._12_4_ = CONCAT22(auVar2250._8_2_,auVar1142._8_2_);
        auVar961._0_8_ = CONCAT26(auVar2252._10_2_,CONCAT24(auVar1144._10_2_,auVar490._12_4_));
        auVar961._8_2_ = auVar1146._12_2_;
        auVar961._10_2_ = auVar2254._12_2_;
        auVar1149._12_2_ = auVar1147._14_2_;
        auVar1149._0_12_ = auVar961;
        auVar1149._14_2_ = auVar2255._14_2_;
        uVar936 = CONCAT22(auVar2180._8_2_,auVar2121._8_2_);
        auVar2047._0_8_ = CONCAT26(auVar2182._10_2_,CONCAT24(auVar2123._10_2_,uVar936));
        auVar2047._8_2_ = auVar2125._12_2_;
        auVar2047._10_2_ = auVar2184._12_2_;
        auVar2128._12_2_ = auVar2126._14_2_;
        auVar2128._0_12_ = auVar2047;
        auVar2128._14_2_ = auVar2185._14_2_;
        auVar926._12_4_ = CONCAT22(auVar1611._8_2_,auVar1328._8_2_);
        auVar1187._0_8_ = CONCAT26(auVar1613._10_2_,CONCAT24(auVar1330._10_2_,auVar926._12_4_));
        auVar1187._8_2_ = auVar1332._12_2_;
        auVar1187._10_2_ = auVar1615._12_2_;
        uVar781 = CONCAT22(auVar1900._8_2_,auVar1745._8_2_);
        auVar1636._0_8_ = CONCAT26(auVar1902._10_2_,CONCAT24(auVar1747._10_2_,uVar781));
        auVar1636._8_2_ = auVar1749._12_2_;
        auVar1636._10_2_ = auVar1904._12_2_;
        auVar464._8_4_ = (int)((ulong)auVar961._0_8_ >> 0x20);
        auVar464._0_8_ = auVar961._0_8_;
        auVar464._12_4_ = (int)((ulong)auVar2047._0_8_ >> 0x20);
        auVar737._8_4_ = (int)((ulong)auVar1187._0_8_ >> 0x20);
        auVar737._0_8_ = auVar1187._0_8_;
        auVar737._12_4_ = (int)((ulong)auVar1636._0_8_ >> 0x20);
        local_15f8 = CONCAT44(uVar936,auVar490._12_4_);
        uStack_15f0 = CONCAT44(uVar781,auVar926._12_4_);
        local_15e8 = auVar464._8_8_;
        uStack_15e0 = auVar737._8_8_;
        local_15d8 = CONCAT44(auVar2047._8_4_,auVar961._8_4_);
        uStack_15d0 = CONCAT44(auVar1636._8_4_,auVar1187._8_4_);
        local_15c8._8_4_ = auVar1149._12_4_;
        local_15c8._12_4_ = auVar2128._12_4_;
        uVar1430 = CONCAT11(pauVar303[1][8],auVar546[8]);
        uVar1431 = CONCAT13(pauVar303[1][9],CONCAT12(auVar546[9],uVar1430));
        uVar1432 = CONCAT15(pauVar303[1][10],CONCAT14(auVar546[10],uVar1431));
        uVar1433 = CONCAT17(pauVar303[1][0xb],CONCAT16(auVar546[0xb],uVar1432));
        auVar1452._0_10_ = CONCAT19(pauVar303[1][0xc],CONCAT18(auVar546[0xc],uVar1433));
        auVar1452[10] = auVar546[0xd];
        auVar1452[0xb] = pauVar303[1][0xd];
        auVar1463[0xc] = auVar546[0xe];
        auVar1463._0_12_ = auVar1452;
        auVar1463[0xd] = pauVar303[1][0xe];
        auVar1505[0xe] = auVar546[0xf];
        auVar1505._0_14_ = auVar1463;
        auVar1505[0xf] = pauVar303[1][0xf];
        uStack_1640 = auVar975[8];
        uStack_163f = auVar975[9];
        uStack_163e = auVar975[10];
        uStack_163d = auVar975[0xb];
        uStack_163c = auVar975[0xc];
        uStack_163b = auVar975[0xd];
        uStack_163a = auVar975[0xe];
        uStack_1639 = auVar975[0xf];
        uVar314 = CONCAT11(pauVar303[3][8],uStack_1640);
        auVar490._12_4_ = CONCAT13(pauVar303[3][9],CONCAT12(uStack_163f,uVar314));
        uVar315 = CONCAT15(pauVar303[3][10],CONCAT14(uStack_163e,auVar490._12_4_));
        uVar316 = CONCAT17(pauVar303[3][0xb],CONCAT16(uStack_163d,uVar315));
        auVar530._0_10_ = CONCAT19(pauVar303[3][0xc],CONCAT18(uStack_163c,uVar316));
        auVar530[10] = uStack_163b;
        auVar530[0xb] = pauVar303[3][0xd];
        auVar545[0xc] = uStack_163a;
        auVar545._0_12_ = auVar530;
        auVar545[0xd] = pauVar303[3][0xe];
        auVar738[0xe] = uStack_1639;
        auVar738._0_14_ = auVar545;
        auVar738[0xf] = pauVar303[3][0xf];
        uStack_1670 = auVar332[8];
        uStack_166f = auVar332[9];
        uStack_166e = auVar332[10];
        uStack_166d = auVar332[0xb];
        uStack_166c = auVar332[0xc];
        uStack_166b = auVar332[0xd];
        uStack_166a = auVar332[0xe];
        uStack_1669 = auVar332[0xf];
        uVar503 = CONCAT11(pauVar303[5][8],uStack_1670);
        auVar926._12_4_ = CONCAT13(pauVar303[5][9],CONCAT12(uStack_166f,uVar503));
        uVar504 = CONCAT15(pauVar303[5][10],CONCAT14(uStack_166e,auVar926._12_4_));
        uVar505 = CONCAT17(pauVar303[5][0xb],CONCAT16(uStack_166d,uVar504));
        auVar800._0_10_ = CONCAT19(pauVar303[5][0xc],CONCAT18(uStack_166c,uVar505));
        auVar800[10] = uStack_166b;
        auVar800[0xb] = pauVar303[5][0xd];
        auVar814[0xc] = uStack_166a;
        auVar814._0_12_ = auVar800;
        auVar814[0xd] = pauVar303[5][0xe];
        auVar911[0xe] = uStack_1669;
        auVar911._0_14_ = auVar814;
        auVar911[0xf] = pauVar303[5][0xf];
        uStack_1690 = auVar1356[8];
        uStack_168f = auVar1356[9];
        uStack_168e = auVar1356[10];
        uStack_168d = auVar1356[0xb];
        uStack_168c = auVar1356[0xc];
        uStack_168b = auVar1356[0xd];
        uStack_168a = auVar1356[0xe];
        uStack_1689 = auVar1356[0xf];
        uVar780 = CONCAT11(pauVar303[7][8],uStack_1690);
        uVar781 = CONCAT13(pauVar303[7][9],CONCAT12(uStack_168f,uVar780));
        uVar782 = CONCAT15(pauVar303[7][10],CONCAT14(uStack_168e,uVar781));
        uVar783 = CONCAT17(pauVar303[7][0xb],CONCAT16(uStack_168d,uVar782));
        auVar962._0_10_ = CONCAT19(pauVar303[7][0xc],CONCAT18(uStack_168c,uVar783));
        auVar962[10] = uStack_168b;
        auVar962[0xb] = pauVar303[7][0xd];
        auVar974[0xc] = uStack_168a;
        auVar974._0_12_ = auVar962;
        auVar974[0xd] = pauVar303[7][0xe];
        auVar1150[0xe] = uStack_1689;
        auVar1150._0_14_ = auVar974;
        auVar1150[0xf] = pauVar303[7][0xf];
        uVar1758 = CONCAT11(pauVar303[9][8],auVar1522[8]);
        uVar1759 = CONCAT13(pauVar303[9][9],CONCAT12(auVar1522[9],uVar1758));
        uVar1760 = CONCAT15(pauVar303[9][10],CONCAT14(auVar1522[10],uVar1759));
        uVar1761 = CONCAT17(pauVar303[9][0xb],CONCAT16(auVar1522[0xb],uVar1760));
        auVar1778._0_10_ = CONCAT19(pauVar303[9][0xc],CONCAT18(auVar1522[0xc],uVar1761));
        auVar1778[10] = auVar1522[0xd];
        auVar1778[0xb] = pauVar303[9][0xd];
        auVar1788[0xc] = auVar1522[0xe];
        auVar1788._0_12_ = auVar1778;
        auVar1788[0xd] = pauVar303[9][0xe];
        auVar1819[0xe] = auVar1522[0xf];
        auVar1819._0_14_ = auVar1788;
        auVar1819[0xf] = pauVar303[9][0xf];
        uStack_16c0 = auVar1198[8];
        uStack_16bf = auVar1198[9];
        uStack_16be = auVar1198[10];
        uStack_16bd = auVar1198[0xb];
        uStack_16bc = auVar1198[0xc];
        uStack_16bb = auVar1198[0xd];
        uStack_16ba = auVar1198[0xe];
        uStack_16b9 = auVar1198[0xf];
        uVar935 = CONCAT11(pauVar303[0xb][8],uStack_16c0);
        uVar936 = CONCAT13(pauVar303[0xb][9],CONCAT12(uStack_16bf,uVar935));
        uVar937 = CONCAT15(pauVar303[0xb][10],CONCAT14(uStack_16be,uVar936));
        uVar938 = CONCAT17(pauVar303[0xb][0xb],CONCAT16(uStack_16bd,uVar937));
        auVar1188._0_10_ = CONCAT19(pauVar303[0xb][0xc],CONCAT18(uStack_16bc,uVar938));
        auVar1188[10] = uStack_16bb;
        auVar1188[0xb] = pauVar303[0xb][0xd];
        auVar1197[0xc] = uStack_16ba;
        auVar1197._0_12_ = auVar1188;
        auVar1197[0xd] = pauVar303[0xb][0xe];
        auVar1335[0xe] = uStack_16b9;
        auVar1335._0_14_ = auVar1197;
        auVar1335[0xf] = pauVar303[0xb][0xf];
        uVar1989 = CONCAT11(pauVar303[0xd][8],auVar1199[8]);
        uVar1990 = CONCAT13(pauVar303[0xd][9],CONCAT12(auVar1199[9],uVar1989));
        uVar1991 = CONCAT15(pauVar303[0xd][10],CONCAT14(auVar1199[10],uVar1990));
        uVar1992 = CONCAT17(pauVar303[0xd][0xb],CONCAT16(auVar1199[0xb],uVar1991));
        auVar2009._0_10_ = CONCAT19(pauVar303[0xd][0xc],CONCAT18(auVar1199[0xc],uVar1992));
        auVar2009[10] = auVar1199[0xd];
        auVar2009[0xb] = pauVar303[0xd][0xd];
        auVar2019[0xc] = auVar1199[0xe];
        auVar2019._0_12_ = auVar2009;
        auVar2019[0xd] = pauVar303[0xd][0xe];
        auVar2036[0xe] = auVar1199[0xf];
        auVar2036._0_14_ = auVar2019;
        auVar2036[0xf] = pauVar303[0xd][0xf];
        uStack_16f0 = auVar1523[8];
        uStack_16ef = auVar1523[9];
        uStack_16ee = auVar1523[10];
        uStack_16ed = auVar1523[0xb];
        uStack_16ec = auVar1523[0xc];
        uStack_16eb = auVar1523[0xd];
        uStack_16ea = auVar1523[0xe];
        uStack_16e9 = auVar1523[0xf];
        uVar1910 = CONCAT11(pauVar303[0xf][8],uStack_16f0);
        uVar1911 = CONCAT13(pauVar303[0xf][9],CONCAT12(uStack_16ef,uVar1910));
        uVar1912 = CONCAT15(pauVar303[0xf][10],CONCAT14(uStack_16ee,uVar1911));
        uVar1913 = CONCAT17(pauVar303[0xf][0xb],CONCAT16(uStack_16ed,uVar1912));
        auVar1922._0_10_ = CONCAT19(pauVar303[0xf][0xc],CONCAT18(uStack_16ec,uVar1913));
        auVar1922[10] = uStack_16eb;
        auVar1922[0xb] = pauVar303[0xf][0xd];
        auVar1931[0xc] = uStack_16ea;
        auVar1931._0_12_ = auVar1922;
        auVar1931[0xd] = pauVar303[0xf][0xe];
        auVar1985[0xe] = uStack_16e9;
        auVar1985._0_14_ = auVar1931;
        auVar1985[0xf] = pauVar303[0xf][0xf];
        auVar470._12_2_ = (short)((ulong)uVar1433 >> 0x30);
        auVar470._0_12_ = auVar1452;
        auVar470._14_2_ = (short)((ulong)uVar316 >> 0x30);
        auVar469._12_4_ = auVar470._12_4_;
        auVar469._10_2_ = (short)((uint6)uVar315 >> 0x20);
        auVar469._0_10_ = auVar1452._0_10_;
        auVar468._10_6_ = auVar469._10_6_;
        auVar468._8_2_ = (short)((uint6)uVar1432 >> 0x20);
        auVar468._0_8_ = uVar1433;
        auVar467._8_8_ = auVar468._8_8_;
        auVar467._6_2_ = (short)((uint)auVar490._12_4_ >> 0x10);
        auVar467._0_6_ = uVar1432;
        auVar466._6_10_ = auVar467._6_10_;
        auVar466._4_2_ = (short)((uint)uVar1431 >> 0x10);
        auVar466._0_4_ = uVar1431;
        auVar465._4_12_ = auVar466._4_12_;
        auVar465._0_4_ = CONCAT22(uVar314,uVar1430);
        auVar743._12_2_ = (short)((ulong)uVar505 >> 0x30);
        auVar743._0_12_ = auVar800;
        auVar743._14_2_ = (short)((ulong)uVar783 >> 0x30);
        auVar742._12_4_ = auVar743._12_4_;
        auVar742._10_2_ = (short)((uint6)uVar782 >> 0x20);
        auVar742._0_10_ = auVar800._0_10_;
        auVar741._10_6_ = auVar742._10_6_;
        auVar741._8_2_ = (short)((uint6)uVar504 >> 0x20);
        auVar741._0_8_ = uVar505;
        auVar740._8_8_ = auVar741._8_8_;
        auVar740._6_2_ = (short)((uint)uVar781 >> 0x10);
        auVar740._0_6_ = uVar504;
        auVar739._6_10_ = auVar740._6_10_;
        auVar739._4_2_ = (short)((uint)auVar926._12_4_ >> 0x10);
        auVar739._0_4_ = auVar926._12_4_;
        auVar917._12_2_ = (short)((ulong)uVar1761 >> 0x30);
        auVar917._0_12_ = auVar1778;
        auVar917._14_2_ = (short)((ulong)uVar938 >> 0x30);
        auVar916._12_4_ = auVar917._12_4_;
        auVar916._10_2_ = (short)((uint6)uVar937 >> 0x20);
        auVar916._0_10_ = auVar1778._0_10_;
        auVar915._10_6_ = auVar916._10_6_;
        auVar915._8_2_ = (short)((uint6)uVar1760 >> 0x20);
        auVar915._0_8_ = uVar1761;
        auVar914._8_8_ = auVar915._8_8_;
        auVar914._6_2_ = (short)((uint)uVar936 >> 0x10);
        auVar914._0_6_ = uVar1760;
        auVar913._6_10_ = auVar914._6_10_;
        auVar913._4_2_ = (short)((uint)uVar1759 >> 0x10);
        auVar913._0_4_ = uVar1759;
        auVar912._4_12_ = auVar913._4_12_;
        auVar912._0_4_ = CONCAT22(uVar935,uVar1758);
        auVar1155._12_2_ = (short)((ulong)uVar1992 >> 0x30);
        auVar1155._0_12_ = auVar2009;
        auVar1155._14_2_ = (short)((ulong)uVar1913 >> 0x30);
        auVar1154._12_4_ = auVar1155._12_4_;
        auVar1154._10_2_ = (short)((uint6)uVar1912 >> 0x20);
        auVar1154._0_10_ = auVar2009._0_10_;
        auVar1153._10_6_ = auVar1154._10_6_;
        auVar1153._8_2_ = (short)((uint6)uVar1991 >> 0x20);
        auVar1153._0_8_ = uVar1992;
        auVar1152._8_8_ = auVar1153._8_8_;
        auVar1152._6_2_ = (short)((uint)uVar1911 >> 0x10);
        auVar1152._0_6_ = uVar1991;
        auVar1151._6_10_ = auVar1152._6_10_;
        auVar1151._4_2_ = (short)((uint)uVar1990 >> 0x10);
        auVar1151._0_4_ = uVar1990;
        auVar1336._0_8_ = auVar465._0_8_;
        auVar1336._8_4_ = auVar466._4_4_;
        auVar1336._12_4_ = auVar739._4_4_;
        auVar744._0_8_ = auVar912._0_8_;
        auVar744._8_4_ = auVar913._4_4_;
        auVar744._12_4_ = auVar1151._4_4_;
        local_15b8 = CONCAT44(CONCAT22(uVar780,uVar503),auVar465._0_4_);
        auStack_15b0[0] = CONCAT44(CONCAT22(uVar1910,uVar1989),auVar912._0_4_);
        auStack_15b0[1] = auVar1336._8_8_;
        auStack_15b0[2] = auVar744._8_8_;
        local_1598 = CONCAT44(auVar741._8_4_,auVar468._8_4_);
        uStack_1590 = CONCAT44(auVar1153._8_4_,auVar915._8_4_);
        local_1588._8_4_ = auVar469._12_4_;
        local_1588._12_4_ = auVar742._12_4_;
        auVar926._12_4_ =
             CONCAT22((short)((unkuint10)auVar530._0_10_ >> 0x40),
                      (short)((unkuint10)auVar1452._0_10_ >> 0x40));
        auVar1453._0_8_ = CONCAT26(auVar530._10_2_,CONCAT24(auVar1452._10_2_,auVar926._12_4_));
        auVar1453._8_2_ = auVar1463._12_2_;
        auVar1453._10_2_ = auVar545._12_2_;
        auVar1506._12_2_ = auVar1505._14_2_;
        auVar1506._0_12_ = auVar1453;
        auVar1506._14_2_ = auVar738._14_2_;
        auVar490._12_4_ =
             CONCAT22((short)((unkuint10)auVar962._0_10_ >> 0x40),
                      (short)((unkuint10)auVar800._0_10_ >> 0x40));
        auVar531._0_8_ = CONCAT26(auVar962._10_2_,CONCAT24(auVar800._10_2_,auVar490._12_4_));
        auVar531._8_2_ = auVar814._12_2_;
        auVar531._10_2_ = auVar974._12_2_;
        auVar745._12_2_ = auVar911._14_2_;
        auVar745._0_12_ = auVar531;
        auVar745._14_2_ = auVar1150._14_2_;
        uVar781 = CONCAT22((short)((unkuint10)auVar1188._0_10_ >> 0x40),
                           (short)((unkuint10)auVar1778._0_10_ >> 0x40));
        auVar1779._0_8_ = CONCAT26(auVar1188._10_2_,CONCAT24(auVar1778._10_2_,uVar781));
        auVar1779._8_2_ = auVar1788._12_2_;
        auVar1779._10_2_ = auVar1197._12_2_;
        auVar1820._12_2_ = auVar1819._14_2_;
        auVar1820._0_12_ = auVar1779;
        auVar1820._14_2_ = auVar1335._14_2_;
        uVar936 = CONCAT22((short)((unkuint10)auVar1922._0_10_ >> 0x40),
                           (short)((unkuint10)auVar2009._0_10_ >> 0x40));
        auVar2010._0_8_ = CONCAT26(auVar1922._10_2_,CONCAT24(auVar2009._10_2_,uVar936));
        auVar2010._8_2_ = auVar2019._12_2_;
        auVar2010._10_2_ = auVar1931._12_2_;
        auVar2037._12_2_ = auVar2036._14_2_;
        auVar2037._0_12_ = auVar2010;
        auVar2037._14_2_ = auVar1985._14_2_;
        auVar471._8_4_ = (int)((ulong)auVar1453._0_8_ >> 0x20);
        auVar471._0_8_ = auVar1453._0_8_;
        auVar471._12_4_ = (int)((ulong)auVar531._0_8_ >> 0x20);
        auVar746._8_4_ = (int)((ulong)auVar1779._0_8_ >> 0x20);
        auVar746._0_8_ = auVar1779._0_8_;
        auVar746._12_4_ = (int)((ulong)auVar2010._0_8_ >> 0x20);
        local_1578 = CONCAT44(auVar490._12_4_,auVar926._12_4_);
        uStack_1570 = CONCAT44(uVar936,uVar781);
        local_1568 = auVar471._8_8_;
        uStack_1560 = auVar746._8_8_;
        local_1558 = CONCAT44(auVar531._8_4_,auVar1453._8_4_);
        uStack_1550 = CONCAT44(auVar2010._8_4_,auVar1779._8_4_);
        local_1548._8_4_ = auVar1506._12_4_;
        local_1548._12_4_ = auVar745._12_4_;
        local_1538 = CONCAT44(auVar2037._12_4_,auVar1820._12_4_);
        puVar301 = dst + lVar300;
        lVar300 = 0;
        do {
          uVar316 = *(undefined8 *)((long)local_1638 + lVar300 + 8);
          *(undefined8 *)puVar301 = *(undefined8 *)((long)local_1638 + lVar300);
          *(undefined8 *)(puVar301 + 8) = uVar316;
          lVar300 = lVar300 + 0x10;
          puVar301 = puVar301 + stride;
        } while (lVar300 != 0x100);
        lVar300 = 0x10;
        pauVar303 = (undefined1 (*) [16])local_f38;
        bVar312 = false;
      } while (bVar299);
      break;
    case 7:
      uStack_1710 = 0x33fd48;
      dr_prediction_z1_32xN_sse4_1(0x40,local_1038,0x20,left,dy,iVar307);
      pitchSrc = 0x20;
      iVar307 = 0x40;
      iVar309 = 0x20;
      goto LAB_0033fd19;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      default: assert(0 && "Invalid block size");
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}